

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mish_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::Mish_x86_avx512::forward_inplace(Mish_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined8 uVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [56];
  undefined1 auVar200 [24];
  undefined1 auVar201 [32];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [16];
  undefined1 auVar205 [40];
  undefined1 auVar206 [48];
  undefined1 auVar207 [24];
  undefined1 auVar208 [40];
  undefined1 auVar209 [48];
  undefined1 auVar210 [56];
  undefined1 auVar211 [24];
  long *in_RSI;
  undefined1 auVar212 [64];
  undefined1 auVar213 [64];
  undefined1 auVar214 [64];
  undefined1 auVar215 [64];
  float fVar217;
  float fVar218;
  undefined1 auVar216 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  __m128 _p_2;
  __m256 _p_1;
  __m512 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  __m512 two;
  __m512 one_2;
  __m512 y_1;
  __m512 z;
  __m512 tmp_1;
  __mmask16 mask_1;
  __m512 e;
  __mmask16 invalid_mask;
  __m512 one_1;
  __m512i imm0_1;
  __m512 pow2n;
  __m512 y;
  __mmask16 mask;
  __m512 one;
  __m512i imm0;
  __m512 fx;
  __m512 tmp;
  __m512 one_3;
  __m512 pow2n_1;
  __m512 y_2;
  __mmask16 mask_2;
  __m512 one_4;
  __m512i imm0_2;
  __m512 fx_1;
  __m512 tmp_2;
  __m256 two_1;
  __m256 one_7;
  __m256 y_4;
  __m256 z_1;
  __m256 tmp_4;
  __m256 mask_4;
  __m256 e_1;
  __m256 invalid_mask_1;
  __m256 one_6;
  __m256i imm0_4;
  __m256 pow2n_2;
  __m256 y_3;
  __m256 mask_3;
  __m256 one_5;
  __m256i imm0_3;
  __m256 fx_2;
  __m256 tmp_3;
  __m256 one_8;
  __m256 pow2n_3;
  __m256 y_5;
  __m256 mask_5;
  __m256 one_9;
  __m256i imm0_5;
  __m256 fx_3;
  __m256 tmp_5;
  __m128 two_2;
  __m128 one_12;
  v4sf y_7;
  v4sf z_2;
  v4sf tmp_7;
  v4sf mask_7;
  v4sf e_2;
  v4sf invalid_mask_2;
  v4sf one_11;
  v4si emm0_1;
  v4sf pow2n_4;
  v4sf y_6;
  v4sf mask_6;
  v4sf one_10;
  v4si emm0;
  v4sf fx_4;
  v4sf tmp_6;
  __m128 one_13;
  v4sf pow2n_5;
  v4sf y_8;
  v4sf mask_8;
  v4sf one_14;
  v4si emm0_2;
  v4sf fx_5;
  v4sf tmp_8;
  undefined8 local_6df0;
  undefined8 uStack_6de8;
  undefined8 local_6de0;
  undefined8 uStack_6dd8;
  undefined8 uStack_6dd0;
  undefined8 uStack_6dc8;
  undefined8 local_6dc0;
  undefined8 uStack_6db8;
  undefined8 uStack_6db0;
  undefined8 uStack_6da8;
  undefined8 uStack_6da0;
  undefined8 uStack_6d98;
  undefined8 uStack_6d90;
  undefined8 uStack_6d88;
  int local_6d58;
  undefined8 local_6d48;
  undefined8 local_6d40;
  undefined8 local_6d38;
  undefined4 local_6d30;
  long local_6d28;
  undefined4 local_6d20;
  undefined4 local_6d1c;
  undefined4 local_6d18;
  undefined4 local_6d14;
  undefined4 local_6d10;
  undefined8 local_6d08;
  undefined1 (*local_6d00) [64];
  int local_6cf4;
  int local_6cf0;
  int local_6cec;
  int local_6ce8;
  int local_6ce4;
  int local_6ce0;
  int local_6cdc;
  long *local_6cd0;
  undefined1 local_6cbd;
  int local_6cbc;
  undefined8 *local_6cb0;
  undefined8 *local_6ca8;
  undefined8 *local_6c98;
  undefined1 (*local_6c88) [64];
  undefined8 local_6c80;
  undefined8 uStack_6c78;
  undefined8 uStack_6c70;
  undefined8 uStack_6c68;
  undefined8 uStack_6c60;
  undefined8 uStack_6c58;
  undefined8 uStack_6c50;
  undefined8 uStack_6c48;
  undefined8 local_6c40;
  undefined8 uStack_6c38;
  undefined8 uStack_6c30;
  undefined8 uStack_6c28;
  undefined8 uStack_6c20;
  undefined8 uStack_6c18;
  undefined8 uStack_6c10;
  undefined8 uStack_6c08;
  undefined1 (*local_6bf0) [64];
  undefined1 (*local_6be8) [64];
  undefined8 local_6be0;
  undefined8 uStack_6bd8;
  undefined8 uStack_6bd0;
  undefined8 uStack_6bc8;
  undefined8 local_6bc0;
  undefined8 uStack_6bb8;
  undefined8 uStack_6bb0;
  undefined8 uStack_6ba8;
  undefined1 (*local_6b90) [64];
  undefined1 (*local_6b88) [64];
  undefined8 local_6b80;
  undefined8 uStack_6b78;
  undefined8 local_6b70;
  undefined8 uStack_6b68;
  undefined1 (*local_6b58) [64];
  long local_6b50;
  undefined4 local_6b44;
  long local_6b40;
  undefined1 (*local_6b38) [64];
  undefined4 local_6b2c;
  int local_6b28;
  int local_6b24;
  undefined8 *local_6b20;
  undefined4 local_6b14;
  long local_6b10;
  undefined8 *local_6af0;
  undefined1 local_6ac0 [64];
  undefined1 local_6a80 [64];
  undefined8 local_6a40;
  undefined8 uStack_6a38;
  undefined8 uStack_6a30;
  undefined8 uStack_6a28;
  undefined8 uStack_6a20;
  undefined8 uStack_6a18;
  undefined8 uStack_6a10;
  undefined8 uStack_6a08;
  undefined8 local_6a00;
  undefined8 uStack_69f8;
  undefined8 uStack_69f0;
  undefined8 uStack_69e8;
  undefined8 uStack_69e0;
  undefined8 uStack_69d8;
  undefined8 uStack_69d0;
  undefined8 uStack_69c8;
  undefined8 local_69c0;
  undefined8 uStack_69b8;
  undefined8 uStack_69b0;
  undefined8 uStack_69a8;
  undefined8 uStack_69a0;
  undefined8 uStack_6998;
  undefined8 uStack_6990;
  undefined8 uStack_6988;
  undefined8 local_6980;
  undefined8 uStack_6978;
  undefined8 uStack_6970;
  undefined8 uStack_6968;
  undefined8 uStack_6960;
  undefined8 uStack_6958;
  undefined8 uStack_6950;
  undefined8 uStack_6948;
  undefined8 local_6940;
  undefined8 uStack_6938;
  undefined8 uStack_6930;
  undefined8 uStack_6928;
  undefined8 uStack_6920;
  undefined8 uStack_6918;
  undefined8 uStack_6910;
  undefined8 uStack_6908;
  undefined1 local_6900 [8];
  undefined8 uStack_68f8;
  undefined8 uStack_68f0;
  undefined8 uStack_68e8;
  undefined8 uStack_68e0;
  undefined8 uStack_68d8;
  undefined8 uStack_68d0;
  undefined8 uStack_68c8;
  undefined1 local_68c0 [64];
  undefined1 local_6880 [64];
  ushort local_6802;
  undefined1 local_6800 [16];
  undefined8 uStack_67f0;
  undefined8 uStack_67e8;
  undefined8 uStack_67e0;
  undefined8 uStack_67d8;
  undefined8 uStack_67d0;
  undefined8 uStack_67c8;
  undefined2 local_6782;
  float local_6780 [2];
  float afStack_6778 [2];
  float afStack_6770 [2];
  float afStack_6768 [2];
  float afStack_6760 [2];
  float afStack_6758 [2];
  float afStack_6750 [2];
  float afStack_6748 [2];
  undefined1 local_6740 [64];
  undefined1 local_6700 [64];
  undefined8 local_66c0;
  undefined8 uStack_66b8;
  undefined8 uStack_66b0;
  undefined8 uStack_66a8;
  undefined8 uStack_66a0;
  undefined8 uStack_6698;
  undefined8 uStack_6690;
  undefined8 uStack_6688;
  undefined8 local_6680;
  undefined8 uStack_6678;
  undefined8 uStack_6670;
  undefined8 uStack_6668;
  undefined8 uStack_6660;
  undefined8 uStack_6658;
  undefined8 uStack_6650;
  undefined8 uStack_6648;
  undefined8 local_6640;
  undefined8 uStack_6638;
  undefined8 uStack_6630;
  undefined8 uStack_6628;
  undefined8 uStack_6620;
  undefined8 uStack_6618;
  undefined8 uStack_6610;
  undefined8 uStack_6608;
  undefined8 local_6600;
  undefined8 uStack_65f8;
  undefined8 uStack_65f0;
  undefined8 uStack_65e8;
  undefined8 uStack_65e0;
  undefined8 uStack_65d8;
  undefined8 uStack_65d0;
  undefined8 uStack_65c8;
  undefined8 local_65c0;
  undefined8 uStack_65b8;
  undefined8 uStack_65b0;
  undefined8 uStack_65a8;
  undefined8 uStack_65a0;
  undefined8 uStack_6598;
  undefined8 uStack_6590;
  undefined8 uStack_6588;
  undefined8 local_6580;
  undefined8 uStack_6578;
  undefined8 uStack_6570;
  undefined8 uStack_6568;
  undefined8 uStack_6560;
  undefined8 uStack_6558;
  undefined8 uStack_6550;
  undefined8 uStack_6548;
  undefined8 local_6540;
  undefined8 uStack_6538;
  undefined8 uStack_6530;
  undefined8 uStack_6528;
  undefined8 uStack_6520;
  undefined8 uStack_6518;
  undefined8 uStack_6510;
  undefined8 uStack_6508;
  undefined8 local_6500;
  undefined8 uStack_64f8;
  undefined8 uStack_64f0;
  undefined8 uStack_64e8;
  undefined8 uStack_64e0;
  undefined8 uStack_64d8;
  undefined8 uStack_64d0;
  undefined8 uStack_64c8;
  float local_64c0 [2];
  float afStack_64b8 [2];
  float afStack_64b0 [2];
  float afStack_64a8 [2];
  float afStack_64a0 [2];
  float afStack_6498 [2];
  float afStack_6490 [2];
  float afStack_6488 [2];
  undefined8 local_6480;
  undefined8 uStack_6478;
  undefined8 uStack_6470;
  undefined8 uStack_6468;
  undefined8 uStack_6460;
  undefined8 uStack_6458;
  undefined8 uStack_6450;
  undefined8 uStack_6448;
  undefined8 local_6440;
  undefined8 uStack_6438;
  undefined8 uStack_6430;
  undefined8 uStack_6428;
  undefined8 uStack_6420;
  undefined8 uStack_6418;
  undefined8 uStack_6410;
  undefined8 uStack_6408;
  undefined8 local_6400;
  undefined8 uStack_63f8;
  undefined8 uStack_63f0;
  undefined8 uStack_63e8;
  undefined8 uStack_63e0;
  undefined8 uStack_63d8;
  undefined8 uStack_63d0;
  undefined8 uStack_63c8;
  undefined1 local_63c0 [64];
  undefined1 local_6380 [8];
  undefined8 uStack_6378;
  undefined8 uStack_6370;
  undefined8 uStack_6368;
  undefined8 uStack_6360;
  undefined8 uStack_6358;
  undefined8 uStack_6350;
  undefined8 uStack_6348;
  ushort local_6302;
  float local_6300 [2];
  float afStack_62f8 [2];
  float afStack_62f0 [2];
  float afStack_62e8 [2];
  float afStack_62e0 [2];
  float afStack_62d8 [2];
  float afStack_62d0 [2];
  float afStack_62c8 [2];
  undefined1 local_62c0 [64];
  undefined1 local_6280 [16];
  undefined8 uStack_6270;
  undefined8 uStack_6268;
  undefined8 uStack_6260;
  undefined8 uStack_6258;
  undefined8 uStack_6250;
  undefined8 uStack_6248;
  undefined1 local_6240 [64];
  undefined1 local_6200 [64];
  undefined8 local_61c0;
  undefined8 uStack_61b8;
  undefined8 uStack_61b0;
  undefined8 uStack_61a8;
  undefined8 uStack_61a0;
  undefined8 uStack_6198;
  undefined8 uStack_6190;
  undefined8 uStack_6188;
  undefined8 local_6180;
  undefined8 uStack_6178;
  undefined8 uStack_6170;
  undefined8 uStack_6168;
  undefined8 uStack_6160;
  undefined8 uStack_6158;
  undefined8 uStack_6150;
  undefined8 uStack_6148;
  undefined8 local_6140;
  undefined8 uStack_6138;
  undefined8 uStack_6130;
  undefined8 uStack_6128;
  undefined8 uStack_6120;
  undefined8 uStack_6118;
  undefined8 uStack_6110;
  undefined8 uStack_6108;
  undefined8 local_6100;
  undefined8 uStack_60f8;
  undefined8 uStack_60f0;
  undefined8 uStack_60e8;
  undefined8 uStack_60e0;
  undefined8 uStack_60d8;
  undefined8 uStack_60d0;
  undefined8 uStack_60c8;
  float local_60c0 [2];
  float afStack_60b8 [2];
  float afStack_60b0 [2];
  float afStack_60a8 [2];
  float afStack_60a0 [2];
  float afStack_6098 [2];
  float afStack_6090 [2];
  float afStack_6088 [2];
  undefined8 local_6080;
  undefined8 uStack_6078;
  undefined8 uStack_6070;
  undefined8 uStack_6068;
  undefined8 uStack_6060;
  undefined8 uStack_6058;
  undefined8 uStack_6050;
  undefined8 uStack_6048;
  undefined1 local_6040 [64];
  undefined4 local_5fc4;
  undefined1 local_5fc0 [64];
  undefined4 local_5f44;
  undefined1 local_5f40 [64];
  undefined4 local_5ec4;
  undefined8 local_5ec0;
  undefined8 uStack_5eb8;
  undefined8 uStack_5eb0;
  undefined8 uStack_5ea8;
  undefined8 uStack_5ea0;
  undefined8 uStack_5e98;
  undefined8 uStack_5e90;
  undefined8 uStack_5e88;
  undefined8 local_5e80;
  undefined8 uStack_5e78;
  undefined8 uStack_5e70;
  undefined8 uStack_5e68;
  undefined8 uStack_5e60;
  undefined8 uStack_5e58;
  undefined8 uStack_5e50;
  undefined8 uStack_5e48;
  undefined1 local_5e40 [64];
  undefined8 local_5e00;
  undefined8 uStack_5df8;
  undefined8 uStack_5df0;
  undefined8 uStack_5de8;
  undefined8 uStack_5de0;
  undefined8 uStack_5dd8;
  undefined8 uStack_5dd0;
  undefined8 uStack_5dc8;
  undefined1 local_5dc0 [64];
  undefined8 local_5d80;
  undefined8 uStack_5d78;
  undefined8 uStack_5d70;
  undefined8 uStack_5d68;
  undefined8 uStack_5d60;
  undefined8 uStack_5d58;
  undefined8 uStack_5d50;
  undefined8 uStack_5d48;
  undefined8 local_5d40;
  undefined8 uStack_5d38;
  undefined8 uStack_5d30;
  undefined8 uStack_5d28;
  undefined8 uStack_5d20;
  undefined8 uStack_5d18;
  undefined8 uStack_5d10;
  undefined8 uStack_5d08;
  undefined1 local_5d00 [64];
  undefined1 local_5cc0 [8];
  undefined8 uStack_5cb8;
  undefined8 uStack_5cb0;
  undefined8 uStack_5ca8;
  undefined8 uStack_5ca0;
  undefined8 uStack_5c98;
  undefined8 uStack_5c90;
  undefined8 uStack_5c88;
  ushort local_5c42;
  float local_5c40 [2];
  float afStack_5c38 [2];
  float afStack_5c30 [2];
  float afStack_5c28 [2];
  float afStack_5c20 [2];
  float afStack_5c18 [2];
  float afStack_5c10 [2];
  float afStack_5c08 [2];
  undefined1 local_5c00 [64];
  undefined1 local_5bc0 [16];
  undefined8 uStack_5bb0;
  undefined8 uStack_5ba8;
  undefined8 uStack_5ba0;
  undefined8 uStack_5b98;
  undefined8 uStack_5b90;
  undefined8 uStack_5b88;
  undefined1 local_5b80 [64];
  undefined1 local_5b40 [64];
  undefined8 local_5b00;
  undefined8 uStack_5af8;
  undefined8 uStack_5af0;
  undefined8 uStack_5ae8;
  undefined8 uStack_5ae0;
  undefined8 uStack_5ad8;
  undefined8 uStack_5ad0;
  undefined8 uStack_5ac8;
  undefined8 local_5ac0;
  undefined8 uStack_5ab8;
  undefined8 uStack_5ab0;
  undefined8 uStack_5aa8;
  undefined8 uStack_5aa0;
  undefined8 uStack_5a98;
  undefined8 uStack_5a90;
  undefined8 uStack_5a88;
  undefined8 local_5a80;
  undefined8 uStack_5a78;
  undefined8 uStack_5a70;
  undefined8 uStack_5a68;
  undefined8 uStack_5a60;
  undefined8 uStack_5a58;
  undefined8 uStack_5a50;
  undefined8 uStack_5a48;
  undefined8 local_5a40;
  undefined8 uStack_5a38;
  undefined8 uStack_5a30;
  undefined8 uStack_5a28;
  undefined8 uStack_5a20;
  undefined8 uStack_5a18;
  undefined8 uStack_5a10;
  undefined8 uStack_5a08;
  float local_5a00 [2];
  float afStack_59f8 [2];
  float afStack_59f0 [2];
  float afStack_59e8 [2];
  float afStack_59e0 [2];
  float afStack_59d8 [2];
  float afStack_59d0 [2];
  float afStack_59c8 [2];
  undefined8 local_59c0;
  undefined8 uStack_59b8;
  undefined8 uStack_59b0;
  undefined8 uStack_59a8;
  undefined8 uStack_59a0;
  undefined8 uStack_5998;
  undefined8 uStack_5990;
  undefined8 uStack_5988;
  undefined1 local_5980 [64];
  undefined4 local_5904;
  undefined1 local_5900 [64];
  undefined8 local_58c0;
  undefined8 uStack_58b8;
  undefined8 uStack_58b0;
  undefined8 uStack_58a8;
  undefined8 uStack_58a0;
  undefined8 uStack_5898;
  undefined8 uStack_5890;
  undefined8 uStack_5888;
  undefined8 local_5880;
  undefined8 uStack_5878;
  undefined8 uStack_5870;
  undefined8 uStack_5868;
  undefined8 uStack_5860;
  undefined8 uStack_5858;
  undefined8 uStack_5850;
  undefined8 uStack_5848;
  undefined8 local_5840;
  undefined8 uStack_5838;
  undefined8 uStack_5830;
  undefined8 uStack_5828;
  undefined8 uStack_5820;
  undefined8 uStack_5818;
  undefined8 uStack_5810;
  undefined8 uStack_5808;
  float local_5800 [2];
  float afStack_57f8 [2];
  float afStack_57f0 [2];
  float afStack_57e8 [2];
  float afStack_57e0 [2];
  float afStack_57d8 [2];
  float afStack_57d0 [2];
  float afStack_57c8 [2];
  undefined8 local_57c0;
  undefined8 uStack_57b8;
  undefined8 uStack_57b0;
  undefined8 uStack_57a8;
  undefined8 uStack_57a0;
  undefined8 uStack_5798;
  undefined8 uStack_5790;
  undefined8 uStack_5788;
  undefined8 local_5780;
  undefined8 uStack_5778;
  undefined8 uStack_5770;
  undefined8 uStack_5768;
  undefined8 uStack_5760;
  undefined8 uStack_5758;
  undefined8 uStack_5750;
  undefined8 uStack_5748;
  undefined8 local_5740;
  undefined8 uStack_5738;
  undefined8 uStack_5730;
  undefined8 uStack_5728;
  undefined8 uStack_5720;
  undefined8 uStack_5718;
  undefined8 uStack_5710;
  undefined8 uStack_5708;
  undefined8 local_5700;
  undefined8 uStack_56f8;
  undefined8 uStack_56f0;
  undefined8 uStack_56e8;
  undefined8 uStack_56e0;
  undefined8 uStack_56d8;
  undefined8 uStack_56d0;
  undefined8 uStack_56c8;
  undefined8 local_56c0;
  undefined8 uStack_56b8;
  undefined8 uStack_56b0;
  undefined8 uStack_56a8;
  undefined8 uStack_56a0;
  undefined8 uStack_5698;
  undefined8 uStack_5690;
  undefined8 uStack_5688;
  float local_5680 [2];
  float afStack_5678 [2];
  float afStack_5670 [2];
  float afStack_5668 [2];
  float afStack_5660 [2];
  float afStack_5658 [2];
  float afStack_5650 [2];
  float afStack_5648 [2];
  undefined8 local_5640;
  undefined8 uStack_5638;
  undefined8 uStack_5630;
  undefined8 uStack_5628;
  undefined8 uStack_5620;
  undefined8 uStack_5618;
  undefined8 uStack_5610;
  undefined8 uStack_5608;
  float local_5600 [2];
  float afStack_55f8 [2];
  float afStack_55f0 [2];
  float afStack_55e8 [2];
  float afStack_55e0 [2];
  float afStack_55d8 [2];
  float afStack_55d0 [2];
  float afStack_55c8 [2];
  undefined8 local_55c0;
  undefined8 uStack_55b8;
  undefined8 uStack_55b0;
  undefined8 uStack_55a8;
  undefined8 uStack_55a0;
  undefined8 uStack_5598;
  undefined8 uStack_5590;
  undefined8 uStack_5588;
  int local_5580 [2];
  int aiStack_5578 [2];
  int aiStack_5570 [2];
  int aiStack_5568 [2];
  int aiStack_5560 [2];
  int aiStack_5558 [2];
  int aiStack_5550 [2];
  int aiStack_5548 [2];
  undefined8 local_5540;
  undefined8 uStack_5538;
  undefined8 uStack_5530;
  undefined8 uStack_5528;
  undefined8 uStack_5520;
  undefined8 uStack_5518;
  undefined8 uStack_5510;
  undefined8 uStack_5508;
  undefined4 local_54c4;
  undefined8 local_54c0;
  undefined8 uStack_54b8;
  undefined8 uStack_54b0;
  undefined8 uStack_54a8;
  undefined8 uStack_54a0;
  undefined8 uStack_5498;
  undefined8 uStack_5490;
  undefined8 uStack_5488;
  undefined8 local_5480;
  undefined8 uStack_5478;
  undefined8 uStack_5470;
  undefined8 uStack_5468;
  undefined8 uStack_5460;
  undefined8 uStack_5458;
  undefined8 uStack_5450;
  undefined8 uStack_5448;
  int local_5440 [2];
  int aiStack_5438 [2];
  int aiStack_5430 [2];
  int aiStack_5428 [2];
  int aiStack_5420 [2];
  int aiStack_5418 [2];
  int aiStack_5410 [2];
  int aiStack_5408 [2];
  undefined8 local_5400;
  undefined8 uStack_53f8;
  undefined8 uStack_53f0;
  undefined8 uStack_53e8;
  undefined8 uStack_53e0;
  undefined8 uStack_53d8;
  undefined8 uStack_53d0;
  undefined8 uStack_53c8;
  undefined1 local_53c0 [64];
  undefined8 local_5380;
  undefined8 uStack_5378;
  undefined8 uStack_5370;
  undefined8 uStack_5368;
  undefined8 uStack_5360;
  undefined8 uStack_5358;
  undefined8 uStack_5350;
  undefined8 uStack_5348;
  float local_5340 [2];
  float afStack_5338 [2];
  float afStack_5330 [2];
  float afStack_5328 [2];
  float afStack_5320 [2];
  float afStack_5318 [2];
  float afStack_5310 [2];
  float afStack_5308 [2];
  undefined8 local_5300;
  undefined8 uStack_52f8;
  undefined8 uStack_52f0;
  undefined8 uStack_52e8;
  undefined8 uStack_52e0;
  undefined8 uStack_52d8;
  undefined8 uStack_52d0;
  undefined8 uStack_52c8;
  undefined1 local_52c0 [64];
  undefined1 local_5280 [64];
  undefined1 local_5240 [64];
  float local_5200 [2];
  float afStack_51f8 [2];
  float afStack_51f0 [2];
  float afStack_51e8 [2];
  float afStack_51e0 [2];
  float afStack_51d8 [2];
  float afStack_51d0 [2];
  float afStack_51c8 [2];
  undefined8 local_51c0;
  undefined8 uStack_51b8;
  undefined8 uStack_51b0;
  undefined8 uStack_51a8;
  undefined8 uStack_51a0;
  undefined8 uStack_5198;
  undefined8 uStack_5190;
  undefined8 uStack_5188;
  ushort local_5142;
  undefined8 local_5140;
  undefined8 uStack_5138;
  undefined8 uStack_5130;
  undefined8 uStack_5128;
  undefined8 uStack_5120;
  undefined8 uStack_5118;
  undefined8 uStack_5110;
  undefined8 uStack_5108;
  float local_5100 [2];
  float afStack_50f8 [2];
  float afStack_50f0 [2];
  float afStack_50e8 [2];
  float afStack_50e0 [2];
  float afStack_50d8 [2];
  float afStack_50d0 [2];
  float afStack_50c8 [2];
  undefined8 local_50c0;
  undefined8 uStack_50b8;
  undefined8 uStack_50b0;
  undefined8 uStack_50a8;
  undefined8 uStack_50a0;
  undefined8 uStack_5098;
  undefined8 uStack_5090;
  undefined8 uStack_5088;
  float local_5080 [2];
  float afStack_5078 [2];
  float afStack_5070 [2];
  float afStack_5068 [2];
  float afStack_5060 [2];
  float afStack_5058 [2];
  float afStack_5050 [2];
  float afStack_5048 [2];
  undefined8 local_5040;
  undefined8 uStack_5038;
  undefined8 uStack_5030;
  undefined8 uStack_5028;
  undefined8 uStack_5020;
  undefined8 uStack_5018;
  undefined8 uStack_5010;
  undefined8 uStack_5008;
  ushort local_4fc2;
  undefined8 local_4fc0;
  undefined8 uStack_4fb8;
  undefined8 uStack_4fb0;
  undefined8 uStack_4fa8;
  undefined8 uStack_4fa0;
  undefined8 uStack_4f98;
  undefined8 uStack_4f90;
  undefined8 uStack_4f88;
  float local_4f80 [2];
  float afStack_4f78 [2];
  float afStack_4f70 [2];
  float afStack_4f68 [2];
  float afStack_4f60 [2];
  float afStack_4f58 [2];
  float afStack_4f50 [2];
  float afStack_4f48 [2];
  undefined8 local_4f40;
  undefined8 uStack_4f38;
  undefined8 uStack_4f30;
  undefined8 uStack_4f28;
  undefined8 uStack_4f20;
  undefined8 uStack_4f18;
  undefined8 uStack_4f10;
  undefined8 uStack_4f08;
  float local_4f00 [2];
  float afStack_4ef8 [2];
  float afStack_4ef0 [2];
  float afStack_4ee8 [2];
  float afStack_4ee0 [2];
  float afStack_4ed8 [2];
  float afStack_4ed0 [2];
  float afStack_4ec8 [2];
  undefined8 local_4ec0;
  undefined8 uStack_4eb8;
  undefined8 uStack_4eb0;
  undefined8 uStack_4ea8;
  undefined8 uStack_4ea0;
  undefined8 uStack_4e98;
  undefined8 uStack_4e90;
  undefined8 uStack_4e88;
  ushort local_4e42;
  undefined8 local_4e40;
  undefined8 uStack_4e38;
  undefined8 uStack_4e30;
  undefined8 uStack_4e28;
  undefined8 uStack_4e20;
  undefined8 uStack_4e18;
  undefined8 uStack_4e10;
  undefined8 uStack_4e08;
  float local_4e00 [2];
  float afStack_4df8 [2];
  float afStack_4df0 [2];
  float afStack_4de8 [2];
  float afStack_4de0 [2];
  float afStack_4dd8 [2];
  float afStack_4dd0 [2];
  float afStack_4dc8 [2];
  undefined8 local_4dc0;
  undefined8 uStack_4db8;
  undefined8 uStack_4db0;
  undefined8 uStack_4da8;
  undefined8 uStack_4da0;
  undefined8 uStack_4d98;
  undefined8 uStack_4d90;
  undefined8 uStack_4d88;
  undefined8 local_4d80;
  undefined8 uStack_4d78;
  undefined8 uStack_4d70;
  undefined8 uStack_4d68;
  undefined8 uStack_4d60;
  undefined8 uStack_4d58;
  undefined8 uStack_4d50;
  undefined8 uStack_4d48;
  undefined8 local_4d40;
  undefined8 uStack_4d38;
  undefined8 uStack_4d30;
  undefined8 uStack_4d28;
  undefined8 uStack_4d20;
  undefined8 uStack_4d18;
  undefined8 uStack_4d10;
  undefined8 uStack_4d08;
  ushort local_4cc2;
  undefined8 local_4cc0;
  undefined8 uStack_4cb8;
  undefined8 uStack_4cb0;
  undefined8 uStack_4ca8;
  undefined8 uStack_4ca0;
  undefined8 uStack_4c98;
  undefined8 uStack_4c90;
  undefined8 uStack_4c88;
  undefined8 local_4c80;
  undefined8 uStack_4c78;
  undefined8 uStack_4c70;
  undefined8 uStack_4c68;
  undefined8 uStack_4c60;
  undefined8 uStack_4c58;
  undefined8 uStack_4c50;
  undefined8 uStack_4c48;
  undefined8 local_4c40;
  undefined8 uStack_4c38;
  undefined8 uStack_4c30;
  undefined8 uStack_4c28;
  undefined8 uStack_4c20;
  undefined8 uStack_4c18;
  undefined8 uStack_4c10;
  undefined8 uStack_4c08;
  undefined8 local_4c00;
  undefined8 uStack_4bf8;
  undefined8 uStack_4bf0;
  undefined8 uStack_4be8;
  undefined8 uStack_4be0;
  undefined8 uStack_4bd8;
  undefined8 uStack_4bd0;
  undefined8 uStack_4bc8;
  undefined8 local_4bc0;
  undefined8 uStack_4bb8;
  undefined8 uStack_4bb0;
  undefined8 uStack_4ba8;
  undefined8 uStack_4ba0;
  undefined8 uStack_4b98;
  undefined8 uStack_4b90;
  undefined8 uStack_4b88;
  undefined8 local_4b80;
  undefined8 uStack_4b78;
  undefined8 uStack_4b70;
  undefined8 uStack_4b68;
  undefined8 uStack_4b60;
  undefined8 uStack_4b58;
  undefined8 uStack_4b50;
  undefined8 uStack_4b48;
  float local_4b40 [2];
  float afStack_4b38 [2];
  float afStack_4b30 [2];
  float afStack_4b28 [2];
  float afStack_4b20 [2];
  float afStack_4b18 [2];
  float afStack_4b10 [2];
  float afStack_4b08 [2];
  undefined8 local_4b00;
  undefined8 uStack_4af8;
  undefined8 uStack_4af0;
  undefined8 uStack_4ae8;
  undefined8 uStack_4ae0;
  undefined8 uStack_4ad8;
  undefined8 uStack_4ad0;
  undefined8 uStack_4ac8;
  undefined8 local_4ac0;
  undefined8 uStack_4ab8;
  undefined8 uStack_4ab0;
  undefined8 uStack_4aa8;
  undefined8 uStack_4aa0;
  undefined8 uStack_4a98;
  undefined8 uStack_4a90;
  undefined8 uStack_4a88;
  float local_4a80 [2];
  float afStack_4a78 [2];
  float afStack_4a70 [2];
  float afStack_4a68 [2];
  float afStack_4a60 [2];
  float afStack_4a58 [2];
  float afStack_4a50 [2];
  float afStack_4a48 [2];
  undefined8 local_4a40;
  undefined8 uStack_4a38;
  undefined8 uStack_4a30;
  undefined8 uStack_4a28;
  undefined8 uStack_4a20;
  undefined8 uStack_4a18;
  undefined8 uStack_4a10;
  undefined8 uStack_4a08;
  undefined8 local_4a00;
  undefined8 uStack_49f8;
  undefined8 uStack_49f0;
  undefined8 uStack_49e8;
  undefined8 uStack_49e0;
  undefined8 uStack_49d8;
  undefined8 uStack_49d0;
  undefined8 uStack_49c8;
  float local_49c0 [2];
  float afStack_49b8 [2];
  float afStack_49b0 [2];
  float afStack_49a8 [2];
  float afStack_49a0 [2];
  float afStack_4998 [2];
  float afStack_4990 [2];
  float afStack_4988 [2];
  undefined8 local_4980;
  undefined8 uStack_4978;
  undefined8 uStack_4970;
  undefined8 uStack_4968;
  undefined8 uStack_4960;
  undefined8 uStack_4958;
  undefined8 uStack_4950;
  undefined8 uStack_4948;
  undefined8 local_4940;
  undefined8 uStack_4938;
  undefined8 uStack_4930;
  undefined8 uStack_4928;
  undefined8 uStack_4920;
  undefined8 uStack_4918;
  undefined8 uStack_4910;
  undefined8 uStack_4908;
  float local_4900 [2];
  float afStack_48f8 [2];
  float afStack_48f0 [2];
  float afStack_48e8 [2];
  float afStack_48e0 [2];
  float afStack_48d8 [2];
  float afStack_48d0 [2];
  float afStack_48c8 [2];
  undefined8 local_48c0;
  undefined8 uStack_48b8;
  undefined8 uStack_48b0;
  undefined8 uStack_48a8;
  undefined8 uStack_48a0;
  undefined8 uStack_4898;
  undefined8 uStack_4890;
  undefined8 uStack_4888;
  undefined8 local_4880;
  undefined8 uStack_4878;
  undefined8 uStack_4870;
  undefined8 uStack_4868;
  undefined8 uStack_4860;
  undefined8 uStack_4858;
  undefined8 uStack_4850;
  undefined8 uStack_4848;
  float local_4840 [2];
  float afStack_4838 [2];
  float afStack_4830 [2];
  float afStack_4828 [2];
  float afStack_4820 [2];
  float afStack_4818 [2];
  float afStack_4810 [2];
  float afStack_4808 [2];
  undefined8 local_4800;
  undefined8 uStack_47f8;
  undefined8 uStack_47f0;
  undefined8 uStack_47e8;
  undefined8 uStack_47e0;
  undefined8 uStack_47d8;
  undefined8 uStack_47d0;
  undefined8 uStack_47c8;
  float local_47c0 [2];
  float afStack_47b8 [2];
  float afStack_47b0 [2];
  float afStack_47a8 [2];
  float afStack_47a0 [2];
  float afStack_4798 [2];
  float afStack_4790 [2];
  float afStack_4788 [2];
  float local_4780 [2];
  float afStack_4778 [2];
  float afStack_4770 [2];
  float afStack_4768 [2];
  float afStack_4760 [2];
  float afStack_4758 [2];
  float afStack_4750 [2];
  float afStack_4748 [2];
  float local_4740 [2];
  float afStack_4738 [2];
  float afStack_4730 [2];
  float afStack_4728 [2];
  float afStack_4720 [2];
  float afStack_4718 [2];
  float afStack_4710 [2];
  float afStack_4708 [2];
  undefined8 local_4700;
  undefined8 uStack_46f8;
  undefined8 uStack_46f0;
  undefined8 uStack_46e8;
  undefined8 uStack_46e0;
  undefined8 uStack_46d8;
  undefined8 uStack_46d0;
  undefined8 uStack_46c8;
  undefined8 local_46c0;
  undefined8 uStack_46b8;
  undefined8 uStack_46b0;
  undefined8 uStack_46a8;
  undefined8 uStack_46a0;
  undefined8 uStack_4698;
  undefined8 uStack_4690;
  undefined8 uStack_4688;
  undefined8 local_4680;
  undefined8 uStack_4678;
  undefined8 uStack_4670;
  undefined8 uStack_4668;
  undefined8 uStack_4660;
  undefined8 uStack_4658;
  undefined8 uStack_4650;
  undefined8 uStack_4648;
  undefined8 local_4640;
  undefined8 uStack_4638;
  undefined8 uStack_4630;
  undefined8 uStack_4628;
  undefined8 uStack_4620;
  undefined8 uStack_4618;
  undefined8 uStack_4610;
  undefined8 uStack_4608;
  float local_4600 [2];
  float afStack_45f8 [2];
  float afStack_45f0 [2];
  float afStack_45e8 [2];
  float afStack_45e0 [2];
  float afStack_45d8 [2];
  float afStack_45d0 [2];
  float afStack_45c8 [2];
  undefined8 local_45c0;
  undefined8 uStack_45b8;
  undefined8 uStack_45b0;
  undefined8 uStack_45a8;
  undefined8 uStack_45a0;
  undefined8 uStack_4598;
  undefined8 uStack_4590;
  undefined8 uStack_4588;
  undefined8 local_4580;
  undefined8 uStack_4578;
  undefined8 uStack_4570;
  undefined8 uStack_4568;
  undefined8 uStack_4560;
  undefined8 uStack_4558;
  undefined8 uStack_4550;
  undefined8 uStack_4548;
  float local_4540 [2];
  float afStack_4538 [2];
  float afStack_4530 [2];
  float afStack_4528 [2];
  float afStack_4520 [2];
  float afStack_4518 [2];
  float afStack_4510 [2];
  float afStack_4508 [2];
  undefined8 local_4500;
  undefined8 uStack_44f8;
  undefined8 uStack_44f0;
  undefined8 uStack_44e8;
  undefined8 uStack_44e0;
  undefined8 uStack_44d8;
  undefined8 uStack_44d0;
  undefined8 uStack_44c8;
  undefined8 local_44c0;
  undefined8 uStack_44b8;
  undefined8 uStack_44b0;
  undefined8 uStack_44a8;
  undefined8 uStack_44a0;
  undefined8 uStack_4498;
  undefined8 uStack_4490;
  undefined8 uStack_4488;
  float local_4480 [2];
  float afStack_4478 [2];
  float afStack_4470 [2];
  float afStack_4468 [2];
  float afStack_4460 [2];
  float afStack_4458 [2];
  float afStack_4450 [2];
  float afStack_4448 [2];
  undefined8 local_4440;
  undefined8 uStack_4438;
  undefined8 uStack_4430;
  undefined8 uStack_4428;
  undefined8 uStack_4420;
  undefined8 uStack_4418;
  undefined8 uStack_4410;
  undefined8 uStack_4408;
  undefined8 local_4400;
  undefined8 uStack_43f8;
  undefined8 uStack_43f0;
  undefined8 uStack_43e8;
  undefined8 uStack_43e0;
  undefined8 uStack_43d8;
  undefined8 uStack_43d0;
  undefined8 uStack_43c8;
  float local_43c0 [2];
  float afStack_43b8 [2];
  float afStack_43b0 [2];
  float afStack_43a8 [2];
  float afStack_43a0 [2];
  float afStack_4398 [2];
  float afStack_4390 [2];
  float afStack_4388 [2];
  undefined8 local_4380;
  undefined8 uStack_4378;
  undefined8 uStack_4370;
  undefined8 uStack_4368;
  undefined8 uStack_4360;
  undefined8 uStack_4358;
  undefined8 uStack_4350;
  undefined8 uStack_4348;
  undefined8 local_4340;
  undefined8 uStack_4338;
  undefined8 uStack_4330;
  undefined8 uStack_4328;
  undefined8 uStack_4320;
  undefined8 uStack_4318;
  undefined8 uStack_4310;
  undefined8 uStack_4308;
  float local_4300 [2];
  float afStack_42f8 [2];
  float afStack_42f0 [2];
  float afStack_42e8 [2];
  float afStack_42e0 [2];
  float afStack_42d8 [2];
  float afStack_42d0 [2];
  float afStack_42c8 [2];
  undefined8 local_42c0;
  undefined8 uStack_42b8;
  undefined8 uStack_42b0;
  undefined8 uStack_42a8;
  undefined8 uStack_42a0;
  undefined8 uStack_4298;
  undefined8 uStack_4290;
  undefined8 uStack_4288;
  float local_4280 [2];
  float afStack_4278 [2];
  float afStack_4270 [2];
  float afStack_4268 [2];
  float afStack_4260 [2];
  float afStack_4258 [2];
  float afStack_4250 [2];
  float afStack_4248 [2];
  float local_4240 [2];
  float afStack_4238 [2];
  float afStack_4230 [2];
  float afStack_4228 [2];
  float afStack_4220 [2];
  float afStack_4218 [2];
  float afStack_4210 [2];
  float afStack_4208 [2];
  float local_4200 [2];
  float afStack_41f8 [2];
  float afStack_41f0 [2];
  float afStack_41e8 [2];
  float afStack_41e0 [2];
  float afStack_41d8 [2];
  float afStack_41d0 [2];
  float afStack_41c8 [2];
  undefined8 local_41c0;
  undefined8 uStack_41b8;
  undefined8 uStack_41b0;
  undefined8 uStack_41a8;
  undefined8 uStack_41a0;
  undefined8 uStack_4198;
  undefined8 uStack_4190;
  undefined8 uStack_4188;
  undefined8 local_4180;
  undefined8 uStack_4178;
  undefined8 uStack_4170;
  undefined8 uStack_4168;
  undefined8 uStack_4160;
  undefined8 uStack_4158;
  undefined8 uStack_4150;
  undefined8 uStack_4148;
  float local_4140 [2];
  float afStack_4138 [2];
  float afStack_4130 [2];
  float afStack_4128 [2];
  float afStack_4120 [2];
  float afStack_4118 [2];
  float afStack_4110 [2];
  float afStack_4108 [2];
  undefined8 local_4100;
  undefined8 uStack_40f8;
  undefined8 uStack_40f0;
  undefined8 uStack_40e8;
  undefined8 uStack_40e0;
  undefined8 uStack_40d8;
  undefined8 uStack_40d0;
  undefined8 uStack_40c8;
  undefined8 local_40c0;
  undefined8 uStack_40b8;
  undefined8 uStack_40b0;
  undefined8 uStack_40a8;
  undefined8 uStack_40a0;
  undefined8 uStack_4098;
  undefined8 uStack_4090;
  undefined8 uStack_4088;
  float local_4080 [2];
  float afStack_4078 [2];
  float afStack_4070 [2];
  float afStack_4068 [2];
  float afStack_4060 [2];
  float afStack_4058 [2];
  float afStack_4050 [2];
  float afStack_4048 [2];
  undefined8 local_4040;
  undefined8 uStack_4038;
  undefined8 uStack_4030;
  undefined8 uStack_4028;
  undefined8 uStack_4020;
  undefined8 uStack_4018;
  undefined8 uStack_4010;
  undefined8 uStack_4008;
  float local_4000 [2];
  float afStack_3ff8 [2];
  float afStack_3ff0 [2];
  float afStack_3fe8 [2];
  float afStack_3fe0 [2];
  float afStack_3fd8 [2];
  float afStack_3fd0 [2];
  float afStack_3fc8 [2];
  undefined8 local_3fc0;
  undefined8 uStack_3fb8;
  undefined8 uStack_3fb0;
  undefined8 uStack_3fa8;
  undefined8 uStack_3fa0;
  undefined8 uStack_3f98;
  undefined8 uStack_3f90;
  undefined8 uStack_3f88;
  undefined8 local_3f80;
  undefined8 uStack_3f78;
  undefined8 uStack_3f70;
  undefined8 uStack_3f68;
  undefined8 uStack_3f60;
  undefined8 uStack_3f58;
  undefined8 uStack_3f50;
  undefined8 uStack_3f48;
  float local_3f40 [2];
  float afStack_3f38 [2];
  float afStack_3f30 [2];
  float afStack_3f28 [2];
  float afStack_3f20 [2];
  float afStack_3f18 [2];
  float afStack_3f10 [2];
  float afStack_3f08 [2];
  undefined8 local_3f00;
  undefined8 uStack_3ef8;
  undefined8 uStack_3ef0;
  undefined8 uStack_3ee8;
  undefined8 uStack_3ee0;
  undefined8 uStack_3ed8;
  undefined8 uStack_3ed0;
  undefined8 uStack_3ec8;
  undefined8 local_3ec0;
  undefined8 uStack_3eb8;
  undefined8 uStack_3eb0;
  undefined8 uStack_3ea8;
  undefined8 uStack_3ea0;
  undefined8 uStack_3e98;
  undefined8 uStack_3e90;
  undefined8 uStack_3e88;
  float local_3e80 [2];
  float afStack_3e78 [2];
  float afStack_3e70 [2];
  float afStack_3e68 [2];
  float afStack_3e60 [2];
  float afStack_3e58 [2];
  float afStack_3e50 [2];
  float afStack_3e48 [2];
  undefined8 local_3e40;
  undefined8 uStack_3e38;
  undefined8 uStack_3e30;
  undefined8 uStack_3e28;
  undefined8 uStack_3e20;
  undefined8 uStack_3e18;
  undefined8 uStack_3e10;
  undefined8 uStack_3e08;
  undefined8 local_3e00;
  undefined8 uStack_3df8;
  undefined8 uStack_3df0;
  undefined8 uStack_3de8;
  undefined8 uStack_3de0;
  undefined8 uStack_3dd8;
  undefined8 uStack_3dd0;
  undefined8 uStack_3dc8;
  float local_3dc0 [2];
  float afStack_3db8 [2];
  float afStack_3db0 [2];
  float afStack_3da8 [2];
  float afStack_3da0 [2];
  float afStack_3d98 [2];
  float afStack_3d90 [2];
  float afStack_3d88 [2];
  undefined8 local_3d80;
  undefined8 uStack_3d78;
  undefined8 uStack_3d70;
  undefined8 uStack_3d68;
  undefined8 uStack_3d60;
  undefined8 uStack_3d58;
  undefined8 uStack_3d50;
  undefined8 uStack_3d48;
  undefined8 local_3d40;
  undefined8 uStack_3d38;
  undefined8 uStack_3d30;
  undefined8 uStack_3d28;
  undefined8 uStack_3d20;
  undefined8 uStack_3d18;
  undefined8 uStack_3d10;
  undefined8 uStack_3d08;
  float local_3d00 [2];
  float afStack_3cf8 [2];
  float afStack_3cf0 [2];
  float afStack_3ce8 [2];
  float afStack_3ce0 [2];
  float afStack_3cd8 [2];
  float afStack_3cd0 [2];
  float afStack_3cc8 [2];
  undefined8 local_3cc0;
  undefined8 uStack_3cb8;
  undefined8 uStack_3cb0;
  undefined8 uStack_3ca8;
  undefined8 uStack_3ca0;
  undefined8 uStack_3c98;
  undefined8 uStack_3c90;
  undefined8 uStack_3c88;
  undefined8 local_3c80;
  undefined8 uStack_3c78;
  undefined8 uStack_3c70;
  undefined8 uStack_3c68;
  undefined8 uStack_3c60;
  undefined8 uStack_3c58;
  undefined8 uStack_3c50;
  undefined8 uStack_3c48;
  float local_3c40 [2];
  float afStack_3c38 [2];
  float afStack_3c30 [2];
  float afStack_3c28 [2];
  float afStack_3c20 [2];
  float afStack_3c18 [2];
  float afStack_3c10 [2];
  float afStack_3c08 [2];
  undefined8 local_3c00;
  undefined8 uStack_3bf8;
  undefined8 uStack_3bf0;
  undefined8 uStack_3be8;
  undefined8 uStack_3be0;
  undefined8 uStack_3bd8;
  undefined8 uStack_3bd0;
  undefined8 uStack_3bc8;
  undefined8 local_3bc0;
  undefined8 uStack_3bb8;
  undefined8 uStack_3bb0;
  undefined8 uStack_3ba8;
  undefined8 uStack_3ba0;
  undefined8 uStack_3b98;
  undefined8 uStack_3b90;
  undefined8 uStack_3b88;
  float local_3b80 [2];
  float afStack_3b78 [2];
  float afStack_3b70 [2];
  float afStack_3b68 [2];
  float afStack_3b60 [2];
  float afStack_3b58 [2];
  float afStack_3b50 [2];
  float afStack_3b48 [2];
  undefined8 local_3b40;
  undefined8 uStack_3b38;
  undefined8 uStack_3b30;
  undefined8 uStack_3b28;
  undefined8 uStack_3b20;
  undefined8 uStack_3b18;
  undefined8 uStack_3b10;
  undefined8 uStack_3b08;
  undefined8 local_3b00;
  undefined8 uStack_3af8;
  undefined8 uStack_3af0;
  undefined8 uStack_3ae8;
  undefined8 uStack_3ae0;
  undefined8 uStack_3ad8;
  undefined8 uStack_3ad0;
  undefined8 uStack_3ac8;
  float local_3ac0 [2];
  float afStack_3ab8 [2];
  float afStack_3ab0 [2];
  float afStack_3aa8 [2];
  float afStack_3aa0 [2];
  float afStack_3a98 [2];
  float afStack_3a90 [2];
  float afStack_3a88 [2];
  undefined8 local_3a80;
  undefined8 uStack_3a78;
  undefined8 uStack_3a70;
  undefined8 uStack_3a68;
  undefined8 uStack_3a60;
  undefined8 uStack_3a58;
  undefined8 uStack_3a50;
  undefined8 uStack_3a48;
  float local_3a40 [2];
  float afStack_3a38 [2];
  float afStack_3a30 [2];
  float afStack_3a28 [2];
  float afStack_3a20 [2];
  float afStack_3a18 [2];
  float afStack_3a10 [2];
  float afStack_3a08 [2];
  undefined8 local_3a00;
  undefined8 uStack_39f8;
  undefined8 uStack_39f0;
  undefined8 uStack_39e8;
  undefined8 uStack_39e0;
  undefined8 uStack_39d8;
  undefined8 uStack_39d0;
  undefined8 uStack_39c8;
  float local_39c0 [2];
  float afStack_39b8 [2];
  float afStack_39b0 [2];
  float afStack_39a8 [2];
  float afStack_39a0 [2];
  float afStack_3998 [2];
  float afStack_3990 [2];
  float afStack_3988 [2];
  undefined8 local_3980;
  undefined8 uStack_3978;
  undefined8 uStack_3970;
  undefined8 uStack_3968;
  undefined8 uStack_3960;
  undefined8 uStack_3958;
  undefined8 uStack_3950;
  undefined8 uStack_3948;
  undefined8 local_3940;
  undefined8 uStack_3938;
  undefined8 uStack_3930;
  undefined8 uStack_3928;
  undefined8 uStack_3920;
  undefined8 uStack_3918;
  undefined8 uStack_3910;
  undefined8 uStack_3908;
  float local_3900 [2];
  float afStack_38f8 [2];
  float afStack_38f0 [2];
  float afStack_38e8 [2];
  float afStack_38e0 [2];
  float afStack_38d8 [2];
  float afStack_38d0 [2];
  float afStack_38c8 [2];
  undefined8 local_38c0;
  undefined8 uStack_38b8;
  undefined8 uStack_38b0;
  undefined8 uStack_38a8;
  undefined8 uStack_38a0;
  undefined8 uStack_3898;
  undefined8 uStack_3890;
  undefined8 uStack_3888;
  undefined8 local_3880;
  undefined8 uStack_3878;
  undefined8 uStack_3870;
  undefined8 uStack_3868;
  undefined8 uStack_3860;
  undefined8 uStack_3858;
  undefined8 uStack_3850;
  undefined8 uStack_3848;
  float local_3840 [2];
  float afStack_3838 [2];
  float afStack_3830 [2];
  float afStack_3828 [2];
  float afStack_3820 [2];
  float afStack_3818 [2];
  float afStack_3810 [2];
  float afStack_3808 [2];
  undefined8 local_3800;
  undefined8 uStack_37f8;
  undefined8 uStack_37f0;
  undefined8 uStack_37e8;
  undefined8 uStack_37e0;
  undefined8 uStack_37d8;
  undefined8 uStack_37d0;
  undefined8 uStack_37c8;
  undefined8 local_37c0;
  undefined8 uStack_37b8;
  undefined8 uStack_37b0;
  undefined8 uStack_37a8;
  undefined8 uStack_37a0;
  undefined8 uStack_3798;
  undefined8 uStack_3790;
  undefined8 uStack_3788;
  float local_3780 [2];
  float afStack_3778 [2];
  float afStack_3770 [2];
  float afStack_3768 [2];
  float afStack_3760 [2];
  float afStack_3758 [2];
  float afStack_3750 [2];
  float afStack_3748 [2];
  undefined8 local_3740;
  undefined8 uStack_3738;
  undefined8 uStack_3730;
  undefined8 uStack_3728;
  undefined8 uStack_3720;
  undefined8 uStack_3718;
  undefined8 uStack_3710;
  undefined8 uStack_3708;
  undefined8 local_3700;
  undefined8 uStack_36f8;
  undefined8 uStack_36f0;
  undefined8 uStack_36e8;
  undefined8 uStack_36e0;
  undefined8 uStack_36d8;
  undefined8 uStack_36d0;
  undefined8 uStack_36c8;
  float local_36c0 [2];
  float afStack_36b8 [2];
  float afStack_36b0 [2];
  float afStack_36a8 [2];
  float afStack_36a0 [2];
  float afStack_3698 [2];
  float afStack_3690 [2];
  float afStack_3688 [2];
  undefined8 local_3680;
  undefined8 uStack_3678;
  undefined8 uStack_3670;
  undefined8 uStack_3668;
  undefined8 uStack_3660;
  undefined8 uStack_3658;
  undefined8 uStack_3650;
  undefined8 uStack_3648;
  undefined1 local_3640 [64];
  undefined1 local_3600 [64];
  undefined1 local_35c0 [64];
  undefined2 local_3542;
  float local_3540 [2];
  float afStack_3538 [2];
  float afStack_3530 [2];
  float afStack_3528 [2];
  float afStack_3520 [2];
  float afStack_3518 [2];
  float afStack_3510 [2];
  float afStack_3508 [2];
  undefined8 local_3500;
  undefined8 uStack_34f8;
  undefined8 uStack_34f0;
  undefined8 uStack_34e8;
  undefined8 uStack_34e0;
  undefined8 uStack_34d8;
  undefined8 uStack_34d0;
  undefined8 uStack_34c8;
  float local_34c0 [2];
  float afStack_34b8 [2];
  float afStack_34b0 [2];
  float afStack_34a8 [2];
  float afStack_34a0 [2];
  float afStack_3498 [2];
  float afStack_3490 [2];
  float afStack_3488 [2];
  undefined8 local_3480;
  undefined8 uStack_3478;
  undefined8 uStack_3470;
  undefined8 uStack_3468;
  undefined8 uStack_3460;
  undefined8 uStack_3458;
  undefined8 uStack_3450;
  undefined8 uStack_3448;
  undefined8 local_3440;
  undefined8 uStack_3438;
  undefined8 uStack_3430;
  undefined8 uStack_3428;
  undefined8 uStack_3420;
  undefined8 uStack_3418;
  undefined8 uStack_3410;
  undefined8 uStack_3408;
  undefined8 local_3400;
  undefined8 uStack_33f8;
  undefined8 uStack_33f0;
  undefined8 uStack_33e8;
  undefined8 uStack_33e0;
  undefined8 uStack_33d8;
  undefined8 uStack_33d0;
  undefined8 uStack_33c8;
  undefined1 local_33c0 [64];
  undefined1 local_3380 [64];
  undefined1 local_3340 [64];
  undefined1 local_3300 [64];
  undefined4 local_3284;
  undefined1 local_3280 [64];
  undefined4 local_3204;
  undefined1 local_3200 [64];
  undefined1 local_31c0 [64];
  undefined1 local_3180 [64];
  undefined1 local_3140 [8];
  float fStack_3138;
  float fStack_3134;
  undefined1 local_3120 [8];
  float fStack_3118;
  float fStack_3114;
  float fStack_3110;
  float fStack_310c;
  float fStack_3108;
  undefined4 uStack_3104;
  undefined8 local_3100;
  undefined8 uStack_30f8;
  undefined8 uStack_30f0;
  undefined8 uStack_30e8;
  undefined8 local_30e0;
  undefined8 uStack_30d8;
  undefined8 uStack_30d0;
  undefined8 uStack_30c8;
  undefined8 local_30c0;
  undefined8 uStack_30b8;
  undefined8 uStack_30b0;
  undefined8 uStack_30a8;
  undefined8 local_30a0;
  undefined8 uStack_3098;
  undefined8 uStack_3090;
  undefined8 uStack_3088;
  undefined8 local_3080;
  undefined8 uStack_3078;
  undefined8 uStack_3070;
  undefined8 uStack_3068;
  undefined1 local_3060 [8];
  undefined8 uStack_3058;
  undefined8 uStack_3050;
  undefined8 uStack_3048;
  float local_3040;
  float fStack_303c;
  float fStack_3038;
  float fStack_3034;
  float fStack_3030;
  float fStack_302c;
  float fStack_3028;
  float fStack_3024;
  undefined1 local_3020 [32];
  undefined1 local_3000 [32];
  undefined1 local_2fe0 [8];
  undefined8 uStack_2fd8;
  undefined8 uStack_2fd0;
  undefined8 uStack_2fc8;
  undefined1 local_2fc0 [32];
  undefined4 local_2fa0;
  undefined4 uStack_2f9c;
  undefined4 uStack_2f98;
  undefined4 uStack_2f94;
  undefined4 uStack_2f90;
  undefined4 uStack_2f8c;
  undefined4 uStack_2f88;
  undefined4 uStack_2f84;
  undefined1 local_2f80 [32];
  undefined1 local_2f60 [8];
  undefined8 uStack_2f58;
  undefined8 uStack_2f50;
  undefined8 uStack_2f48;
  undefined8 local_2f40;
  undefined8 uStack_2f38;
  undefined8 uStack_2f30;
  undefined8 uStack_2f28;
  undefined8 local_2f20;
  undefined8 uStack_2f18;
  undefined8 uStack_2f10;
  ulong uStack_2f08;
  undefined8 local_2f00;
  undefined8 uStack_2ef8;
  undefined8 uStack_2ef0;
  undefined8 uStack_2ee8;
  undefined8 local_2ee0;
  undefined8 uStack_2ed8;
  undefined8 uStack_2ed0;
  undefined8 uStack_2ec8;
  undefined8 local_2ec0;
  undefined8 uStack_2eb8;
  undefined8 uStack_2eb0;
  undefined8 uStack_2ea8;
  undefined8 local_2ea0;
  undefined8 uStack_2e98;
  undefined8 uStack_2e90;
  undefined8 uStack_2e88;
  undefined8 local_2e80;
  undefined8 uStack_2e78;
  undefined8 uStack_2e70;
  undefined8 uStack_2e68;
  undefined8 local_2e60;
  undefined8 uStack_2e58;
  undefined8 uStack_2e50;
  undefined8 uStack_2e48;
  undefined8 local_2e40;
  undefined8 uStack_2e38;
  undefined8 uStack_2e30;
  undefined8 uStack_2e28;
  undefined8 local_2e20;
  undefined8 uStack_2e18;
  undefined8 uStack_2e10;
  undefined8 uStack_2e08;
  undefined8 local_2e00;
  undefined8 uStack_2df8;
  undefined8 uStack_2df0;
  undefined8 uStack_2de8;
  undefined8 local_2de0;
  undefined8 uStack_2dd8;
  undefined8 uStack_2dd0;
  undefined8 uStack_2dc8;
  undefined8 local_2dc0;
  undefined8 uStack_2db8;
  undefined8 uStack_2db0;
  undefined8 uStack_2da8;
  undefined8 local_2da0;
  undefined8 uStack_2d98;
  undefined8 uStack_2d90;
  undefined8 uStack_2d88;
  undefined8 local_2d80;
  undefined8 uStack_2d78;
  undefined8 uStack_2d70;
  undefined8 uStack_2d68;
  undefined1 local_2d60 [8];
  undefined8 uStack_2d58;
  undefined8 uStack_2d50;
  undefined8 uStack_2d48;
  undefined1 local_2d40 [32];
  undefined4 local_2d20;
  undefined4 uStack_2d1c;
  undefined4 uStack_2d18;
  undefined4 uStack_2d14;
  undefined4 uStack_2d10;
  undefined4 uStack_2d0c;
  undefined4 uStack_2d08;
  undefined4 uStack_2d04;
  undefined1 local_2d00 [32];
  undefined1 local_2ce0 [32];
  undefined1 local_2cc0 [8];
  undefined8 uStack_2cb8;
  undefined8 uStack_2cb0;
  undefined8 uStack_2ca8;
  undefined1 local_2ca0 [32];
  undefined8 local_2c80;
  undefined8 uStack_2c78;
  undefined8 uStack_2c70;
  undefined8 uStack_2c68;
  undefined8 local_2c60;
  undefined8 uStack_2c58;
  undefined8 uStack_2c50;
  undefined8 uStack_2c48;
  undefined8 local_2c40;
  undefined8 uStack_2c38;
  undefined8 uStack_2c30;
  undefined8 uStack_2c28;
  undefined8 local_2c20;
  undefined8 uStack_2c18;
  undefined8 uStack_2c10;
  undefined8 uStack_2c08;
  undefined8 local_2c00;
  undefined8 uStack_2bf8;
  undefined8 uStack_2bf0;
  undefined8 uStack_2be8;
  undefined8 local_2be0;
  undefined8 uStack_2bd8;
  undefined8 uStack_2bd0;
  undefined8 uStack_2bc8;
  undefined4 local_2bac;
  undefined4 local_2ba8;
  undefined4 local_2ba4;
  undefined8 local_2ba0;
  undefined8 uStack_2b98;
  undefined8 uStack_2b90;
  undefined8 uStack_2b88;
  undefined8 local_2b80;
  undefined8 uStack_2b78;
  undefined8 uStack_2b70;
  undefined8 uStack_2b68;
  undefined1 local_2b60 [32];
  undefined8 local_2b40;
  undefined8 uStack_2b38;
  undefined8 uStack_2b30;
  undefined8 uStack_2b28;
  float local_2b20;
  float fStack_2b1c;
  float fStack_2b18;
  float fStack_2b14;
  float fStack_2b10;
  float fStack_2b0c;
  float fStack_2b08;
  undefined4 uStack_2b04;
  undefined8 local_2b00;
  undefined8 uStack_2af8;
  undefined8 uStack_2af0;
  undefined8 uStack_2ae8;
  undefined8 local_2ae0;
  undefined8 uStack_2ad8;
  undefined8 uStack_2ad0;
  undefined8 uStack_2ac8;
  undefined8 local_2ac0;
  undefined8 uStack_2ab8;
  undefined8 uStack_2ab0;
  undefined8 uStack_2aa8;
  undefined1 local_2aa0 [8];
  undefined8 uStack_2a98;
  undefined8 uStack_2a90;
  undefined8 uStack_2a88;
  undefined1 local_2a80 [32];
  undefined4 local_2a60;
  undefined4 uStack_2a5c;
  undefined4 uStack_2a58;
  undefined4 uStack_2a54;
  undefined4 uStack_2a50;
  undefined4 uStack_2a4c;
  undefined4 uStack_2a48;
  undefined4 uStack_2a44;
  undefined1 local_2a40 [32];
  undefined1 local_2a20 [32];
  undefined1 local_2a00 [8];
  undefined8 uStack_29f8;
  undefined8 uStack_29f0;
  undefined8 uStack_29e8;
  undefined1 local_29e0 [32];
  undefined8 local_29c0;
  undefined8 uStack_29b8;
  undefined8 uStack_29b0;
  undefined8 uStack_29a8;
  undefined8 local_29a0;
  undefined8 uStack_2998;
  undefined8 uStack_2990;
  undefined8 uStack_2988;
  undefined8 local_2980;
  undefined8 uStack_2978;
  undefined8 uStack_2970;
  undefined8 uStack_2968;
  undefined8 local_2960;
  undefined8 uStack_2958;
  undefined8 uStack_2950;
  undefined8 uStack_2948;
  undefined8 local_2940;
  undefined8 uStack_2938;
  undefined8 uStack_2930;
  undefined8 uStack_2928;
  undefined8 local_2920;
  undefined8 uStack_2918;
  undefined8 uStack_2910;
  undefined8 uStack_2908;
  undefined4 local_28e4;
  float local_28e0;
  float fStack_28dc;
  float fStack_28d8;
  float fStack_28d4;
  float fStack_28d0;
  float fStack_28cc;
  float fStack_28c8;
  float fStack_28c4;
  undefined8 local_28c0;
  undefined8 uStack_28b8;
  undefined8 uStack_28b0;
  undefined8 uStack_28a8;
  undefined8 local_28a0;
  undefined8 uStack_2898;
  undefined8 uStack_2890;
  undefined8 uStack_2888;
  undefined8 local_2880;
  undefined8 uStack_2878;
  undefined8 uStack_2870;
  undefined8 uStack_2868;
  undefined8 local_2860;
  undefined8 uStack_2858;
  undefined8 uStack_2850;
  undefined8 uStack_2848;
  undefined8 local_2840;
  undefined8 uStack_2838;
  undefined8 uStack_2830;
  undefined8 uStack_2828;
  undefined8 local_2820;
  undefined8 uStack_2818;
  undefined8 uStack_2810;
  undefined8 uStack_2808;
  undefined8 local_2800;
  undefined8 uStack_27f8;
  undefined8 uStack_27f0;
  undefined8 uStack_27e8;
  undefined1 local_27e0 [32];
  undefined8 local_27c0;
  undefined8 uStack_27b8;
  undefined8 uStack_27b0;
  undefined8 uStack_27a8;
  undefined8 local_27a0;
  undefined8 uStack_2798;
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  undefined8 local_2760;
  undefined8 uStack_2758;
  undefined8 uStack_2750;
  undefined8 uStack_2748;
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  undefined8 local_2720;
  undefined8 uStack_2718;
  undefined8 uStack_2710;
  undefined8 uStack_2708;
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  undefined4 local_26e0;
  undefined4 uStack_26dc;
  undefined4 uStack_26d8;
  undefined4 uStack_26d4;
  undefined4 uStack_26d0;
  undefined4 uStack_26cc;
  undefined4 uStack_26c8;
  undefined4 uStack_26c4;
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 uStack_26b0;
  undefined8 uStack_26a8;
  undefined4 local_26a0;
  undefined4 uStack_269c;
  undefined4 uStack_2698;
  undefined4 uStack_2694;
  undefined4 uStack_2690;
  undefined4 uStack_268c;
  undefined4 uStack_2688;
  undefined4 uStack_2684;
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined4 local_2660;
  undefined4 uStack_265c;
  undefined4 uStack_2658;
  undefined4 uStack_2654;
  undefined4 uStack_2650;
  undefined4 uStack_264c;
  undefined4 uStack_2648;
  undefined4 uStack_2644;
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  undefined4 local_2604;
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  undefined8 local_25e0;
  undefined8 uStack_25d8;
  undefined8 uStack_25d0;
  undefined8 uStack_25c8;
  undefined8 local_25c0;
  undefined8 uStack_25b8;
  undefined8 uStack_25b0;
  undefined8 uStack_25a8;
  undefined8 local_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined8 local_2560;
  undefined8 uStack_2558;
  undefined8 uStack_2550;
  undefined8 uStack_2548;
  undefined8 local_2540;
  undefined8 uStack_2538;
  undefined8 uStack_2530;
  undefined8 uStack_2528;
  undefined8 local_2520;
  undefined8 uStack_2518;
  undefined8 uStack_2510;
  undefined8 uStack_2508;
  undefined8 local_2500;
  undefined8 uStack_24f8;
  undefined8 uStack_24f0;
  undefined8 uStack_24e8;
  undefined8 local_24e0;
  undefined8 uStack_24d8;
  undefined8 uStack_24d0;
  undefined8 uStack_24c8;
  undefined4 local_24c0;
  undefined4 uStack_24bc;
  undefined4 uStack_24b8;
  undefined4 uStack_24b4;
  undefined4 uStack_24b0;
  undefined4 uStack_24ac;
  undefined4 uStack_24a8;
  undefined4 uStack_24a4;
  undefined8 local_24a0;
  undefined8 uStack_2498;
  undefined8 uStack_2490;
  undefined8 uStack_2488;
  undefined8 local_2480;
  undefined8 uStack_2478;
  undefined8 uStack_2470;
  undefined8 uStack_2468;
  undefined8 local_2460;
  undefined8 uStack_2458;
  undefined8 uStack_2450;
  undefined8 uStack_2448;
  undefined4 local_2440;
  undefined4 uStack_243c;
  undefined4 uStack_2438;
  undefined4 uStack_2434;
  undefined4 uStack_2430;
  undefined4 uStack_242c;
  undefined4 uStack_2428;
  undefined4 uStack_2424;
  undefined8 local_2420;
  undefined8 uStack_2418;
  undefined8 uStack_2410;
  undefined8 uStack_2408;
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  undefined8 local_23e0;
  undefined8 uStack_23d8;
  undefined8 uStack_23d0;
  undefined8 uStack_23c8;
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  undefined1 *local_23a0;
  undefined1 *local_2398;
  undefined1 *local_2390;
  float *local_2388;
  undefined1 *local_2380;
  undefined1 *local_2378;
  float *local_2370;
  undefined1 *local_2368;
  undefined1 *local_2360;
  float *local_2358;
  undefined1 *local_2350;
  undefined1 *local_2348;
  float *local_2340;
  undefined1 *local_2338;
  undefined1 *local_2330;
  float *local_2328;
  undefined1 *local_2320;
  undefined1 *local_2318;
  float *local_2310;
  float *local_2308;
  undefined1 *local_2300;
  undefined1 *local_22f8;
  undefined1 *local_22f0;
  undefined1 *local_22e8;
  float *local_22e0;
  undefined1 *local_22d8;
  undefined1 *local_22d0;
  float *local_22c8;
  undefined1 *local_22c0;
  undefined1 *local_22b8;
  float *local_22b0;
  undefined1 *local_22a8;
  undefined1 *local_22a0;
  float *local_2298;
  undefined1 *local_2290;
  undefined1 *local_2288;
  float *local_2280;
  undefined1 *local_2278;
  undefined1 *local_2270;
  float *local_2268;
  float *local_2260;
  undefined1 *local_2258;
  undefined1 *local_2250;
  float *local_2248;
  undefined1 *local_2240;
  undefined1 *local_2238;
  float *local_2230;
  undefined1 *local_2228;
  float *local_2220;
  undefined1 *local_2218;
  undefined1 *local_2210;
  float *local_2208;
  undefined1 *local_2200;
  undefined1 *local_21f8;
  float *local_21f0;
  undefined1 *local_21e8;
  undefined1 *local_21e0;
  float *local_21d8;
  undefined1 *local_21d0;
  undefined1 *local_21c8;
  float *local_21c0;
  undefined1 *local_21b8;
  undefined1 *local_21b0;
  float *local_21a8;
  undefined1 *local_21a0;
  undefined1 *local_2198;
  float *local_2190;
  undefined1 *local_2188;
  undefined1 *local_2180;
  float *local_2178;
  undefined1 *local_2170;
  undefined1 *local_2168;
  undefined1 *local_2160;
  float *local_2158;
  undefined1 *local_2150;
  undefined1 *local_2148;
  float *local_2140;
  undefined1 *local_2138;
  undefined1 *local_2130;
  float *local_2128;
  undefined1 *local_2120;
  undefined1 *local_2118;
  float *local_2110;
  undefined1 *local_2108;
  undefined1 *local_2100;
  float *local_20f8;
  float *local_20f0;
  undefined4 local_20e4;
  undefined8 local_20e0;
  undefined8 uStack_20d8;
  undefined8 uStack_20d0;
  undefined8 uStack_20c8;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  undefined8 local_20a0;
  undefined8 uStack_2098;
  undefined8 uStack_2090;
  undefined8 uStack_2088;
  float local_2080 [2];
  float afStack_2078 [2];
  float afStack_2070 [2];
  float afStack_2068 [2];
  undefined8 local_2060;
  undefined8 uStack_2058;
  undefined8 uStack_2050;
  undefined8 uStack_2048;
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  float local_2020 [2];
  float afStack_2018 [2];
  float afStack_2010 [2];
  float afStack_2008 [2];
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined8 local_1fe0;
  undefined8 uStack_1fd8;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  float local_1fc0 [2];
  float afStack_1fb8 [2];
  float afStack_1fb0 [2];
  float afStack_1fa8 [2];
  undefined8 local_1fa0;
  undefined8 uStack_1f98;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 uStack_1f70;
  undefined8 uStack_1f68;
  float local_1f60 [2];
  float afStack_1f58 [2];
  float afStack_1f50 [2];
  float afStack_1f48 [2];
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 uStack_1f30;
  undefined8 uStack_1f28;
  undefined8 local_1f20;
  undefined8 uStack_1f18;
  undefined8 uStack_1f10;
  undefined8 uStack_1f08;
  float local_1f00 [2];
  float afStack_1ef8 [2];
  float afStack_1ef0 [2];
  float afStack_1ee8 [2];
  undefined8 local_1ee0;
  undefined8 uStack_1ed8;
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  float local_1ea0 [2];
  float afStack_1e98 [2];
  float afStack_1e90 [2];
  float afStack_1e88 [2];
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  undefined8 local_1e60;
  undefined8 uStack_1e58;
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  float local_1e40 [2];
  float afStack_1e38 [2];
  float afStack_1e30 [2];
  float afStack_1e28 [2];
  undefined8 local_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  float local_1de0 [2];
  float afStack_1dd8 [2];
  float afStack_1dd0 [2];
  float afStack_1dc8 [2];
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  ulong uStack_1d68;
  float local_1d60 [2];
  float afStack_1d58 [2];
  float afStack_1d50 [2];
  float afStack_1d48 [2];
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 local_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  float local_1d00 [2];
  float afStack_1cf8 [2];
  float afStack_1cf0 [2];
  float afStack_1ce8 [2];
  undefined8 local_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  float local_1cc0 [2];
  float afStack_1cb8 [2];
  float afStack_1cb0 [2];
  float afStack_1ca8 [2];
  float local_1ca0 [2];
  float afStack_1c98 [2];
  float afStack_1c90 [2];
  float afStack_1c88 [2];
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  float local_1c60 [2];
  float afStack_1c58 [2];
  float afStack_1c50 [2];
  float afStack_1c48 [2];
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined8 local_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  float local_1c00 [2];
  float afStack_1bf8 [2];
  float afStack_1bf0 [2];
  float afStack_1be8 [2];
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  float local_1ba0 [2];
  float afStack_1b98 [2];
  float afStack_1b90 [2];
  float afStack_1b88 [2];
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  float local_1b40 [2];
  float afStack_1b38 [2];
  float afStack_1b30 [2];
  float afStack_1b28 [2];
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  float local_1ae0 [2];
  float afStack_1ad8 [2];
  float afStack_1ad0 [2];
  float afStack_1ac8 [2];
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  float local_1a20 [2];
  float afStack_1a18 [2];
  float afStack_1a10 [2];
  float afStack_1a08 [2];
  float local_1a00 [2];
  float afStack_19f8 [2];
  float afStack_19f0 [2];
  float afStack_19e8 [2];
  undefined8 local_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  float local_19c0 [2];
  float afStack_19b8 [2];
  float afStack_19b0 [2];
  float afStack_19a8 [2];
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  float local_1960 [2];
  float afStack_1958 [2];
  float afStack_1950 [2];
  float afStack_1948 [2];
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  float local_1900 [2];
  float afStack_18f8 [2];
  float afStack_18f0 [2];
  float afStack_18e8 [2];
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  float local_18a0 [2];
  float afStack_1898 [2];
  float afStack_1890 [2];
  float afStack_1888 [2];
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  float local_1840 [2];
  float afStack_1838 [2];
  float afStack_1830 [2];
  float afStack_1828 [2];
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  float local_1760 [2];
  float afStack_1758 [2];
  float afStack_1750 [2];
  float afStack_1748 [2];
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  float local_1700 [2];
  float afStack_16f8 [2];
  float afStack_16f0 [2];
  float afStack_16e8 [2];
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  float local_16a0 [2];
  float afStack_1698 [2];
  float afStack_1690 [2];
  float afStack_1688 [2];
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  float local_1640 [2];
  float afStack_1638 [2];
  float afStack_1630 [2];
  float afStack_1628 [2];
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  float local_15e0 [2];
  float afStack_15d8 [2];
  float afStack_15d0 [2];
  float afStack_15c8 [2];
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined4 local_15a0;
  undefined4 uStack_159c;
  undefined4 uStack_1598;
  undefined4 uStack_1594;
  undefined4 uStack_1590;
  undefined4 uStack_158c;
  undefined4 uStack_1588;
  undefined4 uStack_1584;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined4 local_1560;
  undefined4 uStack_155c;
  undefined4 uStack_1558;
  undefined4 uStack_1554;
  undefined4 uStack_1550;
  undefined4 uStack_154c;
  undefined4 uStack_1548;
  undefined4 uStack_1544;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined4 local_1444;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined4 local_1404;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined4 local_1304;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined4 local_12c4;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined1 local_12a0 [16];
  undefined1 auStack_1290 [16];
  undefined4 local_1280;
  undefined4 local_127c;
  undefined4 local_1278;
  undefined4 local_1274;
  undefined4 local_1270;
  undefined4 local_126c;
  undefined4 local_1268;
  undefined4 local_1264;
  undefined1 local_1260 [16];
  undefined1 auStack_1250 [16];
  undefined4 local_1240;
  undefined4 local_123c;
  undefined4 local_1238;
  undefined4 local_1234;
  undefined4 local_1230;
  undefined4 local_122c;
  undefined4 local_1228;
  undefined4 local_1224;
  undefined1 local_1220 [16];
  undefined1 auStack_1210 [16];
  undefined4 local_1200;
  undefined4 local_11fc;
  undefined4 local_11f8;
  undefined4 local_11f4;
  undefined4 local_11f0;
  undefined4 local_11ec;
  undefined4 local_11e8;
  undefined4 local_11e4;
  undefined1 local_11e0 [16];
  undefined1 auStack_11d0 [16];
  undefined4 local_11b0;
  undefined4 local_11ac;
  undefined4 local_11a8;
  undefined4 local_11a4;
  undefined4 local_11a0;
  undefined4 local_119c;
  undefined4 local_1198;
  undefined4 local_1194;
  undefined1 local_1190 [8];
  float fStack_1188;
  float fStack_1184;
  undefined1 local_1180 [8];
  float fStack_1178;
  float fStack_1174;
  undefined8 local_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 local_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined1 local_1130 [8];
  float fStack_1128;
  float fStack_1124;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 local_1110;
  undefined8 uStack_1108;
  undefined1 local_1100 [8];
  undefined8 uStack_10f8;
  float local_10f0;
  float fStack_10ec;
  float fStack_10e8;
  float fStack_10e4;
  undefined1 local_10e0 [16];
  undefined1 local_10d0 [16];
  undefined1 local_10c0 [8];
  undefined8 uStack_10b8;
  undefined1 local_10b0 [16];
  undefined4 local_10a0;
  undefined4 uStack_109c;
  undefined4 uStack_1098;
  undefined4 uStack_1094;
  undefined1 local_1090 [16];
  undefined1 local_1080 [8];
  undefined8 uStack_1078;
  undefined8 local_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 local_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 local_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 local_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 local_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 local_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 local_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 local_f90;
  undefined8 uStack_f88;
  undefined1 local_f80 [8];
  undefined8 uStack_f78;
  undefined1 local_f70 [16];
  undefined4 local_f60;
  undefined4 uStack_f5c;
  undefined4 uStack_f58;
  undefined4 uStack_f54;
  undefined1 local_f50 [16];
  undefined1 local_f40 [8];
  undefined8 uStack_f38;
  undefined1 local_f30 [8];
  undefined8 uStack_f28;
  undefined1 local_f20 [16];
  undefined8 local_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 local_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined4 local_ed0;
  undefined4 uStack_ecc;
  undefined4 uStack_ec8;
  undefined4 uStack_ec4;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 local_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined4 local_e90;
  undefined4 uStack_e8c;
  undefined4 uStack_e88;
  undefined4 uStack_e84;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined4 local_e70;
  undefined4 uStack_e6c;
  undefined4 uStack_e68;
  undefined4 uStack_e64;
  undefined4 local_e54;
  undefined4 local_e50;
  undefined4 uStack_e4c;
  undefined4 uStack_e48;
  undefined4 uStack_e44;
  undefined4 local_e34;
  undefined4 local_e30;
  undefined4 uStack_e2c;
  undefined4 uStack_e28;
  undefined4 uStack_e24;
  undefined4 local_e14;
  undefined8 local_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined1 local_df0 [16];
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 local_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 local_db0;
  undefined8 uStack_da8;
  undefined1 local_da0 [16];
  undefined8 local_d90;
  undefined8 uStack_d88;
  float local_d80;
  float fStack_d7c;
  float fStack_d78;
  float fStack_d74;
  undefined8 local_d70;
  undefined8 uStack_d68;
  undefined1 local_d60 [16];
  undefined8 local_d50;
  undefined8 uStack_d48;
  undefined1 local_d40 [8];
  undefined8 uStack_d38;
  undefined1 local_d30 [16];
  undefined4 local_d20;
  undefined4 uStack_d1c;
  undefined4 uStack_d18;
  undefined4 uStack_d14;
  undefined1 local_d10 [16];
  undefined1 local_d00 [8];
  undefined8 uStack_cf8;
  undefined1 local_cf0 [8];
  undefined8 uStack_ce8;
  undefined1 local_ce0 [16];
  undefined8 local_cd0;
  undefined8 uStack_cc8;
  undefined1 local_cc0 [16];
  undefined8 local_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined4 local_c90;
  undefined4 uStack_c8c;
  undefined4 uStack_c88;
  undefined4 uStack_c84;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 local_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined4 local_c50;
  undefined4 uStack_c4c;
  undefined4 uStack_c48;
  undefined4 uStack_c44;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined4 local_c30;
  undefined4 uStack_c2c;
  undefined4 uStack_c28;
  undefined4 uStack_c24;
  undefined4 local_c14;
  undefined8 local_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 local_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  float local_bd0;
  float fStack_bcc;
  float fStack_bc8;
  float fStack_bc4;
  undefined1 local_bc0 [16];
  undefined1 local_bb0 [16];
  undefined1 local_ba0 [16];
  undefined1 local_b90 [16];
  undefined1 local_b80 [16];
  undefined8 local_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined4 local_b50;
  undefined4 uStack_b4c;
  undefined4 uStack_b48;
  undefined4 uStack_b44;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined4 local_b30;
  undefined4 uStack_b2c;
  undefined4 uStack_b28;
  undefined4 uStack_b24;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined4 local_b10;
  undefined4 uStack_b0c;
  undefined4 uStack_b08;
  undefined4 uStack_b04;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined4 local_ae4;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 local_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 local_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 local_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 local_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 local_a50;
  undefined8 uStack_a48;
  undefined4 local_a40;
  undefined4 uStack_a3c;
  undefined4 uStack_a38;
  undefined4 uStack_a34;
  undefined8 local_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 local_a10;
  undefined8 uStack_a08;
  undefined4 local_a00;
  undefined4 uStack_9fc;
  undefined4 uStack_9f8;
  undefined4 uStack_9f4;
  undefined8 local_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 local_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 local_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined4 local_990;
  undefined4 uStack_98c;
  undefined4 uStack_988;
  undefined4 uStack_984;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined1 *local_968;
  undefined1 *local_960;
  undefined1 *local_958;
  float *local_950;
  undefined1 *local_948;
  undefined1 *local_940;
  float *local_938;
  undefined1 *local_930;
  undefined1 *local_928;
  float *local_920;
  undefined1 *local_918;
  undefined1 *local_910;
  float *local_908;
  undefined1 *local_900;
  undefined1 *local_8f8;
  float *local_8f0;
  undefined1 *local_8e8;
  undefined1 *local_8e0;
  undefined1 *local_8d8;
  undefined1 *local_8d0;
  undefined1 *local_8c8;
  float *local_8c0;
  undefined1 *local_8b8;
  undefined1 *local_8b0;
  float *local_8a8;
  undefined1 *local_8a0;
  undefined1 *local_898;
  float *local_890;
  undefined1 *local_888;
  undefined1 *local_880;
  float *local_878;
  undefined1 *local_870;
  undefined1 *local_868;
  float *local_860;
  undefined1 *local_858;
  undefined1 *local_850;
  undefined1 *local_848;
  float *local_840;
  undefined1 *local_838;
  undefined1 *local_830;
  float *local_828;
  undefined1 *local_820;
  float *local_818;
  undefined1 *local_810;
  undefined1 *local_808;
  float *local_800;
  undefined1 *local_7f8;
  undefined1 *local_7f0;
  float *local_7e8;
  undefined1 *local_7e0;
  undefined1 *local_7d8;
  float *local_7d0;
  undefined1 *local_7c8;
  undefined1 *local_7c0;
  float *local_7b8;
  undefined1 *local_7b0;
  undefined1 *local_7a8;
  float *local_7a0;
  undefined1 *local_798;
  undefined1 *local_790;
  float *local_788;
  undefined1 *local_780;
  undefined1 *local_778;
  float *local_770;
  undefined1 *local_768;
  undefined1 *local_760;
  undefined1 *local_758;
  float *local_750;
  undefined1 *local_748;
  undefined1 *local_740;
  float *local_738;
  undefined1 *local_730;
  undefined1 *local_728;
  float *local_720;
  undefined1 *local_718;
  undefined1 *local_710;
  float *local_708;
  undefined1 *local_700;
  undefined1 *local_6f8;
  float *local_6f0;
  float *local_6e8;
  float local_6e0 [2];
  float afStack_6d8 [2];
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  float local_6b0 [2];
  float afStack_6a8 [2];
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  float local_680 [2];
  float afStack_678 [2];
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  float local_650 [2];
  float afStack_648 [2];
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  float local_620 [2];
  float afStack_618 [2];
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  float local_5f0 [2];
  float afStack_5e8 [2];
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  float local_5c0 [2];
  float afStack_5b8 [2];
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  float local_590 [2];
  float afStack_588 [2];
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  float local_550 [2];
  float afStack_548 [2];
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  float local_520 [2];
  float afStack_518 [2];
  undefined8 local_510;
  undefined8 uStack_508;
  float local_500 [2];
  float afStack_4f8 [2];
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  float local_4d0 [2];
  float afStack_4c8 [2];
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  float local_4a0 [2];
  float afStack_498 [2];
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  float local_470 [2];
  float afStack_468 [2];
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  float local_440 [2];
  float afStack_438 [2];
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  float local_3e0 [2];
  float afStack_3d8 [2];
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  float local_3b0 [2];
  float afStack_3a8 [2];
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  float local_380 [2];
  float afStack_378 [2];
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  float local_350 [2];
  float afStack_348 [2];
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  float local_320 [2];
  float afStack_318 [2];
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  float local_2b0 [2];
  float afStack_2a8 [2];
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  float local_280 [2];
  float afStack_278 [2];
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  float local_250 [2];
  float afStack_248 [2];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  float local_220 [2];
  float afStack_218 [2];
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  float local_1f0 [2];
  float afStack_1e8 [2];
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined4 local_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined4 local_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined4 local_c4;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined4 local_a4;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  
  local_6cdc = *(int *)((long)in_RSI + 0x2c);
  local_6ce0 = (int)in_RSI[6];
  local_6ce4 = *(int *)((long)in_RSI + 0x34);
  local_6ce8 = (int)in_RSI[7];
  local_6cec = (int)in_RSI[3];
  local_6cf0 = local_6cdc * local_6ce0 * local_6ce4 * local_6cec;
  local_6cd0 = in_RSI;
  for (local_6cf4 = 0; local_6cf4 < local_6ce8; local_6cf4 = local_6cf4 + 1) {
    local_6cb0 = &local_6d48;
    local_6b24 = *(int *)((long)local_6cd0 + 0x2c);
    local_6b28 = (int)local_6cd0[6];
    local_6b2c = *(undefined4 *)((long)local_6cd0 + 0x34);
    local_6b38 = (undefined1 (*) [64])
                 (*local_6cd0 + local_6cd0[8] * (long)local_6cf4 * local_6cd0[2]);
    local_6b40 = local_6cd0[2];
    local_6b44 = (undefined4)local_6cd0[3];
    local_6b50 = local_6cd0[4];
    local_6b20 = &local_6d48;
    local_6b10 = (long)local_6b24 * (long)local_6b28 * local_6b40;
    local_6ca8 = &local_6d48;
    local_6c98 = &local_6d48;
    local_6b14 = 0x10;
    local_6cbc = local_6cf4;
    local_6cbd = 1;
    local_6d48 = 0;
    local_6d38 = 0;
    local_6d30 = 0;
    local_6d20 = 0;
    local_6d1c = 0;
    local_6d18 = 0;
    local_6d14 = 0;
    local_6d10 = 0;
    local_6d08 = 0;
    local_6d40 = 0;
    local_6d00 = local_6b38;
    for (local_6d58 = 0; local_6d58 + 0xf < local_6cf0; local_6d58 = local_6d58 + 0x10) {
      local_6c88 = local_6d00;
      auVar199 = *(undefined1 (*) [56])*local_6d00;
      uStack_6c48 = *(undefined8 *)(*local_6d00 + 0x38);
      local_6a80 = *local_6d00;
      local_6dc0 = auVar199._0_8_;
      local_6c80 = local_6dc0;
      uStack_6db8 = auVar199._8_8_;
      uStack_6c78 = uStack_6db8;
      uStack_6db0 = auVar199._16_8_;
      uStack_6c70 = uStack_6db0;
      uStack_6da8 = auVar199._24_8_;
      uStack_6c68 = uStack_6da8;
      uStack_6da0 = auVar199._32_8_;
      uStack_6c60 = uStack_6da0;
      uStack_6d98 = auVar199._40_8_;
      uStack_6c58 = uStack_6d98;
      uStack_6d90 = auVar199._48_8_;
      uStack_6c50 = uStack_6d90;
      local_5700 = 0;
      uStack_56f8 = 0;
      uStack_56f0 = 0;
      uStack_56e8 = 0;
      uStack_56e0 = 0;
      uStack_56d8 = 0;
      uStack_56d0 = 0;
      uStack_56c8 = 0;
      local_6300[0] = 1.0;
      local_6300[1] = 1.0;
      afStack_62f8[0] = 1.0;
      afStack_62f8[1] = 1.0;
      afStack_62f0[0] = 1.0;
      afStack_62f0[1] = 1.0;
      afStack_62e8[0] = 1.0;
      afStack_62e8[1] = 1.0;
      afStack_62e0[0] = 1.0;
      afStack_62e0[1] = 1.0;
      afStack_62d8[0] = 1.0;
      afStack_62d8[1] = 1.0;
      afStack_62d0[0] = 1.0;
      afStack_62d0[1] = 1.0;
      afStack_62c8[0] = 1.0;
      afStack_62c8[1] = 1.0;
      local_3480 = local_6dc0;
      uStack_3478 = uStack_6db8;
      uStack_3470 = uStack_6db0;
      uStack_3468 = uStack_6da8;
      uStack_3460 = uStack_6da0;
      uStack_3458 = uStack_6d98;
      uStack_3450 = uStack_6d90;
      local_34c0[0] = 88.37626;
      local_34c0[1] = 88.37626;
      afStack_34b8[0] = 88.37626;
      afStack_34b8[1] = 88.37626;
      afStack_34b0[0] = 88.37626;
      afStack_34b0[1] = 88.37626;
      afStack_34a8[0] = 88.37626;
      afStack_34a8[1] = 88.37626;
      afStack_34a0[0] = 88.37626;
      afStack_34a0[1] = 88.37626;
      afStack_3498[0] = 88.37626;
      afStack_3498[1] = 88.37626;
      afStack_3490[0] = 88.37626;
      afStack_3490[1] = 88.37626;
      afStack_3488[0] = 88.37626;
      afStack_3488[1] = 88.37626;
      auVar98._8_4_ = 88.37626;
      auVar98._12_4_ = 88.37626;
      auVar98._0_4_ = 88.37626;
      auVar98._4_4_ = 88.37626;
      auVar98._16_4_ = 88.37626;
      auVar98._20_4_ = 88.37626;
      auVar98._24_4_ = 88.37626;
      auVar98._28_4_ = 88.37626;
      auVar98._32_4_ = 88.37626;
      auVar98._36_4_ = 88.37626;
      auVar98._40_4_ = 88.37626;
      auVar98._44_4_ = 88.37626;
      auVar98._48_4_ = 88.37626;
      auVar98._52_4_ = 88.37626;
      auVar98._56_4_ = 88.37626;
      auVar98._60_4_ = 88.37626;
      auVar212 = vminps_avx512f(*local_6d00,auVar98);
      local_6200._0_8_ = auVar212._0_8_;
      local_55c0 = local_6200._0_8_;
      local_6200._8_8_ = auVar212._8_8_;
      uStack_55b8 = local_6200._8_8_;
      local_6200._16_8_ = auVar212._16_8_;
      uStack_55b0 = local_6200._16_8_;
      local_6200._24_8_ = auVar212._24_8_;
      uStack_55a8 = local_6200._24_8_;
      local_6200._32_8_ = auVar212._32_8_;
      uStack_55a0 = local_6200._32_8_;
      local_6200._40_8_ = auVar212._40_8_;
      uStack_5598 = local_6200._40_8_;
      local_6200._48_8_ = auVar212._48_8_;
      uStack_5590 = local_6200._48_8_;
      local_6200._56_8_ = auVar212._56_8_;
      uStack_5588 = local_6200._56_8_;
      local_5600[0] = -88.37626;
      local_5600[1] = -88.37626;
      afStack_55f8[0] = -88.37626;
      afStack_55f8[1] = -88.37626;
      afStack_55f0[0] = -88.37626;
      afStack_55f0[1] = -88.37626;
      afStack_55e8[0] = -88.37626;
      afStack_55e8[1] = -88.37626;
      afStack_55e0[0] = -88.37626;
      afStack_55e0[1] = -88.37626;
      afStack_55d8[0] = -88.37626;
      afStack_55d8[1] = -88.37626;
      afStack_55d0[0] = -88.37626;
      afStack_55d0[1] = -88.37626;
      afStack_55c8[0] = -88.37626;
      afStack_55c8[1] = -88.37626;
      auVar44._8_4_ = -88.37626;
      auVar44._12_4_ = -88.37626;
      auVar44._0_4_ = -88.37626;
      auVar44._4_4_ = -88.37626;
      auVar44._16_4_ = -88.37626;
      auVar44._20_4_ = -88.37626;
      auVar44._24_4_ = -88.37626;
      auVar44._28_4_ = -88.37626;
      auVar44._32_4_ = -88.37626;
      auVar44._36_4_ = -88.37626;
      auVar44._40_4_ = -88.37626;
      auVar44._44_4_ = -88.37626;
      auVar44._48_4_ = -88.37626;
      auVar44._52_4_ = -88.37626;
      auVar44._56_4_ = -88.37626;
      auVar44._60_4_ = -88.37626;
      auVar212 = vmaxps_avx512f(auVar212,auVar44);
      local_6200._0_8_ = auVar212._0_8_;
      local_41c0 = local_6200._0_8_;
      local_6200._8_8_ = auVar212._8_8_;
      uStack_41b8 = local_6200._8_8_;
      local_6200._16_8_ = auVar212._16_8_;
      uStack_41b0 = local_6200._16_8_;
      local_6200._24_8_ = auVar212._24_8_;
      uStack_41a8 = local_6200._24_8_;
      local_6200._32_8_ = auVar212._32_8_;
      uStack_41a0 = local_6200._32_8_;
      local_6200._40_8_ = auVar212._40_8_;
      uStack_4198 = local_6200._40_8_;
      local_6200._48_8_ = auVar212._48_8_;
      uStack_4190 = local_6200._48_8_;
      local_6200._56_8_ = auVar212._56_8_;
      uStack_4188 = local_6200._56_8_;
      local_4200[0] = 1.442695;
      local_4200[1] = 1.442695;
      afStack_41f8[0] = 1.442695;
      afStack_41f8[1] = 1.442695;
      afStack_41f0[0] = 1.442695;
      afStack_41f0[1] = 1.442695;
      afStack_41e8[0] = 1.442695;
      afStack_41e8[1] = 1.442695;
      afStack_41e0[0] = 1.442695;
      afStack_41e0[1] = 1.442695;
      afStack_41d8[0] = 1.442695;
      afStack_41d8[1] = 1.442695;
      afStack_41d0[0] = 1.442695;
      afStack_41d0[1] = 1.442695;
      afStack_41c8[0] = 1.442695;
      afStack_41c8[1] = 1.442695;
      local_4240[0] = 0.5;
      local_4240[1] = 0.5;
      afStack_4238[0] = 0.5;
      afStack_4238[1] = 0.5;
      afStack_4230[0] = 0.5;
      afStack_4230[1] = 0.5;
      afStack_4228[0] = 0.5;
      afStack_4228[1] = 0.5;
      afStack_4220[0] = 0.5;
      afStack_4220[1] = 0.5;
      afStack_4218[0] = 0.5;
      afStack_4218[1] = 0.5;
      afStack_4210[0] = 0.5;
      afStack_4210[1] = 0.5;
      afStack_4208[0] = 0.5;
      afStack_4208[1] = 0.5;
      auVar66._8_4_ = 1.442695;
      auVar66._12_4_ = 1.442695;
      auVar66._0_4_ = 1.442695;
      auVar66._4_4_ = 1.442695;
      auVar66._16_4_ = 1.442695;
      auVar66._20_4_ = 1.442695;
      auVar66._24_4_ = 1.442695;
      auVar66._28_4_ = 1.442695;
      auVar66._32_4_ = 1.442695;
      auVar66._36_4_ = 1.442695;
      auVar66._40_4_ = 1.442695;
      auVar66._44_4_ = 1.442695;
      auVar66._48_4_ = 1.442695;
      auVar66._52_4_ = 1.442695;
      auVar66._56_4_ = 1.442695;
      auVar66._60_4_ = 1.442695;
      auVar65._8_4_ = 0.5;
      auVar65._12_4_ = 0.5;
      auVar65._0_4_ = 0.5;
      auVar65._4_4_ = 0.5;
      auVar65._16_4_ = 0.5;
      auVar65._20_4_ = 0.5;
      auVar65._24_4_ = 0.5;
      auVar65._28_4_ = 0.5;
      auVar65._32_4_ = 0.5;
      auVar65._36_4_ = 0.5;
      auVar65._40_4_ = 0.5;
      auVar65._44_4_ = 0.5;
      auVar65._48_4_ = 0.5;
      auVar65._52_4_ = 0.5;
      auVar65._56_4_ = 0.5;
      auVar65._60_4_ = 0.5;
      auVar213 = vfmadd213ps_avx512f(auVar66,auVar212,auVar65);
      auVar214 = vrndscaleps_avx512f(auVar213,1);
      uVar20 = vcmpps_avx512f(auVar213,auVar214,1);
      local_6302 = (ushort)uVar20;
      local_6240._0_8_ = auVar214._0_8_;
      local_5040 = local_6240._0_8_;
      local_6240._8_8_ = auVar214._8_8_;
      uStack_5038 = local_6240._8_8_;
      local_6240._16_8_ = auVar214._16_8_;
      uStack_5030 = local_6240._16_8_;
      local_6240._24_8_ = auVar214._24_8_;
      uStack_5028 = local_6240._24_8_;
      local_6240._32_8_ = auVar214._32_8_;
      uStack_5020 = local_6240._32_8_;
      local_6240._40_8_ = auVar214._40_8_;
      uStack_5018 = local_6240._40_8_;
      local_6240._48_8_ = auVar214._48_8_;
      uStack_5010 = local_6240._48_8_;
      local_6240._56_8_ = auVar214._56_8_;
      uStack_5008 = local_6240._56_8_;
      local_5080[0] = 1.0;
      local_5080[1] = 1.0;
      afStack_5078[0] = 1.0;
      afStack_5078[1] = 1.0;
      afStack_5070[0] = 1.0;
      afStack_5070[1] = 1.0;
      afStack_5068[0] = 1.0;
      afStack_5068[1] = 1.0;
      afStack_5060[0] = 1.0;
      afStack_5060[1] = 1.0;
      afStack_5058[0] = 1.0;
      afStack_5058[1] = 1.0;
      afStack_5050[0] = 1.0;
      afStack_5050[1] = 1.0;
      afStack_5048[0] = 1.0;
      afStack_5048[1] = 1.0;
      local_4f40 = local_6240._0_8_;
      uStack_4f38 = local_6240._8_8_;
      uStack_4f30 = local_6240._16_8_;
      uStack_4f28 = local_6240._24_8_;
      uStack_4f20 = local_6240._32_8_;
      uStack_4f18 = local_6240._40_8_;
      uStack_4f10 = local_6240._48_8_;
      uStack_4f08 = local_6240._56_8_;
      local_4f80[0] = 1.0;
      local_4f80[1] = 1.0;
      afStack_4f78[0] = 1.0;
      afStack_4f78[1] = 1.0;
      afStack_4f70[0] = 1.0;
      afStack_4f70[1] = 1.0;
      afStack_4f68[0] = 1.0;
      afStack_4f68[1] = 1.0;
      afStack_4f60[0] = 1.0;
      afStack_4f60[1] = 1.0;
      afStack_4f58[0] = 1.0;
      afStack_4f58[1] = 1.0;
      afStack_4f50[0] = 1.0;
      afStack_4f50[1] = 1.0;
      afStack_4f48[0] = 1.0;
      afStack_4f48[1] = 1.0;
      auVar49._8_4_ = 1.0;
      auVar49._12_4_ = 1.0;
      auVar49._0_4_ = 1.0;
      auVar49._4_4_ = 1.0;
      auVar49._16_4_ = 1.0;
      auVar49._20_4_ = 1.0;
      auVar49._24_4_ = 1.0;
      auVar49._28_4_ = 1.0;
      auVar49._32_4_ = 1.0;
      auVar49._36_4_ = 1.0;
      auVar49._40_4_ = 1.0;
      auVar49._44_4_ = 1.0;
      auVar49._48_4_ = 1.0;
      auVar49._52_4_ = 1.0;
      auVar49._56_4_ = 1.0;
      auVar49._60_4_ = 1.0;
      local_4fc0._0_4_ = auVar214._0_4_;
      local_4fc0._4_4_ = auVar214._4_4_;
      uStack_4fb8._0_4_ = auVar214._8_4_;
      uStack_4fb8._4_4_ = auVar214._12_4_;
      uStack_4fb0._0_4_ = auVar214._16_4_;
      uStack_4fb0._4_4_ = auVar214._20_4_;
      uStack_4fa8._0_4_ = auVar214._24_4_;
      uStack_4fa8._4_4_ = auVar214._28_4_;
      uStack_4fa0._0_4_ = auVar214._32_4_;
      uStack_4fa0._4_4_ = auVar214._36_4_;
      uStack_4f98._0_4_ = auVar214._40_4_;
      uStack_4f98._4_4_ = auVar214._44_4_;
      uStack_4f90._0_4_ = auVar214._48_4_;
      uStack_4f90._4_4_ = auVar214._52_4_;
      uStack_4f88._0_4_ = auVar214._56_4_;
      uStack_4f88._4_4_ = auVar214._60_4_;
      auVar213 = vsubps_avx512f(auVar214,auVar49);
      bVar1 = (bool)((byte)uVar20 & 1);
      bVar2 = (bool)((byte)(local_6302 >> 1) & 1);
      bVar3 = (bool)((byte)(local_6302 >> 2) & 1);
      bVar4 = (bool)((byte)(local_6302 >> 3) & 1);
      bVar5 = (bool)((byte)(local_6302 >> 4) & 1);
      bVar6 = (bool)((byte)(local_6302 >> 5) & 1);
      bVar7 = (bool)((byte)(local_6302 >> 6) & 1);
      bVar8 = (bool)((byte)(local_6302 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar20 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      local_6280._4_4_ = (uint)bVar2 * auVar213._4_4_ | (uint)!bVar2 * local_4fc0._4_4_;
      local_6280._0_4_ = (uint)bVar1 * auVar213._0_4_ | (uint)!bVar1 * (int)local_4fc0;
      local_6280._8_4_ = (uint)bVar3 * auVar213._8_4_ | (uint)!bVar3 * (int)uStack_4fb8;
      local_6280._12_4_ = (uint)bVar4 * auVar213._12_4_ | (uint)!bVar4 * uStack_4fb8._4_4_;
      uStack_6270._0_4_ = (uint)bVar5 * auVar213._16_4_ | (uint)!bVar5 * (int)uStack_4fb0;
      uStack_6270._4_4_ = (uint)bVar6 * auVar213._20_4_ | (uint)!bVar6 * uStack_4fb0._4_4_;
      auVar200 = _local_6280;
      uStack_6268._0_4_ = (uint)bVar7 * auVar213._24_4_ | (uint)!bVar7 * (int)uStack_4fa8;
      uStack_6268._4_4_ = (uint)bVar8 * auVar213._28_4_ | (uint)!bVar8 * uStack_4fa8._4_4_;
      auVar18 = _local_6280;
      uStack_6260._0_4_ =
           (uint)(bVar9 & 1) * auVar213._32_4_ | (uint)!(bool)(bVar9 & 1) * (int)uStack_4fa0;
      uStack_6260._4_4_ = (uint)bVar10 * auVar213._36_4_ | (uint)!bVar10 * uStack_4fa0._4_4_;
      auVar205 = _local_6280;
      uStack_6258._0_4_ = (uint)bVar11 * auVar213._40_4_ | (uint)!bVar11 * (int)uStack_4f98;
      uStack_6258._4_4_ = (uint)bVar12 * auVar213._44_4_ | (uint)!bVar12 * uStack_4f98._4_4_;
      auVar206 = _local_6280;
      uStack_6250._0_4_ = (uint)bVar13 * auVar213._48_4_ | (uint)!bVar13 * (int)uStack_4f90;
      uStack_6250._4_4_ = (uint)bVar14 * auVar213._52_4_ | (uint)!bVar14 * uStack_4f90._4_4_;
      auVar199 = _local_6280;
      uStack_6248._0_4_ = (uint)bVar15 * auVar213._56_4_ | (uint)!bVar15 * (int)uStack_4f88;
      uStack_6248._4_4_ =
           (uint)(bVar9 >> 7) * auVar213._60_4_ | (uint)!(bool)(bVar9 >> 7) * uStack_4f88._4_4_;
      auVar44 = _local_6280;
      local_3740 = local_6280._0_8_;
      uStack_3738 = local_6280._8_8_;
      uStack_6270 = auVar200._16_8_;
      uStack_3730 = uStack_6270;
      uStack_6268 = auVar18._24_8_;
      uStack_3728 = uStack_6268;
      uStack_6260 = auVar205._32_8_;
      uStack_3720 = uStack_6260;
      uStack_6258 = auVar206._40_8_;
      uStack_3718 = uStack_6258;
      uStack_6250 = auVar199._48_8_;
      uStack_3710 = uStack_6250;
      uStack_6248 = auVar44._56_8_;
      uStack_3708 = uStack_6248;
      local_3780[0] = 0.6933594;
      local_3780[1] = 0.6933594;
      afStack_3778[0] = 0.6933594;
      afStack_3778[1] = 0.6933594;
      afStack_3770[0] = 0.6933594;
      afStack_3770[1] = 0.6933594;
      afStack_3768[0] = 0.6933594;
      afStack_3768[1] = 0.6933594;
      afStack_3760[0] = 0.6933594;
      afStack_3760[1] = 0.6933594;
      afStack_3758[0] = 0.6933594;
      afStack_3758[1] = 0.6933594;
      afStack_3750[0] = 0.6933594;
      afStack_3750[1] = 0.6933594;
      afStack_3748[0] = 0.6933594;
      afStack_3748[1] = 0.6933594;
      local_37c0 = local_6200._0_8_;
      uStack_37b8 = local_6200._8_8_;
      uStack_37b0 = local_6200._16_8_;
      uStack_37a8 = local_6200._24_8_;
      uStack_37a0 = local_6200._32_8_;
      uStack_3798 = local_6200._40_8_;
      uStack_3790 = local_6200._48_8_;
      uStack_3788 = local_6200._56_8_;
      auVar95._16_8_ = uStack_6270;
      auVar95._0_16_ = local_6280;
      auVar95._24_8_ = uStack_6268;
      auVar95._32_8_ = uStack_6260;
      auVar95._40_8_ = uStack_6258;
      auVar95._48_8_ = uStack_6250;
      auVar95._56_8_ = uStack_6248;
      auVar94._8_4_ = 0.6933594;
      auVar94._12_4_ = 0.6933594;
      auVar94._0_4_ = 0.6933594;
      auVar94._4_4_ = 0.6933594;
      auVar94._16_4_ = 0.6933594;
      auVar94._20_4_ = 0.6933594;
      auVar94._24_4_ = 0.6933594;
      auVar94._28_4_ = 0.6933594;
      auVar94._32_4_ = 0.6933594;
      auVar94._36_4_ = 0.6933594;
      auVar94._40_4_ = 0.6933594;
      auVar94._44_4_ = 0.6933594;
      auVar94._48_4_ = 0.6933594;
      auVar94._52_4_ = 0.6933594;
      auVar94._56_4_ = 0.6933594;
      auVar94._60_4_ = 0.6933594;
      auVar212 = vfnmadd213ps_avx512f(auVar94,auVar95,auVar212);
      local_3800 = local_6280._0_8_;
      uStack_37f8 = local_6280._8_8_;
      uStack_37f0 = uStack_6270;
      uStack_37e8 = uStack_6268;
      uStack_37e0 = uStack_6260;
      uStack_37d8 = uStack_6258;
      uStack_37d0 = uStack_6250;
      uStack_37c8 = uStack_6248;
      local_3840[0] = -0.00021219444;
      local_3840[1] = -0.00021219444;
      afStack_3838[0] = -0.00021219444;
      afStack_3838[1] = -0.00021219444;
      afStack_3830[0] = -0.00021219444;
      afStack_3830[1] = -0.00021219444;
      afStack_3828[0] = -0.00021219444;
      afStack_3828[1] = -0.00021219444;
      afStack_3820[0] = -0.00021219444;
      afStack_3820[1] = -0.00021219444;
      afStack_3818[0] = -0.00021219444;
      afStack_3818[1] = -0.00021219444;
      afStack_3810[0] = -0.00021219444;
      afStack_3810[1] = -0.00021219444;
      afStack_3808[0] = -0.00021219444;
      afStack_3808[1] = -0.00021219444;
      local_6200._0_8_ = auVar212._0_8_;
      local_3880 = local_6200._0_8_;
      local_6200._8_8_ = auVar212._8_8_;
      uStack_3878 = local_6200._8_8_;
      local_6200._16_8_ = auVar212._16_8_;
      uStack_3870 = local_6200._16_8_;
      local_6200._24_8_ = auVar212._24_8_;
      uStack_3868 = local_6200._24_8_;
      local_6200._32_8_ = auVar212._32_8_;
      uStack_3860 = local_6200._32_8_;
      local_6200._40_8_ = auVar212._40_8_;
      uStack_3858 = local_6200._40_8_;
      local_6200._48_8_ = auVar212._48_8_;
      uStack_3850 = local_6200._48_8_;
      local_6200._56_8_ = auVar212._56_8_;
      uStack_3848 = local_6200._56_8_;
      auVar93._16_8_ = uStack_6270;
      auVar93._0_16_ = local_6280;
      auVar93._24_8_ = uStack_6268;
      auVar93._32_8_ = uStack_6260;
      auVar93._40_8_ = uStack_6258;
      auVar93._48_8_ = uStack_6250;
      auVar93._56_8_ = uStack_6248;
      auVar92._8_4_ = -0.00021219444;
      auVar92._12_4_ = -0.00021219444;
      auVar92._0_4_ = -0.00021219444;
      auVar92._4_4_ = -0.00021219444;
      auVar92._16_4_ = -0.00021219444;
      auVar92._20_4_ = -0.00021219444;
      auVar92._24_4_ = -0.00021219444;
      auVar92._28_4_ = -0.00021219444;
      auVar92._32_4_ = -0.00021219444;
      auVar92._36_4_ = -0.00021219444;
      auVar92._40_4_ = -0.00021219444;
      auVar92._44_4_ = -0.00021219444;
      auVar92._48_4_ = -0.00021219444;
      auVar92._52_4_ = -0.00021219444;
      auVar92._56_4_ = -0.00021219444;
      auVar92._60_4_ = -0.00021219444;
      local_6200 = vfnmadd213ps_avx512f(auVar92,auVar93,auVar212);
      local_6140 = local_6200._0_8_;
      uStack_6138 = local_6200._8_8_;
      uStack_6130 = local_6200._16_8_;
      uStack_6128 = local_6200._24_8_;
      uStack_6120 = local_6200._32_8_;
      uStack_6118 = local_6200._40_8_;
      uStack_6110 = local_6200._48_8_;
      uStack_6108 = local_6200._56_8_;
      local_6240 = vmulps_avx512f(local_6200,local_6200);
      uStack_6378._0_4_ = 0.00019875691;
      uStack_6378._4_4_ = 0.00019875691;
      local_6380._0_4_ = 0.00019875691;
      local_6380._4_4_ = 0.00019875691;
      local_4280[0] = 0.00019875691;
      local_4280[1] = 0.00019875691;
      afStack_4278[0] = 0.00019875691;
      afStack_4278[1] = 0.00019875691;
      afStack_4270[0] = 0.00019875691;
      afStack_4270[1] = 0.00019875691;
      afStack_4268[0] = 0.00019875691;
      afStack_4268[1] = 0.00019875691;
      afStack_4260[0] = 0.00019875691;
      afStack_4260[1] = 0.00019875691;
      afStack_4258[0] = 0.00019875691;
      afStack_4258[1] = 0.00019875691;
      afStack_4250[0] = 0.00019875691;
      afStack_4250[1] = 0.00019875691;
      afStack_4248[0] = 0.00019875691;
      afStack_4248[1] = 0.00019875691;
      local_42c0 = local_6200._0_8_;
      uStack_42b8 = local_6200._8_8_;
      uStack_42b0 = local_6200._16_8_;
      uStack_42a8 = local_6200._24_8_;
      uStack_42a0 = local_6200._32_8_;
      uStack_4298 = local_6200._40_8_;
      uStack_4290 = local_6200._48_8_;
      uStack_4288 = local_6200._56_8_;
      local_4300[0] = 0.0013981999;
      local_4300[1] = 0.0013981999;
      afStack_42f8[0] = 0.0013981999;
      afStack_42f8[1] = 0.0013981999;
      afStack_42f0[0] = 0.0013981999;
      afStack_42f0[1] = 0.0013981999;
      afStack_42e8[0] = 0.0013981999;
      afStack_42e8[1] = 0.0013981999;
      afStack_42e0[0] = 0.0013981999;
      afStack_42e0[1] = 0.0013981999;
      afStack_42d8[0] = 0.0013981999;
      afStack_42d8[1] = 0.0013981999;
      afStack_42d0[0] = 0.0013981999;
      afStack_42d0[1] = 0.0013981999;
      afStack_42c8[0] = 0.0013981999;
      afStack_42c8[1] = 0.0013981999;
      auVar64._16_4_ = 0.00019875691;
      auVar64._20_4_ = 0.00019875691;
      auVar64._0_16_ = _local_6380;
      auVar64._24_4_ = 0.00019875691;
      auVar64._28_4_ = 0.00019875691;
      auVar64._32_4_ = 0.00019875691;
      auVar64._36_4_ = 0.00019875691;
      auVar64._40_4_ = 0.00019875691;
      auVar64._44_4_ = 0.00019875691;
      auVar64._48_4_ = 0.00019875691;
      auVar64._52_4_ = 0.00019875691;
      auVar64._56_4_ = 0.00019875691;
      auVar64._60_4_ = 0.00019875691;
      auVar63._8_4_ = 0.0013981999;
      auVar63._12_4_ = 0.0013981999;
      auVar63._0_4_ = 0.0013981999;
      auVar63._4_4_ = 0.0013981999;
      auVar63._16_4_ = 0.0013981999;
      auVar63._20_4_ = 0.0013981999;
      auVar63._24_4_ = 0.0013981999;
      auVar63._28_4_ = 0.0013981999;
      auVar63._32_4_ = 0.0013981999;
      auVar63._36_4_ = 0.0013981999;
      auVar63._40_4_ = 0.0013981999;
      auVar63._44_4_ = 0.0013981999;
      auVar63._48_4_ = 0.0013981999;
      auVar63._52_4_ = 0.0013981999;
      auVar63._56_4_ = 0.0013981999;
      auVar63._60_4_ = 0.0013981999;
      auVar212 = vfmadd213ps_avx512f(local_6200,auVar64,auVar63);
      local_6380 = auVar212._0_8_;
      local_4340 = local_6380;
      uStack_6378 = auVar212._8_8_;
      uStack_4338 = uStack_6378;
      uStack_6370 = auVar212._16_8_;
      uStack_4330 = uStack_6370;
      uStack_6368 = auVar212._24_8_;
      uStack_4328 = uStack_6368;
      uStack_6360 = auVar212._32_8_;
      uStack_4320 = uStack_6360;
      uStack_6358 = auVar212._40_8_;
      uStack_4318 = uStack_6358;
      uStack_6350 = auVar212._48_8_;
      uStack_4310 = uStack_6350;
      uStack_6348 = auVar212._56_8_;
      uStack_4308 = uStack_6348;
      local_4380 = local_6200._0_8_;
      uStack_4378 = local_6200._8_8_;
      uStack_4370 = local_6200._16_8_;
      uStack_4368 = local_6200._24_8_;
      uStack_4360 = local_6200._32_8_;
      uStack_4358 = local_6200._40_8_;
      uStack_4350 = local_6200._48_8_;
      uStack_4348 = local_6200._56_8_;
      local_43c0[0] = 0.008333452;
      local_43c0[1] = 0.008333452;
      afStack_43b8[0] = 0.008333452;
      afStack_43b8[1] = 0.008333452;
      afStack_43b0[0] = 0.008333452;
      afStack_43b0[1] = 0.008333452;
      afStack_43a8[0] = 0.008333452;
      afStack_43a8[1] = 0.008333452;
      afStack_43a0[0] = 0.008333452;
      afStack_43a0[1] = 0.008333452;
      afStack_4398[0] = 0.008333452;
      afStack_4398[1] = 0.008333452;
      afStack_4390[0] = 0.008333452;
      afStack_4390[1] = 0.008333452;
      afStack_4388[0] = 0.008333452;
      afStack_4388[1] = 0.008333452;
      auVar62._8_4_ = 0.008333452;
      auVar62._12_4_ = 0.008333452;
      auVar62._0_4_ = 0.008333452;
      auVar62._4_4_ = 0.008333452;
      auVar62._16_4_ = 0.008333452;
      auVar62._20_4_ = 0.008333452;
      auVar62._24_4_ = 0.008333452;
      auVar62._28_4_ = 0.008333452;
      auVar62._32_4_ = 0.008333452;
      auVar62._36_4_ = 0.008333452;
      auVar62._40_4_ = 0.008333452;
      auVar62._44_4_ = 0.008333452;
      auVar62._48_4_ = 0.008333452;
      auVar62._52_4_ = 0.008333452;
      auVar62._56_4_ = 0.008333452;
      auVar62._60_4_ = 0.008333452;
      auVar212 = vfmadd213ps_avx512f(local_6200,auVar212,auVar62);
      local_6380 = auVar212._0_8_;
      local_4400 = local_6380;
      uStack_6378 = auVar212._8_8_;
      uStack_43f8 = uStack_6378;
      uStack_6370 = auVar212._16_8_;
      uStack_43f0 = uStack_6370;
      uStack_6368 = auVar212._24_8_;
      uStack_43e8 = uStack_6368;
      uStack_6360 = auVar212._32_8_;
      uStack_43e0 = uStack_6360;
      uStack_6358 = auVar212._40_8_;
      uStack_43d8 = uStack_6358;
      uStack_6350 = auVar212._48_8_;
      uStack_43d0 = uStack_6350;
      uStack_6348 = auVar212._56_8_;
      uStack_43c8 = uStack_6348;
      local_4440 = local_6200._0_8_;
      uStack_4438 = local_6200._8_8_;
      uStack_4430 = local_6200._16_8_;
      uStack_4428 = local_6200._24_8_;
      uStack_4420 = local_6200._32_8_;
      uStack_4418 = local_6200._40_8_;
      uStack_4410 = local_6200._48_8_;
      uStack_4408 = local_6200._56_8_;
      local_4480[0] = 0.041665796;
      local_4480[1] = 0.041665796;
      afStack_4478[0] = 0.041665796;
      afStack_4478[1] = 0.041665796;
      afStack_4470[0] = 0.041665796;
      afStack_4470[1] = 0.041665796;
      afStack_4468[0] = 0.041665796;
      afStack_4468[1] = 0.041665796;
      afStack_4460[0] = 0.041665796;
      afStack_4460[1] = 0.041665796;
      afStack_4458[0] = 0.041665796;
      afStack_4458[1] = 0.041665796;
      afStack_4450[0] = 0.041665796;
      afStack_4450[1] = 0.041665796;
      afStack_4448[0] = 0.041665796;
      afStack_4448[1] = 0.041665796;
      auVar61._8_4_ = 0.041665796;
      auVar61._12_4_ = 0.041665796;
      auVar61._0_4_ = 0.041665796;
      auVar61._4_4_ = 0.041665796;
      auVar61._16_4_ = 0.041665796;
      auVar61._20_4_ = 0.041665796;
      auVar61._24_4_ = 0.041665796;
      auVar61._28_4_ = 0.041665796;
      auVar61._32_4_ = 0.041665796;
      auVar61._36_4_ = 0.041665796;
      auVar61._40_4_ = 0.041665796;
      auVar61._44_4_ = 0.041665796;
      auVar61._48_4_ = 0.041665796;
      auVar61._52_4_ = 0.041665796;
      auVar61._56_4_ = 0.041665796;
      auVar61._60_4_ = 0.041665796;
      auVar212 = vfmadd213ps_avx512f(local_6200,auVar212,auVar61);
      local_6380 = auVar212._0_8_;
      local_44c0 = local_6380;
      uStack_6378 = auVar212._8_8_;
      uStack_44b8 = uStack_6378;
      uStack_6370 = auVar212._16_8_;
      uStack_44b0 = uStack_6370;
      uStack_6368 = auVar212._24_8_;
      uStack_44a8 = uStack_6368;
      uStack_6360 = auVar212._32_8_;
      uStack_44a0 = uStack_6360;
      uStack_6358 = auVar212._40_8_;
      uStack_4498 = uStack_6358;
      uStack_6350 = auVar212._48_8_;
      uStack_4490 = uStack_6350;
      uStack_6348 = auVar212._56_8_;
      uStack_4488 = uStack_6348;
      local_4500 = local_6200._0_8_;
      uStack_44f8 = local_6200._8_8_;
      uStack_44f0 = local_6200._16_8_;
      uStack_44e8 = local_6200._24_8_;
      uStack_44e0 = local_6200._32_8_;
      uStack_44d8 = local_6200._40_8_;
      uStack_44d0 = local_6200._48_8_;
      uStack_44c8 = local_6200._56_8_;
      local_4540[0] = 0.16666666;
      local_4540[1] = 0.16666666;
      afStack_4538[0] = 0.16666666;
      afStack_4538[1] = 0.16666666;
      afStack_4530[0] = 0.16666666;
      afStack_4530[1] = 0.16666666;
      afStack_4528[0] = 0.16666666;
      afStack_4528[1] = 0.16666666;
      afStack_4520[0] = 0.16666666;
      afStack_4520[1] = 0.16666666;
      afStack_4518[0] = 0.16666666;
      afStack_4518[1] = 0.16666666;
      afStack_4510[0] = 0.16666666;
      afStack_4510[1] = 0.16666666;
      afStack_4508[0] = 0.16666666;
      afStack_4508[1] = 0.16666666;
      auVar60._8_4_ = 0.16666666;
      auVar60._12_4_ = 0.16666666;
      auVar60._0_4_ = 0.16666666;
      auVar60._4_4_ = 0.16666666;
      auVar60._16_4_ = 0.16666666;
      auVar60._20_4_ = 0.16666666;
      auVar60._24_4_ = 0.16666666;
      auVar60._28_4_ = 0.16666666;
      auVar60._32_4_ = 0.16666666;
      auVar60._36_4_ = 0.16666666;
      auVar60._40_4_ = 0.16666666;
      auVar60._44_4_ = 0.16666666;
      auVar60._48_4_ = 0.16666666;
      auVar60._52_4_ = 0.16666666;
      auVar60._56_4_ = 0.16666666;
      auVar60._60_4_ = 0.16666666;
      auVar212 = vfmadd213ps_avx512f(local_6200,auVar212,auVar60);
      local_6380 = auVar212._0_8_;
      local_4580 = local_6380;
      uStack_6378 = auVar212._8_8_;
      uStack_4578 = uStack_6378;
      uStack_6370 = auVar212._16_8_;
      uStack_4570 = uStack_6370;
      uStack_6368 = auVar212._24_8_;
      uStack_4568 = uStack_6368;
      uStack_6360 = auVar212._32_8_;
      uStack_4560 = uStack_6360;
      uStack_6358 = auVar212._40_8_;
      uStack_4558 = uStack_6358;
      uStack_6350 = auVar212._48_8_;
      uStack_4550 = uStack_6350;
      uStack_6348 = auVar212._56_8_;
      uStack_4548 = uStack_6348;
      local_45c0 = local_6200._0_8_;
      uStack_45b8 = local_6200._8_8_;
      uStack_45b0 = local_6200._16_8_;
      uStack_45a8 = local_6200._24_8_;
      uStack_45a0 = local_6200._32_8_;
      uStack_4598 = local_6200._40_8_;
      uStack_4590 = local_6200._48_8_;
      uStack_4588 = local_6200._56_8_;
      local_4600[0] = 0.5;
      local_4600[1] = 0.5;
      afStack_45f8[0] = 0.5;
      afStack_45f8[1] = 0.5;
      afStack_45f0[0] = 0.5;
      afStack_45f0[1] = 0.5;
      afStack_45e8[0] = 0.5;
      afStack_45e8[1] = 0.5;
      afStack_45e0[0] = 0.5;
      afStack_45e0[1] = 0.5;
      afStack_45d8[0] = 0.5;
      afStack_45d8[1] = 0.5;
      afStack_45d0[0] = 0.5;
      afStack_45d0[1] = 0.5;
      afStack_45c8[0] = 0.5;
      afStack_45c8[1] = 0.5;
      auVar59._8_4_ = 0.5;
      auVar59._12_4_ = 0.5;
      auVar59._0_4_ = 0.5;
      auVar59._4_4_ = 0.5;
      auVar59._16_4_ = 0.5;
      auVar59._20_4_ = 0.5;
      auVar59._24_4_ = 0.5;
      auVar59._28_4_ = 0.5;
      auVar59._32_4_ = 0.5;
      auVar59._36_4_ = 0.5;
      auVar59._40_4_ = 0.5;
      auVar59._44_4_ = 0.5;
      auVar59._48_4_ = 0.5;
      auVar59._52_4_ = 0.5;
      auVar59._56_4_ = 0.5;
      auVar59._60_4_ = 0.5;
      auVar212 = vfmadd213ps_avx512f(local_6200,auVar212,auVar59);
      local_6380 = auVar212._0_8_;
      local_4640 = local_6380;
      uStack_6378 = auVar212._8_8_;
      uStack_4638 = uStack_6378;
      uStack_6370 = auVar212._16_8_;
      uStack_4630 = uStack_6370;
      uStack_6368 = auVar212._24_8_;
      uStack_4628 = uStack_6368;
      uStack_6360 = auVar212._32_8_;
      uStack_4620 = uStack_6360;
      uStack_6358 = auVar212._40_8_;
      uStack_4618 = uStack_6358;
      uStack_6350 = auVar212._48_8_;
      uStack_4610 = uStack_6350;
      uStack_6348 = auVar212._56_8_;
      uStack_4608 = uStack_6348;
      local_4680 = local_6240._0_8_;
      uStack_4678 = local_6240._8_8_;
      uStack_4670 = local_6240._16_8_;
      uStack_4668 = local_6240._24_8_;
      uStack_4660 = local_6240._32_8_;
      uStack_4658 = local_6240._40_8_;
      uStack_4650 = local_6240._48_8_;
      uStack_4648 = local_6240._56_8_;
      local_46c0 = local_6200._0_8_;
      uStack_46b8 = local_6200._8_8_;
      uStack_46b0 = local_6200._16_8_;
      uStack_46a8 = local_6200._24_8_;
      uStack_46a0 = local_6200._32_8_;
      uStack_4698 = local_6200._40_8_;
      uStack_4690 = local_6200._48_8_;
      uStack_4688 = local_6200._56_8_;
      auVar212 = vfmadd213ps_avx512f(local_6240,auVar212,local_6200);
      local_6380 = auVar212._0_8_;
      local_6080 = local_6380;
      uStack_6378 = auVar212._8_8_;
      uStack_6078 = uStack_6378;
      uStack_6370 = auVar212._16_8_;
      uStack_6070 = uStack_6370;
      uStack_6368 = auVar212._24_8_;
      uStack_6068 = uStack_6368;
      uStack_6360 = auVar212._32_8_;
      uStack_6060 = uStack_6360;
      uStack_6358 = auVar212._40_8_;
      uStack_6058 = uStack_6358;
      uStack_6350 = auVar212._48_8_;
      uStack_6050 = uStack_6350;
      uStack_6348 = auVar212._56_8_;
      uStack_6048 = uStack_6348;
      local_60c0[0] = 1.0;
      local_60c0[1] = 1.0;
      afStack_60b8[0] = 1.0;
      afStack_60b8[1] = 1.0;
      afStack_60b0[0] = 1.0;
      afStack_60b0[1] = 1.0;
      afStack_60a8[0] = 1.0;
      afStack_60a8[1] = 1.0;
      afStack_60a0[0] = 1.0;
      afStack_60a0[1] = 1.0;
      afStack_6098[0] = 1.0;
      afStack_6098[1] = 1.0;
      afStack_6090[0] = 1.0;
      afStack_6090[1] = 1.0;
      afStack_6088[0] = 1.0;
      afStack_6088[1] = 1.0;
      auVar40._8_4_ = 1.0;
      auVar40._12_4_ = 1.0;
      auVar40._0_4_ = 1.0;
      auVar40._4_4_ = 1.0;
      auVar40._16_4_ = 1.0;
      auVar40._20_4_ = 1.0;
      auVar40._24_4_ = 1.0;
      auVar40._28_4_ = 1.0;
      auVar40._32_4_ = 1.0;
      auVar40._36_4_ = 1.0;
      auVar40._40_4_ = 1.0;
      auVar40._44_4_ = 1.0;
      auVar40._48_4_ = 1.0;
      auVar40._52_4_ = 1.0;
      auVar40._56_4_ = 1.0;
      auVar40._60_4_ = 1.0;
      auVar213 = vaddps_avx512f(auVar212,auVar40);
      local_3400 = local_6280._0_8_;
      uStack_33f8 = local_6280._8_8_;
      uStack_33f0 = uStack_6270;
      uStack_33e8 = uStack_6268;
      uStack_33e0 = uStack_6260;
      uStack_33d8 = uStack_6258;
      uStack_33d0 = uStack_6250;
      uStack_33c8 = uStack_6248;
      auVar100._16_8_ = uStack_6270;
      auVar100._0_16_ = local_6280;
      auVar100._24_8_ = uStack_6268;
      auVar100._32_8_ = uStack_6260;
      auVar100._40_8_ = uStack_6258;
      auVar100._48_8_ = uStack_6250;
      auVar100._56_8_ = uStack_6248;
      auVar212 = vcvttps2dq_avx512f(auVar100);
      local_31c0 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
      auVar212 = vmovdqa64_avx512f(auVar212);
      auVar212 = vmovdqa64_avx512f(auVar212);
      auVar214 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      local_3300 = vmovdqa64_avx512f(auVar212);
      local_3340 = vmovdqa64_avx512f(auVar214);
      auVar212 = vmovdqa64_avx512f(local_3300);
      auVar214 = vmovdqa64_avx512f(local_3340);
      auVar212 = vpaddd_avx512f(auVar212,auVar214);
      auVar212 = vmovdqa64_avx512f(auVar212);
      auVar212 = vmovdqa64_avx512f(auVar212);
      local_3200 = vmovdqa64_avx512f(auVar212);
      local_3204 = 0x17;
      auVar212 = vmovdqa64_avx512f(local_3200);
      auVar212 = vpslld_avx512f(auVar212,ZEXT416(0x17));
      local_62c0 = vmovdqa64_avx512f(auVar212);
      auVar212 = vmovdqa64_avx512f(local_62c0);
      local_3600 = vmovdqa64_avx512f(auVar212);
      auVar212 = vmovdqa64_avx512f(local_3600);
      local_63c0 = vmovdqa64_avx512f(auVar212);
      local_6380 = auVar213._0_8_;
      local_6180 = local_6380;
      uStack_6378 = auVar213._8_8_;
      uStack_6178 = uStack_6378;
      uStack_6370 = auVar213._16_8_;
      uStack_6170 = uStack_6370;
      uStack_6368 = auVar213._24_8_;
      uStack_6168 = uStack_6368;
      uStack_6360 = auVar213._32_8_;
      uStack_6160 = uStack_6360;
      uStack_6358 = auVar213._40_8_;
      uStack_6158 = uStack_6358;
      uStack_6350 = auVar213._48_8_;
      uStack_6150 = uStack_6350;
      uStack_6348 = auVar213._56_8_;
      uStack_6148 = uStack_6348;
      local_61c0 = local_63c0._0_8_;
      uStack_61b8 = local_63c0._8_8_;
      uStack_61b0 = local_63c0._16_8_;
      uStack_61a8 = local_63c0._24_8_;
      uStack_61a0 = local_63c0._32_8_;
      uStack_6198 = local_63c0._40_8_;
      uStack_6190 = local_63c0._48_8_;
      uStack_6188 = local_63c0._56_8_;
      _local_6380 = vmulps_avx512f(auVar213,local_63c0);
      local_6400 = local_6380;
      uStack_63f8 = uStack_6378;
      uStack_63f0 = uStack_6370;
      uStack_63e8 = uStack_6368;
      uStack_63e0 = uStack_6360;
      uStack_63d8 = uStack_6358;
      uStack_63d0 = uStack_6350;
      uStack_63c8 = uStack_6348;
      local_5ec4 = 0x3f800000;
      local_5f40 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      local_6440 = local_5f40._0_8_;
      uStack_6438 = local_5f40._8_8_;
      uStack_6430 = local_5f40._16_8_;
      uStack_6428 = local_5f40._24_8_;
      uStack_6420 = local_5f40._32_8_;
      uStack_6418 = local_5f40._40_8_;
      uStack_6410 = local_5f40._48_8_;
      uStack_6408 = local_5f40._56_8_;
      auVar212 = vaddps_avx512f(_local_6380,local_5f40);
      local_6780[0] = 1.0;
      local_6780[1] = 1.0;
      afStack_6778[0] = 1.0;
      afStack_6778[1] = 1.0;
      afStack_6770[0] = 1.0;
      afStack_6770[1] = 1.0;
      afStack_6768[0] = 1.0;
      afStack_6768[1] = 1.0;
      afStack_6760[0] = 1.0;
      afStack_6760[1] = 1.0;
      afStack_6758[0] = 1.0;
      afStack_6758[1] = 1.0;
      afStack_6750[0] = 1.0;
      afStack_6750[1] = 1.0;
      afStack_6748[0] = 1.0;
      afStack_6748[1] = 1.0;
      local_56c0 = 0;
      uStack_56b8 = 0;
      uStack_56b0 = 0;
      uStack_56a8 = 0;
      uStack_56a0 = 0;
      uStack_5698 = 0;
      uStack_5690 = 0;
      uStack_5688 = 0;
      uVar21 = vcmpps_avx512f(auVar212,ZEXT1664(ZEXT816(0)),2);
      local_6782 = (undefined2)uVar21;
      local_6700._0_8_ = auVar212._0_8_;
      local_5540 = local_6700._0_8_;
      local_6700._8_8_ = auVar212._8_8_;
      uStack_5538 = local_6700._8_8_;
      local_6700._16_8_ = auVar212._16_8_;
      uStack_5530 = local_6700._16_8_;
      local_6700._24_8_ = auVar212._24_8_;
      uStack_5528 = local_6700._24_8_;
      local_6700._32_8_ = auVar212._32_8_;
      uStack_5520 = local_6700._32_8_;
      local_6700._40_8_ = auVar212._40_8_;
      uStack_5518 = local_6700._40_8_;
      local_6700._48_8_ = auVar212._48_8_;
      uStack_5510 = local_6700._48_8_;
      local_6700._56_8_ = auVar212._56_8_;
      uStack_5508 = local_6700._56_8_;
      local_5580[0] = 0x800000;
      local_5580[1] = 0x800000;
      aiStack_5578[0] = 0x800000;
      aiStack_5578[1] = 0x800000;
      aiStack_5570[0] = 0x800000;
      aiStack_5570[1] = 0x800000;
      aiStack_5568[0] = 0x800000;
      aiStack_5568[1] = 0x800000;
      aiStack_5560[0] = 0x800000;
      aiStack_5560[1] = 0x800000;
      aiStack_5558[0] = 0x800000;
      aiStack_5558[1] = 0x800000;
      aiStack_5550[0] = 0x800000;
      aiStack_5550[1] = 0x800000;
      aiStack_5548[0] = 0x800000;
      aiStack_5548[1] = 0x800000;
      auVar45._8_4_ = 0x800000;
      auVar45._12_4_ = 0x800000;
      auVar45._0_4_ = 0x800000;
      auVar45._4_4_ = 0x800000;
      auVar45._16_4_ = 0x800000;
      auVar45._20_4_ = 0x800000;
      auVar45._24_4_ = 0x800000;
      auVar45._28_4_ = 0x800000;
      auVar45._32_4_ = 0x800000;
      auVar45._36_4_ = 0x800000;
      auVar45._40_4_ = 0x800000;
      auVar45._44_4_ = 0x800000;
      auVar45._48_4_ = 0x800000;
      auVar45._52_4_ = 0x800000;
      auVar45._56_4_ = 0x800000;
      auVar45._60_4_ = 0x800000;
      auVar213 = vmaxps_avx512f(auVar212,auVar45);
      local_6700._0_8_ = auVar213._0_8_;
      local_5480 = local_6700._0_8_;
      local_6700._8_8_ = auVar213._8_8_;
      uStack_5478 = local_6700._8_8_;
      local_6700._16_8_ = auVar213._16_8_;
      uStack_5470 = local_6700._16_8_;
      local_6700._24_8_ = auVar213._24_8_;
      uStack_5468 = local_6700._24_8_;
      local_6700._32_8_ = auVar213._32_8_;
      uStack_5460 = local_6700._32_8_;
      local_6700._40_8_ = auVar213._40_8_;
      uStack_5458 = local_6700._40_8_;
      local_6700._48_8_ = auVar213._48_8_;
      uStack_5450 = local_6700._48_8_;
      local_6700._56_8_ = auVar213._56_8_;
      uStack_5448 = local_6700._56_8_;
      local_54c0 = local_6700._0_8_;
      uStack_54b8 = local_6700._8_8_;
      uStack_54b0 = local_6700._16_8_;
      uStack_54a8 = local_6700._24_8_;
      uStack_54a0 = local_6700._32_8_;
      uStack_5498 = local_6700._40_8_;
      uStack_5490 = local_6700._48_8_;
      uStack_5488 = local_6700._56_8_;
      local_54c4 = 0x17;
      auVar212 = vmovdqa64_avx512f(auVar213);
      auVar212 = vpsrld_avx512f(auVar212,ZEXT416(0x17));
      auVar212 = vmovdqa64_avx512f(auVar212);
      local_5400 = local_6700._0_8_;
      uStack_53f8 = local_6700._8_8_;
      uStack_53f0 = local_6700._16_8_;
      uStack_53e8 = local_6700._24_8_;
      uStack_53e0 = local_6700._32_8_;
      uStack_53d8 = local_6700._40_8_;
      uStack_53d0 = local_6700._48_8_;
      uStack_53c8 = local_6700._56_8_;
      local_5440[0] = -0x7f800001;
      local_5440[1] = -0x7f800001;
      aiStack_5438[0] = -0x7f800001;
      aiStack_5438[1] = -0x7f800001;
      aiStack_5430[0] = -0x7f800001;
      aiStack_5430[1] = -0x7f800001;
      aiStack_5428[0] = -0x7f800001;
      aiStack_5428[1] = -0x7f800001;
      aiStack_5420[0] = -0x7f800001;
      aiStack_5420[1] = -0x7f800001;
      aiStack_5418[0] = -0x7f800001;
      aiStack_5418[1] = -0x7f800001;
      aiStack_5410[0] = -0x7f800001;
      aiStack_5410[1] = -0x7f800001;
      aiStack_5408[0] = -0x7f800001;
      aiStack_5408[1] = -0x7f800001;
      auVar213 = vmovdqa64_avx512f(auVar213);
      auVar46._8_4_ = -0x7f800001;
      auVar46._12_4_ = -0x7f800001;
      auVar46._0_4_ = -0x7f800001;
      auVar46._4_4_ = -0x7f800001;
      auVar46._16_4_ = -0x7f800001;
      auVar46._20_4_ = -0x7f800001;
      auVar46._24_4_ = -0x7f800001;
      auVar46._28_4_ = -0x7f800001;
      auVar46._32_4_ = -0x7f800001;
      auVar46._36_4_ = -0x7f800001;
      auVar46._40_4_ = -0x7f800001;
      auVar46._44_4_ = -0x7f800001;
      auVar46._48_4_ = -0x7f800001;
      auVar46._52_4_ = -0x7f800001;
      auVar46._56_4_ = -0x7f800001;
      auVar46._60_4_ = -0x7f800001;
      auVar214 = vmovdqa64_avx512f(auVar46);
      auVar213 = vpandd_avx512f(auVar213,auVar214);
      auVar213 = vmovdqa64_avx512f(auVar213);
      local_6700._0_8_ = auVar213._0_8_;
      local_5300 = local_6700._0_8_;
      local_6700._8_8_ = auVar213._8_8_;
      uStack_52f8 = local_6700._8_8_;
      local_6700._16_8_ = auVar213._16_8_;
      uStack_52f0 = local_6700._16_8_;
      local_6700._24_8_ = auVar213._24_8_;
      uStack_52e8 = local_6700._24_8_;
      local_6700._32_8_ = auVar213._32_8_;
      uStack_52e0 = local_6700._32_8_;
      local_6700._40_8_ = auVar213._40_8_;
      uStack_52d8 = local_6700._40_8_;
      local_6700._48_8_ = auVar213._48_8_;
      uStack_52d0 = local_6700._48_8_;
      local_6700._56_8_ = auVar213._56_8_;
      uStack_52c8 = local_6700._56_8_;
      local_5340[0] = 0.5;
      local_5340[1] = 0.5;
      afStack_5338[0] = 0.5;
      afStack_5338[1] = 0.5;
      afStack_5330[0] = 0.5;
      afStack_5330[1] = 0.5;
      afStack_5328[0] = 0.5;
      afStack_5328[1] = 0.5;
      afStack_5320[0] = 0.5;
      afStack_5320[1] = 0.5;
      afStack_5318[0] = 0.5;
      afStack_5318[1] = 0.5;
      afStack_5310[0] = 0.5;
      afStack_5310[1] = 0.5;
      afStack_5308[0] = 0.5;
      afStack_5308[1] = 0.5;
      auVar213 = vmovdqa64_avx512f(auVar213);
      auVar47._8_4_ = 0.5;
      auVar47._12_4_ = 0.5;
      auVar47._0_4_ = 0.5;
      auVar47._4_4_ = 0.5;
      auVar47._16_4_ = 0.5;
      auVar47._20_4_ = 0.5;
      auVar47._24_4_ = 0.5;
      auVar47._28_4_ = 0.5;
      auVar47._32_4_ = 0.5;
      auVar47._36_4_ = 0.5;
      auVar47._40_4_ = 0.5;
      auVar47._44_4_ = 0.5;
      auVar47._48_4_ = 0.5;
      auVar47._52_4_ = 0.5;
      auVar47._56_4_ = 0.5;
      auVar47._60_4_ = 0.5;
      auVar214 = vmovdqa64_avx512f(auVar47);
      auVar213 = vpord_avx512f(auVar213,auVar214);
      auVar213 = vmovdqa64_avx512f(auVar213);
      auVar212 = vmovdqa64_avx512f(auVar212);
      auVar214 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      local_5280 = vmovdqa64_avx512f(auVar212);
      local_52c0 = vmovdqa64_avx512f(auVar214);
      auVar212 = vmovdqa64_avx512f(local_5280);
      auVar214 = vmovdqa64_avx512f(local_52c0);
      auVar212 = vpsubd_avx512f(auVar212,auVar214);
      local_6740 = vmovdqa64_avx512f(auVar212);
      auVar212 = vmovdqa64_avx512f(local_6740);
      local_5240 = vmovdqa64_avx512f(auVar212);
      auVar212 = vcvtdq2ps_avx512f(local_5240);
      local_6800._0_8_ = auVar212._0_8_;
      local_6480 = local_6800._0_8_;
      local_6800._8_8_ = auVar212._8_8_;
      uStack_6478 = local_6800._8_8_;
      uStack_67f0 = auVar212._16_8_;
      uStack_6470 = uStack_67f0;
      uStack_67e8 = auVar212._24_8_;
      uStack_6468 = uStack_67e8;
      uStack_67e0 = auVar212._32_8_;
      uStack_6460 = uStack_67e0;
      uStack_67d8 = auVar212._40_8_;
      uStack_6458 = uStack_67d8;
      uStack_67d0 = auVar212._48_8_;
      uStack_6450 = uStack_67d0;
      uStack_67c8 = auVar212._56_8_;
      uStack_6448 = uStack_67c8;
      local_64c0[0] = 1.0;
      local_64c0[1] = 1.0;
      afStack_64b8[0] = 1.0;
      afStack_64b8[1] = 1.0;
      afStack_64b0[0] = 1.0;
      afStack_64b0[1] = 1.0;
      afStack_64a8[0] = 1.0;
      afStack_64a8[1] = 1.0;
      afStack_64a0[0] = 1.0;
      afStack_64a0[1] = 1.0;
      afStack_6498[0] = 1.0;
      afStack_6498[1] = 1.0;
      afStack_6490[0] = 1.0;
      afStack_6490[1] = 1.0;
      afStack_6488[0] = 1.0;
      afStack_6488[1] = 1.0;
      auVar39._8_4_ = 1.0;
      auVar39._12_4_ = 1.0;
      auVar39._0_4_ = 1.0;
      auVar39._4_4_ = 1.0;
      auVar39._16_4_ = 1.0;
      auVar39._20_4_ = 1.0;
      auVar39._24_4_ = 1.0;
      auVar39._28_4_ = 1.0;
      auVar39._32_4_ = 1.0;
      auVar39._36_4_ = 1.0;
      auVar39._40_4_ = 1.0;
      auVar39._44_4_ = 1.0;
      auVar39._48_4_ = 1.0;
      auVar39._52_4_ = 1.0;
      auVar39._56_4_ = 1.0;
      auVar39._60_4_ = 1.0;
      auVar212 = vaddps_avx512f(auVar212,auVar39);
      uVar20 = vcmpps_avx512f(auVar213,(undefined1  [64])_ps512_cephes_SQRTHF,1);
      local_6802 = (ushort)uVar20;
      local_6700._0_8_ = auVar213._0_8_;
      local_57c0 = local_6700._0_8_;
      local_6700._8_8_ = auVar213._8_8_;
      uStack_57b8 = local_6700._8_8_;
      local_6700._16_8_ = auVar213._16_8_;
      uStack_57b0 = local_6700._16_8_;
      local_6700._24_8_ = auVar213._24_8_;
      uStack_57a8 = local_6700._24_8_;
      local_6700._32_8_ = auVar213._32_8_;
      uStack_57a0 = local_6700._32_8_;
      local_6700._40_8_ = auVar213._40_8_;
      uStack_5798 = local_6700._40_8_;
      local_6700._48_8_ = auVar213._48_8_;
      uStack_5790 = local_6700._48_8_;
      local_6700._56_8_ = auVar213._56_8_;
      uStack_5788 = local_6700._56_8_;
      local_5800[0] = 1.0;
      local_5800[1] = 1.0;
      afStack_57f8[0] = 1.0;
      afStack_57f8[1] = 1.0;
      afStack_57f0[0] = 1.0;
      afStack_57f0[1] = 1.0;
      afStack_57e8[0] = 1.0;
      afStack_57e8[1] = 1.0;
      afStack_57e0[0] = 1.0;
      afStack_57e0[1] = 1.0;
      afStack_57d8[0] = 1.0;
      afStack_57d8[1] = 1.0;
      afStack_57d0[0] = 1.0;
      afStack_57d0[1] = 1.0;
      afStack_57c8[0] = 1.0;
      afStack_57c8[1] = 1.0;
      auVar42._8_4_ = 1.0;
      auVar42._12_4_ = 1.0;
      auVar42._0_4_ = 1.0;
      auVar42._4_4_ = 1.0;
      auVar42._16_4_ = 1.0;
      auVar42._20_4_ = 1.0;
      auVar42._24_4_ = 1.0;
      auVar42._28_4_ = 1.0;
      auVar42._32_4_ = 1.0;
      auVar42._36_4_ = 1.0;
      auVar42._40_4_ = 1.0;
      auVar42._44_4_ = 1.0;
      auVar42._48_4_ = 1.0;
      auVar42._52_4_ = 1.0;
      auVar42._56_4_ = 1.0;
      auVar42._60_4_ = 1.0;
      local_6880 = vsubps_avx512f(auVar213,auVar42);
      local_6800._0_8_ = auVar212._0_8_;
      local_4ec0 = local_6800._0_8_;
      local_6800._8_8_ = auVar212._8_8_;
      uStack_4eb8 = local_6800._8_8_;
      uStack_67f0 = auVar212._16_8_;
      uStack_4eb0 = uStack_67f0;
      uStack_67e8 = auVar212._24_8_;
      uStack_4ea8 = uStack_67e8;
      uStack_67e0 = auVar212._32_8_;
      uStack_4ea0 = uStack_67e0;
      uStack_67d8 = auVar212._40_8_;
      uStack_4e98 = uStack_67d8;
      uStack_67d0 = auVar212._48_8_;
      uStack_4e90 = uStack_67d0;
      uStack_67c8 = auVar212._56_8_;
      uStack_4e88 = uStack_67c8;
      local_4f00[0] = 1.0;
      local_4f00[1] = 1.0;
      afStack_4ef8[0] = 1.0;
      afStack_4ef8[1] = 1.0;
      afStack_4ef0[0] = 1.0;
      afStack_4ef0[1] = 1.0;
      afStack_4ee8[0] = 1.0;
      afStack_4ee8[1] = 1.0;
      afStack_4ee0[0] = 1.0;
      afStack_4ee0[1] = 1.0;
      afStack_4ed8[0] = 1.0;
      afStack_4ed8[1] = 1.0;
      afStack_4ed0[0] = 1.0;
      afStack_4ed0[1] = 1.0;
      afStack_4ec8[0] = 1.0;
      afStack_4ec8[1] = 1.0;
      local_4dc0 = local_6800._0_8_;
      uStack_4db8 = local_6800._8_8_;
      uStack_4db0 = uStack_67f0;
      uStack_4da8 = uStack_67e8;
      uStack_4da0 = uStack_67e0;
      uStack_4d98 = uStack_67d8;
      uStack_4d90 = uStack_67d0;
      uStack_4d88 = uStack_67c8;
      local_4e00[0] = 1.0;
      local_4e00[1] = 1.0;
      afStack_4df8[0] = 1.0;
      afStack_4df8[1] = 1.0;
      afStack_4df0[0] = 1.0;
      afStack_4df0[1] = 1.0;
      afStack_4de8[0] = 1.0;
      afStack_4de8[1] = 1.0;
      afStack_4de0[0] = 1.0;
      afStack_4de0[1] = 1.0;
      afStack_4dd8[0] = 1.0;
      afStack_4dd8[1] = 1.0;
      afStack_4dd0[0] = 1.0;
      afStack_4dd0[1] = 1.0;
      afStack_4dc8[0] = 1.0;
      afStack_4dc8[1] = 1.0;
      auVar50._8_4_ = 1.0;
      auVar50._12_4_ = 1.0;
      auVar50._0_4_ = 1.0;
      auVar50._4_4_ = 1.0;
      auVar50._16_4_ = 1.0;
      auVar50._20_4_ = 1.0;
      auVar50._24_4_ = 1.0;
      auVar50._28_4_ = 1.0;
      auVar50._32_4_ = 1.0;
      auVar50._36_4_ = 1.0;
      auVar50._40_4_ = 1.0;
      auVar50._44_4_ = 1.0;
      auVar50._48_4_ = 1.0;
      auVar50._52_4_ = 1.0;
      auVar50._56_4_ = 1.0;
      auVar50._60_4_ = 1.0;
      local_4e40._0_4_ = auVar212._0_4_;
      local_4e40._4_4_ = auVar212._4_4_;
      uStack_4e38._0_4_ = auVar212._8_4_;
      uStack_4e38._4_4_ = auVar212._12_4_;
      uStack_4e30._0_4_ = auVar212._16_4_;
      uStack_4e30._4_4_ = auVar212._20_4_;
      uStack_4e28._0_4_ = auVar212._24_4_;
      uStack_4e28._4_4_ = auVar212._28_4_;
      uStack_4e20._0_4_ = auVar212._32_4_;
      uStack_4e20._4_4_ = auVar212._36_4_;
      uStack_4e18._0_4_ = auVar212._40_4_;
      uStack_4e18._4_4_ = auVar212._44_4_;
      uStack_4e10._0_4_ = auVar212._48_4_;
      uStack_4e10._4_4_ = auVar212._52_4_;
      uStack_4e08._0_4_ = auVar212._56_4_;
      uStack_4e08._4_4_ = auVar212._60_4_;
      auVar212 = vsubps_avx512f(auVar212,auVar50);
      bVar1 = (bool)((byte)uVar20 & 1);
      bVar2 = (bool)((byte)(local_6802 >> 1) & 1);
      bVar3 = (bool)((byte)(local_6802 >> 2) & 1);
      bVar4 = (bool)((byte)(local_6802 >> 3) & 1);
      bVar5 = (bool)((byte)(local_6802 >> 4) & 1);
      bVar6 = (bool)((byte)(local_6802 >> 5) & 1);
      bVar7 = (bool)((byte)(local_6802 >> 6) & 1);
      bVar8 = (bool)((byte)(local_6802 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar20 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      local_6800._4_4_ = (uint)bVar2 * auVar212._4_4_ | (uint)!bVar2 * local_4e40._4_4_;
      local_6800._0_4_ = (uint)bVar1 * auVar212._0_4_ | (uint)!bVar1 * (int)local_4e40;
      local_6800._8_4_ = (uint)bVar3 * auVar212._8_4_ | (uint)!bVar3 * (int)uStack_4e38;
      local_6800._12_4_ = (uint)bVar4 * auVar212._12_4_ | (uint)!bVar4 * uStack_4e38._4_4_;
      uStack_67f0._0_4_ = (uint)bVar5 * auVar212._16_4_ | (uint)!bVar5 * (int)uStack_4e30;
      uStack_67f0._4_4_ = (uint)bVar6 * auVar212._20_4_ | (uint)!bVar6 * uStack_4e30._4_4_;
      auVar200 = _local_6800;
      uStack_67e8._0_4_ = (uint)bVar7 * auVar212._24_4_ | (uint)!bVar7 * (int)uStack_4e28;
      uStack_67e8._4_4_ = (uint)bVar8 * auVar212._28_4_ | (uint)!bVar8 * uStack_4e28._4_4_;
      auVar18 = _local_6800;
      uStack_67e0._0_4_ =
           (uint)(bVar9 & 1) * auVar212._32_4_ | (uint)!(bool)(bVar9 & 1) * (int)uStack_4e20;
      uStack_67e0._4_4_ = (uint)bVar10 * auVar212._36_4_ | (uint)!bVar10 * uStack_4e20._4_4_;
      auVar205 = _local_6800;
      uStack_67d8._0_4_ = (uint)bVar11 * auVar212._40_4_ | (uint)!bVar11 * (int)uStack_4e18;
      uStack_67d8._4_4_ = (uint)bVar12 * auVar212._44_4_ | (uint)!bVar12 * uStack_4e18._4_4_;
      auVar206 = _local_6800;
      uStack_67d0._0_4_ = (uint)bVar13 * auVar212._48_4_ | (uint)!bVar13 * (int)uStack_4e10;
      uStack_67d0._4_4_ = (uint)bVar14 * auVar212._52_4_ | (uint)!bVar14 * uStack_4e10._4_4_;
      auVar199 = _local_6800;
      uStack_67c8._0_4_ = (uint)bVar15 * auVar212._56_4_ | (uint)!bVar15 * (int)uStack_4e08;
      uStack_67c8._4_4_ =
           (uint)(bVar9 >> 7) * auVar212._60_4_ | (uint)!(bool)(bVar9 >> 7) * uStack_4e08._4_4_;
      auVar39 = _local_6800;
      local_4d40 = local_6880._0_8_;
      uStack_4d38 = local_6880._8_8_;
      uStack_4d30 = local_6880._16_8_;
      uStack_4d28 = local_6880._24_8_;
      uStack_4d20 = local_6880._32_8_;
      uStack_4d18 = local_6880._40_8_;
      uStack_4d10 = local_6880._48_8_;
      uStack_4d08 = local_6880._56_8_;
      local_4d80 = local_6700._0_8_;
      uStack_4d78 = local_6700._8_8_;
      uStack_4d70 = local_6700._16_8_;
      uStack_4d68 = local_6700._24_8_;
      uStack_4d60 = local_6700._32_8_;
      uStack_4d58 = local_6700._40_8_;
      uStack_4d50 = local_6700._48_8_;
      uStack_4d48 = local_6700._56_8_;
      local_4c40 = local_6880._0_8_;
      uStack_4c38 = local_6880._8_8_;
      uStack_4c30 = local_6880._16_8_;
      uStack_4c28 = local_6880._24_8_;
      uStack_4c20 = local_6880._32_8_;
      uStack_4c18 = local_6880._40_8_;
      uStack_4c10 = local_6880._48_8_;
      uStack_4c08 = local_6880._56_8_;
      local_4c80 = local_6700._0_8_;
      uStack_4c78 = local_6700._8_8_;
      uStack_4c70 = local_6700._16_8_;
      uStack_4c68 = local_6700._24_8_;
      uStack_4c60 = local_6700._32_8_;
      uStack_4c58 = local_6700._40_8_;
      uStack_4c50 = local_6700._48_8_;
      uStack_4c48 = local_6700._56_8_;
      local_4cc0._0_4_ = local_6880._0_4_;
      local_4cc0._4_4_ = local_6880._4_4_;
      uStack_4cb8._0_4_ = local_6880._8_4_;
      uStack_4cb8._4_4_ = local_6880._12_4_;
      uStack_4cb0._0_4_ = local_6880._16_4_;
      uStack_4cb0._4_4_ = local_6880._20_4_;
      uStack_4ca8._0_4_ = local_6880._24_4_;
      uStack_4ca8._4_4_ = local_6880._28_4_;
      uStack_4ca0._0_4_ = local_6880._32_4_;
      uStack_4ca0._4_4_ = local_6880._36_4_;
      uStack_4c98._0_4_ = local_6880._40_4_;
      uStack_4c98._4_4_ = local_6880._44_4_;
      uStack_4c90._0_4_ = local_6880._48_4_;
      uStack_4c90._4_4_ = local_6880._52_4_;
      uStack_4c88._0_4_ = local_6880._56_4_;
      uStack_4c88._4_4_ = local_6880._60_4_;
      auVar212 = vaddps_avx512f(local_6880,auVar213);
      bVar1 = (bool)((byte)uVar20 & 1);
      bVar2 = (bool)((byte)(local_6802 >> 1) & 1);
      bVar3 = (bool)((byte)(local_6802 >> 2) & 1);
      bVar4 = (bool)((byte)(local_6802 >> 3) & 1);
      bVar5 = (bool)((byte)(local_6802 >> 4) & 1);
      bVar6 = (bool)((byte)(local_6802 >> 5) & 1);
      bVar7 = (bool)((byte)(local_6802 >> 6) & 1);
      bVar8 = (bool)((byte)(local_6802 >> 7) & 1);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      local_6700._4_4_ = (uint)bVar2 * auVar212._4_4_ | (uint)!bVar2 * local_4cc0._4_4_;
      local_6700._0_4_ = (uint)bVar1 * auVar212._0_4_ | (uint)!bVar1 * (int)local_4cc0;
      local_6700._8_4_ = (uint)bVar3 * auVar212._8_4_ | (uint)!bVar3 * (int)uStack_4cb8;
      local_6700._12_4_ = (uint)bVar4 * auVar212._12_4_ | (uint)!bVar4 * uStack_4cb8._4_4_;
      local_6700._16_4_ = (uint)bVar5 * auVar212._16_4_ | (uint)!bVar5 * (int)uStack_4cb0;
      local_6700._20_4_ = (uint)bVar6 * auVar212._20_4_ | (uint)!bVar6 * uStack_4cb0._4_4_;
      auVar207 = local_6700._0_24_;
      local_6700._24_4_ = (uint)bVar7 * auVar212._24_4_ | (uint)!bVar7 * (int)uStack_4ca8;
      local_6700._28_4_ = (uint)bVar8 * auVar212._28_4_ | (uint)!bVar8 * uStack_4ca8._4_4_;
      auVar17 = local_6700._0_32_;
      local_6700._32_4_ =
           (uint)(bVar9 & 1) * auVar212._32_4_ | (uint)!(bool)(bVar9 & 1) * (int)uStack_4ca0;
      local_6700._36_4_ = (uint)bVar10 * auVar212._36_4_ | (uint)!bVar10 * uStack_4ca0._4_4_;
      auVar208 = local_6700._0_40_;
      local_6700._40_4_ = (uint)bVar11 * auVar212._40_4_ | (uint)!bVar11 * (int)uStack_4c98;
      local_6700._44_4_ = (uint)bVar12 * auVar212._44_4_ | (uint)!bVar12 * uStack_4c98._4_4_;
      auVar209 = local_6700._0_48_;
      local_6700._48_4_ = (uint)bVar13 * auVar212._48_4_ | (uint)!bVar13 * (int)uStack_4c90;
      local_6700._52_4_ = (uint)bVar14 * auVar212._52_4_ | (uint)!bVar14 * uStack_4c90._4_4_;
      auVar210 = local_6700._0_56_;
      local_6700._56_4_ = (uint)bVar15 * auVar212._56_4_ | (uint)!bVar15 * (int)uStack_4c88;
      local_6700._60_4_ =
           (uint)(bVar9 >> 7) * auVar212._60_4_ | (uint)!(bool)(bVar9 >> 7) * uStack_4c88._4_4_;
      auVar212 = local_6700;
      local_65c0 = local_6700._0_8_;
      uStack_65b8 = local_6700._8_8_;
      local_6700._16_8_ = auVar207._16_8_;
      uStack_65b0 = local_6700._16_8_;
      local_6700._24_8_ = auVar17._24_8_;
      uStack_65a8 = local_6700._24_8_;
      local_6700._32_8_ = auVar208._32_8_;
      uStack_65a0 = local_6700._32_8_;
      local_6700._40_8_ = auVar209._40_8_;
      uStack_6598 = local_6700._40_8_;
      local_6700._48_8_ = auVar210._48_8_;
      uStack_6590 = local_6700._48_8_;
      local_6700._56_8_ = auVar212._56_8_;
      uStack_6588 = local_6700._56_8_;
      auVar214._16_8_ = local_6700._16_8_;
      auVar214._0_16_ = local_6700._0_16_;
      auVar214._24_8_ = local_6700._24_8_;
      auVar214._32_8_ = local_6700._32_8_;
      auVar214._40_8_ = local_6700._40_8_;
      auVar214._48_8_ = local_6700._48_8_;
      auVar214._56_8_ = local_6700._56_8_;
      auVar213._16_8_ = local_6700._16_8_;
      auVar213._0_16_ = local_6700._0_16_;
      auVar213._24_8_ = local_6700._24_8_;
      auVar213._32_8_ = local_6700._32_8_;
      auVar213._40_8_ = local_6700._40_8_;
      auVar213._48_8_ = local_6700._48_8_;
      auVar213._56_8_ = local_6700._56_8_;
      local_68c0 = vmulps_avx512f(auVar214,auVar213);
      uStack_68f8._0_4_ = 0.070376836;
      uStack_68f8._4_4_ = 0.070376836;
      local_6900._0_4_ = 0.070376836;
      local_6900._4_4_ = 0.070376836;
      local_3a40[0] = 0.070376836;
      local_3a40[1] = 0.070376836;
      afStack_3a38[0] = 0.070376836;
      afStack_3a38[1] = 0.070376836;
      afStack_3a30[0] = 0.070376836;
      afStack_3a30[1] = 0.070376836;
      afStack_3a28[0] = 0.070376836;
      afStack_3a28[1] = 0.070376836;
      afStack_3a20[0] = 0.070376836;
      afStack_3a20[1] = 0.070376836;
      afStack_3a18[0] = 0.070376836;
      afStack_3a18[1] = 0.070376836;
      afStack_3a10[0] = 0.070376836;
      afStack_3a10[1] = 0.070376836;
      afStack_3a08[0] = 0.070376836;
      afStack_3a08[1] = 0.070376836;
      local_3a80 = local_6700._0_8_;
      uStack_3a78 = local_6700._8_8_;
      uStack_3a70 = local_6700._16_8_;
      uStack_3a68 = local_6700._24_8_;
      uStack_3a60 = local_6700._32_8_;
      uStack_3a58 = local_6700._40_8_;
      uStack_3a50 = local_6700._48_8_;
      uStack_3a48 = local_6700._56_8_;
      local_3ac0[0] = -0.1151461;
      local_3ac0[1] = -0.1151461;
      afStack_3ab8[0] = -0.1151461;
      afStack_3ab8[1] = -0.1151461;
      afStack_3ab0[0] = -0.1151461;
      afStack_3ab0[1] = -0.1151461;
      afStack_3aa8[0] = -0.1151461;
      afStack_3aa8[1] = -0.1151461;
      afStack_3aa0[0] = -0.1151461;
      afStack_3aa0[1] = -0.1151461;
      afStack_3a98[0] = -0.1151461;
      afStack_3a98[1] = -0.1151461;
      afStack_3a90[0] = -0.1151461;
      afStack_3a90[1] = -0.1151461;
      afStack_3a88[0] = -0.1151461;
      afStack_3a88[1] = -0.1151461;
      auVar87._16_4_ = 0.070376836;
      auVar87._20_4_ = 0.070376836;
      auVar87._0_16_ = _local_6900;
      auVar87._24_4_ = 0.070376836;
      auVar87._28_4_ = 0.070376836;
      auVar87._32_4_ = 0.070376836;
      auVar87._36_4_ = 0.070376836;
      auVar87._40_4_ = 0.070376836;
      auVar87._44_4_ = 0.070376836;
      auVar87._48_4_ = 0.070376836;
      auVar87._52_4_ = 0.070376836;
      auVar87._56_4_ = 0.070376836;
      auVar87._60_4_ = 0.070376836;
      auVar86._16_8_ = local_6700._16_8_;
      auVar86._0_16_ = local_6700._0_16_;
      auVar86._24_8_ = local_6700._24_8_;
      auVar86._32_8_ = local_6700._32_8_;
      auVar86._40_8_ = local_6700._40_8_;
      auVar86._48_8_ = local_6700._48_8_;
      auVar86._56_8_ = local_6700._56_8_;
      auVar85._8_4_ = -0.1151461;
      auVar85._12_4_ = -0.1151461;
      auVar85._0_4_ = -0.1151461;
      auVar85._4_4_ = -0.1151461;
      auVar85._16_4_ = -0.1151461;
      auVar85._20_4_ = -0.1151461;
      auVar85._24_4_ = -0.1151461;
      auVar85._28_4_ = -0.1151461;
      auVar85._32_4_ = -0.1151461;
      auVar85._36_4_ = -0.1151461;
      auVar85._40_4_ = -0.1151461;
      auVar85._44_4_ = -0.1151461;
      auVar85._48_4_ = -0.1151461;
      auVar85._52_4_ = -0.1151461;
      auVar85._56_4_ = -0.1151461;
      auVar85._60_4_ = -0.1151461;
      auVar212 = vfmadd213ps_avx512f(auVar86,auVar87,auVar85);
      local_6900 = auVar212._0_8_;
      local_3b00 = local_6900;
      uStack_68f8 = auVar212._8_8_;
      uStack_3af8 = uStack_68f8;
      uStack_68f0 = auVar212._16_8_;
      uStack_3af0 = uStack_68f0;
      uStack_68e8 = auVar212._24_8_;
      uStack_3ae8 = uStack_68e8;
      uStack_68e0 = auVar212._32_8_;
      uStack_3ae0 = uStack_68e0;
      uStack_68d8 = auVar212._40_8_;
      uStack_3ad8 = uStack_68d8;
      uStack_68d0 = auVar212._48_8_;
      uStack_3ad0 = uStack_68d0;
      uStack_68c8 = auVar212._56_8_;
      uStack_3ac8 = uStack_68c8;
      local_3b40 = local_6700._0_8_;
      uStack_3b38 = local_6700._8_8_;
      uStack_3b30 = local_6700._16_8_;
      uStack_3b28 = local_6700._24_8_;
      uStack_3b20 = local_6700._32_8_;
      uStack_3b18 = local_6700._40_8_;
      uStack_3b10 = local_6700._48_8_;
      uStack_3b08 = local_6700._56_8_;
      local_3b80[0] = 0.116769984;
      local_3b80[1] = 0.116769984;
      afStack_3b78[0] = 0.116769984;
      afStack_3b78[1] = 0.116769984;
      afStack_3b70[0] = 0.116769984;
      afStack_3b70[1] = 0.116769984;
      afStack_3b68[0] = 0.116769984;
      afStack_3b68[1] = 0.116769984;
      afStack_3b60[0] = 0.116769984;
      afStack_3b60[1] = 0.116769984;
      afStack_3b58[0] = 0.116769984;
      afStack_3b58[1] = 0.116769984;
      afStack_3b50[0] = 0.116769984;
      afStack_3b50[1] = 0.116769984;
      afStack_3b48[0] = 0.116769984;
      afStack_3b48[1] = 0.116769984;
      auVar84._16_8_ = local_6700._16_8_;
      auVar84._0_16_ = local_6700._0_16_;
      auVar84._24_8_ = local_6700._24_8_;
      auVar84._32_8_ = local_6700._32_8_;
      auVar84._40_8_ = local_6700._40_8_;
      auVar84._48_8_ = local_6700._48_8_;
      auVar84._56_8_ = local_6700._56_8_;
      auVar83._8_4_ = 0.116769984;
      auVar83._12_4_ = 0.116769984;
      auVar83._0_4_ = 0.116769984;
      auVar83._4_4_ = 0.116769984;
      auVar83._16_4_ = 0.116769984;
      auVar83._20_4_ = 0.116769984;
      auVar83._24_4_ = 0.116769984;
      auVar83._28_4_ = 0.116769984;
      auVar83._32_4_ = 0.116769984;
      auVar83._36_4_ = 0.116769984;
      auVar83._40_4_ = 0.116769984;
      auVar83._44_4_ = 0.116769984;
      auVar83._48_4_ = 0.116769984;
      auVar83._52_4_ = 0.116769984;
      auVar83._56_4_ = 0.116769984;
      auVar83._60_4_ = 0.116769984;
      auVar212 = vfmadd213ps_avx512f(auVar84,auVar212,auVar83);
      local_6900 = auVar212._0_8_;
      local_3bc0 = local_6900;
      uStack_68f8 = auVar212._8_8_;
      uStack_3bb8 = uStack_68f8;
      uStack_68f0 = auVar212._16_8_;
      uStack_3bb0 = uStack_68f0;
      uStack_68e8 = auVar212._24_8_;
      uStack_3ba8 = uStack_68e8;
      uStack_68e0 = auVar212._32_8_;
      uStack_3ba0 = uStack_68e0;
      uStack_68d8 = auVar212._40_8_;
      uStack_3b98 = uStack_68d8;
      uStack_68d0 = auVar212._48_8_;
      uStack_3b90 = uStack_68d0;
      uStack_68c8 = auVar212._56_8_;
      uStack_3b88 = uStack_68c8;
      local_3c00 = local_6700._0_8_;
      uStack_3bf8 = local_6700._8_8_;
      uStack_3bf0 = local_6700._16_8_;
      uStack_3be8 = local_6700._24_8_;
      uStack_3be0 = local_6700._32_8_;
      uStack_3bd8 = local_6700._40_8_;
      uStack_3bd0 = local_6700._48_8_;
      uStack_3bc8 = local_6700._56_8_;
      local_3c40[0] = -0.12420141;
      local_3c40[1] = -0.12420141;
      afStack_3c38[0] = -0.12420141;
      afStack_3c38[1] = -0.12420141;
      afStack_3c30[0] = -0.12420141;
      afStack_3c30[1] = -0.12420141;
      afStack_3c28[0] = -0.12420141;
      afStack_3c28[1] = -0.12420141;
      afStack_3c20[0] = -0.12420141;
      afStack_3c20[1] = -0.12420141;
      afStack_3c18[0] = -0.12420141;
      afStack_3c18[1] = -0.12420141;
      afStack_3c10[0] = -0.12420141;
      afStack_3c10[1] = -0.12420141;
      afStack_3c08[0] = -0.12420141;
      afStack_3c08[1] = -0.12420141;
      auVar82._16_8_ = local_6700._16_8_;
      auVar82._0_16_ = local_6700._0_16_;
      auVar82._24_8_ = local_6700._24_8_;
      auVar82._32_8_ = local_6700._32_8_;
      auVar82._40_8_ = local_6700._40_8_;
      auVar82._48_8_ = local_6700._48_8_;
      auVar82._56_8_ = local_6700._56_8_;
      auVar81._8_4_ = -0.12420141;
      auVar81._12_4_ = -0.12420141;
      auVar81._0_4_ = -0.12420141;
      auVar81._4_4_ = -0.12420141;
      auVar81._16_4_ = -0.12420141;
      auVar81._20_4_ = -0.12420141;
      auVar81._24_4_ = -0.12420141;
      auVar81._28_4_ = -0.12420141;
      auVar81._32_4_ = -0.12420141;
      auVar81._36_4_ = -0.12420141;
      auVar81._40_4_ = -0.12420141;
      auVar81._44_4_ = -0.12420141;
      auVar81._48_4_ = -0.12420141;
      auVar81._52_4_ = -0.12420141;
      auVar81._56_4_ = -0.12420141;
      auVar81._60_4_ = -0.12420141;
      auVar212 = vfmadd213ps_avx512f(auVar82,auVar212,auVar81);
      local_6900 = auVar212._0_8_;
      local_3c80 = local_6900;
      uStack_68f8 = auVar212._8_8_;
      uStack_3c78 = uStack_68f8;
      uStack_68f0 = auVar212._16_8_;
      uStack_3c70 = uStack_68f0;
      uStack_68e8 = auVar212._24_8_;
      uStack_3c68 = uStack_68e8;
      uStack_68e0 = auVar212._32_8_;
      uStack_3c60 = uStack_68e0;
      uStack_68d8 = auVar212._40_8_;
      uStack_3c58 = uStack_68d8;
      uStack_68d0 = auVar212._48_8_;
      uStack_3c50 = uStack_68d0;
      uStack_68c8 = auVar212._56_8_;
      uStack_3c48 = uStack_68c8;
      local_3cc0 = local_6700._0_8_;
      uStack_3cb8 = local_6700._8_8_;
      uStack_3cb0 = local_6700._16_8_;
      uStack_3ca8 = local_6700._24_8_;
      uStack_3ca0 = local_6700._32_8_;
      uStack_3c98 = local_6700._40_8_;
      uStack_3c90 = local_6700._48_8_;
      uStack_3c88 = local_6700._56_8_;
      local_3d00[0] = 0.14249323;
      local_3d00[1] = 0.14249323;
      afStack_3cf8[0] = 0.14249323;
      afStack_3cf8[1] = 0.14249323;
      afStack_3cf0[0] = 0.14249323;
      afStack_3cf0[1] = 0.14249323;
      afStack_3ce8[0] = 0.14249323;
      afStack_3ce8[1] = 0.14249323;
      afStack_3ce0[0] = 0.14249323;
      afStack_3ce0[1] = 0.14249323;
      afStack_3cd8[0] = 0.14249323;
      afStack_3cd8[1] = 0.14249323;
      afStack_3cd0[0] = 0.14249323;
      afStack_3cd0[1] = 0.14249323;
      afStack_3cc8[0] = 0.14249323;
      afStack_3cc8[1] = 0.14249323;
      auVar80._16_8_ = local_6700._16_8_;
      auVar80._0_16_ = local_6700._0_16_;
      auVar80._24_8_ = local_6700._24_8_;
      auVar80._32_8_ = local_6700._32_8_;
      auVar80._40_8_ = local_6700._40_8_;
      auVar80._48_8_ = local_6700._48_8_;
      auVar80._56_8_ = local_6700._56_8_;
      auVar79._8_4_ = 0.14249323;
      auVar79._12_4_ = 0.14249323;
      auVar79._0_4_ = 0.14249323;
      auVar79._4_4_ = 0.14249323;
      auVar79._16_4_ = 0.14249323;
      auVar79._20_4_ = 0.14249323;
      auVar79._24_4_ = 0.14249323;
      auVar79._28_4_ = 0.14249323;
      auVar79._32_4_ = 0.14249323;
      auVar79._36_4_ = 0.14249323;
      auVar79._40_4_ = 0.14249323;
      auVar79._44_4_ = 0.14249323;
      auVar79._48_4_ = 0.14249323;
      auVar79._52_4_ = 0.14249323;
      auVar79._56_4_ = 0.14249323;
      auVar79._60_4_ = 0.14249323;
      auVar212 = vfmadd213ps_avx512f(auVar80,auVar212,auVar79);
      local_6900 = auVar212._0_8_;
      local_3d40 = local_6900;
      uStack_68f8 = auVar212._8_8_;
      uStack_3d38 = uStack_68f8;
      uStack_68f0 = auVar212._16_8_;
      uStack_3d30 = uStack_68f0;
      uStack_68e8 = auVar212._24_8_;
      uStack_3d28 = uStack_68e8;
      uStack_68e0 = auVar212._32_8_;
      uStack_3d20 = uStack_68e0;
      uStack_68d8 = auVar212._40_8_;
      uStack_3d18 = uStack_68d8;
      uStack_68d0 = auVar212._48_8_;
      uStack_3d10 = uStack_68d0;
      uStack_68c8 = auVar212._56_8_;
      uStack_3d08 = uStack_68c8;
      local_3d80 = local_6700._0_8_;
      uStack_3d78 = local_6700._8_8_;
      uStack_3d70 = local_6700._16_8_;
      uStack_3d68 = local_6700._24_8_;
      uStack_3d60 = local_6700._32_8_;
      uStack_3d58 = local_6700._40_8_;
      uStack_3d50 = local_6700._48_8_;
      uStack_3d48 = local_6700._56_8_;
      local_3dc0[0] = -0.16668057;
      local_3dc0[1] = -0.16668057;
      afStack_3db8[0] = -0.16668057;
      afStack_3db8[1] = -0.16668057;
      afStack_3db0[0] = -0.16668057;
      afStack_3db0[1] = -0.16668057;
      afStack_3da8[0] = -0.16668057;
      afStack_3da8[1] = -0.16668057;
      afStack_3da0[0] = -0.16668057;
      afStack_3da0[1] = -0.16668057;
      afStack_3d98[0] = -0.16668057;
      afStack_3d98[1] = -0.16668057;
      afStack_3d90[0] = -0.16668057;
      afStack_3d90[1] = -0.16668057;
      afStack_3d88[0] = -0.16668057;
      afStack_3d88[1] = -0.16668057;
      auVar78._16_8_ = local_6700._16_8_;
      auVar78._0_16_ = local_6700._0_16_;
      auVar78._24_8_ = local_6700._24_8_;
      auVar78._32_8_ = local_6700._32_8_;
      auVar78._40_8_ = local_6700._40_8_;
      auVar78._48_8_ = local_6700._48_8_;
      auVar78._56_8_ = local_6700._56_8_;
      auVar77._8_4_ = -0.16668057;
      auVar77._12_4_ = -0.16668057;
      auVar77._0_4_ = -0.16668057;
      auVar77._4_4_ = -0.16668057;
      auVar77._16_4_ = -0.16668057;
      auVar77._20_4_ = -0.16668057;
      auVar77._24_4_ = -0.16668057;
      auVar77._28_4_ = -0.16668057;
      auVar77._32_4_ = -0.16668057;
      auVar77._36_4_ = -0.16668057;
      auVar77._40_4_ = -0.16668057;
      auVar77._44_4_ = -0.16668057;
      auVar77._48_4_ = -0.16668057;
      auVar77._52_4_ = -0.16668057;
      auVar77._56_4_ = -0.16668057;
      auVar77._60_4_ = -0.16668057;
      auVar212 = vfmadd213ps_avx512f(auVar78,auVar212,auVar77);
      local_6900 = auVar212._0_8_;
      local_3e00 = local_6900;
      uStack_68f8 = auVar212._8_8_;
      uStack_3df8 = uStack_68f8;
      uStack_68f0 = auVar212._16_8_;
      uStack_3df0 = uStack_68f0;
      uStack_68e8 = auVar212._24_8_;
      uStack_3de8 = uStack_68e8;
      uStack_68e0 = auVar212._32_8_;
      uStack_3de0 = uStack_68e0;
      uStack_68d8 = auVar212._40_8_;
      uStack_3dd8 = uStack_68d8;
      uStack_68d0 = auVar212._48_8_;
      uStack_3dd0 = uStack_68d0;
      uStack_68c8 = auVar212._56_8_;
      uStack_3dc8 = uStack_68c8;
      local_3e40 = local_6700._0_8_;
      uStack_3e38 = local_6700._8_8_;
      uStack_3e30 = local_6700._16_8_;
      uStack_3e28 = local_6700._24_8_;
      uStack_3e20 = local_6700._32_8_;
      uStack_3e18 = local_6700._40_8_;
      uStack_3e10 = local_6700._48_8_;
      uStack_3e08 = local_6700._56_8_;
      local_3e80[0] = 0.20000714;
      local_3e80[1] = 0.20000714;
      afStack_3e78[0] = 0.20000714;
      afStack_3e78[1] = 0.20000714;
      afStack_3e70[0] = 0.20000714;
      afStack_3e70[1] = 0.20000714;
      afStack_3e68[0] = 0.20000714;
      afStack_3e68[1] = 0.20000714;
      afStack_3e60[0] = 0.20000714;
      afStack_3e60[1] = 0.20000714;
      afStack_3e58[0] = 0.20000714;
      afStack_3e58[1] = 0.20000714;
      afStack_3e50[0] = 0.20000714;
      afStack_3e50[1] = 0.20000714;
      afStack_3e48[0] = 0.20000714;
      afStack_3e48[1] = 0.20000714;
      auVar76._16_8_ = local_6700._16_8_;
      auVar76._0_16_ = local_6700._0_16_;
      auVar76._24_8_ = local_6700._24_8_;
      auVar76._32_8_ = local_6700._32_8_;
      auVar76._40_8_ = local_6700._40_8_;
      auVar76._48_8_ = local_6700._48_8_;
      auVar76._56_8_ = local_6700._56_8_;
      auVar75._8_4_ = 0.20000714;
      auVar75._12_4_ = 0.20000714;
      auVar75._0_4_ = 0.20000714;
      auVar75._4_4_ = 0.20000714;
      auVar75._16_4_ = 0.20000714;
      auVar75._20_4_ = 0.20000714;
      auVar75._24_4_ = 0.20000714;
      auVar75._28_4_ = 0.20000714;
      auVar75._32_4_ = 0.20000714;
      auVar75._36_4_ = 0.20000714;
      auVar75._40_4_ = 0.20000714;
      auVar75._44_4_ = 0.20000714;
      auVar75._48_4_ = 0.20000714;
      auVar75._52_4_ = 0.20000714;
      auVar75._56_4_ = 0.20000714;
      auVar75._60_4_ = 0.20000714;
      auVar212 = vfmadd213ps_avx512f(auVar76,auVar212,auVar75);
      local_6900 = auVar212._0_8_;
      local_3ec0 = local_6900;
      uStack_68f8 = auVar212._8_8_;
      uStack_3eb8 = uStack_68f8;
      uStack_68f0 = auVar212._16_8_;
      uStack_3eb0 = uStack_68f0;
      uStack_68e8 = auVar212._24_8_;
      uStack_3ea8 = uStack_68e8;
      uStack_68e0 = auVar212._32_8_;
      uStack_3ea0 = uStack_68e0;
      uStack_68d8 = auVar212._40_8_;
      uStack_3e98 = uStack_68d8;
      uStack_68d0 = auVar212._48_8_;
      uStack_3e90 = uStack_68d0;
      uStack_68c8 = auVar212._56_8_;
      uStack_3e88 = uStack_68c8;
      local_3f00 = local_6700._0_8_;
      uStack_3ef8 = local_6700._8_8_;
      uStack_3ef0 = local_6700._16_8_;
      uStack_3ee8 = local_6700._24_8_;
      uStack_3ee0 = local_6700._32_8_;
      uStack_3ed8 = local_6700._40_8_;
      uStack_3ed0 = local_6700._48_8_;
      uStack_3ec8 = local_6700._56_8_;
      local_3f40[0] = -0.24999994;
      local_3f40[1] = -0.24999994;
      afStack_3f38[0] = -0.24999994;
      afStack_3f38[1] = -0.24999994;
      afStack_3f30[0] = -0.24999994;
      afStack_3f30[1] = -0.24999994;
      afStack_3f28[0] = -0.24999994;
      afStack_3f28[1] = -0.24999994;
      afStack_3f20[0] = -0.24999994;
      afStack_3f20[1] = -0.24999994;
      afStack_3f18[0] = -0.24999994;
      afStack_3f18[1] = -0.24999994;
      afStack_3f10[0] = -0.24999994;
      afStack_3f10[1] = -0.24999994;
      afStack_3f08[0] = -0.24999994;
      afStack_3f08[1] = -0.24999994;
      auVar74._16_8_ = local_6700._16_8_;
      auVar74._0_16_ = local_6700._0_16_;
      auVar74._24_8_ = local_6700._24_8_;
      auVar74._32_8_ = local_6700._32_8_;
      auVar74._40_8_ = local_6700._40_8_;
      auVar74._48_8_ = local_6700._48_8_;
      auVar74._56_8_ = local_6700._56_8_;
      auVar73._8_4_ = -0.24999994;
      auVar73._12_4_ = -0.24999994;
      auVar73._0_4_ = -0.24999994;
      auVar73._4_4_ = -0.24999994;
      auVar73._16_4_ = -0.24999994;
      auVar73._20_4_ = -0.24999994;
      auVar73._24_4_ = -0.24999994;
      auVar73._28_4_ = -0.24999994;
      auVar73._32_4_ = -0.24999994;
      auVar73._36_4_ = -0.24999994;
      auVar73._40_4_ = -0.24999994;
      auVar73._44_4_ = -0.24999994;
      auVar73._48_4_ = -0.24999994;
      auVar73._52_4_ = -0.24999994;
      auVar73._56_4_ = -0.24999994;
      auVar73._60_4_ = -0.24999994;
      auVar212 = vfmadd213ps_avx512f(auVar74,auVar212,auVar73);
      local_6900 = auVar212._0_8_;
      local_3f80 = local_6900;
      uStack_68f8 = auVar212._8_8_;
      uStack_3f78 = uStack_68f8;
      uStack_68f0 = auVar212._16_8_;
      uStack_3f70 = uStack_68f0;
      uStack_68e8 = auVar212._24_8_;
      uStack_3f68 = uStack_68e8;
      uStack_68e0 = auVar212._32_8_;
      uStack_3f60 = uStack_68e0;
      uStack_68d8 = auVar212._40_8_;
      uStack_3f58 = uStack_68d8;
      uStack_68d0 = auVar212._48_8_;
      uStack_3f50 = uStack_68d0;
      uStack_68c8 = auVar212._56_8_;
      uStack_3f48 = uStack_68c8;
      local_3fc0 = local_6700._0_8_;
      uStack_3fb8 = local_6700._8_8_;
      uStack_3fb0 = local_6700._16_8_;
      uStack_3fa8 = local_6700._24_8_;
      uStack_3fa0 = local_6700._32_8_;
      uStack_3f98 = local_6700._40_8_;
      uStack_3f90 = local_6700._48_8_;
      uStack_3f88 = local_6700._56_8_;
      local_4000[0] = 0.3333333;
      local_4000[1] = 0.3333333;
      afStack_3ff8[0] = 0.3333333;
      afStack_3ff8[1] = 0.3333333;
      afStack_3ff0[0] = 0.3333333;
      afStack_3ff0[1] = 0.3333333;
      afStack_3fe8[0] = 0.3333333;
      afStack_3fe8[1] = 0.3333333;
      afStack_3fe0[0] = 0.3333333;
      afStack_3fe0[1] = 0.3333333;
      afStack_3fd8[0] = 0.3333333;
      afStack_3fd8[1] = 0.3333333;
      afStack_3fd0[0] = 0.3333333;
      afStack_3fd0[1] = 0.3333333;
      afStack_3fc8[0] = 0.3333333;
      afStack_3fc8[1] = 0.3333333;
      auVar72._16_8_ = local_6700._16_8_;
      auVar72._0_16_ = local_6700._0_16_;
      auVar72._24_8_ = local_6700._24_8_;
      auVar72._32_8_ = local_6700._32_8_;
      auVar72._40_8_ = local_6700._40_8_;
      auVar72._48_8_ = local_6700._48_8_;
      auVar72._56_8_ = local_6700._56_8_;
      auVar71._8_4_ = 0.3333333;
      auVar71._12_4_ = 0.3333333;
      auVar71._0_4_ = 0.3333333;
      auVar71._4_4_ = 0.3333333;
      auVar71._16_4_ = 0.3333333;
      auVar71._20_4_ = 0.3333333;
      auVar71._24_4_ = 0.3333333;
      auVar71._28_4_ = 0.3333333;
      auVar71._32_4_ = 0.3333333;
      auVar71._36_4_ = 0.3333333;
      auVar71._40_4_ = 0.3333333;
      auVar71._44_4_ = 0.3333333;
      auVar71._48_4_ = 0.3333333;
      auVar71._52_4_ = 0.3333333;
      auVar71._56_4_ = 0.3333333;
      auVar71._60_4_ = 0.3333333;
      auVar213 = vfmadd213ps_avx512f(auVar72,auVar212,auVar71);
      local_6900 = auVar213._0_8_;
      local_6600 = local_6900;
      uStack_68f8 = auVar213._8_8_;
      uStack_65f8 = uStack_68f8;
      uStack_68f0 = auVar213._16_8_;
      uStack_65f0 = uStack_68f0;
      uStack_68e8 = auVar213._24_8_;
      uStack_65e8 = uStack_68e8;
      uStack_68e0 = auVar213._32_8_;
      uStack_65e0 = uStack_68e0;
      uStack_68d8 = auVar213._40_8_;
      uStack_65d8 = uStack_68d8;
      uStack_68d0 = auVar213._48_8_;
      uStack_65d0 = uStack_68d0;
      uStack_68c8 = auVar213._56_8_;
      uStack_65c8 = uStack_68c8;
      local_6640 = local_6700._0_8_;
      uStack_6638 = local_6700._8_8_;
      uStack_6630 = local_6700._16_8_;
      uStack_6628 = local_6700._24_8_;
      uStack_6620 = local_6700._32_8_;
      uStack_6618 = local_6700._40_8_;
      uStack_6610 = local_6700._48_8_;
      uStack_6608 = local_6700._56_8_;
      auVar212._16_8_ = local_6700._16_8_;
      auVar212._0_16_ = local_6700._0_16_;
      auVar212._24_8_ = local_6700._24_8_;
      auVar212._32_8_ = local_6700._32_8_;
      auVar212._40_8_ = local_6700._40_8_;
      auVar212._48_8_ = local_6700._48_8_;
      auVar212._56_8_ = local_6700._56_8_;
      auVar212 = vmulps_avx512f(auVar213,auVar212);
      local_6900 = auVar212._0_8_;
      local_6680 = local_6900;
      uStack_68f8 = auVar212._8_8_;
      uStack_6678 = uStack_68f8;
      uStack_68f0 = auVar212._16_8_;
      uStack_6670 = uStack_68f0;
      uStack_68e8 = auVar212._24_8_;
      uStack_6668 = uStack_68e8;
      uStack_68e0 = auVar212._32_8_;
      uStack_6660 = uStack_68e0;
      uStack_68d8 = auVar212._40_8_;
      uStack_6658 = uStack_68d8;
      uStack_68d0 = auVar212._48_8_;
      uStack_6650 = uStack_68d0;
      uStack_68c8 = auVar212._56_8_;
      uStack_6648 = uStack_68c8;
      local_66c0 = local_68c0._0_8_;
      uStack_66b8 = local_68c0._8_8_;
      uStack_66b0 = local_68c0._16_8_;
      uStack_66a8 = local_68c0._24_8_;
      uStack_66a0 = local_68c0._32_8_;
      uStack_6698 = local_68c0._40_8_;
      uStack_6690 = local_68c0._48_8_;
      uStack_6688 = local_68c0._56_8_;
      auVar212 = vmulps_avx512f(auVar212,local_68c0);
      local_4040 = local_6800._0_8_;
      uStack_4038 = local_6800._8_8_;
      uStack_67f0 = auVar200._16_8_;
      uStack_4030 = uStack_67f0;
      uStack_67e8 = auVar18._24_8_;
      uStack_4028 = uStack_67e8;
      uStack_67e0 = auVar205._32_8_;
      uStack_4020 = uStack_67e0;
      uStack_67d8 = auVar206._40_8_;
      uStack_4018 = uStack_67d8;
      uStack_67d0 = auVar199._48_8_;
      uStack_4010 = uStack_67d0;
      uStack_67c8 = auVar39._56_8_;
      uStack_4008 = uStack_67c8;
      local_4080[0] = -0.00021219444;
      local_4080[1] = -0.00021219444;
      afStack_4078[0] = -0.00021219444;
      afStack_4078[1] = -0.00021219444;
      afStack_4070[0] = -0.00021219444;
      afStack_4070[1] = -0.00021219444;
      afStack_4068[0] = -0.00021219444;
      afStack_4068[1] = -0.00021219444;
      afStack_4060[0] = -0.00021219444;
      afStack_4060[1] = -0.00021219444;
      afStack_4058[0] = -0.00021219444;
      afStack_4058[1] = -0.00021219444;
      afStack_4050[0] = -0.00021219444;
      afStack_4050[1] = -0.00021219444;
      afStack_4048[0] = -0.00021219444;
      afStack_4048[1] = -0.00021219444;
      local_6900 = auVar212._0_8_;
      local_40c0 = local_6900;
      uStack_68f8 = auVar212._8_8_;
      uStack_40b8 = uStack_68f8;
      uStack_68f0 = auVar212._16_8_;
      uStack_40b0 = uStack_68f0;
      uStack_68e8 = auVar212._24_8_;
      uStack_40a8 = uStack_68e8;
      uStack_68e0 = auVar212._32_8_;
      uStack_40a0 = uStack_68e0;
      uStack_68d8 = auVar212._40_8_;
      uStack_4098 = uStack_68d8;
      uStack_68d0 = auVar212._48_8_;
      uStack_4090 = uStack_68d0;
      uStack_68c8 = auVar212._56_8_;
      uStack_4088 = uStack_68c8;
      auVar70._16_8_ = uStack_67f0;
      auVar70._0_16_ = local_6800;
      auVar70._24_8_ = uStack_67e8;
      auVar70._32_8_ = uStack_67e0;
      auVar70._40_8_ = uStack_67d8;
      auVar70._48_8_ = uStack_67d0;
      auVar70._56_8_ = uStack_67c8;
      auVar69._8_4_ = -0.00021219444;
      auVar69._12_4_ = -0.00021219444;
      auVar69._0_4_ = -0.00021219444;
      auVar69._4_4_ = -0.00021219444;
      auVar69._16_4_ = -0.00021219444;
      auVar69._20_4_ = -0.00021219444;
      auVar69._24_4_ = -0.00021219444;
      auVar69._28_4_ = -0.00021219444;
      auVar69._32_4_ = -0.00021219444;
      auVar69._36_4_ = -0.00021219444;
      auVar69._40_4_ = -0.00021219444;
      auVar69._44_4_ = -0.00021219444;
      auVar69._48_4_ = -0.00021219444;
      auVar69._52_4_ = -0.00021219444;
      auVar69._56_4_ = -0.00021219444;
      auVar69._60_4_ = -0.00021219444;
      auVar212 = vfmadd213ps_avx512f(auVar69,auVar70,auVar212);
      local_3680 = local_68c0._0_8_;
      uStack_3678 = local_68c0._8_8_;
      uStack_3670 = local_68c0._16_8_;
      uStack_3668 = local_68c0._24_8_;
      uStack_3660 = local_68c0._32_8_;
      uStack_3658 = local_68c0._40_8_;
      uStack_3650 = local_68c0._48_8_;
      uStack_3648 = local_68c0._56_8_;
      local_36c0[0] = 0.5;
      local_36c0[1] = 0.5;
      afStack_36b8[0] = 0.5;
      afStack_36b8[1] = 0.5;
      afStack_36b0[0] = 0.5;
      afStack_36b0[1] = 0.5;
      afStack_36a8[0] = 0.5;
      afStack_36a8[1] = 0.5;
      afStack_36a0[0] = 0.5;
      afStack_36a0[1] = 0.5;
      afStack_3698[0] = 0.5;
      afStack_3698[1] = 0.5;
      afStack_3690[0] = 0.5;
      afStack_3690[1] = 0.5;
      afStack_3688[0] = 0.5;
      afStack_3688[1] = 0.5;
      local_6900 = auVar212._0_8_;
      local_3700 = local_6900;
      uStack_68f8 = auVar212._8_8_;
      uStack_36f8 = uStack_68f8;
      uStack_68f0 = auVar212._16_8_;
      uStack_36f0 = uStack_68f0;
      uStack_68e8 = auVar212._24_8_;
      uStack_36e8 = uStack_68e8;
      uStack_68e0 = auVar212._32_8_;
      uStack_36e0 = uStack_68e0;
      uStack_68d8 = auVar212._40_8_;
      uStack_36d8 = uStack_68d8;
      uStack_68d0 = auVar212._48_8_;
      uStack_36d0 = uStack_68d0;
      uStack_68c8 = auVar212._56_8_;
      uStack_36c8 = uStack_68c8;
      auVar96._8_4_ = 0.5;
      auVar96._12_4_ = 0.5;
      auVar96._0_4_ = 0.5;
      auVar96._4_4_ = 0.5;
      auVar96._16_4_ = 0.5;
      auVar96._20_4_ = 0.5;
      auVar96._24_4_ = 0.5;
      auVar96._28_4_ = 0.5;
      auVar96._32_4_ = 0.5;
      auVar96._36_4_ = 0.5;
      auVar96._40_4_ = 0.5;
      auVar96._44_4_ = 0.5;
      auVar96._48_4_ = 0.5;
      auVar96._52_4_ = 0.5;
      auVar96._56_4_ = 0.5;
      auVar96._60_4_ = 0.5;
      auVar212 = vfnmadd213ps_avx512f(auVar96,local_68c0,auVar212);
      local_6500 = local_6700._0_8_;
      uStack_64f8 = local_6700._8_8_;
      uStack_64f0 = local_6700._16_8_;
      uStack_64e8 = local_6700._24_8_;
      uStack_64e0 = local_6700._32_8_;
      uStack_64d8 = local_6700._40_8_;
      uStack_64d0 = local_6700._48_8_;
      uStack_64c8 = local_6700._56_8_;
      local_6900 = auVar212._0_8_;
      local_6540 = local_6900;
      uStack_68f8 = auVar212._8_8_;
      uStack_6538 = uStack_68f8;
      uStack_68f0 = auVar212._16_8_;
      uStack_6530 = uStack_68f0;
      uStack_68e8 = auVar212._24_8_;
      uStack_6528 = uStack_68e8;
      uStack_68e0 = auVar212._32_8_;
      uStack_6520 = uStack_68e0;
      uStack_68d8 = auVar212._40_8_;
      uStack_6518 = uStack_68d8;
      uStack_68d0 = auVar212._48_8_;
      uStack_6510 = uStack_68d0;
      uStack_68c8 = auVar212._56_8_;
      uStack_6508 = uStack_68c8;
      auVar215._16_8_ = local_6700._16_8_;
      auVar215._0_16_ = local_6700._0_16_;
      auVar215._24_8_ = local_6700._24_8_;
      auVar215._32_8_ = local_6700._32_8_;
      auVar215._40_8_ = local_6700._40_8_;
      auVar215._48_8_ = local_6700._48_8_;
      auVar215._56_8_ = local_6700._56_8_;
      auVar212 = vaddps_avx512f(auVar215,auVar212);
      local_4100 = local_6800._0_8_;
      uStack_40f8 = local_6800._8_8_;
      uStack_40f0 = uStack_67f0;
      uStack_40e8 = uStack_67e8;
      uStack_40e0 = uStack_67e0;
      uStack_40d8 = uStack_67d8;
      uStack_40d0 = uStack_67d0;
      uStack_40c8 = uStack_67c8;
      local_4140[0] = 0.6933594;
      local_4140[1] = 0.6933594;
      afStack_4138[0] = 0.6933594;
      afStack_4138[1] = 0.6933594;
      afStack_4130[0] = 0.6933594;
      afStack_4130[1] = 0.6933594;
      afStack_4128[0] = 0.6933594;
      afStack_4128[1] = 0.6933594;
      afStack_4120[0] = 0.6933594;
      afStack_4120[1] = 0.6933594;
      afStack_4118[0] = 0.6933594;
      afStack_4118[1] = 0.6933594;
      afStack_4110[0] = 0.6933594;
      afStack_4110[1] = 0.6933594;
      afStack_4108[0] = 0.6933594;
      afStack_4108[1] = 0.6933594;
      local_6700._0_8_ = auVar212._0_8_;
      local_4180 = local_6700._0_8_;
      local_6700._8_8_ = auVar212._8_8_;
      uStack_4178 = local_6700._8_8_;
      local_6700._16_8_ = auVar212._16_8_;
      uStack_4170 = local_6700._16_8_;
      local_6700._24_8_ = auVar212._24_8_;
      uStack_4168 = local_6700._24_8_;
      local_6700._32_8_ = auVar212._32_8_;
      uStack_4160 = local_6700._32_8_;
      local_6700._40_8_ = auVar212._40_8_;
      uStack_4158 = local_6700._40_8_;
      local_6700._48_8_ = auVar212._48_8_;
      uStack_4150 = local_6700._48_8_;
      local_6700._56_8_ = auVar212._56_8_;
      uStack_4148 = local_6700._56_8_;
      auVar68._16_8_ = uStack_67f0;
      auVar68._0_16_ = local_6800;
      auVar68._24_8_ = uStack_67e8;
      auVar68._32_8_ = uStack_67e0;
      auVar68._40_8_ = uStack_67d8;
      auVar68._48_8_ = uStack_67d0;
      auVar68._56_8_ = uStack_67c8;
      auVar67._8_4_ = 0.6933594;
      auVar67._12_4_ = 0.6933594;
      auVar67._0_4_ = 0.6933594;
      auVar67._4_4_ = 0.6933594;
      auVar67._16_4_ = 0.6933594;
      auVar67._20_4_ = 0.6933594;
      auVar67._24_4_ = 0.6933594;
      auVar67._28_4_ = 0.6933594;
      auVar67._32_4_ = 0.6933594;
      auVar67._36_4_ = 0.6933594;
      auVar67._40_4_ = 0.6933594;
      auVar67._44_4_ = 0.6933594;
      auVar67._48_4_ = 0.6933594;
      auVar67._52_4_ = 0.6933594;
      auVar67._56_4_ = 0.6933594;
      auVar67._60_4_ = 0.6933594;
      local_6700 = vfmadd213ps_avx512f(auVar67,auVar68,auVar212);
      local_5380 = local_6700._0_8_;
      uStack_5378 = local_6700._8_8_;
      uStack_5370 = local_6700._16_8_;
      uStack_5368 = local_6700._24_8_;
      uStack_5360 = local_6700._32_8_;
      uStack_5358 = local_6700._40_8_;
      uStack_5350 = local_6700._48_8_;
      uStack_5348 = local_6700._56_8_;
      auVar212 = vpmovm2d_avx512dq(uVar21 & 0xffff);
      local_35c0 = vmovdqa64_avx512f(auVar212);
      auVar212 = vmovdqa64_avx512f(local_35c0);
      local_53c0 = vmovdqa64_avx512f(auVar212);
      auVar212 = vmovdqa64_avx512f(local_6700);
      auVar213 = vmovdqa64_avx512f(local_53c0);
      auVar212 = vpord_avx512f(auVar212,auVar213);
      _local_6900 = vmovdqa64_avx512f(auVar212);
      local_69c0 = local_6900;
      uStack_69b8 = uStack_68f8;
      uStack_69b0 = uStack_68f0;
      uStack_69a8 = uStack_68e8;
      uStack_69a0 = uStack_68e0;
      uStack_6998 = uStack_68d8;
      uStack_6990 = uStack_68d0;
      uStack_6988 = uStack_68c8;
      local_5f44 = 0x3f800000;
      local_5fc0 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      local_6a00 = local_5fc0._0_8_;
      uStack_69f8 = local_5fc0._8_8_;
      uStack_69f0 = local_5fc0._16_8_;
      uStack_69e8 = local_5fc0._24_8_;
      uStack_69e0 = local_5fc0._32_8_;
      uStack_69d8 = local_5fc0._40_8_;
      uStack_69d0 = local_5fc0._48_8_;
      uStack_69c8 = local_5fc0._56_8_;
      local_5fc4 = 0x40000000;
      local_6040 = vbroadcastss_avx512f(ZEXT416(0x40000000));
      local_6a40 = local_6040._0_8_;
      uStack_6a38 = local_6040._8_8_;
      uStack_6a30 = local_6040._16_8_;
      uStack_6a28 = local_6040._24_8_;
      uStack_6a20 = local_6040._32_8_;
      uStack_6a18 = local_6040._40_8_;
      uStack_6a10 = local_6040._48_8_;
      uStack_6a08 = local_6040._56_8_;
      local_6940 = local_6900;
      uStack_6938 = uStack_68f8;
      uStack_6930 = uStack_68f0;
      uStack_6928 = uStack_68e8;
      uStack_6920 = uStack_68e0;
      uStack_6918 = uStack_68d8;
      uStack_6910 = uStack_68d0;
      uStack_6908 = uStack_68c8;
      local_6980 = local_6040._0_8_;
      uStack_6978 = local_6040._8_8_;
      uStack_6970 = local_6040._16_8_;
      uStack_6968 = local_6040._24_8_;
      uStack_6960 = local_6040._32_8_;
      uStack_6958 = local_6040._40_8_;
      uStack_6950 = local_6040._48_8_;
      uStack_6948 = local_6040._56_8_;
      local_5dc0 = vmulps_avx512f(_local_6900,local_6040);
      local_5904 = 0x3f800000;
      local_5980 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      local_5e00 = local_5980._0_8_;
      uStack_5df8 = local_5980._8_8_;
      uStack_5df0 = local_5980._16_8_;
      uStack_5de8 = local_5980._24_8_;
      uStack_5de0 = local_5980._32_8_;
      uStack_5dd8 = local_5980._40_8_;
      uStack_5dd0 = local_5980._48_8_;
      uStack_5dc8 = local_5980._56_8_;
      local_5d40 = local_5980._0_8_;
      uStack_5d38 = local_5980._8_8_;
      uStack_5d30 = local_5980._16_8_;
      uStack_5d28 = local_5980._24_8_;
      uStack_5d20 = local_5980._32_8_;
      uStack_5d18 = local_5980._40_8_;
      uStack_5d10 = local_5980._48_8_;
      uStack_5d08 = local_5980._56_8_;
      local_5740 = 0;
      uStack_5738 = 0;
      uStack_5730 = 0;
      uStack_5728 = 0;
      uStack_5720 = 0;
      uStack_5718 = 0;
      uStack_5710 = 0;
      uStack_5708 = 0;
      local_5840 = 0;
      uStack_5838 = 0;
      uStack_5830 = 0;
      uStack_5828 = 0;
      uStack_5820 = 0;
      uStack_5818 = 0;
      uStack_5810 = 0;
      uStack_5808 = 0;
      local_5880 = local_5dc0._0_8_;
      uStack_5878 = local_5dc0._8_8_;
      uStack_5870 = local_5dc0._16_8_;
      uStack_5868 = local_5dc0._24_8_;
      uStack_5860 = local_5dc0._32_8_;
      uStack_5858 = local_5dc0._40_8_;
      uStack_5850 = local_5dc0._48_8_;
      uStack_5848 = local_5dc0._56_8_;
      auVar212 = vsubps_avx512f(ZEXT1664(ZEXT816(0)),local_5dc0);
      local_5780 = 0;
      uStack_5778 = 0;
      uStack_5770 = 0;
      uStack_5768 = 0;
      uStack_5760 = 0;
      uStack_5758 = 0;
      uStack_5750 = 0;
      uStack_5748 = 0;
      local_5c40[0] = 1.0;
      local_5c40[1] = 1.0;
      afStack_5c38[0] = 1.0;
      afStack_5c38[1] = 1.0;
      afStack_5c30[0] = 1.0;
      afStack_5c30[1] = 1.0;
      afStack_5c28[0] = 1.0;
      afStack_5c28[1] = 1.0;
      afStack_5c20[0] = 1.0;
      afStack_5c20[1] = 1.0;
      afStack_5c18[0] = 1.0;
      afStack_5c18[1] = 1.0;
      afStack_5c10[0] = 1.0;
      afStack_5c10[1] = 1.0;
      afStack_5c08[0] = 1.0;
      afStack_5c08[1] = 1.0;
      local_5b40._0_8_ = auVar212._0_8_;
      local_3500 = local_5b40._0_8_;
      local_5b40._8_8_ = auVar212._8_8_;
      uStack_34f8 = local_5b40._8_8_;
      local_5b40._16_8_ = auVar212._16_8_;
      uStack_34f0 = local_5b40._16_8_;
      local_5b40._24_8_ = auVar212._24_8_;
      uStack_34e8 = local_5b40._24_8_;
      local_5b40._32_8_ = auVar212._32_8_;
      uStack_34e0 = local_5b40._32_8_;
      local_5b40._40_8_ = auVar212._40_8_;
      uStack_34d8 = local_5b40._40_8_;
      local_5b40._48_8_ = auVar212._48_8_;
      uStack_34d0 = local_5b40._48_8_;
      local_5b40._56_8_ = auVar212._56_8_;
      uStack_34c8 = local_5b40._56_8_;
      local_3540[0] = 88.37626;
      local_3540[1] = 88.37626;
      afStack_3538[0] = 88.37626;
      afStack_3538[1] = 88.37626;
      afStack_3530[0] = 88.37626;
      afStack_3530[1] = 88.37626;
      afStack_3528[0] = 88.37626;
      afStack_3528[1] = 88.37626;
      afStack_3520[0] = 88.37626;
      afStack_3520[1] = 88.37626;
      afStack_3518[0] = 88.37626;
      afStack_3518[1] = 88.37626;
      afStack_3510[0] = 88.37626;
      afStack_3510[1] = 88.37626;
      afStack_3508[0] = 88.37626;
      afStack_3508[1] = 88.37626;
      auVar97._8_4_ = 88.37626;
      auVar97._12_4_ = 88.37626;
      auVar97._0_4_ = 88.37626;
      auVar97._4_4_ = 88.37626;
      auVar97._16_4_ = 88.37626;
      auVar97._20_4_ = 88.37626;
      auVar97._24_4_ = 88.37626;
      auVar97._28_4_ = 88.37626;
      auVar97._32_4_ = 88.37626;
      auVar97._36_4_ = 88.37626;
      auVar97._40_4_ = 88.37626;
      auVar97._44_4_ = 88.37626;
      auVar97._48_4_ = 88.37626;
      auVar97._52_4_ = 88.37626;
      auVar97._56_4_ = 88.37626;
      auVar97._60_4_ = 88.37626;
      auVar212 = vminps_avx512f(auVar212,auVar97);
      local_5b40._0_8_ = auVar212._0_8_;
      local_5640 = local_5b40._0_8_;
      local_5b40._8_8_ = auVar212._8_8_;
      uStack_5638 = local_5b40._8_8_;
      local_5b40._16_8_ = auVar212._16_8_;
      uStack_5630 = local_5b40._16_8_;
      local_5b40._24_8_ = auVar212._24_8_;
      uStack_5628 = local_5b40._24_8_;
      local_5b40._32_8_ = auVar212._32_8_;
      uStack_5620 = local_5b40._32_8_;
      local_5b40._40_8_ = auVar212._40_8_;
      uStack_5618 = local_5b40._40_8_;
      local_5b40._48_8_ = auVar212._48_8_;
      uStack_5610 = local_5b40._48_8_;
      local_5b40._56_8_ = auVar212._56_8_;
      uStack_5608 = local_5b40._56_8_;
      local_5680[0] = -88.37626;
      local_5680[1] = -88.37626;
      afStack_5678[0] = -88.37626;
      afStack_5678[1] = -88.37626;
      afStack_5670[0] = -88.37626;
      afStack_5670[1] = -88.37626;
      afStack_5668[0] = -88.37626;
      afStack_5668[1] = -88.37626;
      afStack_5660[0] = -88.37626;
      afStack_5660[1] = -88.37626;
      afStack_5658[0] = -88.37626;
      afStack_5658[1] = -88.37626;
      afStack_5650[0] = -88.37626;
      afStack_5650[1] = -88.37626;
      afStack_5648[0] = -88.37626;
      afStack_5648[1] = -88.37626;
      auVar43._8_4_ = -88.37626;
      auVar43._12_4_ = -88.37626;
      auVar43._0_4_ = -88.37626;
      auVar43._4_4_ = -88.37626;
      auVar43._16_4_ = -88.37626;
      auVar43._20_4_ = -88.37626;
      auVar43._24_4_ = -88.37626;
      auVar43._28_4_ = -88.37626;
      auVar43._32_4_ = -88.37626;
      auVar43._36_4_ = -88.37626;
      auVar43._40_4_ = -88.37626;
      auVar43._44_4_ = -88.37626;
      auVar43._48_4_ = -88.37626;
      auVar43._52_4_ = -88.37626;
      auVar43._56_4_ = -88.37626;
      auVar43._60_4_ = -88.37626;
      auVar212 = vmaxps_avx512f(auVar212,auVar43);
      local_5b40._0_8_ = auVar212._0_8_;
      local_4700 = local_5b40._0_8_;
      local_5b40._8_8_ = auVar212._8_8_;
      uStack_46f8 = local_5b40._8_8_;
      local_5b40._16_8_ = auVar212._16_8_;
      uStack_46f0 = local_5b40._16_8_;
      local_5b40._24_8_ = auVar212._24_8_;
      uStack_46e8 = local_5b40._24_8_;
      local_5b40._32_8_ = auVar212._32_8_;
      uStack_46e0 = local_5b40._32_8_;
      local_5b40._40_8_ = auVar212._40_8_;
      uStack_46d8 = local_5b40._40_8_;
      local_5b40._48_8_ = auVar212._48_8_;
      uStack_46d0 = local_5b40._48_8_;
      local_5b40._56_8_ = auVar212._56_8_;
      uStack_46c8 = local_5b40._56_8_;
      local_4740[0] = 1.442695;
      local_4740[1] = 1.442695;
      afStack_4738[0] = 1.442695;
      afStack_4738[1] = 1.442695;
      afStack_4730[0] = 1.442695;
      afStack_4730[1] = 1.442695;
      afStack_4728[0] = 1.442695;
      afStack_4728[1] = 1.442695;
      afStack_4720[0] = 1.442695;
      afStack_4720[1] = 1.442695;
      afStack_4718[0] = 1.442695;
      afStack_4718[1] = 1.442695;
      afStack_4710[0] = 1.442695;
      afStack_4710[1] = 1.442695;
      afStack_4708[0] = 1.442695;
      afStack_4708[1] = 1.442695;
      local_4780[0] = 0.5;
      local_4780[1] = 0.5;
      afStack_4778[0] = 0.5;
      afStack_4778[1] = 0.5;
      afStack_4770[0] = 0.5;
      afStack_4770[1] = 0.5;
      afStack_4768[0] = 0.5;
      afStack_4768[1] = 0.5;
      afStack_4760[0] = 0.5;
      afStack_4760[1] = 0.5;
      afStack_4758[0] = 0.5;
      afStack_4758[1] = 0.5;
      afStack_4750[0] = 0.5;
      afStack_4750[1] = 0.5;
      afStack_4748[0] = 0.5;
      afStack_4748[1] = 0.5;
      auVar58._8_4_ = 1.442695;
      auVar58._12_4_ = 1.442695;
      auVar58._0_4_ = 1.442695;
      auVar58._4_4_ = 1.442695;
      auVar58._16_4_ = 1.442695;
      auVar58._20_4_ = 1.442695;
      auVar58._24_4_ = 1.442695;
      auVar58._28_4_ = 1.442695;
      auVar58._32_4_ = 1.442695;
      auVar58._36_4_ = 1.442695;
      auVar58._40_4_ = 1.442695;
      auVar58._44_4_ = 1.442695;
      auVar58._48_4_ = 1.442695;
      auVar58._52_4_ = 1.442695;
      auVar58._56_4_ = 1.442695;
      auVar58._60_4_ = 1.442695;
      auVar57._8_4_ = 0.5;
      auVar57._12_4_ = 0.5;
      auVar57._0_4_ = 0.5;
      auVar57._4_4_ = 0.5;
      auVar57._16_4_ = 0.5;
      auVar57._20_4_ = 0.5;
      auVar57._24_4_ = 0.5;
      auVar57._28_4_ = 0.5;
      auVar57._32_4_ = 0.5;
      auVar57._36_4_ = 0.5;
      auVar57._40_4_ = 0.5;
      auVar57._44_4_ = 0.5;
      auVar57._48_4_ = 0.5;
      auVar57._52_4_ = 0.5;
      auVar57._56_4_ = 0.5;
      auVar57._60_4_ = 0.5;
      auVar213 = vfmadd213ps_avx512f(auVar58,auVar212,auVar57);
      auVar214 = vrndscaleps_avx512f(auVar213,1);
      uVar20 = vcmpps_avx512f(auVar213,auVar214,1);
      local_5c42 = (ushort)uVar20;
      local_5b80._0_8_ = auVar214._0_8_;
      local_51c0 = local_5b80._0_8_;
      local_5b80._8_8_ = auVar214._8_8_;
      uStack_51b8 = local_5b80._8_8_;
      local_5b80._16_8_ = auVar214._16_8_;
      uStack_51b0 = local_5b80._16_8_;
      local_5b80._24_8_ = auVar214._24_8_;
      uStack_51a8 = local_5b80._24_8_;
      local_5b80._32_8_ = auVar214._32_8_;
      uStack_51a0 = local_5b80._32_8_;
      local_5b80._40_8_ = auVar214._40_8_;
      uStack_5198 = local_5b80._40_8_;
      local_5b80._48_8_ = auVar214._48_8_;
      uStack_5190 = local_5b80._48_8_;
      local_5b80._56_8_ = auVar214._56_8_;
      uStack_5188 = local_5b80._56_8_;
      local_5200[0] = 1.0;
      local_5200[1] = 1.0;
      afStack_51f8[0] = 1.0;
      afStack_51f8[1] = 1.0;
      afStack_51f0[0] = 1.0;
      afStack_51f0[1] = 1.0;
      afStack_51e8[0] = 1.0;
      afStack_51e8[1] = 1.0;
      afStack_51e0[0] = 1.0;
      afStack_51e0[1] = 1.0;
      afStack_51d8[0] = 1.0;
      afStack_51d8[1] = 1.0;
      afStack_51d0[0] = 1.0;
      afStack_51d0[1] = 1.0;
      afStack_51c8[0] = 1.0;
      afStack_51c8[1] = 1.0;
      local_50c0 = local_5b80._0_8_;
      uStack_50b8 = local_5b80._8_8_;
      uStack_50b0 = local_5b80._16_8_;
      uStack_50a8 = local_5b80._24_8_;
      uStack_50a0 = local_5b80._32_8_;
      uStack_5098 = local_5b80._40_8_;
      uStack_5090 = local_5b80._48_8_;
      uStack_5088 = local_5b80._56_8_;
      local_5100[0] = 1.0;
      local_5100[1] = 1.0;
      afStack_50f8[0] = 1.0;
      afStack_50f8[1] = 1.0;
      afStack_50f0[0] = 1.0;
      afStack_50f0[1] = 1.0;
      afStack_50e8[0] = 1.0;
      afStack_50e8[1] = 1.0;
      afStack_50e0[0] = 1.0;
      afStack_50e0[1] = 1.0;
      afStack_50d8[0] = 1.0;
      afStack_50d8[1] = 1.0;
      afStack_50d0[0] = 1.0;
      afStack_50d0[1] = 1.0;
      afStack_50c8[0] = 1.0;
      afStack_50c8[1] = 1.0;
      auVar48._8_4_ = 1.0;
      auVar48._12_4_ = 1.0;
      auVar48._0_4_ = 1.0;
      auVar48._4_4_ = 1.0;
      auVar48._16_4_ = 1.0;
      auVar48._20_4_ = 1.0;
      auVar48._24_4_ = 1.0;
      auVar48._28_4_ = 1.0;
      auVar48._32_4_ = 1.0;
      auVar48._36_4_ = 1.0;
      auVar48._40_4_ = 1.0;
      auVar48._44_4_ = 1.0;
      auVar48._48_4_ = 1.0;
      auVar48._52_4_ = 1.0;
      auVar48._56_4_ = 1.0;
      auVar48._60_4_ = 1.0;
      local_5140._0_4_ = auVar214._0_4_;
      local_5140._4_4_ = auVar214._4_4_;
      uStack_5138._0_4_ = auVar214._8_4_;
      uStack_5138._4_4_ = auVar214._12_4_;
      uStack_5130._0_4_ = auVar214._16_4_;
      uStack_5130._4_4_ = auVar214._20_4_;
      uStack_5128._0_4_ = auVar214._24_4_;
      uStack_5128._4_4_ = auVar214._28_4_;
      uStack_5120._0_4_ = auVar214._32_4_;
      uStack_5120._4_4_ = auVar214._36_4_;
      uStack_5118._0_4_ = auVar214._40_4_;
      uStack_5118._4_4_ = auVar214._44_4_;
      uStack_5110._0_4_ = auVar214._48_4_;
      uStack_5110._4_4_ = auVar214._52_4_;
      uStack_5108._0_4_ = auVar214._56_4_;
      uStack_5108._4_4_ = auVar214._60_4_;
      auVar213 = vsubps_avx512f(auVar214,auVar48);
      bVar1 = (bool)((byte)uVar20 & 1);
      bVar2 = (bool)((byte)(local_5c42 >> 1) & 1);
      bVar3 = (bool)((byte)(local_5c42 >> 2) & 1);
      bVar4 = (bool)((byte)(local_5c42 >> 3) & 1);
      bVar5 = (bool)((byte)(local_5c42 >> 4) & 1);
      bVar6 = (bool)((byte)(local_5c42 >> 5) & 1);
      bVar7 = (bool)((byte)(local_5c42 >> 6) & 1);
      bVar8 = (bool)((byte)(local_5c42 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar20 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      local_5bc0._4_4_ = (uint)bVar2 * auVar213._4_4_ | (uint)!bVar2 * local_5140._4_4_;
      local_5bc0._0_4_ = (uint)bVar1 * auVar213._0_4_ | (uint)!bVar1 * (int)local_5140;
      local_5bc0._8_4_ = (uint)bVar3 * auVar213._8_4_ | (uint)!bVar3 * (int)uStack_5138;
      local_5bc0._12_4_ = (uint)bVar4 * auVar213._12_4_ | (uint)!bVar4 * uStack_5138._4_4_;
      uStack_5bb0._0_4_ = (uint)bVar5 * auVar213._16_4_ | (uint)!bVar5 * (int)uStack_5130;
      uStack_5bb0._4_4_ = (uint)bVar6 * auVar213._20_4_ | (uint)!bVar6 * uStack_5130._4_4_;
      auVar200 = _local_5bc0;
      uStack_5ba8._0_4_ = (uint)bVar7 * auVar213._24_4_ | (uint)!bVar7 * (int)uStack_5128;
      uStack_5ba8._4_4_ = (uint)bVar8 * auVar213._28_4_ | (uint)!bVar8 * uStack_5128._4_4_;
      auVar18 = _local_5bc0;
      uStack_5ba0._0_4_ =
           (uint)(bVar9 & 1) * auVar213._32_4_ | (uint)!(bool)(bVar9 & 1) * (int)uStack_5120;
      uStack_5ba0._4_4_ = (uint)bVar10 * auVar213._36_4_ | (uint)!bVar10 * uStack_5120._4_4_;
      auVar205 = _local_5bc0;
      uStack_5b98._0_4_ = (uint)bVar11 * auVar213._40_4_ | (uint)!bVar11 * (int)uStack_5118;
      uStack_5b98._4_4_ = (uint)bVar12 * auVar213._44_4_ | (uint)!bVar12 * uStack_5118._4_4_;
      auVar206 = _local_5bc0;
      uStack_5b90._0_4_ = (uint)bVar13 * auVar213._48_4_ | (uint)!bVar13 * (int)uStack_5110;
      uStack_5b90._4_4_ = (uint)bVar14 * auVar213._52_4_ | (uint)!bVar14 * uStack_5110._4_4_;
      auVar199 = _local_5bc0;
      uStack_5b88._0_4_ = (uint)bVar15 * auVar213._56_4_ | (uint)!bVar15 * (int)uStack_5108;
      uStack_5b88._4_4_ =
           (uint)(bVar9 >> 7) * auVar213._60_4_ | (uint)!(bool)(bVar9 >> 7) * uStack_5108._4_4_;
      auVar213 = _local_5bc0;
      local_38c0 = local_5bc0._0_8_;
      uStack_38b8 = local_5bc0._8_8_;
      uStack_5bb0 = auVar200._16_8_;
      uStack_38b0 = uStack_5bb0;
      uStack_5ba8 = auVar18._24_8_;
      uStack_38a8 = uStack_5ba8;
      uStack_5ba0 = auVar205._32_8_;
      uStack_38a0 = uStack_5ba0;
      uStack_5b98 = auVar206._40_8_;
      uStack_3898 = uStack_5b98;
      uStack_5b90 = auVar199._48_8_;
      uStack_3890 = uStack_5b90;
      uStack_5b88 = auVar213._56_8_;
      uStack_3888 = uStack_5b88;
      local_3900[0] = 0.6933594;
      local_3900[1] = 0.6933594;
      afStack_38f8[0] = 0.6933594;
      afStack_38f8[1] = 0.6933594;
      afStack_38f0[0] = 0.6933594;
      afStack_38f0[1] = 0.6933594;
      afStack_38e8[0] = 0.6933594;
      afStack_38e8[1] = 0.6933594;
      afStack_38e0[0] = 0.6933594;
      afStack_38e0[1] = 0.6933594;
      afStack_38d8[0] = 0.6933594;
      afStack_38d8[1] = 0.6933594;
      afStack_38d0[0] = 0.6933594;
      afStack_38d0[1] = 0.6933594;
      afStack_38c8[0] = 0.6933594;
      afStack_38c8[1] = 0.6933594;
      local_3940 = local_5b40._0_8_;
      uStack_3938 = local_5b40._8_8_;
      uStack_3930 = local_5b40._16_8_;
      uStack_3928 = local_5b40._24_8_;
      uStack_3920 = local_5b40._32_8_;
      uStack_3918 = local_5b40._40_8_;
      uStack_3910 = local_5b40._48_8_;
      uStack_3908 = local_5b40._56_8_;
      auVar91._16_8_ = uStack_5bb0;
      auVar91._0_16_ = local_5bc0;
      auVar91._24_8_ = uStack_5ba8;
      auVar91._32_8_ = uStack_5ba0;
      auVar91._40_8_ = uStack_5b98;
      auVar91._48_8_ = uStack_5b90;
      auVar91._56_8_ = uStack_5b88;
      auVar90._8_4_ = 0.6933594;
      auVar90._12_4_ = 0.6933594;
      auVar90._0_4_ = 0.6933594;
      auVar90._4_4_ = 0.6933594;
      auVar90._16_4_ = 0.6933594;
      auVar90._20_4_ = 0.6933594;
      auVar90._24_4_ = 0.6933594;
      auVar90._28_4_ = 0.6933594;
      auVar90._32_4_ = 0.6933594;
      auVar90._36_4_ = 0.6933594;
      auVar90._40_4_ = 0.6933594;
      auVar90._44_4_ = 0.6933594;
      auVar90._48_4_ = 0.6933594;
      auVar90._52_4_ = 0.6933594;
      auVar90._56_4_ = 0.6933594;
      auVar90._60_4_ = 0.6933594;
      auVar212 = vfnmadd213ps_avx512f(auVar90,auVar91,auVar212);
      local_3980 = local_5bc0._0_8_;
      uStack_3978 = local_5bc0._8_8_;
      uStack_3970 = uStack_5bb0;
      uStack_3968 = uStack_5ba8;
      uStack_3960 = uStack_5ba0;
      uStack_3958 = uStack_5b98;
      uStack_3950 = uStack_5b90;
      uStack_3948 = uStack_5b88;
      local_39c0[0] = -0.00021219444;
      local_39c0[1] = -0.00021219444;
      afStack_39b8[0] = -0.00021219444;
      afStack_39b8[1] = -0.00021219444;
      afStack_39b0[0] = -0.00021219444;
      afStack_39b0[1] = -0.00021219444;
      afStack_39a8[0] = -0.00021219444;
      afStack_39a8[1] = -0.00021219444;
      afStack_39a0[0] = -0.00021219444;
      afStack_39a0[1] = -0.00021219444;
      afStack_3998[0] = -0.00021219444;
      afStack_3998[1] = -0.00021219444;
      afStack_3990[0] = -0.00021219444;
      afStack_3990[1] = -0.00021219444;
      afStack_3988[0] = -0.00021219444;
      afStack_3988[1] = -0.00021219444;
      local_5b40._0_8_ = auVar212._0_8_;
      local_3a00 = local_5b40._0_8_;
      local_5b40._8_8_ = auVar212._8_8_;
      uStack_39f8 = local_5b40._8_8_;
      local_5b40._16_8_ = auVar212._16_8_;
      uStack_39f0 = local_5b40._16_8_;
      local_5b40._24_8_ = auVar212._24_8_;
      uStack_39e8 = local_5b40._24_8_;
      local_5b40._32_8_ = auVar212._32_8_;
      uStack_39e0 = local_5b40._32_8_;
      local_5b40._40_8_ = auVar212._40_8_;
      uStack_39d8 = local_5b40._40_8_;
      local_5b40._48_8_ = auVar212._48_8_;
      uStack_39d0 = local_5b40._48_8_;
      local_5b40._56_8_ = auVar212._56_8_;
      uStack_39c8 = local_5b40._56_8_;
      auVar89._16_8_ = uStack_5bb0;
      auVar89._0_16_ = local_5bc0;
      auVar89._24_8_ = uStack_5ba8;
      auVar89._32_8_ = uStack_5ba0;
      auVar89._40_8_ = uStack_5b98;
      auVar89._48_8_ = uStack_5b90;
      auVar89._56_8_ = uStack_5b88;
      auVar88._8_4_ = -0.00021219444;
      auVar88._12_4_ = -0.00021219444;
      auVar88._0_4_ = -0.00021219444;
      auVar88._4_4_ = -0.00021219444;
      auVar88._16_4_ = -0.00021219444;
      auVar88._20_4_ = -0.00021219444;
      auVar88._24_4_ = -0.00021219444;
      auVar88._28_4_ = -0.00021219444;
      auVar88._32_4_ = -0.00021219444;
      auVar88._36_4_ = -0.00021219444;
      auVar88._40_4_ = -0.00021219444;
      auVar88._44_4_ = -0.00021219444;
      auVar88._48_4_ = -0.00021219444;
      auVar88._52_4_ = -0.00021219444;
      auVar88._56_4_ = -0.00021219444;
      auVar88._60_4_ = -0.00021219444;
      local_5b40 = vfnmadd213ps_avx512f(auVar88,auVar89,auVar212);
      local_5a80 = local_5b40._0_8_;
      uStack_5a78 = local_5b40._8_8_;
      uStack_5a70 = local_5b40._16_8_;
      uStack_5a68 = local_5b40._24_8_;
      uStack_5a60 = local_5b40._32_8_;
      uStack_5a58 = local_5b40._40_8_;
      uStack_5a50 = local_5b40._48_8_;
      uStack_5a48 = local_5b40._56_8_;
      local_5b80 = vmulps_avx512f(local_5b40,local_5b40);
      uStack_5cb8._0_4_ = 0.00019875691;
      uStack_5cb8._4_4_ = 0.00019875691;
      local_5cc0._0_4_ = 0.00019875691;
      local_5cc0._4_4_ = 0.00019875691;
      local_47c0[0] = 0.00019875691;
      local_47c0[1] = 0.00019875691;
      afStack_47b8[0] = 0.00019875691;
      afStack_47b8[1] = 0.00019875691;
      afStack_47b0[0] = 0.00019875691;
      afStack_47b0[1] = 0.00019875691;
      afStack_47a8[0] = 0.00019875691;
      afStack_47a8[1] = 0.00019875691;
      afStack_47a0[0] = 0.00019875691;
      afStack_47a0[1] = 0.00019875691;
      afStack_4798[0] = 0.00019875691;
      afStack_4798[1] = 0.00019875691;
      afStack_4790[0] = 0.00019875691;
      afStack_4790[1] = 0.00019875691;
      afStack_4788[0] = 0.00019875691;
      afStack_4788[1] = 0.00019875691;
      local_4800 = local_5b40._0_8_;
      uStack_47f8 = local_5b40._8_8_;
      uStack_47f0 = local_5b40._16_8_;
      uStack_47e8 = local_5b40._24_8_;
      uStack_47e0 = local_5b40._32_8_;
      uStack_47d8 = local_5b40._40_8_;
      uStack_47d0 = local_5b40._48_8_;
      uStack_47c8 = local_5b40._56_8_;
      local_4840[0] = 0.0013981999;
      local_4840[1] = 0.0013981999;
      afStack_4838[0] = 0.0013981999;
      afStack_4838[1] = 0.0013981999;
      afStack_4830[0] = 0.0013981999;
      afStack_4830[1] = 0.0013981999;
      afStack_4828[0] = 0.0013981999;
      afStack_4828[1] = 0.0013981999;
      afStack_4820[0] = 0.0013981999;
      afStack_4820[1] = 0.0013981999;
      afStack_4818[0] = 0.0013981999;
      afStack_4818[1] = 0.0013981999;
      afStack_4810[0] = 0.0013981999;
      afStack_4810[1] = 0.0013981999;
      afStack_4808[0] = 0.0013981999;
      afStack_4808[1] = 0.0013981999;
      auVar56._16_4_ = 0.00019875691;
      auVar56._20_4_ = 0.00019875691;
      auVar56._0_16_ = _local_5cc0;
      auVar56._24_4_ = 0.00019875691;
      auVar56._28_4_ = 0.00019875691;
      auVar56._32_4_ = 0.00019875691;
      auVar56._36_4_ = 0.00019875691;
      auVar56._40_4_ = 0.00019875691;
      auVar56._44_4_ = 0.00019875691;
      auVar56._48_4_ = 0.00019875691;
      auVar56._52_4_ = 0.00019875691;
      auVar56._56_4_ = 0.00019875691;
      auVar56._60_4_ = 0.00019875691;
      auVar55._8_4_ = 0.0013981999;
      auVar55._12_4_ = 0.0013981999;
      auVar55._0_4_ = 0.0013981999;
      auVar55._4_4_ = 0.0013981999;
      auVar55._16_4_ = 0.0013981999;
      auVar55._20_4_ = 0.0013981999;
      auVar55._24_4_ = 0.0013981999;
      auVar55._28_4_ = 0.0013981999;
      auVar55._32_4_ = 0.0013981999;
      auVar55._36_4_ = 0.0013981999;
      auVar55._40_4_ = 0.0013981999;
      auVar55._44_4_ = 0.0013981999;
      auVar55._48_4_ = 0.0013981999;
      auVar55._52_4_ = 0.0013981999;
      auVar55._56_4_ = 0.0013981999;
      auVar55._60_4_ = 0.0013981999;
      auVar212 = vfmadd213ps_avx512f(local_5b40,auVar56,auVar55);
      local_5cc0 = auVar212._0_8_;
      local_4880 = local_5cc0;
      uStack_5cb8 = auVar212._8_8_;
      uStack_4878 = uStack_5cb8;
      uStack_5cb0 = auVar212._16_8_;
      uStack_4870 = uStack_5cb0;
      uStack_5ca8 = auVar212._24_8_;
      uStack_4868 = uStack_5ca8;
      uStack_5ca0 = auVar212._32_8_;
      uStack_4860 = uStack_5ca0;
      uStack_5c98 = auVar212._40_8_;
      uStack_4858 = uStack_5c98;
      uStack_5c90 = auVar212._48_8_;
      uStack_4850 = uStack_5c90;
      uStack_5c88 = auVar212._56_8_;
      uStack_4848 = uStack_5c88;
      local_48c0 = local_5b40._0_8_;
      uStack_48b8 = local_5b40._8_8_;
      uStack_48b0 = local_5b40._16_8_;
      uStack_48a8 = local_5b40._24_8_;
      uStack_48a0 = local_5b40._32_8_;
      uStack_4898 = local_5b40._40_8_;
      uStack_4890 = local_5b40._48_8_;
      uStack_4888 = local_5b40._56_8_;
      local_4900[0] = 0.008333452;
      local_4900[1] = 0.008333452;
      afStack_48f8[0] = 0.008333452;
      afStack_48f8[1] = 0.008333452;
      afStack_48f0[0] = 0.008333452;
      afStack_48f0[1] = 0.008333452;
      afStack_48e8[0] = 0.008333452;
      afStack_48e8[1] = 0.008333452;
      afStack_48e0[0] = 0.008333452;
      afStack_48e0[1] = 0.008333452;
      afStack_48d8[0] = 0.008333452;
      afStack_48d8[1] = 0.008333452;
      afStack_48d0[0] = 0.008333452;
      afStack_48d0[1] = 0.008333452;
      afStack_48c8[0] = 0.008333452;
      afStack_48c8[1] = 0.008333452;
      auVar54._8_4_ = 0.008333452;
      auVar54._12_4_ = 0.008333452;
      auVar54._0_4_ = 0.008333452;
      auVar54._4_4_ = 0.008333452;
      auVar54._16_4_ = 0.008333452;
      auVar54._20_4_ = 0.008333452;
      auVar54._24_4_ = 0.008333452;
      auVar54._28_4_ = 0.008333452;
      auVar54._32_4_ = 0.008333452;
      auVar54._36_4_ = 0.008333452;
      auVar54._40_4_ = 0.008333452;
      auVar54._44_4_ = 0.008333452;
      auVar54._48_4_ = 0.008333452;
      auVar54._52_4_ = 0.008333452;
      auVar54._56_4_ = 0.008333452;
      auVar54._60_4_ = 0.008333452;
      auVar212 = vfmadd213ps_avx512f(local_5b40,auVar212,auVar54);
      local_5cc0 = auVar212._0_8_;
      local_4940 = local_5cc0;
      uStack_5cb8 = auVar212._8_8_;
      uStack_4938 = uStack_5cb8;
      uStack_5cb0 = auVar212._16_8_;
      uStack_4930 = uStack_5cb0;
      uStack_5ca8 = auVar212._24_8_;
      uStack_4928 = uStack_5ca8;
      uStack_5ca0 = auVar212._32_8_;
      uStack_4920 = uStack_5ca0;
      uStack_5c98 = auVar212._40_8_;
      uStack_4918 = uStack_5c98;
      uStack_5c90 = auVar212._48_8_;
      uStack_4910 = uStack_5c90;
      uStack_5c88 = auVar212._56_8_;
      uStack_4908 = uStack_5c88;
      local_4980 = local_5b40._0_8_;
      uStack_4978 = local_5b40._8_8_;
      uStack_4970 = local_5b40._16_8_;
      uStack_4968 = local_5b40._24_8_;
      uStack_4960 = local_5b40._32_8_;
      uStack_4958 = local_5b40._40_8_;
      uStack_4950 = local_5b40._48_8_;
      uStack_4948 = local_5b40._56_8_;
      local_49c0[0] = 0.041665796;
      local_49c0[1] = 0.041665796;
      afStack_49b8[0] = 0.041665796;
      afStack_49b8[1] = 0.041665796;
      afStack_49b0[0] = 0.041665796;
      afStack_49b0[1] = 0.041665796;
      afStack_49a8[0] = 0.041665796;
      afStack_49a8[1] = 0.041665796;
      afStack_49a0[0] = 0.041665796;
      afStack_49a0[1] = 0.041665796;
      afStack_4998[0] = 0.041665796;
      afStack_4998[1] = 0.041665796;
      afStack_4990[0] = 0.041665796;
      afStack_4990[1] = 0.041665796;
      afStack_4988[0] = 0.041665796;
      afStack_4988[1] = 0.041665796;
      auVar53._8_4_ = 0.041665796;
      auVar53._12_4_ = 0.041665796;
      auVar53._0_4_ = 0.041665796;
      auVar53._4_4_ = 0.041665796;
      auVar53._16_4_ = 0.041665796;
      auVar53._20_4_ = 0.041665796;
      auVar53._24_4_ = 0.041665796;
      auVar53._28_4_ = 0.041665796;
      auVar53._32_4_ = 0.041665796;
      auVar53._36_4_ = 0.041665796;
      auVar53._40_4_ = 0.041665796;
      auVar53._44_4_ = 0.041665796;
      auVar53._48_4_ = 0.041665796;
      auVar53._52_4_ = 0.041665796;
      auVar53._56_4_ = 0.041665796;
      auVar53._60_4_ = 0.041665796;
      auVar212 = vfmadd213ps_avx512f(local_5b40,auVar212,auVar53);
      local_5cc0 = auVar212._0_8_;
      local_4a00 = local_5cc0;
      uStack_5cb8 = auVar212._8_8_;
      uStack_49f8 = uStack_5cb8;
      uStack_5cb0 = auVar212._16_8_;
      uStack_49f0 = uStack_5cb0;
      uStack_5ca8 = auVar212._24_8_;
      uStack_49e8 = uStack_5ca8;
      uStack_5ca0 = auVar212._32_8_;
      uStack_49e0 = uStack_5ca0;
      uStack_5c98 = auVar212._40_8_;
      uStack_49d8 = uStack_5c98;
      uStack_5c90 = auVar212._48_8_;
      uStack_49d0 = uStack_5c90;
      uStack_5c88 = auVar212._56_8_;
      uStack_49c8 = uStack_5c88;
      local_4a40 = local_5b40._0_8_;
      uStack_4a38 = local_5b40._8_8_;
      uStack_4a30 = local_5b40._16_8_;
      uStack_4a28 = local_5b40._24_8_;
      uStack_4a20 = local_5b40._32_8_;
      uStack_4a18 = local_5b40._40_8_;
      uStack_4a10 = local_5b40._48_8_;
      uStack_4a08 = local_5b40._56_8_;
      local_4a80[0] = 0.16666666;
      local_4a80[1] = 0.16666666;
      afStack_4a78[0] = 0.16666666;
      afStack_4a78[1] = 0.16666666;
      afStack_4a70[0] = 0.16666666;
      afStack_4a70[1] = 0.16666666;
      afStack_4a68[0] = 0.16666666;
      afStack_4a68[1] = 0.16666666;
      afStack_4a60[0] = 0.16666666;
      afStack_4a60[1] = 0.16666666;
      afStack_4a58[0] = 0.16666666;
      afStack_4a58[1] = 0.16666666;
      afStack_4a50[0] = 0.16666666;
      afStack_4a50[1] = 0.16666666;
      afStack_4a48[0] = 0.16666666;
      afStack_4a48[1] = 0.16666666;
      auVar52._8_4_ = 0.16666666;
      auVar52._12_4_ = 0.16666666;
      auVar52._0_4_ = 0.16666666;
      auVar52._4_4_ = 0.16666666;
      auVar52._16_4_ = 0.16666666;
      auVar52._20_4_ = 0.16666666;
      auVar52._24_4_ = 0.16666666;
      auVar52._28_4_ = 0.16666666;
      auVar52._32_4_ = 0.16666666;
      auVar52._36_4_ = 0.16666666;
      auVar52._40_4_ = 0.16666666;
      auVar52._44_4_ = 0.16666666;
      auVar52._48_4_ = 0.16666666;
      auVar52._52_4_ = 0.16666666;
      auVar52._56_4_ = 0.16666666;
      auVar52._60_4_ = 0.16666666;
      auVar212 = vfmadd213ps_avx512f(local_5b40,auVar212,auVar52);
      local_5cc0 = auVar212._0_8_;
      local_4ac0 = local_5cc0;
      uStack_5cb8 = auVar212._8_8_;
      uStack_4ab8 = uStack_5cb8;
      uStack_5cb0 = auVar212._16_8_;
      uStack_4ab0 = uStack_5cb0;
      uStack_5ca8 = auVar212._24_8_;
      uStack_4aa8 = uStack_5ca8;
      uStack_5ca0 = auVar212._32_8_;
      uStack_4aa0 = uStack_5ca0;
      uStack_5c98 = auVar212._40_8_;
      uStack_4a98 = uStack_5c98;
      uStack_5c90 = auVar212._48_8_;
      uStack_4a90 = uStack_5c90;
      uStack_5c88 = auVar212._56_8_;
      uStack_4a88 = uStack_5c88;
      local_4b00 = local_5b40._0_8_;
      uStack_4af8 = local_5b40._8_8_;
      uStack_4af0 = local_5b40._16_8_;
      uStack_4ae8 = local_5b40._24_8_;
      uStack_4ae0 = local_5b40._32_8_;
      uStack_4ad8 = local_5b40._40_8_;
      uStack_4ad0 = local_5b40._48_8_;
      uStack_4ac8 = local_5b40._56_8_;
      local_4b40[0] = 0.5;
      local_4b40[1] = 0.5;
      afStack_4b38[0] = 0.5;
      afStack_4b38[1] = 0.5;
      afStack_4b30[0] = 0.5;
      afStack_4b30[1] = 0.5;
      afStack_4b28[0] = 0.5;
      afStack_4b28[1] = 0.5;
      afStack_4b20[0] = 0.5;
      afStack_4b20[1] = 0.5;
      afStack_4b18[0] = 0.5;
      afStack_4b18[1] = 0.5;
      afStack_4b10[0] = 0.5;
      afStack_4b10[1] = 0.5;
      afStack_4b08[0] = 0.5;
      afStack_4b08[1] = 0.5;
      auVar51._8_4_ = 0.5;
      auVar51._12_4_ = 0.5;
      auVar51._0_4_ = 0.5;
      auVar51._4_4_ = 0.5;
      auVar51._16_4_ = 0.5;
      auVar51._20_4_ = 0.5;
      auVar51._24_4_ = 0.5;
      auVar51._28_4_ = 0.5;
      auVar51._32_4_ = 0.5;
      auVar51._36_4_ = 0.5;
      auVar51._40_4_ = 0.5;
      auVar51._44_4_ = 0.5;
      auVar51._48_4_ = 0.5;
      auVar51._52_4_ = 0.5;
      auVar51._56_4_ = 0.5;
      auVar51._60_4_ = 0.5;
      auVar212 = vfmadd213ps_avx512f(local_5b40,auVar212,auVar51);
      local_5cc0 = auVar212._0_8_;
      local_4b80 = local_5cc0;
      uStack_5cb8 = auVar212._8_8_;
      uStack_4b78 = uStack_5cb8;
      uStack_5cb0 = auVar212._16_8_;
      uStack_4b70 = uStack_5cb0;
      uStack_5ca8 = auVar212._24_8_;
      uStack_4b68 = uStack_5ca8;
      uStack_5ca0 = auVar212._32_8_;
      uStack_4b60 = uStack_5ca0;
      uStack_5c98 = auVar212._40_8_;
      uStack_4b58 = uStack_5c98;
      uStack_5c90 = auVar212._48_8_;
      uStack_4b50 = uStack_5c90;
      uStack_5c88 = auVar212._56_8_;
      uStack_4b48 = uStack_5c88;
      local_4bc0 = local_5b80._0_8_;
      uStack_4bb8 = local_5b80._8_8_;
      uStack_4bb0 = local_5b80._16_8_;
      uStack_4ba8 = local_5b80._24_8_;
      uStack_4ba0 = local_5b80._32_8_;
      uStack_4b98 = local_5b80._40_8_;
      uStack_4b90 = local_5b80._48_8_;
      uStack_4b88 = local_5b80._56_8_;
      local_4c00 = local_5b40._0_8_;
      uStack_4bf8 = local_5b40._8_8_;
      uStack_4bf0 = local_5b40._16_8_;
      uStack_4be8 = local_5b40._24_8_;
      uStack_4be0 = local_5b40._32_8_;
      uStack_4bd8 = local_5b40._40_8_;
      uStack_4bd0 = local_5b40._48_8_;
      uStack_4bc8 = local_5b40._56_8_;
      auVar212 = vfmadd213ps_avx512f(local_5b80,auVar212,local_5b40);
      local_5cc0 = auVar212._0_8_;
      local_59c0 = local_5cc0;
      uStack_5cb8 = auVar212._8_8_;
      uStack_59b8 = uStack_5cb8;
      uStack_5cb0 = auVar212._16_8_;
      uStack_59b0 = uStack_5cb0;
      uStack_5ca8 = auVar212._24_8_;
      uStack_59a8 = uStack_5ca8;
      uStack_5ca0 = auVar212._32_8_;
      uStack_59a0 = uStack_5ca0;
      uStack_5c98 = auVar212._40_8_;
      uStack_5998 = uStack_5c98;
      uStack_5c90 = auVar212._48_8_;
      uStack_5990 = uStack_5c90;
      uStack_5c88 = auVar212._56_8_;
      uStack_5988 = uStack_5c88;
      local_5a00[0] = 1.0;
      local_5a00[1] = 1.0;
      afStack_59f8[0] = 1.0;
      afStack_59f8[1] = 1.0;
      afStack_59f0[0] = 1.0;
      afStack_59f0[1] = 1.0;
      afStack_59e8[0] = 1.0;
      afStack_59e8[1] = 1.0;
      afStack_59e0[0] = 1.0;
      afStack_59e0[1] = 1.0;
      afStack_59d8[0] = 1.0;
      afStack_59d8[1] = 1.0;
      afStack_59d0[0] = 1.0;
      afStack_59d0[1] = 1.0;
      afStack_59c8[0] = 1.0;
      afStack_59c8[1] = 1.0;
      auVar41._8_4_ = 1.0;
      auVar41._12_4_ = 1.0;
      auVar41._0_4_ = 1.0;
      auVar41._4_4_ = 1.0;
      auVar41._16_4_ = 1.0;
      auVar41._20_4_ = 1.0;
      auVar41._24_4_ = 1.0;
      auVar41._28_4_ = 1.0;
      auVar41._32_4_ = 1.0;
      auVar41._36_4_ = 1.0;
      auVar41._40_4_ = 1.0;
      auVar41._44_4_ = 1.0;
      auVar41._48_4_ = 1.0;
      auVar41._52_4_ = 1.0;
      auVar41._56_4_ = 1.0;
      auVar41._60_4_ = 1.0;
      auVar214 = vaddps_avx512f(auVar212,auVar41);
      local_3440 = local_5bc0._0_8_;
      uStack_3438 = local_5bc0._8_8_;
      uStack_3430 = uStack_5bb0;
      uStack_3428 = uStack_5ba8;
      uStack_3420 = uStack_5ba0;
      uStack_3418 = uStack_5b98;
      uStack_3410 = uStack_5b90;
      uStack_3408 = uStack_5b88;
      auVar99._16_8_ = uStack_5bb0;
      auVar99._0_16_ = local_5bc0;
      auVar99._24_8_ = uStack_5ba8;
      auVar99._32_8_ = uStack_5ba0;
      auVar99._40_8_ = uStack_5b98;
      auVar99._48_8_ = uStack_5b90;
      auVar99._56_8_ = uStack_5b88;
      auVar212 = vcvttps2dq_avx512f(auVar99);
      local_3180 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
      auVar212 = vmovdqa64_avx512f(auVar212);
      auVar212 = vmovdqa64_avx512f(auVar212);
      auVar215 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      local_3380 = vmovdqa64_avx512f(auVar212);
      local_33c0 = vmovdqa64_avx512f(auVar215);
      auVar212 = vmovdqa64_avx512f(local_3380);
      auVar215 = vmovdqa64_avx512f(local_33c0);
      auVar212 = vpaddd_avx512f(auVar212,auVar215);
      auVar212 = vmovdqa64_avx512f(auVar212);
      auVar212 = vmovdqa64_avx512f(auVar212);
      local_3280 = vmovdqa64_avx512f(auVar212);
      local_3284 = 0x17;
      auVar212 = vmovdqa64_avx512f(local_3280);
      auVar212 = vpslld_avx512f(auVar212,ZEXT416(0x17));
      local_5c00 = vmovdqa64_avx512f(auVar212);
      auVar212 = vmovdqa64_avx512f(local_5c00);
      local_3640 = vmovdqa64_avx512f(auVar212);
      auVar212 = vmovdqa64_avx512f(local_3640);
      local_5d00 = vmovdqa64_avx512f(auVar212);
      local_5cc0 = auVar214._0_8_;
      local_5ac0 = local_5cc0;
      uStack_5cb8 = auVar214._8_8_;
      uStack_5ab8 = uStack_5cb8;
      uStack_5cb0 = auVar214._16_8_;
      uStack_5ab0 = uStack_5cb0;
      uStack_5ca8 = auVar214._24_8_;
      uStack_5aa8 = uStack_5ca8;
      uStack_5ca0 = auVar214._32_8_;
      uStack_5aa0 = uStack_5ca0;
      uStack_5c98 = auVar214._40_8_;
      uStack_5a98 = uStack_5c98;
      uStack_5c90 = auVar214._48_8_;
      uStack_5a90 = uStack_5c90;
      uStack_5c88 = auVar214._56_8_;
      uStack_5a88 = uStack_5c88;
      local_5b00 = local_5d00._0_8_;
      uStack_5af8 = local_5d00._8_8_;
      uStack_5af0 = local_5d00._16_8_;
      uStack_5ae8 = local_5d00._24_8_;
      uStack_5ae0 = local_5d00._32_8_;
      uStack_5ad8 = local_5d00._40_8_;
      uStack_5ad0 = local_5d00._48_8_;
      uStack_5ac8 = local_5d00._56_8_;
      _local_5cc0 = vmulps_avx512f(auVar214,local_5d00);
      local_5d80 = local_5cc0;
      uStack_5d78 = uStack_5cb8;
      uStack_5d70 = uStack_5cb0;
      uStack_5d68 = uStack_5ca8;
      uStack_5d60 = uStack_5ca0;
      uStack_5d58 = uStack_5c98;
      uStack_5d50 = uStack_5c90;
      uStack_5d48 = uStack_5c88;
      local_5900 = vaddps_avx512f(local_5980,_local_5cc0);
      local_5e40 = vdivps_avx512f(local_5980,local_5900);
      local_5e80 = local_6040._0_8_;
      uStack_5e78 = local_6040._8_8_;
      uStack_5e70 = local_6040._16_8_;
      uStack_5e68 = local_6040._24_8_;
      uStack_5e60 = local_6040._32_8_;
      uStack_5e58 = local_6040._40_8_;
      uStack_5e50 = local_6040._48_8_;
      uStack_5e48 = local_6040._56_8_;
      local_5ec0 = local_5fc0._0_8_;
      uStack_5eb8 = local_5fc0._8_8_;
      uStack_5eb0 = local_5fc0._16_8_;
      uStack_5ea8 = local_5fc0._24_8_;
      uStack_5ea0 = local_5fc0._32_8_;
      uStack_5e98 = local_5fc0._40_8_;
      uStack_5e90 = local_5fc0._48_8_;
      uStack_5e88 = local_5fc0._56_8_;
      auVar212 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar212 = vpxord_avx512f(local_5fc0,auVar212);
      local_6ac0 = vfmadd213ps_avx512f(local_6040,local_5e40,auVar212);
      auVar212 = vmulps_avx512f(local_6a80,local_6ac0);
      local_6bf0 = local_6d00;
      local_6dc0 = auVar212._0_8_;
      local_6c40 = local_6dc0;
      uStack_6db8 = auVar212._8_8_;
      uStack_6c38 = uStack_6db8;
      uStack_6db0 = auVar212._16_8_;
      uStack_6c30 = uStack_6db0;
      uStack_6da8 = auVar212._24_8_;
      uStack_6c28 = uStack_6da8;
      uStack_6da0 = auVar212._32_8_;
      uStack_6c20 = uStack_6da0;
      uStack_6d98 = auVar212._40_8_;
      uStack_6c18 = uStack_6d98;
      uStack_6d90 = auVar212._48_8_;
      uStack_6c10 = uStack_6d90;
      uStack_6d88 = auVar212._56_8_;
      uStack_6c08 = uStack_6d88;
      *local_6d00 = auVar212;
      local_6d00 = local_6d00 + 1;
      _local_6800 = auVar39;
      local_6580 = local_65c0;
      uStack_6578 = uStack_65b8;
      uStack_6570 = uStack_65b0;
      uStack_6568 = uStack_65a8;
      uStack_6560 = uStack_65a0;
      uStack_6558 = uStack_6598;
      uStack_6550 = uStack_6590;
      uStack_6548 = uStack_6588;
      _local_6280 = auVar44;
      local_6100 = local_6140;
      uStack_60f8 = uStack_6138;
      uStack_60f0 = uStack_6130;
      uStack_60e8 = uStack_6128;
      uStack_60e0 = uStack_6120;
      uStack_60d8 = uStack_6118;
      uStack_60d0 = uStack_6110;
      uStack_60c8 = uStack_6108;
      _local_5bc0 = auVar213;
      local_5a40 = local_5a80;
      uStack_5a38 = uStack_5a78;
      uStack_5a30 = uStack_5a70;
      uStack_5a28 = uStack_5a68;
      uStack_5a20 = uStack_5a60;
      uStack_5a18 = uStack_5a58;
      uStack_5a10 = uStack_5a50;
      uStack_5a08 = uStack_5a48;
      local_58c0 = local_5d40;
      uStack_58b8 = uStack_5d38;
      uStack_58b0 = uStack_5d30;
      uStack_58a8 = uStack_5d28;
      uStack_58a0 = uStack_5d20;
      uStack_5898 = uStack_5d18;
      uStack_5890 = uStack_5d10;
      uStack_5888 = uStack_5d08;
      local_5142 = local_5c42;
      local_5140 = local_51c0;
      uStack_5138 = uStack_51b8;
      uStack_5130 = uStack_51b0;
      uStack_5128 = uStack_51a8;
      uStack_5120 = uStack_51a0;
      uStack_5118 = uStack_5198;
      uStack_5110 = uStack_5190;
      uStack_5108 = uStack_5188;
      local_4fc2 = local_6302;
      local_4fc0 = local_5040;
      uStack_4fb8 = uStack_5038;
      uStack_4fb0 = uStack_5030;
      uStack_4fa8 = uStack_5028;
      uStack_4fa0 = uStack_5020;
      uStack_4f98 = uStack_5018;
      uStack_4f90 = uStack_5010;
      uStack_4f88 = uStack_5008;
      local_4e42 = local_6802;
      local_4e40 = local_4ec0;
      uStack_4e38 = uStack_4eb8;
      uStack_4e30 = uStack_4eb0;
      uStack_4e28 = uStack_4ea8;
      uStack_4e20 = uStack_4ea0;
      uStack_4e18 = uStack_4e98;
      uStack_4e10 = uStack_4e90;
      uStack_4e08 = uStack_4e88;
      local_4cc2 = local_6802;
      local_4cc0 = local_4d40;
      uStack_4cb8 = uStack_4d38;
      uStack_4cb0 = uStack_4d30;
      uStack_4ca8 = uStack_4d28;
      uStack_4ca0 = uStack_4d20;
      uStack_4c98 = uStack_4d18;
      uStack_4c90 = uStack_4d10;
      uStack_4c88 = uStack_4d08;
      local_3542 = local_6782;
      uStack_3448 = uStack_6c48;
    }
    for (; local_6d58 + 7 < local_6cf0; local_6d58 = local_6d58 + 8) {
      local_6be8 = local_6d00;
      local_6be0 = *(undefined8 *)*local_6d00;
      uStack_6bd8 = *(undefined8 *)(*local_6d00 + 8);
      uStack_6bd0 = *(undefined8 *)(*local_6d00 + 0x10);
      auVar200 = *(undefined1 (*) [24])*local_6d00;
      uStack_6bc8 = *(undefined8 *)(*local_6d00 + 0x18);
      auVar201 = *(undefined1 (*) [32])*local_6d00;
      local_2720 = 0;
      uStack_2718 = 0;
      uStack_2710 = 0;
      uStack_2708 = 0;
      local_2d20 = 0x3f800000;
      uStack_2d1c = 0x3f800000;
      uStack_2d18 = 0x3f800000;
      uStack_2d14 = 0x3f800000;
      uStack_2d10 = 0x3f800000;
      uStack_2d0c = 0x3f800000;
      uStack_2d08 = 0x3f800000;
      uStack_2d04 = 0x3f800000;
      local_2ca0._0_8_ = auVar200._0_8_;
      local_1540 = local_2ca0._0_8_;
      local_2ca0._8_8_ = auVar200._8_8_;
      uStack_1538 = local_2ca0._8_8_;
      local_2ca0._16_8_ = auVar200._16_8_;
      uStack_1530 = local_2ca0._16_8_;
      local_1560 = 0x42b0c0a5;
      uStack_155c = 0x42b0c0a5;
      uStack_1558 = 0x42b0c0a5;
      uStack_1554 = 0x42b0c0a5;
      uStack_1550 = 0x42b0c0a5;
      uStack_154c = 0x42b0c0a5;
      uStack_1548 = 0x42b0c0a5;
      uStack_1544 = 0x42b0c0a5;
      auVar144._8_4_ = 0x42b0c0a5;
      auVar144._0_8_ = 0x42b0c0a542b0c0a5;
      auVar144._12_4_ = 0x42b0c0a5;
      auVar144._16_4_ = 0x42b0c0a5;
      auVar144._20_4_ = 0x42b0c0a5;
      auVar144._24_4_ = 0x42b0c0a5;
      auVar144._28_4_ = 0x42b0c0a5;
      auVar18 = vminps_avx(*(undefined1 (*) [32])*local_6d00,auVar144);
      local_2ca0._0_8_ = auVar18._0_8_;
      local_2680 = local_2ca0._0_8_;
      local_2ca0._8_8_ = auVar18._8_8_;
      uStack_2678 = local_2ca0._8_8_;
      local_2ca0._16_8_ = auVar18._16_8_;
      uStack_2670 = local_2ca0._16_8_;
      local_2ca0._24_8_ = auVar18._24_8_;
      uStack_2668 = local_2ca0._24_8_;
      local_26a0 = 0xc2b0c0a5;
      uStack_269c = 0xc2b0c0a5;
      uStack_2698 = 0xc2b0c0a5;
      uStack_2694 = 0xc2b0c0a5;
      uStack_2690 = 0xc2b0c0a5;
      uStack_268c = 0xc2b0c0a5;
      uStack_2688 = 0xc2b0c0a5;
      uStack_2684 = 0xc2b0c0a5;
      auVar106._8_4_ = 0xc2b0c0a5;
      auVar106._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar106._12_4_ = 0xc2b0c0a5;
      auVar106._16_4_ = 0xc2b0c0a5;
      auVar106._20_4_ = 0xc2b0c0a5;
      auVar106._24_4_ = 0xc2b0c0a5;
      auVar106._28_4_ = 0xc2b0c0a5;
      auVar17 = vmaxps_avx(auVar18,auVar106);
      local_22f8 = local_2ca0;
      local_2260 = ::_ps256_cephes_LOG2EF;
      local_2268 = ::_ps256_0p5;
      local_2ca0._0_8_ = auVar17._0_8_;
      local_1c80 = local_2ca0._0_8_;
      local_2ca0._8_8_ = auVar17._8_8_;
      uStack_1c78 = local_2ca0._8_8_;
      local_2ca0._16_8_ = auVar17._16_8_;
      uStack_1c70 = local_2ca0._16_8_;
      local_2ca0._24_8_ = auVar17._24_8_;
      uStack_1c68 = local_2ca0._24_8_;
      local_1ca0[0] = 1.442695;
      local_1ca0[1] = 1.442695;
      afStack_1c98[0] = 1.442695;
      afStack_1c98[1] = 1.442695;
      afStack_1c90[0] = 1.442695;
      afStack_1c90[1] = 1.442695;
      afStack_1c88[0] = 1.442695;
      afStack_1c88[1] = 1.442695;
      local_1cc0[0] = 0.5;
      local_1cc0[1] = 0.5;
      afStack_1cb8[0] = 0.5;
      afStack_1cb8[1] = 0.5;
      afStack_1cb0[0] = 0.5;
      afStack_1cb0[1] = 0.5;
      afStack_1ca8[0] = 0.5;
      afStack_1ca8[1] = 0.5;
      auVar125._8_4_ = 1.442695;
      auVar125._12_4_ = 1.442695;
      auVar125._0_4_ = 1.442695;
      auVar125._4_4_ = 1.442695;
      auVar125._16_4_ = 1.442695;
      auVar125._20_4_ = 1.442695;
      auVar125._24_4_ = 1.442695;
      auVar125._28_4_ = 1.442695;
      auVar216._8_4_ = 0.5;
      auVar216._12_4_ = 0.5;
      auVar216._0_4_ = 0.5;
      auVar216._4_4_ = 0.5;
      auVar216._16_4_ = 0.5;
      auVar216._20_4_ = 0.5;
      auVar216._24_4_ = 0.5;
      auVar216._28_4_ = 0.5;
      auVar22 = vfmadd213ps_fma(auVar125,auVar17,auVar216);
      auVar19 = vroundps_avx(ZEXT1632(auVar22),1);
      auVar18 = vcmpps_avx(ZEXT1632(auVar22),auVar19,1);
      local_2d40._0_8_ = auVar18._0_8_;
      local_2560 = local_2d40._0_8_;
      local_2d40._8_8_ = auVar18._8_8_;
      uStack_2558 = local_2d40._8_8_;
      local_2d40._16_8_ = auVar18._16_8_;
      uStack_2550 = local_2d40._16_8_;
      local_2d40._24_8_ = auVar18._24_8_;
      uStack_2548 = local_2d40._24_8_;
      local_2580 = 0x3f8000003f800000;
      uStack_2578 = 0x3f8000003f800000;
      uStack_2570 = 0x3f8000003f800000;
      uStack_2568 = 0x3f8000003f800000;
      auVar110._8_8_ = 0x3f8000003f800000;
      auVar110._0_8_ = 0x3f8000003f800000;
      auVar110._16_8_ = 0x3f8000003f800000;
      auVar110._24_8_ = 0x3f8000003f800000;
      local_2d40 = vpand_avx2(auVar18,auVar110);
      local_2cc0 = auVar19._0_8_;
      local_2800 = local_2cc0;
      uStack_2cb8 = auVar19._8_8_;
      uStack_27f8 = uStack_2cb8;
      uStack_2cb0 = auVar19._16_8_;
      uStack_27f0 = uStack_2cb0;
      uStack_2ca8 = auVar19._24_8_;
      uStack_27e8 = uStack_2ca8;
      local_2820 = local_2d40._0_8_;
      uStack_2818 = local_2d40._8_8_;
      uStack_2810 = local_2d40._16_8_;
      uStack_2808 = local_2d40._24_8_;
      local_2ce0 = vsubps_avx(auVar19,local_2d40);
      local_2120 = local_2ce0;
      local_2110 = ::_ps256_cephes_exp_C1;
      local_16e0 = local_2ce0._0_8_;
      uStack_16d8 = local_2ce0._8_8_;
      uStack_16d0 = local_2ce0._16_8_;
      uStack_16c8 = local_2ce0._24_8_;
      local_1700[0] = 0.6933594;
      local_1700[1] = 0.6933594;
      afStack_16f8[0] = 0.6933594;
      afStack_16f8[1] = 0.6933594;
      afStack_16f0[0] = 0.6933594;
      afStack_16f0[1] = 0.6933594;
      afStack_16e8[0] = 0.6933594;
      afStack_16e8[1] = 0.6933594;
      local_1720 = local_2ca0._0_8_;
      uStack_1718 = local_2ca0._8_8_;
      uStack_1710 = local_2ca0._16_8_;
      uStack_1708 = local_2ca0._24_8_;
      auVar139._8_4_ = 0.6933594;
      auVar139._12_4_ = 0.6933594;
      auVar139._0_4_ = 0.6933594;
      auVar139._4_4_ = 0.6933594;
      auVar139._16_4_ = 0.6933594;
      auVar139._20_4_ = 0.6933594;
      auVar139._24_4_ = 0.6933594;
      auVar139._28_4_ = 0.6933594;
      auVar22 = vfnmadd213ps_fma(auVar139,local_2ce0,auVar17);
      local_2128 = ::_ps256_cephes_exp_C2;
      local_1680 = local_2ce0._0_8_;
      uStack_1678 = local_2ce0._8_8_;
      uStack_1670 = local_2ce0._16_8_;
      uStack_1668 = local_2ce0._24_8_;
      local_16a0[0] = -0.00021219444;
      local_16a0[1] = -0.00021219444;
      afStack_1698[0] = -0.00021219444;
      afStack_1698[1] = -0.00021219444;
      afStack_1690[0] = -0.00021219444;
      afStack_1690[1] = -0.00021219444;
      afStack_1688[0] = -0.00021219444;
      afStack_1688[1] = -0.00021219444;
      local_2ca0._0_8_ = auVar22._0_8_;
      local_16c0 = local_2ca0._0_8_;
      local_2ca0._8_8_ = auVar22._8_8_;
      uStack_16b8 = local_2ca0._8_8_;
      uStack_16b0 = 0;
      uStack_16a8 = 0;
      auVar140._8_4_ = -0.00021219444;
      auVar140._12_4_ = -0.00021219444;
      auVar140._0_4_ = -0.00021219444;
      auVar140._4_4_ = -0.00021219444;
      auVar140._16_4_ = -0.00021219444;
      auVar140._20_4_ = -0.00021219444;
      auVar140._24_4_ = -0.00021219444;
      auVar140._28_4_ = -0.00021219444;
      auVar22 = vfnmadd213ps_fma(auVar140,local_2ce0,ZEXT1632(auVar22));
      auVar216 = ZEXT1632(auVar22);
      local_2ca0._0_8_ = auVar22._0_8_;
      local_2c40 = local_2ca0._0_8_;
      local_2ca0._8_8_ = auVar22._8_8_;
      uStack_2c38 = local_2ca0._8_8_;
      uStack_2c30 = 0;
      uStack_2c28 = 0;
      local_2c20._0_4_ = auVar22._0_4_;
      local_2c20._4_4_ = auVar22._4_4_;
      uStack_2c18._0_4_ = auVar22._8_4_;
      uStack_2c18._4_4_ = auVar22._12_4_;
      local_2cc0._4_4_ = local_2c20._4_4_ * local_2c20._4_4_;
      local_2cc0._0_4_ = (float)local_2c20 * (float)local_2c20;
      local_1a60 = local_2cc0;
      uStack_2cb8._0_4_ = (float)uStack_2c18 * (float)uStack_2c18;
      uStack_2cb8._4_4_ = uStack_2c18._4_4_ * uStack_2c18._4_4_;
      auVar23 = _local_2cc0;
      _local_2cc0 = ZEXT1632(_local_2cc0);
      auVar110 = _local_2cc0;
      uStack_2d58._0_4_ = 0x39506967;
      local_2d60 = (undefined1  [8])0x3950696739506967;
      uStack_2d58._4_4_ = 0x39506967;
      uStack_2d50._0_4_ = 0x39506967;
      uStack_2d50._4_4_ = 0x39506967;
      auVar207 = _local_2d60;
      uStack_2d48._0_4_ = 0x39506967;
      uStack_2d48._4_4_ = 0x39506967;
      auVar18 = _local_2d60;
      local_22e8 = local_2d60;
      local_2280 = ::_ps256_cephes_exp_p1;
      local_1c20 = 0x3950696739506967;
      uStack_1c18 = uStack_2d58;
      uStack_2d50 = auVar207._16_8_;
      uStack_1c10 = uStack_2d50;
      uStack_2d48 = auVar18._24_8_;
      uStack_1c08 = uStack_2d48;
      local_1c40 = local_2ca0._0_8_;
      uStack_1c38 = local_2ca0._8_8_;
      uStack_1c30 = 0;
      uStack_1c28 = 0;
      local_1c60[0] = 0.0013981999;
      local_1c60[1] = 0.0013981999;
      afStack_1c58[0] = 0.0013981999;
      afStack_1c58[1] = 0.0013981999;
      afStack_1c50[0] = 0.0013981999;
      afStack_1c50[1] = 0.0013981999;
      afStack_1c48[0] = 0.0013981999;
      afStack_1c48[1] = 0.0013981999;
      auVar126._8_4_ = 0.0013981999;
      auVar126._12_4_ = 0.0013981999;
      auVar126._0_4_ = 0.0013981999;
      auVar126._4_4_ = 0.0013981999;
      auVar126._16_4_ = 0.0013981999;
      auVar126._20_4_ = 0.0013981999;
      auVar126._24_4_ = 0.0013981999;
      auVar126._28_4_ = 0.0013981999;
      auVar22 = vfmadd213ps_fma(auVar216,auVar18,auVar126);
      local_2298 = ::_ps256_cephes_exp_p2;
      local_2d60 = auVar22._0_8_;
      local_1bc0 = local_2d60;
      uStack_2d58 = auVar22._8_8_;
      uStack_1bb8 = uStack_2d58;
      uStack_1bb0 = 0;
      uStack_1ba8 = 0;
      local_1be0 = local_2ca0._0_8_;
      uStack_1bd8 = local_2ca0._8_8_;
      uStack_1bd0 = 0;
      uStack_1bc8 = 0;
      local_1c00[0] = 0.008333452;
      local_1c00[1] = 0.008333452;
      afStack_1bf8[0] = 0.008333452;
      afStack_1bf8[1] = 0.008333452;
      afStack_1bf0[0] = 0.008333452;
      afStack_1bf0[1] = 0.008333452;
      afStack_1be8[0] = 0.008333452;
      afStack_1be8[1] = 0.008333452;
      auVar127._8_4_ = 0.008333452;
      auVar127._12_4_ = 0.008333452;
      auVar127._0_4_ = 0.008333452;
      auVar127._4_4_ = 0.008333452;
      auVar127._16_4_ = 0.008333452;
      auVar127._20_4_ = 0.008333452;
      auVar127._24_4_ = 0.008333452;
      auVar127._28_4_ = 0.008333452;
      auVar22 = vfmadd213ps_fma(auVar216,ZEXT1632(auVar22),auVar127);
      local_22b0 = ::_ps256_cephes_exp_p3;
      local_2d60 = auVar22._0_8_;
      local_1b60 = local_2d60;
      uStack_2d58 = auVar22._8_8_;
      uStack_1b58 = uStack_2d58;
      uStack_1b50 = 0;
      uStack_1b48 = 0;
      local_1b80 = local_2ca0._0_8_;
      uStack_1b78 = local_2ca0._8_8_;
      uStack_1b70 = 0;
      uStack_1b68 = 0;
      local_1ba0[0] = 0.041665796;
      local_1ba0[1] = 0.041665796;
      afStack_1b98[0] = 0.041665796;
      afStack_1b98[1] = 0.041665796;
      afStack_1b90[0] = 0.041665796;
      afStack_1b90[1] = 0.041665796;
      afStack_1b88[0] = 0.041665796;
      afStack_1b88[1] = 0.041665796;
      auVar128._8_4_ = 0.041665796;
      auVar128._12_4_ = 0.041665796;
      auVar128._0_4_ = 0.041665796;
      auVar128._4_4_ = 0.041665796;
      auVar128._16_4_ = 0.041665796;
      auVar128._20_4_ = 0.041665796;
      auVar128._24_4_ = 0.041665796;
      auVar128._28_4_ = 0.041665796;
      auVar22 = vfmadd213ps_fma(auVar216,ZEXT1632(auVar22),auVar128);
      local_22c8 = ::_ps256_cephes_exp_p4;
      local_2d60 = auVar22._0_8_;
      local_1b00 = local_2d60;
      uStack_2d58 = auVar22._8_8_;
      uStack_1af8 = uStack_2d58;
      uStack_1af0 = 0;
      uStack_1ae8 = 0;
      local_1b20 = local_2ca0._0_8_;
      uStack_1b18 = local_2ca0._8_8_;
      uStack_1b10 = 0;
      uStack_1b08 = 0;
      local_1b40[0] = 0.16666666;
      local_1b40[1] = 0.16666666;
      afStack_1b38[0] = 0.16666666;
      afStack_1b38[1] = 0.16666666;
      afStack_1b30[0] = 0.16666666;
      afStack_1b30[1] = 0.16666666;
      afStack_1b28[0] = 0.16666666;
      afStack_1b28[1] = 0.16666666;
      auVar129._8_4_ = 0.16666666;
      auVar129._12_4_ = 0.16666666;
      auVar129._0_4_ = 0.16666666;
      auVar129._4_4_ = 0.16666666;
      auVar129._16_4_ = 0.16666666;
      auVar129._20_4_ = 0.16666666;
      auVar129._24_4_ = 0.16666666;
      auVar129._28_4_ = 0.16666666;
      auVar22 = vfmadd213ps_fma(auVar216,ZEXT1632(auVar22),auVar129);
      local_22e0 = ::_ps256_cephes_exp_p5;
      local_2d60 = auVar22._0_8_;
      local_1aa0 = local_2d60;
      uStack_2d58 = auVar22._8_8_;
      uStack_1a98 = uStack_2d58;
      uStack_1a90 = 0;
      uStack_1a88 = 0;
      local_1ac0 = local_2ca0._0_8_;
      uStack_1ab8 = local_2ca0._8_8_;
      uStack_1ab0 = 0;
      uStack_1aa8 = 0;
      local_1ae0[0] = 0.5;
      local_1ae0[1] = 0.5;
      afStack_1ad8[0] = 0.5;
      afStack_1ad8[1] = 0.5;
      afStack_1ad0[0] = 0.5;
      afStack_1ad0[1] = 0.5;
      afStack_1ac8[0] = 0.5;
      afStack_1ac8[1] = 0.5;
      auVar130._8_4_ = 0.5;
      auVar130._12_4_ = 0.5;
      auVar130._0_4_ = 0.5;
      auVar130._4_4_ = 0.5;
      auVar130._16_4_ = 0.5;
      auVar130._20_4_ = 0.5;
      auVar130._24_4_ = 0.5;
      auVar130._28_4_ = 0.5;
      auVar22 = vfmadd213ps_fma(auVar216,ZEXT1632(auVar22),auVar130);
      local_22f0 = local_2cc0;
      local_2d60 = auVar22._0_8_;
      local_1a40 = local_2d60;
      uStack_2d58 = auVar22._8_8_;
      uStack_1a38 = uStack_2d58;
      uStack_1a30 = 0;
      uStack_1a28 = 0;
      uStack_2cb8 = auVar23._8_8_;
      uStack_1a58 = uStack_2cb8;
      uStack_1a50 = 0;
      uStack_1a48 = 0;
      local_1a80 = local_2ca0._0_8_;
      uStack_1a78 = local_2ca0._8_8_;
      uStack_1a70 = 0;
      uStack_1a68 = 0;
      auVar22 = vfmadd213ps_fma(auVar110,ZEXT1632(auVar22),auVar216);
      local_2d60 = auVar22._0_8_;
      uVar20 = local_2d60;
      uStack_2d58 = auVar22._8_8_;
      uVar24 = uStack_2d58;
      uStack_2bd0 = 0;
      uStack_2bc8 = 0;
      local_2c00 = 0x3f8000003f800000;
      uStack_2bf8 = 0x3f8000003f800000;
      uStack_2bf0 = 0x3f8000003f800000;
      uStack_2be8 = 0x3f8000003f800000;
      local_2be0._0_4_ = auVar22._0_4_;
      local_2be0._4_4_ = auVar22._4_4_;
      uStack_2bd8._0_4_ = auVar22._8_4_;
      uStack_2bd8._4_4_ = auVar22._12_4_;
      local_2d60._4_4_ = local_2be0._4_4_ + 1.0;
      local_2d60._0_4_ = (float)local_2be0 + 1.0;
      uStack_2d58._0_4_ = (float)uStack_2bd8 + 1.0;
      uStack_2d58._4_4_ = uStack_2bd8._4_4_ + 1.0;
      uStack_2d50._0_4_ = 0x3f800000;
      uStack_2d50._4_4_ = 0x3f800000;
      auVar207 = _local_2d60;
      uStack_2d48._0_4_ = 0x3f800000;
      uStack_2d48._4_4_ = 0x3f800000;
      auVar17 = _local_2d60;
      local_1500._0_4_ = local_2ce0._0_4_;
      local_1500._4_4_ = local_2ce0._4_4_;
      uStack_14f8._0_4_ = local_2ce0._8_4_;
      uStack_14f8._4_4_ = local_2ce0._12_4_;
      uStack_14f0._0_4_ = local_2ce0._16_4_;
      uStack_14f0._4_4_ = local_2ce0._20_4_;
      uStack_14e8._0_4_ = local_2ce0._24_4_;
      uStack_14e8._4_4_ = local_2ce0._28_4_;
      local_2d00._4_4_ = (int)local_1500._4_4_;
      local_2d00._0_4_ = (int)(float)local_1500;
      local_2d00._8_4_ = (int)(float)uStack_14f8;
      local_2d00._12_4_ = (int)uStack_14f8._4_4_;
      local_2d00._16_4_ = (int)(float)uStack_14f0;
      local_2d00._20_4_ = (int)uStack_14f0._4_4_;
      auVar211 = local_2d00._0_24_;
      local_2d00._24_4_ = (int)(float)uStack_14e8;
      local_2d00._28_4_ = (int)uStack_14e8._4_4_;
      auVar18 = local_2d00;
      local_1480 = local_2d00._0_8_;
      uStack_1478 = local_2d00._8_8_;
      local_2d00._16_8_ = auVar211._16_8_;
      uStack_1470 = local_2d00._16_8_;
      local_2d00._24_8_ = auVar18._24_8_;
      uStack_1468 = local_2d00._24_8_;
      local_14a0 = 0x7f0000007f;
      uStack_1498 = 0x7f0000007f;
      uStack_1490 = 0x7f0000007f;
      uStack_1488 = 0x7f0000007f;
      local_1380 = local_2d00._0_8_;
      uStack_1378 = local_2d00._8_8_;
      uStack_1370 = local_2d00._16_8_;
      uStack_1368 = local_2d00._24_8_;
      local_13a0 = 0x7f0000007f;
      uStack_1398 = 0x7f0000007f;
      uStack_1390 = 0x7f0000007f;
      uStack_1388 = 0x7f0000007f;
      auVar146._16_8_ = local_2d00._16_8_;
      auVar146._0_16_ = local_2d00._0_16_;
      auVar146._24_8_ = local_2d00._24_8_;
      auVar145._8_8_ = 0x7f0000007f;
      auVar145._0_8_ = 0x7f0000007f;
      auVar145._16_8_ = 0x7f0000007f;
      auVar145._24_8_ = 0x7f0000007f;
      auVar18 = vpaddd_avx2(auVar145,auVar146);
      local_2d00._0_8_ = auVar18._0_8_;
      local_1400 = local_2d00._0_8_;
      local_2d00._8_8_ = auVar18._8_8_;
      uStack_13f8 = local_2d00._8_8_;
      local_2d00._16_8_ = auVar18._16_8_;
      uStack_13f0 = local_2d00._16_8_;
      local_2d00._24_8_ = auVar18._24_8_;
      uStack_13e8 = local_2d00._24_8_;
      local_1404 = 0x17;
      local_1300 = local_2d00._0_8_;
      uStack_12f8 = local_2d00._8_8_;
      uStack_12f0 = local_2d00._16_8_;
      uStack_12e8 = local_2d00._24_8_;
      local_1304 = 0x17;
      local_2d00 = vpslld_avx2(auVar18,ZEXT416(0x17));
      local_13c0 = local_2d00._0_8_;
      uStack_13b8 = local_2d00._8_8_;
      uStack_13b0 = local_2d00._16_8_;
      uStack_13a8 = local_2d00._24_8_;
      local_2d80 = local_2d00._0_8_;
      uStack_2d78 = local_2d00._8_8_;
      uStack_2d70 = local_2d00._16_8_;
      uStack_2d68 = local_2d00._24_8_;
      local_2c60 = local_2d60;
      uStack_2c58 = uStack_2d58;
      uStack_2d50 = auVar207._16_8_;
      uStack_2c50 = uStack_2d50;
      uStack_2d48 = auVar17._24_8_;
      uStack_2c48 = uStack_2d48;
      local_2c80._0_4_ = local_2d00._0_4_;
      local_2c80._4_4_ = local_2d00._4_4_;
      uStack_2c78._0_4_ = local_2d00._8_4_;
      uStack_2c78._4_4_ = local_2d00._12_4_;
      uStack_2c70._0_4_ = local_2d00._16_4_;
      uStack_2c70._4_4_ = local_2d00._20_4_;
      uStack_2c68._0_4_ = local_2d00._24_4_;
      local_2d60._0_4_ = (float)local_2c80 * ((float)local_2be0 + 1.0);
      local_2d60._4_4_ = local_2c80._4_4_ * (local_2be0._4_4_ + 1.0);
      uStack_2c78._0_4_ = (float)uStack_2c78 * ((float)uStack_2bd8 + 1.0);
      uStack_2c78._4_4_ = uStack_2c78._4_4_ * (uStack_2bd8._4_4_ + 1.0);
      uStack_2d58._0_4_ = (float)uStack_2c78;
      uStack_2d58._4_4_ = uStack_2c78._4_4_;
      uStack_2d50._0_4_ = (float)uStack_2c70 * 1.0;
      uStack_2d50._4_4_ = uStack_2c70._4_4_ * 1.0;
      auVar207 = _local_2d60;
      uStack_2d48._0_4_ = (float)uStack_2c68 * 1.0;
      uStack_2d48._4_4_ = 0x3f800000;
      auVar106 = _local_2d60;
      local_2da0 = local_2d60;
      uStack_2d98 = uStack_2d58;
      uStack_2d50 = auVar207._16_8_;
      uStack_2d90 = uStack_2d50;
      uStack_2d48 = auVar106._24_8_;
      uStack_2d88 = uStack_2d48;
      local_2ba4 = 0x3f800000;
      local_1240 = 0x3f800000;
      auVar22 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0x3f800000),0x20);
      local_1260 = vinsertps_avx(auVar22,ZEXT416(0x3f800000),0x30);
      auVar22 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0x3f800000),0x20);
      auStack_1250 = vinsertps_avx(auVar22,ZEXT416(0x3f800000),0x30);
      local_2dc0._0_4_ = local_1260._0_4_;
      local_2dc0._4_4_ = local_1260._4_4_;
      uStack_2db8._0_4_ = local_1260._8_4_;
      uStack_2db8._4_4_ = local_1260._12_4_;
      uStack_2db0._0_4_ = auStack_1250._0_4_;
      uStack_2db0._4_4_ = auStack_1250._4_4_;
      uStack_2da8._0_4_ = auStack_1250._8_4_;
      uStack_2da8._4_4_ = auStack_1250._12_4_;
      local_2f60._4_4_ = local_2dc0._4_4_ + (float)local_2d60._4_4_;
      local_2f60._0_4_ = (float)local_2dc0 + (float)local_2d60._0_4_;
      uStack_2f58._0_4_ = (float)uStack_2db8 + (float)uStack_2c78;
      uStack_2f58._4_4_ = uStack_2db8._4_4_ + uStack_2c78._4_4_;
      uStack_2f50._0_4_ = (float)uStack_2db0 + (float)uStack_2c70 * 1.0;
      uStack_2f50._4_4_ = uStack_2db0._4_4_ + uStack_2c70._4_4_ * 1.0;
      auVar207 = _local_2f60;
      uStack_2f48._0_4_ = (float)uStack_2da8 + (float)uStack_2c68 * 1.0;
      uStack_2f48._4_4_ = uStack_2da8._4_4_ + 1.0;
      auVar18 = _local_2f60;
      local_2fa0 = 0x3f800000;
      uStack_2f9c = 0x3f800000;
      uStack_2f98 = 0x3f800000;
      uStack_2f94 = 0x3f800000;
      uStack_2f90 = 0x3f800000;
      uStack_2f8c = 0x3f800000;
      uStack_2f88 = 0x3f800000;
      uStack_2f84 = 0x3f800000;
      local_2700 = 0;
      uStack_26f8 = 0;
      uStack_26f0 = 0;
      uStack_26e8 = 0;
      local_2fc0 = vcmpps_avx(_local_2f60,ZEXT1632(ZEXT816(0)),2);
      local_2640 = local_2f60;
      uStack_2638 = uStack_2f58;
      uStack_2f50 = auVar207._16_8_;
      uStack_2630 = uStack_2f50;
      uStack_2f48 = auVar18._24_8_;
      uStack_2628 = uStack_2f48;
      local_2660 = 0x800000;
      uStack_265c = 0x800000;
      uStack_2658 = 0x800000;
      uStack_2654 = 0x800000;
      uStack_2650 = 0x800000;
      uStack_264c = 0x800000;
      uStack_2648 = 0x800000;
      uStack_2644 = 0x800000;
      auVar108._16_8_ = uStack_2f50;
      auVar108._0_16_ = _local_2f60;
      auVar108._24_8_ = uStack_2f48;
      auVar107._8_4_ = 0x800000;
      auVar107._0_8_ = 0x80000000800000;
      auVar107._12_4_ = 0x800000;
      auVar107._16_4_ = 0x800000;
      auVar107._20_4_ = 0x800000;
      auVar107._24_4_ = 0x800000;
      auVar107._28_4_ = 0x800000;
      auVar18 = vmaxps_avx(auVar107,auVar108);
      local_2f60 = auVar18._0_8_;
      local_25e0 = local_2f60;
      uStack_2f58 = auVar18._8_8_;
      uStack_25d8 = uStack_2f58;
      uStack_2f50 = auVar18._16_8_;
      uStack_25d0 = uStack_2f50;
      uStack_2f48 = auVar18._24_8_;
      uStack_25c8 = uStack_2f48;
      local_2600 = local_2f60;
      uStack_25f8 = uStack_2f58;
      uStack_25f0 = uStack_2f50;
      uStack_25e8 = uStack_2f48;
      local_2604 = 0x17;
      local_20e0 = local_2f60;
      uStack_20d8 = uStack_2f58;
      uStack_20d0 = uStack_2f50;
      uStack_20c8 = uStack_2f48;
      local_20e4 = 0x17;
      auVar19 = vpsrld_avx2(auVar18,ZEXT416(0x17));
      local_24a0 = local_2f60;
      uStack_2498 = uStack_2f58;
      uStack_2490 = uStack_2f50;
      uStack_2488 = uStack_2f48;
      local_24c0 = 0x807fffff;
      uStack_24bc = 0x807fffff;
      uStack_24b8 = 0x807fffff;
      uStack_24b4 = 0x807fffff;
      uStack_24b0 = 0x807fffff;
      uStack_24ac = 0x807fffff;
      uStack_24a8 = 0x807fffff;
      uStack_24a4 = 0x807fffff;
      auVar112._8_4_ = 0x807fffff;
      auVar112._0_8_ = 0x807fffff807fffff;
      auVar112._12_4_ = 0x807fffff;
      auVar112._16_4_ = 0x807fffff;
      auVar112._20_4_ = 0x807fffff;
      auVar112._24_4_ = 0x807fffff;
      auVar112._28_4_ = 0x807fffff;
      auVar18 = vpand_avx2(auVar112,auVar18);
      local_2f60 = auVar18._0_8_;
      local_2420 = local_2f60;
      uStack_2f58 = auVar18._8_8_;
      uStack_2418 = uStack_2f58;
      uStack_2f50 = auVar18._16_8_;
      uStack_2410 = uStack_2f50;
      uStack_2f48 = auVar18._24_8_;
      uStack_2408 = uStack_2f48;
      local_2440 = 0x3f000000;
      uStack_243c = 0x3f000000;
      uStack_2438 = 0x3f000000;
      uStack_2434 = 0x3f000000;
      uStack_2430 = 0x3f000000;
      uStack_242c = 0x3f000000;
      uStack_2428 = 0x3f000000;
      uStack_2424 = 0x3f000000;
      auVar113._8_4_ = 0x3f000000;
      auVar113._0_8_ = 0x3f0000003f000000;
      auVar113._12_4_ = 0x3f000000;
      auVar113._16_4_ = 0x3f000000;
      auVar113._20_4_ = 0x3f000000;
      auVar113._24_4_ = 0x3f000000;
      auVar113._28_4_ = 0x3f000000;
      auVar17 = vpor_avx2(auVar113,auVar18);
      local_2f80._0_8_ = auVar19._0_8_;
      local_23e0 = local_2f80._0_8_;
      local_2f80._8_8_ = auVar19._8_8_;
      uStack_23d8 = local_2f80._8_8_;
      local_2f80._16_8_ = auVar19._16_8_;
      uStack_23d0 = local_2f80._16_8_;
      local_2f80._24_8_ = auVar19._24_8_;
      uStack_23c8 = local_2f80._24_8_;
      local_2400 = 0x7f0000007f;
      uStack_23f8 = 0x7f0000007f;
      uStack_23f0 = 0x7f0000007f;
      uStack_23e8 = 0x7f0000007f;
      local_20a0 = local_2f80._0_8_;
      uStack_2098 = local_2f80._8_8_;
      uStack_2090 = local_2f80._16_8_;
      uStack_2088 = local_2f80._24_8_;
      local_20c0 = 0x7f0000007f;
      uStack_20b8 = 0x7f0000007f;
      uStack_20b0 = 0x7f0000007f;
      uStack_20a8 = 0x7f0000007f;
      auVar114._8_8_ = 0x7f0000007f;
      auVar114._0_8_ = 0x7f0000007f;
      auVar114._16_8_ = 0x7f0000007f;
      auVar114._24_8_ = 0x7f0000007f;
      local_2f80 = vpsubd_avx2(auVar19,auVar114);
      local_23c0 = local_2f80._0_8_;
      uStack_23b8 = local_2f80._8_8_;
      uStack_23b0 = local_2f80._16_8_;
      uStack_23a8 = local_2f80._24_8_;
      auVar18 = vcvtdq2ps_avx(local_2f80);
      local_2fe0 = auVar18._0_8_;
      uVar25 = local_2fe0;
      uStack_2fd8 = auVar18._8_8_;
      uVar26 = uStack_2fd8;
      uStack_2fd0 = auVar18._16_8_;
      uVar27 = uStack_2fd0;
      uStack_2fc8 = auVar18._24_8_;
      uVar28 = uStack_2fc8;
      local_2e00 = 0x3f8000003f800000;
      uStack_2df8 = 0x3f8000003f800000;
      uStack_2df0 = 0x3f8000003f800000;
      uStack_2de8 = 0x3f8000003f800000;
      local_2de0._0_4_ = auVar18._0_4_;
      local_2de0._4_4_ = auVar18._4_4_;
      uStack_2dd8._0_4_ = auVar18._8_4_;
      uStack_2dd8._4_4_ = auVar18._12_4_;
      uStack_2dd0._0_4_ = auVar18._16_4_;
      uStack_2dd0._4_4_ = auVar18._20_4_;
      uStack_2dc8._0_4_ = auVar18._24_4_;
      uStack_2dc8._4_4_ = auVar18._28_4_;
      local_2fe0._4_4_ = local_2de0._4_4_ + 1.0;
      local_2fe0._0_4_ = (float)local_2de0 + 1.0;
      uStack_2fd8._0_4_ = (float)uStack_2dd8 + 1.0;
      uStack_2fd8._4_4_ = uStack_2dd8._4_4_ + 1.0;
      uStack_2fd0._0_4_ = (float)uStack_2dd0 + 1.0;
      uStack_2fd0._4_4_ = uStack_2dd0._4_4_ + 1.0;
      auVar207 = _local_2fe0;
      uStack_2fc8._0_4_ = (float)uStack_2dc8 + 1.0;
      uStack_2fc8._4_4_ = uStack_2dc8._4_4_ + 1.0;
      auVar19 = _local_2fe0;
      auVar221._8_4_ = 0x3f3504f3;
      auVar221._0_8_ = 0x3f3504f33f3504f3;
      auVar221._12_4_ = 0x3f3504f3;
      auVar221._16_4_ = 0x3f3504f3;
      auVar221._20_4_ = 0x3f3504f3;
      auVar221._24_4_ = 0x3f3504f3;
      auVar221._28_4_ = 0x3f3504f3;
      local_3000 = vcmpps_avx(auVar17,auVar221,1);
      local_2f60 = auVar17._0_8_;
      local_24e0 = local_2f60;
      uStack_2f58 = auVar17._8_8_;
      uStack_24d8 = uStack_2f58;
      uStack_2f50 = auVar17._16_8_;
      uStack_24d0 = uStack_2f50;
      uStack_2f48 = auVar17._24_8_;
      uStack_24c8 = uStack_2f48;
      local_2500 = local_3000._0_8_;
      uStack_24f8 = local_3000._8_8_;
      uStack_24f0 = local_3000._16_8_;
      uStack_24e8 = local_3000._24_8_;
      local_3020 = vpand_avx2(local_3000,auVar17);
      local_2780 = local_2f60;
      uStack_2778 = uStack_2f58;
      uStack_2770 = uStack_2f50;
      uStack_2768 = uStack_2f48;
      local_27a0 = 0x3f8000003f800000;
      uStack_2798 = 0x3f8000003f800000;
      uStack_2790 = 0x3f8000003f800000;
      uStack_2788 = 0x3f8000003f800000;
      auVar219._8_8_ = 0x3f8000003f800000;
      auVar219._0_8_ = 0x3f8000003f800000;
      auVar219._16_8_ = 0x3f8000003f800000;
      auVar219._24_8_ = 0x3f8000003f800000;
      auVar18 = vsubps_avx(auVar17,auVar219);
      local_27c0 = local_2fe0;
      uStack_27b8 = uStack_2fd8;
      uStack_2fd0 = auVar207._16_8_;
      uStack_27b0 = uStack_2fd0;
      uStack_2fc8 = auVar19._24_8_;
      uStack_27a8 = uStack_2fc8;
      local_2520 = 0x3f8000003f800000;
      uStack_2518 = 0x3f8000003f800000;
      uStack_2510 = 0x3f8000003f800000;
      uStack_2508 = 0x3f8000003f800000;
      local_2540 = local_3000._0_8_;
      uStack_2538 = local_3000._8_8_;
      uStack_2530 = local_3000._16_8_;
      uStack_2528 = local_3000._24_8_;
      auVar111._8_8_ = 0x3f8000003f800000;
      auVar111._0_8_ = 0x3f8000003f800000;
      auVar111._16_8_ = 0x3f8000003f800000;
      auVar111._24_8_ = 0x3f8000003f800000;
      local_27e0 = vpand_avx2(local_3000,auVar111);
      auVar104._16_8_ = uStack_2fd0;
      auVar104._0_16_ = _local_2fe0;
      auVar104._24_8_ = uStack_2fc8;
      _local_2fe0 = vsubps_avx(auVar104,local_27e0);
      local_2f60 = auVar18._0_8_;
      uVar29 = local_2f60;
      uStack_2f58 = auVar18._8_8_;
      uVar30 = uStack_2f58;
      uStack_2f50 = auVar18._16_8_;
      uVar31 = uStack_2f50;
      uStack_2f48 = auVar18._24_8_;
      uVar32 = uStack_2f48;
      local_2e20._0_4_ = auVar18._0_4_;
      local_2e20._4_4_ = auVar18._4_4_;
      uStack_2e18._0_4_ = auVar18._8_4_;
      uStack_2e18._4_4_ = auVar18._12_4_;
      uStack_2e10._0_4_ = auVar18._16_4_;
      uStack_2e10._4_4_ = auVar18._20_4_;
      uStack_2e08._0_4_ = auVar18._24_4_;
      uStack_2e08._4_4_ = auVar18._28_4_;
      local_2e40._0_4_ = local_3020._0_4_;
      local_2e40._4_4_ = local_3020._4_4_;
      uStack_2e38._0_4_ = local_3020._8_4_;
      uStack_2e38._4_4_ = local_3020._12_4_;
      uStack_2e30._0_4_ = local_3020._16_4_;
      uStack_2e30._4_4_ = local_3020._20_4_;
      uStack_2e28._0_4_ = local_3020._24_4_;
      uStack_2e28._4_4_ = local_3020._28_4_;
      local_2f60._0_4_ = (float)local_2e40 + (float)local_2e20;
      local_2f60._4_4_ = local_2e40._4_4_ + local_2e20._4_4_;
      uStack_2e38._0_4_ = (float)uStack_2e38 + (float)uStack_2e18;
      uStack_2e38._4_4_ = uStack_2e38._4_4_ + uStack_2e18._4_4_;
      uStack_2e30._0_4_ = (float)uStack_2e30 + (float)uStack_2e10;
      uStack_2e30._4_4_ = uStack_2e30._4_4_ + uStack_2e10._4_4_;
      uStack_2e28._0_4_ = (float)uStack_2e28 + (float)uStack_2e08;
      fStack_3024 = uStack_2e28._4_4_ + uStack_2e08._4_4_;
      uStack_2f58._0_4_ = (float)uStack_2e38;
      uStack_2f58._4_4_ = uStack_2e38._4_4_;
      uStack_2f50._0_4_ = (float)uStack_2e30;
      uStack_2f50._4_4_ = uStack_2e30._4_4_;
      auVar207 = _local_2f60;
      uStack_2f48._0_4_ = (float)uStack_2e28;
      uStack_2f48._4_4_ = fStack_3024;
      auVar17 = _local_2f60;
      local_2ec0 = local_2f60;
      uStack_2eb8 = uStack_2f58;
      uStack_2f50 = auVar207._16_8_;
      uStack_2eb0 = uStack_2f50;
      uStack_2f48 = auVar17._24_8_;
      uStack_2ea8 = uStack_2f48;
      local_3040 = (float)local_2f60._0_4_ * (float)local_2f60._0_4_;
      fStack_303c = (float)local_2f60._4_4_ * (float)local_2f60._4_4_;
      fStack_3038 = (float)uStack_2e38 * (float)uStack_2e38;
      fStack_3034 = uStack_2e38._4_4_ * uStack_2e38._4_4_;
      fStack_3030 = (float)uStack_2e30 * (float)uStack_2e30;
      fStack_302c = uStack_2e30._4_4_ * uStack_2e30._4_4_;
      fStack_3028 = (float)uStack_2e28 * (float)uStack_2e28;
      uStack_3058._0_4_ = 0x3d9021bb;
      local_3060 = (undefined1  [8])0x3d9021bb3d9021bb;
      uStack_3058._4_4_ = 0x3d9021bb;
      uStack_3050._0_4_ = 0x3d9021bb;
      uStack_3050._4_4_ = 0x3d9021bb;
      auVar207 = _local_3060;
      uStack_3048._0_4_ = 0.070376836;
      uStack_3048._4_4_ = 0x3d9021bb;
      auVar18 = _local_3060;
      local_2238 = local_3060;
      local_2250 = local_2f60;
      local_2178 = ::_ps256_cephes_log_p1;
      local_2040 = 0x3d9021bb3d9021bb;
      uStack_2038 = uStack_3058;
      uStack_3050 = auVar207._16_8_;
      uStack_2030 = uStack_3050;
      uStack_3048 = auVar18._24_8_;
      uStack_2028 = uStack_3048;
      local_2060 = local_2f60;
      uStack_2058 = uStack_2f58;
      uStack_2050 = uStack_2f50;
      uStack_2048 = uStack_2f48;
      local_2080[0] = -0.1151461;
      local_2080[1] = -0.1151461;
      afStack_2078[0] = -0.1151461;
      afStack_2078[1] = -0.1151461;
      afStack_2070[0] = -0.1151461;
      afStack_2070[1] = -0.1151461;
      afStack_2068[0] = -0.1151461;
      afStack_2068[1] = -0.1151461;
      auVar115._8_4_ = -0.1151461;
      auVar115._12_4_ = -0.1151461;
      auVar115._0_4_ = -0.1151461;
      auVar115._4_4_ = -0.1151461;
      auVar115._16_4_ = -0.1151461;
      auVar115._20_4_ = -0.1151461;
      auVar115._24_4_ = -0.1151461;
      auVar115._28_4_ = -0.1151461;
      auVar22 = vfmadd213ps_fma(auVar17,auVar18,auVar115);
      local_2190 = ::_ps256_cephes_log_p2;
      local_3060 = auVar22._0_8_;
      local_1fe0 = local_3060;
      uStack_3058 = auVar22._8_8_;
      uStack_1fd8 = uStack_3058;
      uStack_1fd0 = 0;
      uStack_1fc8 = 0;
      local_2000 = local_2f60;
      uStack_1ff8 = uStack_2f58;
      uStack_1ff0 = uStack_2f50;
      uStack_1fe8 = uStack_2f48;
      local_2020[0] = 0.116769984;
      local_2020[1] = 0.116769984;
      afStack_2018[0] = 0.116769984;
      afStack_2018[1] = 0.116769984;
      afStack_2010[0] = 0.116769984;
      afStack_2010[1] = 0.116769984;
      afStack_2008[0] = 0.116769984;
      afStack_2008[1] = 0.116769984;
      auVar116._8_4_ = 0.116769984;
      auVar116._12_4_ = 0.116769984;
      auVar116._0_4_ = 0.116769984;
      auVar116._4_4_ = 0.116769984;
      auVar116._16_4_ = 0.116769984;
      auVar116._20_4_ = 0.116769984;
      auVar116._24_4_ = 0.116769984;
      auVar116._28_4_ = 0.116769984;
      auVar22 = vfmadd213ps_fma(auVar17,ZEXT1632(auVar22),auVar116);
      local_21a8 = ::_ps256_cephes_log_p3;
      local_3060 = auVar22._0_8_;
      local_1f80 = local_3060;
      uStack_3058 = auVar22._8_8_;
      uStack_1f78 = uStack_3058;
      uStack_1f70 = 0;
      uStack_1f68 = 0;
      local_1fa0 = local_2f60;
      uStack_1f98 = uStack_2f58;
      uStack_1f90 = uStack_2f50;
      uStack_1f88 = uStack_2f48;
      local_1fc0[0] = -0.12420141;
      local_1fc0[1] = -0.12420141;
      afStack_1fb8[0] = -0.12420141;
      afStack_1fb8[1] = -0.12420141;
      afStack_1fb0[0] = -0.12420141;
      afStack_1fb0[1] = -0.12420141;
      afStack_1fa8[0] = -0.12420141;
      afStack_1fa8[1] = -0.12420141;
      auVar117._8_4_ = -0.12420141;
      auVar117._12_4_ = -0.12420141;
      auVar117._0_4_ = -0.12420141;
      auVar117._4_4_ = -0.12420141;
      auVar117._16_4_ = -0.12420141;
      auVar117._20_4_ = -0.12420141;
      auVar117._24_4_ = -0.12420141;
      auVar117._28_4_ = -0.12420141;
      auVar22 = vfmadd213ps_fma(auVar17,ZEXT1632(auVar22),auVar117);
      local_21c0 = ::_ps256_cephes_log_p4;
      local_3060 = auVar22._0_8_;
      local_1f20 = local_3060;
      uStack_3058 = auVar22._8_8_;
      uStack_1f18 = uStack_3058;
      uStack_1f10 = 0;
      uStack_1f08 = 0;
      local_1f40 = local_2f60;
      uStack_1f38 = uStack_2f58;
      uStack_1f30 = uStack_2f50;
      uStack_1f28 = uStack_2f48;
      local_1f60[0] = 0.14249323;
      local_1f60[1] = 0.14249323;
      afStack_1f58[0] = 0.14249323;
      afStack_1f58[1] = 0.14249323;
      afStack_1f50[0] = 0.14249323;
      afStack_1f50[1] = 0.14249323;
      afStack_1f48[0] = 0.14249323;
      afStack_1f48[1] = 0.14249323;
      auVar118._8_4_ = 0.14249323;
      auVar118._12_4_ = 0.14249323;
      auVar118._0_4_ = 0.14249323;
      auVar118._4_4_ = 0.14249323;
      auVar118._16_4_ = 0.14249323;
      auVar118._20_4_ = 0.14249323;
      auVar118._24_4_ = 0.14249323;
      auVar118._28_4_ = 0.14249323;
      auVar22 = vfmadd213ps_fma(auVar17,ZEXT1632(auVar22),auVar118);
      local_21d8 = ::_ps256_cephes_log_p5;
      local_3060 = auVar22._0_8_;
      local_1ec0 = local_3060;
      uStack_3058 = auVar22._8_8_;
      uStack_1eb8 = uStack_3058;
      uStack_1eb0 = 0;
      uStack_1ea8 = 0;
      local_1ee0 = local_2f60;
      uStack_1ed8 = uStack_2f58;
      uStack_1ed0 = uStack_2f50;
      uStack_1ec8 = uStack_2f48;
      local_1f00[0] = -0.16668057;
      local_1f00[1] = -0.16668057;
      afStack_1ef8[0] = -0.16668057;
      afStack_1ef8[1] = -0.16668057;
      afStack_1ef0[0] = -0.16668057;
      afStack_1ef0[1] = -0.16668057;
      afStack_1ee8[0] = -0.16668057;
      afStack_1ee8[1] = -0.16668057;
      auVar119._8_4_ = -0.16668057;
      auVar119._12_4_ = -0.16668057;
      auVar119._0_4_ = -0.16668057;
      auVar119._4_4_ = -0.16668057;
      auVar119._16_4_ = -0.16668057;
      auVar119._20_4_ = -0.16668057;
      auVar119._24_4_ = -0.16668057;
      auVar119._28_4_ = -0.16668057;
      auVar22 = vfmadd213ps_fma(auVar17,ZEXT1632(auVar22),auVar119);
      local_21f0 = ::_ps256_cephes_log_p6;
      local_3060 = auVar22._0_8_;
      local_1e60 = local_3060;
      uStack_3058 = auVar22._8_8_;
      uStack_1e58 = uStack_3058;
      uStack_1e50 = 0;
      uStack_1e48 = 0;
      local_1e80 = local_2f60;
      uStack_1e78 = uStack_2f58;
      uStack_1e70 = uStack_2f50;
      uStack_1e68 = uStack_2f48;
      local_1ea0[0] = 0.20000714;
      local_1ea0[1] = 0.20000714;
      afStack_1e98[0] = 0.20000714;
      afStack_1e98[1] = 0.20000714;
      afStack_1e90[0] = 0.20000714;
      afStack_1e90[1] = 0.20000714;
      afStack_1e88[0] = 0.20000714;
      afStack_1e88[1] = 0.20000714;
      auVar120._8_4_ = 0.20000714;
      auVar120._12_4_ = 0.20000714;
      auVar120._0_4_ = 0.20000714;
      auVar120._4_4_ = 0.20000714;
      auVar120._16_4_ = 0.20000714;
      auVar120._20_4_ = 0.20000714;
      auVar120._24_4_ = 0.20000714;
      auVar120._28_4_ = 0.20000714;
      auVar22 = vfmadd213ps_fma(auVar17,ZEXT1632(auVar22),auVar120);
      local_2208 = ::_ps256_cephes_log_p7;
      local_3060 = auVar22._0_8_;
      local_1e00 = local_3060;
      uStack_3058 = auVar22._8_8_;
      uStack_1df8 = uStack_3058;
      uStack_1df0 = 0;
      uStack_1de8 = 0;
      local_1e20 = local_2f60;
      uStack_1e18 = uStack_2f58;
      uStack_1e10 = uStack_2f50;
      uStack_1e08 = uStack_2f48;
      local_1e40[0] = -0.24999994;
      local_1e40[1] = -0.24999994;
      afStack_1e38[0] = -0.24999994;
      afStack_1e38[1] = -0.24999994;
      afStack_1e30[0] = -0.24999994;
      afStack_1e30[1] = -0.24999994;
      afStack_1e28[0] = -0.24999994;
      afStack_1e28[1] = -0.24999994;
      auVar121._8_4_ = -0.24999994;
      auVar121._12_4_ = -0.24999994;
      auVar121._0_4_ = -0.24999994;
      auVar121._4_4_ = -0.24999994;
      auVar121._16_4_ = -0.24999994;
      auVar121._20_4_ = -0.24999994;
      auVar121._24_4_ = -0.24999994;
      auVar121._28_4_ = -0.24999994;
      auVar22 = vfmadd213ps_fma(auVar17,ZEXT1632(auVar22),auVar121);
      local_2220 = ::_ps256_cephes_log_p8;
      local_3060 = auVar22._0_8_;
      local_1da0 = local_3060;
      uStack_3058 = auVar22._8_8_;
      uStack_1d98 = uStack_3058;
      uStack_1d90 = 0;
      uStack_1d88 = 0;
      local_1dc0 = local_2f60;
      uStack_1db8 = uStack_2f58;
      uStack_1db0 = uStack_2f50;
      uStack_1da8 = uStack_2f48;
      local_1de0[0] = 0.3333333;
      local_1de0[1] = 0.3333333;
      afStack_1dd8[0] = 0.3333333;
      afStack_1dd8[1] = 0.3333333;
      afStack_1dd0[0] = 0.3333333;
      afStack_1dd0[1] = 0.3333333;
      afStack_1dc8[0] = 0.3333333;
      afStack_1dc8[1] = 0.3333333;
      auVar122._8_4_ = 0.3333333;
      auVar122._12_4_ = 0.3333333;
      auVar122._0_4_ = 0.3333333;
      auVar122._4_4_ = 0.3333333;
      auVar122._16_4_ = 0.3333333;
      auVar122._20_4_ = 0.3333333;
      auVar122._24_4_ = 0.3333333;
      auVar122._28_4_ = 0.3333333;
      auVar22 = vfmadd213ps_fma(auVar17,ZEXT1632(auVar22),auVar122);
      local_3060 = auVar22._0_8_;
      uVar33 = local_3060;
      uStack_3058 = auVar22._8_8_;
      uVar34 = uStack_3058;
      uStack_2ed0 = 0;
      uStack_2ec8 = 0;
      local_2f00 = local_2f60;
      uStack_2ef8 = uStack_2f58;
      uStack_2ef0 = uStack_2f50;
      uStack_2ee8 = uStack_2f48;
      local_2ee0._0_4_ = auVar22._0_4_;
      local_2ee0._4_4_ = auVar22._4_4_;
      uStack_2ed8._0_4_ = auVar22._8_4_;
      uStack_2ed8._4_4_ = auVar22._12_4_;
      local_3060._4_4_ = (float)local_2f60._4_4_ * local_2ee0._4_4_;
      local_3060._0_4_ = (float)local_2f60._0_4_ * (float)local_2ee0;
      uStack_3058._0_4_ = (float)uStack_2e38 * (float)uStack_2ed8;
      uStack_3058._4_4_ = uStack_2e38._4_4_ * uStack_2ed8._4_4_;
      uStack_3050._0_4_ = (float)uStack_2e30 * 0.0;
      uStack_3050._4_4_ = uStack_2e30._4_4_ * 0.0;
      auVar207 = _local_3060;
      local_2f20 = local_3060;
      uStack_2f18 = uStack_3058;
      uStack_3050 = auVar207._16_8_;
      uStack_2f10 = uStack_3050;
      uStack_3048 = (ulong)(uint)((float)uStack_2e28 * 0.0);
      uStack_2f08 = uStack_3048;
      local_2f40 = CONCAT44(fStack_303c,local_3040);
      uStack_2f38 = CONCAT44(fStack_3034,fStack_3038);
      uStack_2f30 = CONCAT44(fStack_302c,fStack_3030);
      uStack_2f28 = CONCAT44(fStack_3024,fStack_3028);
      uStack_3048._0_4_ = fStack_3028 * (float)uStack_2e28 * 0.0;
      local_3060._4_4_ = fStack_303c * (float)local_2f60._4_4_ * local_2ee0._4_4_;
      local_3060._0_4_ = local_3040 * (float)local_2f60._0_4_ * (float)local_2ee0;
      uStack_3058._0_4_ = fStack_3038 * (float)uStack_2e38 * (float)uStack_2ed8;
      uStack_3058._4_4_ = fStack_3034 * uStack_2e38._4_4_ * uStack_2ed8._4_4_;
      uStack_3050._0_4_ = fStack_3030 * (float)uStack_2e30 * 0.0;
      uStack_3050._4_4_ = fStack_302c * uStack_2e30._4_4_ * 0.0;
      auVar207 = _local_3060;
      uStack_3048._4_4_ = 0;
      auVar18 = _local_3060;
      local_2240 = local_2fe0;
      local_2230 = ::_ps256_cephes_log_q1;
      local_1d40 = local_2fe0;
      uStack_1d38 = uStack_2fd8;
      uStack_1d30 = uStack_2fd0;
      uStack_1d28 = uStack_2fc8;
      local_1d60[0] = -0.00021219444;
      local_1d60[1] = -0.00021219444;
      afStack_1d58[0] = -0.00021219444;
      afStack_1d58[1] = -0.00021219444;
      afStack_1d50[0] = -0.00021219444;
      afStack_1d50[1] = -0.00021219444;
      afStack_1d48[0] = -0.00021219444;
      afStack_1d48[1] = -0.00021219444;
      local_1d80 = local_3060;
      uStack_1d78 = uStack_3058;
      uStack_3050 = auVar207._16_8_;
      uStack_1d70 = uStack_3050;
      uStack_3048 = (ulong)(uint)(float)uStack_3048;
      uStack_1d68 = uStack_3048;
      auVar123._8_4_ = -0.00021219444;
      auVar123._12_4_ = -0.00021219444;
      auVar123._0_4_ = -0.00021219444;
      auVar123._4_4_ = -0.00021219444;
      auVar123._16_4_ = -0.00021219444;
      auVar123._20_4_ = -0.00021219444;
      auVar123._24_4_ = -0.00021219444;
      auVar123._28_4_ = -0.00021219444;
      auVar22 = vfmadd213ps_fma(auVar123,_local_2fe0,auVar18);
      local_20f0 = &local_3040;
      local_20f8 = ::_ps256_0p5;
      local_1740 = CONCAT44(fStack_303c,local_3040);
      uStack_1738 = CONCAT44(fStack_3034,fStack_3038);
      uStack_1730 = CONCAT44(fStack_302c,fStack_3030);
      uStack_1728 = CONCAT44(fStack_3024,fStack_3028);
      auVar203._4_4_ = fStack_303c;
      auVar203._0_4_ = local_3040;
      auVar203._8_4_ = fStack_3038;
      auVar203._12_4_ = fStack_3034;
      auVar203._16_4_ = fStack_3030;
      auVar203._20_4_ = fStack_302c;
      auVar203._24_4_ = fStack_3028;
      auVar203._28_4_ = fStack_3024;
      local_1760[0] = 0.5;
      local_1760[1] = 0.5;
      afStack_1758[0] = 0.5;
      afStack_1758[1] = 0.5;
      afStack_1750[0] = 0.5;
      afStack_1750[1] = 0.5;
      afStack_1748[0] = 0.5;
      afStack_1748[1] = 0.5;
      local_3060 = auVar22._0_8_;
      local_1780 = local_3060;
      uStack_3058 = auVar22._8_8_;
      uStack_1778 = uStack_3058;
      uStack_1770 = 0;
      uStack_1768 = 0;
      auVar138._8_4_ = 0.5;
      auVar138._12_4_ = 0.5;
      auVar138._0_4_ = 0.5;
      auVar138._4_4_ = 0.5;
      auVar138._16_4_ = 0.5;
      auVar138._20_4_ = 0.5;
      auVar138._24_4_ = 0.5;
      auVar138._28_4_ = 0.5;
      auVar22 = vfnmadd213ps_fma(auVar138,auVar203,ZEXT1632(auVar22));
      local_2e60 = local_2f60;
      uStack_2e58 = uStack_2f58;
      uStack_2e50 = uStack_2f50;
      uStack_2e48 = uStack_2f48;
      local_3060 = auVar22._0_8_;
      uVar35 = local_3060;
      uStack_3058 = auVar22._8_8_;
      uVar36 = uStack_3058;
      uStack_2e70 = 0;
      uStack_2e68 = 0;
      local_2e80._0_4_ = auVar22._0_4_;
      local_2e80._4_4_ = auVar22._4_4_;
      uStack_2e78._0_4_ = auVar22._8_4_;
      uStack_2e78._4_4_ = auVar22._12_4_;
      local_2f60._4_4_ = local_2e80._4_4_ + (float)local_2f60._4_4_;
      local_2f60._0_4_ = (float)local_2e80 + (float)local_2f60._0_4_;
      uStack_2f58._0_4_ = (float)uStack_2e78 + (float)uStack_2e38;
      uStack_2f58._4_4_ = uStack_2e78._4_4_ + uStack_2e38._4_4_;
      uStack_2f50._0_4_ = (float)uStack_2e30 + 0.0;
      uStack_2f50._4_4_ = uStack_2e30._4_4_ + 0.0;
      auVar207 = _local_2f60;
      uStack_2f48._0_4_ = (float)uStack_2e28 + 0.0;
      uStack_2f48._4_4_ = fStack_3024 + 0.0;
      auVar18 = _local_2f60;
      local_2248 = ::_ps256_cephes_log_q2;
      local_1ce0 = local_2fe0;
      uStack_1cd8 = uStack_2fd8;
      uStack_1cd0 = uStack_2fd0;
      uStack_1cc8 = uStack_2fc8;
      local_1d00[0] = 0.6933594;
      local_1d00[1] = 0.6933594;
      afStack_1cf8[0] = 0.6933594;
      afStack_1cf8[1] = 0.6933594;
      afStack_1cf0[0] = 0.6933594;
      afStack_1cf0[1] = 0.6933594;
      afStack_1ce8[0] = 0.6933594;
      afStack_1ce8[1] = 0.6933594;
      local_1d20 = local_2f60;
      uStack_1d18 = uStack_2f58;
      uStack_2f50 = auVar207._16_8_;
      uStack_1d10 = uStack_2f50;
      uStack_2f48 = auVar18._24_8_;
      uStack_1d08 = uStack_2f48;
      auVar124._8_4_ = 0.6933594;
      auVar124._12_4_ = 0.6933594;
      auVar124._0_4_ = 0.6933594;
      auVar124._4_4_ = 0.6933594;
      auVar124._16_4_ = 0.6933594;
      auVar124._20_4_ = 0.6933594;
      auVar124._24_4_ = 0.6933594;
      auVar124._28_4_ = 0.6933594;
      auVar23 = vfmadd213ps_fma(auVar124,_local_2fe0,auVar18);
      local_2f60 = auVar23._0_8_;
      local_2460 = local_2f60;
      uStack_2f58 = auVar23._8_8_;
      uStack_2458 = uStack_2f58;
      uStack_2450 = 0;
      uStack_2448 = 0;
      local_2480 = local_2fc0._0_8_;
      uStack_2478 = local_2fc0._8_8_;
      uStack_2470 = local_2fc0._16_8_;
      uStack_2468 = local_2fc0._24_8_;
      _local_3060 = vpor_avx2(local_2fc0,ZEXT1632(auVar23));
      local_30c0 = local_3060;
      uStack_30b8 = uStack_3058;
      uStack_30b0 = uStack_3050;
      uStack_30a8 = uStack_3048;
      local_2ba8 = 0x3f800000;
      local_1200 = 0x3f800000;
      auVar22 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0x3f800000),0x20);
      local_1220 = vinsertps_avx(auVar22,ZEXT416(0x3f800000),0x30);
      auVar22 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0x3f800000),0x20);
      auStack_1210 = vinsertps_avx(auVar22,ZEXT416(0x3f800000),0x30);
      local_30e0 = local_1220._0_8_;
      uStack_30d8 = local_1220._8_8_;
      uStack_30d0 = auStack_1210._0_8_;
      uStack_30c8 = auStack_1210._8_8_;
      local_2bac = 0x40000000;
      local_11b0 = 0x40000000;
      auVar22 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0x40000000),0x20);
      local_11e0 = vinsertps_avx(auVar22,ZEXT416(0x40000000),0x30);
      auVar22 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0x40000000),0x20);
      auStack_11d0 = vinsertps_avx(auVar22,ZEXT416(0x40000000),0x30);
      local_3100 = local_11e0._0_8_;
      uStack_30f8 = local_11e0._8_8_;
      uStack_30f0 = auStack_11d0._0_8_;
      uStack_30e8 = auStack_11d0._8_8_;
      local_3080._0_4_ = local_3060._0_4_;
      local_3080._4_4_ = local_3060._4_4_;
      uStack_3078._0_4_ = local_3060._8_4_;
      uStack_3078._4_4_ = local_3060._12_4_;
      uStack_3070._0_4_ = local_3060._16_4_;
      uStack_3070._4_4_ = local_3060._20_4_;
      uStack_3068._0_4_ = local_3060._24_4_;
      uStack_3068._4_4_ = local_3060._28_4_;
      uStack_2b04 = uStack_3068._4_4_;
      local_30a0._0_4_ = local_11e0._0_4_;
      local_30a0._4_4_ = local_11e0._4_4_;
      uStack_3098._0_4_ = local_11e0._8_4_;
      uStack_3098._4_4_ = local_11e0._12_4_;
      uStack_3090._0_4_ = auStack_11d0._0_4_;
      uStack_3090._4_4_ = auStack_11d0._4_4_;
      uStack_3088._0_4_ = auStack_11d0._8_4_;
      local_2b20 = (float)local_30a0 * (float)local_3080;
      fStack_2b1c = local_30a0._4_4_ * local_3080._4_4_;
      fStack_2b18 = (float)uStack_3098 * (float)uStack_3078;
      fStack_2b14 = uStack_3098._4_4_ * uStack_3078._4_4_;
      fStack_2b10 = (float)uStack_3090 * (float)uStack_3070;
      fStack_2b0c = uStack_3090._4_4_ * uStack_3070._4_4_;
      fStack_2b08 = (float)uStack_3088 * (float)uStack_3068;
      local_28e4 = 0x3f800000;
      local_1280 = 0x3f800000;
      auVar22 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0x3f800000),0x20);
      local_12a0 = vinsertps_avx(auVar22,ZEXT416(0x3f800000),0x30);
      auVar22 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0x3f800000),0x20);
      auStack_1290 = vinsertps_avx(auVar22,ZEXT416(0x3f800000),0x30);
      local_2b40 = local_12a0._0_8_;
      uStack_2b38 = local_12a0._8_8_;
      uStack_2b30 = auStack_1290._0_8_;
      uStack_2b28 = auStack_1290._8_8_;
      local_28c0 = local_12a0._0_8_;
      uStack_28b8 = local_12a0._8_8_;
      uStack_28b0 = auStack_1290._0_8_;
      uStack_28a8 = auStack_1290._8_8_;
      local_2740 = 0;
      uStack_2738 = 0;
      uStack_2730 = 0;
      uStack_2728 = 0;
      local_2840 = 0;
      uStack_2838 = 0;
      uStack_2830 = 0;
      uStack_2828 = 0;
      local_2860 = CONCAT44(fStack_2b1c,local_2b20);
      uStack_2858 = CONCAT44(fStack_2b14,fStack_2b18);
      uStack_2850 = CONCAT44(fStack_2b0c,fStack_2b10);
      uStack_2848 = CONCAT44(uStack_3068._4_4_,fStack_2b08);
      auVar103._8_8_ = uStack_2858;
      auVar103._0_8_ = local_2860;
      auVar103._16_8_ = uStack_2850;
      auVar103._24_8_ = uStack_2848;
      auVar18 = vsubps_avx(ZEXT1632(ZEXT816(0)),auVar103);
      local_2760 = 0;
      uStack_2758 = 0;
      uStack_2750 = 0;
      uStack_2748 = 0;
      local_2a60 = 0x3f800000;
      uStack_2a5c = 0x3f800000;
      uStack_2a58 = 0x3f800000;
      uStack_2a54 = 0x3f800000;
      uStack_2a50 = 0x3f800000;
      uStack_2a4c = 0x3f800000;
      uStack_2a48 = 0x3f800000;
      uStack_2a44 = 0x3f800000;
      local_29e0._0_8_ = auVar18._0_8_;
      local_1580 = local_29e0._0_8_;
      local_29e0._8_8_ = auVar18._8_8_;
      uStack_1578 = local_29e0._8_8_;
      local_29e0._16_8_ = auVar18._16_8_;
      uStack_1570 = local_29e0._16_8_;
      local_29e0._24_8_ = auVar18._24_8_;
      uStack_1568 = local_29e0._24_8_;
      local_15a0 = 0x42b0c0a5;
      uStack_159c = 0x42b0c0a5;
      uStack_1598 = 0x42b0c0a5;
      uStack_1594 = 0x42b0c0a5;
      uStack_1590 = 0x42b0c0a5;
      uStack_158c = 0x42b0c0a5;
      uStack_1588 = 0x42b0c0a5;
      uStack_1584 = 0x42b0c0a5;
      auVar143._8_4_ = 0x42b0c0a5;
      auVar143._0_8_ = 0x42b0c0a542b0c0a5;
      auVar143._12_4_ = 0x42b0c0a5;
      auVar143._16_4_ = 0x42b0c0a5;
      auVar143._20_4_ = 0x42b0c0a5;
      auVar143._24_4_ = 0x42b0c0a5;
      auVar143._28_4_ = 0x42b0c0a5;
      auVar18 = vminps_avx(auVar18,auVar143);
      local_29e0._0_8_ = auVar18._0_8_;
      local_26c0 = local_29e0._0_8_;
      local_29e0._8_8_ = auVar18._8_8_;
      uStack_26b8 = local_29e0._8_8_;
      local_29e0._16_8_ = auVar18._16_8_;
      uStack_26b0 = local_29e0._16_8_;
      local_29e0._24_8_ = auVar18._24_8_;
      uStack_26a8 = local_29e0._24_8_;
      local_26e0 = 0xc2b0c0a5;
      uStack_26dc = 0xc2b0c0a5;
      uStack_26d8 = 0xc2b0c0a5;
      uStack_26d4 = 0xc2b0c0a5;
      uStack_26d0 = 0xc2b0c0a5;
      uStack_26cc = 0xc2b0c0a5;
      uStack_26c8 = 0xc2b0c0a5;
      uStack_26c4 = 0xc2b0c0a5;
      auVar105._8_4_ = 0xc2b0c0a5;
      auVar105._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar105._12_4_ = 0xc2b0c0a5;
      auVar105._16_4_ = 0xc2b0c0a5;
      auVar105._20_4_ = 0xc2b0c0a5;
      auVar105._24_4_ = 0xc2b0c0a5;
      auVar105._28_4_ = 0xc2b0c0a5;
      auVar17 = vmaxps_avx(auVar18,auVar105);
      local_23a0 = local_29e0;
      local_2308 = ::_ps256_cephes_LOG2EF;
      local_2310 = ::_ps256_0p5;
      local_29e0._0_8_ = auVar17._0_8_;
      local_19e0 = local_29e0._0_8_;
      local_29e0._8_8_ = auVar17._8_8_;
      uStack_19d8 = local_29e0._8_8_;
      local_29e0._16_8_ = auVar17._16_8_;
      uStack_19d0 = local_29e0._16_8_;
      local_29e0._24_8_ = auVar17._24_8_;
      uStack_19c8 = local_29e0._24_8_;
      local_1a00[0] = 1.442695;
      local_1a00[1] = 1.442695;
      afStack_19f8[0] = 1.442695;
      afStack_19f8[1] = 1.442695;
      afStack_19f0[0] = 1.442695;
      afStack_19f0[1] = 1.442695;
      afStack_19e8[0] = 1.442695;
      afStack_19e8[1] = 1.442695;
      local_1a20[0] = 0.5;
      local_1a20[1] = 0.5;
      afStack_1a18[0] = 0.5;
      afStack_1a18[1] = 0.5;
      afStack_1a10[0] = 0.5;
      afStack_1a10[1] = 0.5;
      afStack_1a08[0] = 0.5;
      afStack_1a08[1] = 0.5;
      auVar132._8_4_ = 1.442695;
      auVar132._12_4_ = 1.442695;
      auVar132._0_4_ = 1.442695;
      auVar132._4_4_ = 1.442695;
      auVar132._16_4_ = 1.442695;
      auVar132._20_4_ = 1.442695;
      auVar132._24_4_ = 1.442695;
      auVar132._28_4_ = 1.442695;
      auVar131._8_4_ = 0.5;
      auVar131._12_4_ = 0.5;
      auVar131._0_4_ = 0.5;
      auVar131._4_4_ = 0.5;
      auVar131._16_4_ = 0.5;
      auVar131._20_4_ = 0.5;
      auVar131._24_4_ = 0.5;
      auVar131._28_4_ = 0.5;
      auVar22 = vfmadd213ps_fma(auVar132,auVar17,auVar131);
      auVar19 = vroundps_avx(ZEXT1632(auVar22),1);
      auVar18 = vcmpps_avx(ZEXT1632(auVar22),auVar19,1);
      local_2a80._0_8_ = auVar18._0_8_;
      local_25a0 = local_2a80._0_8_;
      local_2a80._8_8_ = auVar18._8_8_;
      uStack_2598 = local_2a80._8_8_;
      local_2a80._16_8_ = auVar18._16_8_;
      uStack_2590 = local_2a80._16_8_;
      local_2a80._24_8_ = auVar18._24_8_;
      uStack_2588 = local_2a80._24_8_;
      local_25c0 = 0x3f8000003f800000;
      uStack_25b8 = 0x3f8000003f800000;
      uStack_25b0 = 0x3f8000003f800000;
      uStack_25a8 = 0x3f8000003f800000;
      auVar109._8_8_ = 0x3f8000003f800000;
      auVar109._0_8_ = 0x3f8000003f800000;
      auVar109._16_8_ = 0x3f8000003f800000;
      auVar109._24_8_ = 0x3f8000003f800000;
      local_2a80 = vpand_avx2(auVar18,auVar109);
      local_2a00 = auVar19._0_8_;
      local_2880 = local_2a00;
      uStack_29f8 = auVar19._8_8_;
      uStack_2878 = uStack_29f8;
      uStack_29f0 = auVar19._16_8_;
      uStack_2870 = uStack_29f0;
      uStack_29e8 = auVar19._24_8_;
      uStack_2868 = uStack_29e8;
      local_28a0 = local_2a80._0_8_;
      uStack_2898 = local_2a80._8_8_;
      uStack_2890 = local_2a80._16_8_;
      uStack_2888 = local_2a80._24_8_;
      local_2a20 = vsubps_avx(auVar19,local_2a80);
      local_2150 = local_2a20;
      local_2140 = ::_ps256_cephes_exp_C1;
      local_1620 = local_2a20._0_8_;
      uStack_1618 = local_2a20._8_8_;
      uStack_1610 = local_2a20._16_8_;
      uStack_1608 = local_2a20._24_8_;
      local_1640[0] = 0.6933594;
      local_1640[1] = 0.6933594;
      afStack_1638[0] = 0.6933594;
      afStack_1638[1] = 0.6933594;
      afStack_1630[0] = 0.6933594;
      afStack_1630[1] = 0.6933594;
      afStack_1628[0] = 0.6933594;
      afStack_1628[1] = 0.6933594;
      local_1660 = local_29e0._0_8_;
      uStack_1658 = local_29e0._8_8_;
      uStack_1650 = local_29e0._16_8_;
      uStack_1648 = local_29e0._24_8_;
      auVar141._8_4_ = 0.6933594;
      auVar141._12_4_ = 0.6933594;
      auVar141._0_4_ = 0.6933594;
      auVar141._4_4_ = 0.6933594;
      auVar141._16_4_ = 0.6933594;
      auVar141._20_4_ = 0.6933594;
      auVar141._24_4_ = 0.6933594;
      auVar141._28_4_ = 0.6933594;
      auVar22 = vfnmadd213ps_fma(auVar141,local_2a20,auVar17);
      local_2158 = ::_ps256_cephes_exp_C2;
      local_15c0 = local_2a20._0_8_;
      uStack_15b8 = local_2a20._8_8_;
      uStack_15b0 = local_2a20._16_8_;
      uStack_15a8 = local_2a20._24_8_;
      local_15e0[0] = -0.00021219444;
      local_15e0[1] = -0.00021219444;
      afStack_15d8[0] = -0.00021219444;
      afStack_15d8[1] = -0.00021219444;
      afStack_15d0[0] = -0.00021219444;
      afStack_15d0[1] = -0.00021219444;
      afStack_15c8[0] = -0.00021219444;
      afStack_15c8[1] = -0.00021219444;
      local_29e0._0_8_ = auVar22._0_8_;
      local_1600 = local_29e0._0_8_;
      local_29e0._8_8_ = auVar22._8_8_;
      uStack_15f8 = local_29e0._8_8_;
      uStack_15f0 = 0;
      uStack_15e8 = 0;
      auVar142._8_4_ = -0.00021219444;
      auVar142._12_4_ = -0.00021219444;
      auVar142._0_4_ = -0.00021219444;
      auVar142._4_4_ = -0.00021219444;
      auVar142._16_4_ = -0.00021219444;
      auVar142._20_4_ = -0.00021219444;
      auVar142._24_4_ = -0.00021219444;
      auVar142._28_4_ = -0.00021219444;
      auVar22 = vfnmadd213ps_fma(auVar142,local_2a20,ZEXT1632(auVar22));
      auVar219 = ZEXT1632(auVar22);
      local_29e0._0_8_ = auVar22._0_8_;
      local_2980 = local_29e0._0_8_;
      local_29e0._8_8_ = auVar22._8_8_;
      uStack_2978 = local_29e0._8_8_;
      uStack_2970 = 0;
      uStack_2968 = 0;
      local_2960._0_4_ = auVar22._0_4_;
      local_2960._4_4_ = auVar22._4_4_;
      uStack_2958._0_4_ = auVar22._8_4_;
      uStack_2958._4_4_ = auVar22._12_4_;
      local_2a00._4_4_ = local_2960._4_4_ * local_2960._4_4_;
      local_2a00._0_4_ = (float)local_2960 * (float)local_2960;
      local_17c0 = local_2a00;
      uStack_29f8._0_4_ = (float)uStack_2958 * (float)uStack_2958;
      uStack_29f8._4_4_ = uStack_2958._4_4_ * uStack_2958._4_4_;
      auVar16 = _local_2a00;
      _local_2a00 = ZEXT1632(_local_2a00);
      auVar104 = _local_2a00;
      uStack_2a98._0_4_ = 0x39506967;
      local_2aa0 = (undefined1  [8])0x3950696739506967;
      uStack_2a98._4_4_ = 0x39506967;
      uStack_2a90._0_4_ = 0x39506967;
      uStack_2a90._4_4_ = 0x39506967;
      auVar207 = _local_2aa0;
      uStack_2a88._0_4_ = 0x39506967;
      uStack_2a88._4_4_ = 0x39506967;
      auVar18 = _local_2aa0;
      local_2390 = local_2aa0;
      local_2328 = ::_ps256_cephes_exp_p1;
      local_1980 = 0x3950696739506967;
      uStack_1978 = uStack_2a98;
      uStack_2a90 = auVar207._16_8_;
      uStack_1970 = uStack_2a90;
      uStack_2a88 = auVar18._24_8_;
      uStack_1968 = uStack_2a88;
      local_19a0 = local_29e0._0_8_;
      uStack_1998 = local_29e0._8_8_;
      uStack_1990 = 0;
      uStack_1988 = 0;
      local_19c0[0] = 0.0013981999;
      local_19c0[1] = 0.0013981999;
      afStack_19b8[0] = 0.0013981999;
      afStack_19b8[1] = 0.0013981999;
      afStack_19b0[0] = 0.0013981999;
      afStack_19b0[1] = 0.0013981999;
      afStack_19a8[0] = 0.0013981999;
      afStack_19a8[1] = 0.0013981999;
      auVar133._8_4_ = 0.0013981999;
      auVar133._12_4_ = 0.0013981999;
      auVar133._0_4_ = 0.0013981999;
      auVar133._4_4_ = 0.0013981999;
      auVar133._16_4_ = 0.0013981999;
      auVar133._20_4_ = 0.0013981999;
      auVar133._24_4_ = 0.0013981999;
      auVar133._28_4_ = 0.0013981999;
      auVar22 = vfmadd213ps_fma(auVar219,auVar18,auVar133);
      local_2340 = ::_ps256_cephes_exp_p2;
      local_2aa0 = auVar22._0_8_;
      local_1920 = local_2aa0;
      uStack_2a98 = auVar22._8_8_;
      uStack_1918 = uStack_2a98;
      uStack_1910 = 0;
      uStack_1908 = 0;
      local_1940 = local_29e0._0_8_;
      uStack_1938 = local_29e0._8_8_;
      uStack_1930 = 0;
      uStack_1928 = 0;
      local_1960[0] = 0.008333452;
      local_1960[1] = 0.008333452;
      afStack_1958[0] = 0.008333452;
      afStack_1958[1] = 0.008333452;
      afStack_1950[0] = 0.008333452;
      afStack_1950[1] = 0.008333452;
      afStack_1948[0] = 0.008333452;
      afStack_1948[1] = 0.008333452;
      auVar134._8_4_ = 0.008333452;
      auVar134._12_4_ = 0.008333452;
      auVar134._0_4_ = 0.008333452;
      auVar134._4_4_ = 0.008333452;
      auVar134._16_4_ = 0.008333452;
      auVar134._20_4_ = 0.008333452;
      auVar134._24_4_ = 0.008333452;
      auVar134._28_4_ = 0.008333452;
      auVar22 = vfmadd213ps_fma(auVar219,ZEXT1632(auVar22),auVar134);
      local_2358 = ::_ps256_cephes_exp_p3;
      local_2aa0 = auVar22._0_8_;
      local_18c0 = local_2aa0;
      uStack_2a98 = auVar22._8_8_;
      uStack_18b8 = uStack_2a98;
      uStack_18b0 = 0;
      uStack_18a8 = 0;
      local_18e0 = local_29e0._0_8_;
      uStack_18d8 = local_29e0._8_8_;
      uStack_18d0 = 0;
      uStack_18c8 = 0;
      local_1900[0] = 0.041665796;
      local_1900[1] = 0.041665796;
      afStack_18f8[0] = 0.041665796;
      afStack_18f8[1] = 0.041665796;
      afStack_18f0[0] = 0.041665796;
      afStack_18f0[1] = 0.041665796;
      afStack_18e8[0] = 0.041665796;
      afStack_18e8[1] = 0.041665796;
      auVar135._8_4_ = 0.041665796;
      auVar135._12_4_ = 0.041665796;
      auVar135._0_4_ = 0.041665796;
      auVar135._4_4_ = 0.041665796;
      auVar135._16_4_ = 0.041665796;
      auVar135._20_4_ = 0.041665796;
      auVar135._24_4_ = 0.041665796;
      auVar135._28_4_ = 0.041665796;
      auVar22 = vfmadd213ps_fma(auVar219,ZEXT1632(auVar22),auVar135);
      local_2370 = ::_ps256_cephes_exp_p4;
      local_2aa0 = auVar22._0_8_;
      local_1860 = local_2aa0;
      uStack_2a98 = auVar22._8_8_;
      uStack_1858 = uStack_2a98;
      uStack_1850 = 0;
      uStack_1848 = 0;
      local_1880 = local_29e0._0_8_;
      uStack_1878 = local_29e0._8_8_;
      uStack_1870 = 0;
      uStack_1868 = 0;
      local_18a0[0] = 0.16666666;
      local_18a0[1] = 0.16666666;
      afStack_1898[0] = 0.16666666;
      afStack_1898[1] = 0.16666666;
      afStack_1890[0] = 0.16666666;
      afStack_1890[1] = 0.16666666;
      afStack_1888[0] = 0.16666666;
      afStack_1888[1] = 0.16666666;
      auVar136._8_4_ = 0.16666666;
      auVar136._12_4_ = 0.16666666;
      auVar136._0_4_ = 0.16666666;
      auVar136._4_4_ = 0.16666666;
      auVar136._16_4_ = 0.16666666;
      auVar136._20_4_ = 0.16666666;
      auVar136._24_4_ = 0.16666666;
      auVar136._28_4_ = 0.16666666;
      auVar22 = vfmadd213ps_fma(auVar219,ZEXT1632(auVar22),auVar136);
      local_2388 = ::_ps256_cephes_exp_p5;
      local_2aa0 = auVar22._0_8_;
      local_1800 = local_2aa0;
      uStack_2a98 = auVar22._8_8_;
      uStack_17f8 = uStack_2a98;
      uStack_17f0 = 0;
      uStack_17e8 = 0;
      local_1820 = local_29e0._0_8_;
      uStack_1818 = local_29e0._8_8_;
      uStack_1810 = 0;
      uStack_1808 = 0;
      local_1840[0] = 0.5;
      local_1840[1] = 0.5;
      afStack_1838[0] = 0.5;
      afStack_1838[1] = 0.5;
      afStack_1830[0] = 0.5;
      afStack_1830[1] = 0.5;
      afStack_1828[0] = 0.5;
      afStack_1828[1] = 0.5;
      auVar137._8_4_ = 0.5;
      auVar137._12_4_ = 0.5;
      auVar137._0_4_ = 0.5;
      auVar137._4_4_ = 0.5;
      auVar137._16_4_ = 0.5;
      auVar137._20_4_ = 0.5;
      auVar137._24_4_ = 0.5;
      auVar137._28_4_ = 0.5;
      auVar22 = vfmadd213ps_fma(auVar219,ZEXT1632(auVar22),auVar137);
      local_2398 = local_2a00;
      local_2aa0 = auVar22._0_8_;
      local_17a0 = local_2aa0;
      uStack_2a98 = auVar22._8_8_;
      uStack_1798 = uStack_2a98;
      uStack_1790 = 0;
      uStack_1788 = 0;
      uStack_29f8 = auVar16._8_8_;
      uStack_17b8 = uStack_29f8;
      uStack_17b0 = 0;
      uStack_17a8 = 0;
      local_17e0 = local_29e0._0_8_;
      uStack_17d8 = local_29e0._8_8_;
      uStack_17d0 = 0;
      uStack_17c8 = 0;
      auVar22 = vfmadd213ps_fma(auVar104,ZEXT1632(auVar22),auVar219);
      local_2aa0 = auVar22._0_8_;
      uVar37 = local_2aa0;
      uStack_2a98 = auVar22._8_8_;
      uVar38 = uStack_2a98;
      uStack_2910 = 0;
      uStack_2908 = 0;
      local_2940 = 0x3f8000003f800000;
      uStack_2938 = 0x3f8000003f800000;
      uStack_2930 = 0x3f8000003f800000;
      uStack_2928 = 0x3f8000003f800000;
      local_2920._0_4_ = auVar22._0_4_;
      local_2920._4_4_ = auVar22._4_4_;
      uStack_2918._0_4_ = auVar22._8_4_;
      uStack_2918._4_4_ = auVar22._12_4_;
      local_2aa0._4_4_ = local_2920._4_4_ + 1.0;
      local_2aa0._0_4_ = (float)local_2920 + 1.0;
      uStack_2a98._0_4_ = (float)uStack_2918 + 1.0;
      uStack_2a98._4_4_ = uStack_2918._4_4_ + 1.0;
      uStack_2a90._0_4_ = 0x3f800000;
      uStack_2a90._4_4_ = 0x3f800000;
      auVar207 = _local_2aa0;
      uStack_2a88._0_4_ = 0x3f800000;
      uStack_2a88._4_4_ = 0x3f800000;
      auVar17 = _local_2aa0;
      local_1520._0_4_ = local_2a20._0_4_;
      local_1520._4_4_ = local_2a20._4_4_;
      uStack_1518._0_4_ = local_2a20._8_4_;
      uStack_1518._4_4_ = local_2a20._12_4_;
      uStack_1510._0_4_ = local_2a20._16_4_;
      uStack_1510._4_4_ = local_2a20._20_4_;
      uStack_1508._0_4_ = local_2a20._24_4_;
      uStack_1508._4_4_ = local_2a20._28_4_;
      local_2a40._4_4_ = (int)local_1520._4_4_;
      local_2a40._0_4_ = (int)(float)local_1520;
      local_2a40._8_4_ = (int)(float)uStack_1518;
      local_2a40._12_4_ = (int)uStack_1518._4_4_;
      local_2a40._16_4_ = (int)(float)uStack_1510;
      local_2a40._20_4_ = (int)uStack_1510._4_4_;
      auVar211 = local_2a40._0_24_;
      local_2a40._24_4_ = (int)(float)uStack_1508;
      local_2a40._28_4_ = (int)uStack_1508._4_4_;
      auVar18 = local_2a40;
      local_14c0 = local_2a40._0_8_;
      uStack_14b8 = local_2a40._8_8_;
      local_2a40._16_8_ = auVar211._16_8_;
      uStack_14b0 = local_2a40._16_8_;
      local_2a40._24_8_ = auVar18._24_8_;
      uStack_14a8 = local_2a40._24_8_;
      local_14e0 = 0x7f0000007f;
      uStack_14d8 = 0x7f0000007f;
      uStack_14d0 = 0x7f0000007f;
      uStack_14c8 = 0x7f0000007f;
      local_1340 = local_2a40._0_8_;
      uStack_1338 = local_2a40._8_8_;
      uStack_1330 = local_2a40._16_8_;
      uStack_1328 = local_2a40._24_8_;
      local_1360 = 0x7f0000007f;
      uStack_1358 = 0x7f0000007f;
      uStack_1350 = 0x7f0000007f;
      uStack_1348 = 0x7f0000007f;
      auVar148._16_8_ = local_2a40._16_8_;
      auVar148._0_16_ = local_2a40._0_16_;
      auVar148._24_8_ = local_2a40._24_8_;
      auVar147._8_8_ = 0x7f0000007f;
      auVar147._0_8_ = 0x7f0000007f;
      auVar147._16_8_ = 0x7f0000007f;
      auVar147._24_8_ = 0x7f0000007f;
      auVar18 = vpaddd_avx2(auVar148,auVar147);
      local_2a40._0_8_ = auVar18._0_8_;
      local_1440 = local_2a40._0_8_;
      local_2a40._8_8_ = auVar18._8_8_;
      uStack_1438 = local_2a40._8_8_;
      local_2a40._16_8_ = auVar18._16_8_;
      uStack_1430 = local_2a40._16_8_;
      local_2a40._24_8_ = auVar18._24_8_;
      uStack_1428 = local_2a40._24_8_;
      local_1444 = 0x17;
      local_12c0 = local_2a40._0_8_;
      uStack_12b8 = local_2a40._8_8_;
      uStack_12b0 = local_2a40._16_8_;
      uStack_12a8 = local_2a40._24_8_;
      local_12c4 = 0x17;
      local_2a40 = vpslld_avx2(auVar18,ZEXT416(0x17));
      local_13e0 = local_2a40._0_8_;
      uStack_13d8 = local_2a40._8_8_;
      uStack_13d0 = local_2a40._16_8_;
      uStack_13c8 = local_2a40._24_8_;
      local_2ac0 = local_2a40._0_8_;
      uStack_2ab8 = local_2a40._8_8_;
      uStack_2ab0 = local_2a40._16_8_;
      uStack_2aa8 = local_2a40._24_8_;
      local_29a0 = local_2aa0;
      uStack_2998 = uStack_2a98;
      uStack_2a90 = auVar207._16_8_;
      uStack_2990 = uStack_2a90;
      uStack_2a88 = auVar17._24_8_;
      uStack_2988 = uStack_2a88;
      local_29c0._0_4_ = local_2a40._0_4_;
      local_29c0._4_4_ = local_2a40._4_4_;
      uStack_29b8._0_4_ = local_2a40._8_4_;
      uStack_29b8._4_4_ = local_2a40._12_4_;
      uStack_29b0._0_4_ = local_2a40._16_4_;
      uStack_29b0._4_4_ = local_2a40._20_4_;
      uStack_29a8._0_4_ = local_2a40._24_4_;
      local_2aa0._0_4_ = ((float)local_2920 + 1.0) * (float)local_29c0;
      local_2aa0._4_4_ = (local_2920._4_4_ + 1.0) * local_29c0._4_4_;
      uStack_29b8._0_4_ = ((float)uStack_2918 + 1.0) * (float)uStack_29b8;
      uStack_29b8._4_4_ = (uStack_2918._4_4_ + 1.0) * uStack_29b8._4_4_;
      uStack_2a98._0_4_ = (float)uStack_29b8;
      uStack_2a98._4_4_ = uStack_29b8._4_4_;
      uStack_2a90._0_4_ = (float)uStack_29b0 * 1.0;
      uStack_2a90._4_4_ = uStack_29b0._4_4_ * 1.0;
      auVar207 = _local_2aa0;
      uStack_2a88._0_4_ = (float)uStack_29a8 * 1.0;
      uStack_2a88._4_4_ = 0x3f800000;
      auVar103 = _local_2aa0;
      local_2b00 = local_2aa0;
      uStack_2af8 = uStack_2a98;
      uStack_2a90 = auVar207._16_8_;
      uStack_2af0 = uStack_2a90;
      uStack_2a88 = auVar103._24_8_;
      uStack_2ae8 = uStack_2a88;
      local_2ae0._0_4_ = local_12a0._0_4_;
      local_2ae0._4_4_ = local_12a0._4_4_;
      uStack_2ad8._0_4_ = local_12a0._8_4_;
      uStack_2ad8._4_4_ = local_12a0._12_4_;
      uStack_2ad0._0_4_ = auStack_1290._0_4_;
      uStack_2ad0._4_4_ = auStack_1290._4_4_;
      uStack_2ac8._0_4_ = auStack_1290._8_4_;
      uStack_2ac8._4_4_ = auStack_1290._12_4_;
      local_28e0 = (float)local_2ae0 + (float)local_2aa0._0_4_;
      fStack_28dc = local_2ae0._4_4_ + (float)local_2aa0._4_4_;
      fStack_28d8 = (float)uStack_2ad8 + (float)uStack_29b8;
      fStack_28d4 = uStack_2ad8._4_4_ + uStack_29b8._4_4_;
      fStack_28d0 = (float)uStack_2ad0 + (float)uStack_29b0 * 1.0;
      fStack_28cc = uStack_2ad0._4_4_ + uStack_29b0._4_4_ * 1.0;
      fStack_28c8 = (float)uStack_2ac8 + (float)uStack_29a8 * 1.0;
      fStack_28c4 = uStack_2ac8._4_4_ + 1.0;
      auVar102._16_8_ = auStack_1290._0_8_;
      auVar102._0_16_ = local_12a0;
      auVar102._24_8_ = auStack_1290._8_8_;
      auVar101._4_4_ = fStack_28dc;
      auVar101._0_4_ = local_28e0;
      auVar101._8_4_ = fStack_28d8;
      auVar101._12_4_ = fStack_28d4;
      auVar101._16_4_ = fStack_28d0;
      auVar101._20_4_ = fStack_28cc;
      auVar101._24_4_ = fStack_28c8;
      auVar101._28_4_ = fStack_28c4;
      local_2b60 = vdivps_avx(auVar102,auVar101);
      local_2b80 = local_11e0._0_8_;
      uStack_2b78 = local_11e0._8_8_;
      uStack_2b70 = auStack_11d0._0_8_;
      uStack_2b68 = auStack_11d0._8_8_;
      local_2ba0 = local_1220._0_8_;
      uStack_2b98 = local_1220._8_8_;
      uStack_2b90 = auStack_1210._0_8_;
      uStack_2b88 = auStack_1210._8_8_;
      auVar19._16_8_ = auStack_11d0._0_8_;
      auVar19._0_16_ = local_11e0;
      auVar19._24_8_ = auStack_11d0._8_8_;
      auVar17._16_8_ = auStack_1210._0_8_;
      auVar17._0_16_ = local_1220;
      auVar17._24_8_ = auStack_1210._8_8_;
      auVar220._8_4_ = 0x80000000;
      auVar220._0_8_ = 0x8000000080000000;
      auVar220._12_4_ = 0x80000000;
      auVar220._16_4_ = 0x80000000;
      auVar220._20_4_ = 0x80000000;
      auVar220._24_4_ = 0x80000000;
      auVar220._28_4_ = 0x80000000;
      auVar22 = vfmadd213ps_fma(auVar19,local_2b60,auVar17 ^ auVar220);
      local_3120._0_4_ = auVar200._0_4_;
      local_3120._4_4_ = auVar200._4_4_;
      fStack_3118 = auVar200._8_4_;
      fStack_3114 = auVar200._12_4_;
      fStack_3110 = auVar200._16_4_;
      fStack_310c = auVar200._20_4_;
      fStack_3108 = (float)uStack_6bc8;
      uStack_3104 = (undefined4)((ulong)uStack_6bc8 >> 0x20);
      local_3140._0_4_ = auVar22._0_4_;
      local_3140._4_4_ = auVar22._4_4_;
      fStack_3138 = auVar22._8_4_;
      fStack_3134 = auVar22._12_4_;
      local_6de0 = CONCAT44((float)local_3120._4_4_ * (float)local_3140._4_4_,
                            (float)local_3120._0_4_ * (float)local_3140._0_4_);
      uStack_6dd8 = CONCAT44(fStack_3114 * fStack_3134,fStack_3118 * fStack_3138);
      uStack_6dd0 = CONCAT44(fStack_310c * 0.0,fStack_3110 * 0.0);
      uStack_6dc8 = CONCAT44(uStack_3104,fStack_3108 * 0.0);
      local_6b90 = local_6d00;
      local_6bc0 = local_6de0;
      uStack_6bb8 = uStack_6dd8;
      uStack_6bb0 = uStack_6dd0;
      uStack_6ba8 = uStack_6dc8;
      auVar18._8_8_ = uStack_6dd8;
      auVar18._0_8_ = local_6de0;
      auVar18._16_8_ = uStack_6dd0;
      auVar18._24_8_ = uStack_6dc8;
      *(undefined1 (*) [32])*local_6d00 = auVar18;
      local_6d00 = (undefined1 (*) [64])(*local_6d00 + 0x20);
      _local_3140 = ZEXT1632(auVar22);
      _local_3120 = auVar201;
      local_30a0 = local_11e0._0_8_;
      uStack_3098 = local_11e0._8_8_;
      uStack_3090 = auStack_11d0._0_8_;
      uStack_3088 = auStack_11d0._8_8_;
      local_3080 = local_3060;
      uStack_3078 = uStack_3058;
      uStack_3070 = uStack_3050;
      uStack_3068 = uStack_3048;
      _local_2f60 = ZEXT1632(auVar23);
      local_2ee0 = uVar33;
      uStack_2ed8 = uVar34;
      local_2ea0 = local_2ec0;
      uStack_2e98 = uStack_2eb8;
      uStack_2e90 = uStack_2eb0;
      uStack_2e88 = uStack_2ea8;
      local_2e80 = uVar35;
      uStack_2e78 = uVar36;
      local_2e40 = local_3020._0_8_;
      uStack_2e38 = local_3020._8_8_;
      uStack_2e30 = local_3020._16_8_;
      uStack_2e28 = local_3020._24_8_;
      local_2e20 = uVar29;
      uStack_2e18 = uVar30;
      uStack_2e10 = uVar31;
      uStack_2e08 = uVar32;
      local_2de0 = uVar25;
      uStack_2dd8 = uVar26;
      uStack_2dd0 = uVar27;
      uStack_2dc8 = uVar28;
      local_2dc0 = local_1260._0_8_;
      uStack_2db8 = local_1260._8_8_;
      uStack_2db0 = auStack_1250._0_8_;
      uStack_2da8 = auStack_1250._8_8_;
      _local_2d60 = auVar106;
      _local_2cc0 = auVar110;
      local_2ca0 = auVar216;
      local_2c80 = local_2d00._0_8_;
      uStack_2c78 = local_2d00._8_8_;
      uStack_2c70 = local_2d00._16_8_;
      uStack_2c68 = local_2d00._24_8_;
      local_2c20 = local_2c40;
      uStack_2c18 = uStack_2c38;
      uStack_2c10 = uStack_2c30;
      uStack_2c08 = uStack_2c28;
      local_2be0 = uVar20;
      uStack_2bd8 = uVar24;
      local_2ae0 = local_28c0;
      uStack_2ad8 = uStack_28b8;
      uStack_2ad0 = uStack_28b0;
      uStack_2ac8 = uStack_28a8;
      _local_2aa0 = auVar103;
      _local_2a00 = auVar104;
      local_29e0 = auVar219;
      local_29c0 = local_2a40._0_8_;
      uStack_29b8 = local_2a40._8_8_;
      uStack_29b0 = local_2a40._16_8_;
      uStack_29a8 = local_2a40._24_8_;
      local_2960 = local_2980;
      uStack_2958 = uStack_2978;
      uStack_2950 = uStack_2970;
      uStack_2948 = uStack_2968;
      local_2920 = uVar37;
      uStack_2918 = uVar38;
      local_2380 = local_23a0;
      local_2378 = local_2390;
      local_2368 = local_23a0;
      local_2360 = local_2390;
      local_2350 = local_23a0;
      local_2348 = local_2390;
      local_2338 = local_23a0;
      local_2330 = local_2390;
      local_2320 = local_23a0;
      local_2318 = local_2390;
      local_2300 = local_23a0;
      local_22d8 = local_22f8;
      local_22d0 = local_22e8;
      local_22c0 = local_22f8;
      local_22b8 = local_22e8;
      local_22a8 = local_22f8;
      local_22a0 = local_22e8;
      local_2290 = local_22f8;
      local_2288 = local_22e8;
      local_2278 = local_22f8;
      local_2270 = local_22e8;
      local_2258 = local_22f8;
      local_2228 = local_2240;
      local_2218 = local_2250;
      local_2210 = local_2238;
      local_2200 = local_2250;
      local_21f8 = local_2238;
      local_21e8 = local_2250;
      local_21e0 = local_2238;
      local_21d0 = local_2250;
      local_21c8 = local_2238;
      local_21b8 = local_2250;
      local_21b0 = local_2238;
      local_21a0 = local_2250;
      local_2198 = local_2238;
      local_2188 = local_2250;
      local_2180 = local_2238;
      local_2170 = local_2250;
      local_2168 = local_2238;
      local_2160 = local_23a0;
      local_2148 = local_23a0;
      local_2138 = local_2150;
      local_2130 = local_22f8;
      local_2118 = local_22f8;
      local_2108 = local_2120;
      local_2100 = local_2238;
      uStack_1528 = uStack_6bc8;
      local_1520 = local_2a20._0_8_;
      uStack_1518 = local_2a20._8_8_;
      uStack_1510 = local_2a20._16_8_;
      uStack_1508 = local_2a20._24_8_;
      local_1500 = local_2ce0._0_8_;
      uStack_14f8 = local_2ce0._8_8_;
      uStack_14f0 = local_2ce0._16_8_;
      uStack_14e8 = local_2ce0._24_8_;
      local_127c = local_1280;
      local_1278 = local_1280;
      local_1274 = local_1280;
      local_1270 = local_1280;
      local_126c = local_1280;
      local_1268 = local_1280;
      local_1264 = local_1280;
      local_123c = local_1240;
      local_1238 = local_1240;
      local_1234 = local_1240;
      local_1230 = local_1240;
      local_122c = local_1240;
      local_1228 = local_1240;
      local_1224 = local_1240;
      local_11fc = local_1200;
      local_11f8 = local_1200;
      local_11f4 = local_1200;
      local_11f0 = local_1200;
      local_11ec = local_1200;
      local_11e8 = local_1200;
      local_11e4 = local_1200;
      local_11ac = local_11b0;
      local_11a8 = local_11b0;
      local_11a4 = local_11b0;
      local_11a0 = local_11b0;
      local_119c = local_11b0;
      local_1198 = local_11b0;
      local_1194 = local_11b0;
    }
    for (; local_6af0 = local_6c98, local_6d28 = local_6b50, local_6d58 + 3 < local_6cf0;
        local_6d58 = local_6d58 + 4) {
      local_6b88 = local_6d00;
      local_6b80 = *(undefined8 *)*local_6d00;
      uStack_6b78 = *(undefined8 *)(*local_6d00 + 8);
      auVar202 = *(undefined1 (*) [16])*local_6d00;
      local_b90 = (undefined1  [16])0x0;
      local_f60 = 0x3f800000;
      uStack_f5c = 0x3f800000;
      uStack_f58 = 0x3f800000;
      uStack_f54 = 0x3f800000;
      local_1b0 = 0x42b0c0a5;
      uStack_1ac = 0x42b0c0a5;
      uStack_1a8 = 0x42b0c0a5;
      uStack_1a4 = 0x42b0c0a5;
      auVar192._8_4_ = 0x42b0c0a5;
      auVar192._0_8_ = 0x42b0c0a542b0c0a5;
      auVar192._12_4_ = 0x42b0c0a5;
      auVar22 = vminps_avx(*(undefined1 (*) [16])*local_6d00,auVar192);
      local_f20._0_8_ = auVar22._0_8_;
      local_b20 = local_f20._0_8_;
      local_f20._8_8_ = auVar22._8_8_;
      uStack_b18 = local_f20._8_8_;
      local_b30 = 0xc2b0c0a5;
      uStack_b2c = 0xc2b0c0a5;
      uStack_b28 = 0xc2b0c0a5;
      uStack_b24 = 0xc2b0c0a5;
      auVar154._8_4_ = 0xc2b0c0a5;
      auVar154._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar154._12_4_ = 0xc2b0c0a5;
      auVar16 = vmaxps_avx(auVar22,auVar154);
      local_f20._0_8_ = auVar16._0_8_;
      uVar20 = local_f20._0_8_;
      local_f20._8_8_ = auVar16._8_8_;
      uVar24 = local_f20._8_8_;
      local_ed0 = 0x3fb8aa3b;
      uStack_ecc = 0x3fb8aa3b;
      uStack_ec8 = 0x3fb8aa3b;
      uStack_ec4 = 0x3fb8aa3b;
      local_ec0._0_4_ = auVar16._0_4_;
      local_ec0._4_4_ = auVar16._4_4_;
      uStack_eb8._0_4_ = auVar16._8_4_;
      uStack_eb8._4_4_ = auVar16._12_4_;
      local_f40._4_4_ = local_ec0._4_4_ * 1.442695;
      local_f40._0_4_ = (float)local_ec0 * 1.442695;
      uStack_f38._0_4_ = (float)uStack_eb8 * 1.442695;
      uStack_f38._4_4_ = uStack_eb8._4_4_ * 1.442695;
      local_e80 = local_f40;
      uStack_e78 = uStack_f38;
      local_e90 = 0x3f000000;
      uStack_e8c = 0x3f000000;
      uStack_e88 = 0x3f000000;
      uStack_e84 = 0x3f000000;
      local_f40._0_4_ = (float)local_ec0 * 1.442695 + 0.5;
      local_f40._4_4_ = local_ec0._4_4_ * 1.442695 + 0.5;
      fVar217 = (float)uStack_eb8 * 1.442695 + 0.5;
      fVar218 = uStack_eb8._4_4_ * 1.442695 + 0.5;
      uStack_f38._0_4_ = fVar217;
      uStack_f38._4_4_ = fVar218;
      local_160 = local_f40;
      uStack_158 = uStack_f38;
      local_f50._4_4_ = (int)(float)local_f40._4_4_;
      local_f50._0_4_ = (int)(float)local_f40._0_4_;
      local_f50._8_4_ = (int)fVar217;
      local_f50._12_4_ = (int)fVar218;
      local_9b0 = local_f50._0_8_;
      uStack_9a8 = local_f50._8_8_;
      auVar164._8_8_ = local_f50._8_8_;
      auVar164._0_8_ = local_f50._0_8_;
      auVar23 = vcvtdq2ps_avx(auVar164);
      local_f30 = auVar23._0_8_;
      local_120 = local_f30;
      uStack_f28 = auVar23._8_8_;
      uStack_118 = uStack_f28;
      local_130 = local_f40;
      uStack_128 = uStack_f38;
      auVar194._8_8_ = uStack_f38;
      auVar194._0_8_ = local_f40;
      auVar22 = vcmpps_avx(auVar194,auVar23,1);
      local_f70._0_8_ = auVar22._0_8_;
      local_a90 = local_f70._0_8_;
      local_f70._8_8_ = auVar22._8_8_;
      uStack_a88 = local_f70._8_8_;
      local_aa0 = 0x3f8000003f800000;
      uStack_a98 = 0x3f8000003f800000;
      auVar158._8_8_ = 0x3f8000003f800000;
      auVar158._0_8_ = 0x3f8000003f800000;
      local_f70 = vpand_avx(auVar22,auVar158);
      local_e00 = local_f30;
      uStack_df8 = uStack_f28;
      local_e10 = local_f70._0_8_;
      uStack_e08 = local_f70._8_8_;
      _local_f40 = vsubps_avx(auVar23,local_f70);
      local_718 = local_f40;
      local_708 = ::_ps_cephes_exp_C1;
      local_8d8 = local_f20;
      local_270 = local_f40;
      uStack_268 = uStack_f38;
      local_280[0] = 0.6933594;
      local_280[1] = 0.6933594;
      afStack_278[0] = 0.6933594;
      afStack_278[1] = 0.6933594;
      local_290 = local_f20._0_8_;
      uStack_288 = local_f20._8_8_;
      auVar187._8_4_ = 0.6933594;
      auVar187._12_4_ = 0.6933594;
      auVar187._0_4_ = 0.6933594;
      auVar187._4_4_ = 0.6933594;
      auVar22 = vfnmadd213ps_fma(auVar187,_local_f40,auVar16);
      local_720 = ::_ps_cephes_exp_C2;
      local_240 = local_f40;
      uStack_238 = uStack_f38;
      local_250[0] = -0.00021219444;
      local_250[1] = -0.00021219444;
      afStack_248[0] = -0.00021219444;
      afStack_248[1] = -0.00021219444;
      local_f20._0_8_ = auVar22._0_8_;
      local_260 = local_f20._0_8_;
      local_f20._8_8_ = auVar22._8_8_;
      uStack_258 = local_f20._8_8_;
      auVar188._8_4_ = -0.00021219444;
      auVar188._12_4_ = -0.00021219444;
      auVar188._0_4_ = -0.00021219444;
      auVar188._4_4_ = -0.00021219444;
      local_f20 = vfnmadd213ps_fma(auVar188,_local_f40,auVar22);
      local_ef0 = local_f20._0_8_;
      uStack_ee8 = local_f20._8_8_;
      local_ee0._0_4_ = local_f20._0_4_;
      local_ee0._4_4_ = local_f20._4_4_;
      uStack_ed8._0_4_ = local_f20._8_4_;
      uStack_ed8._4_4_ = local_f20._12_4_;
      local_f30._4_4_ = local_ee0._4_4_ * local_ee0._4_4_;
      local_f30._0_4_ = (float)local_ee0 * (float)local_ee0;
      uStack_f28._0_4_ = (float)uStack_ed8 * (float)uStack_ed8;
      uStack_f28._4_4_ = uStack_ed8._4_4_ * uStack_ed8._4_4_;
      uStack_f78._0_4_ = 0x39506967;
      local_f80 = (undefined1  [8])0x3950696739506967;
      uStack_f78._4_4_ = 0x39506967;
      local_8c8 = local_f80;
      local_860 = ::_ps_cephes_exp_p1;
      local_4e0 = 0x3950696739506967;
      uStack_4d8 = uStack_f78;
      local_4f0 = local_f20._0_8_;
      uStack_4e8 = local_f20._8_8_;
      local_500[0] = 0.0013981999;
      local_500[1] = 0.0013981999;
      afStack_4f8[0] = 0.0013981999;
      afStack_4f8[1] = 0.0013981999;
      auVar176._8_4_ = 0.0013981999;
      auVar176._12_4_ = 0.0013981999;
      auVar176._0_4_ = 0.0013981999;
      auVar176._4_4_ = 0.0013981999;
      auVar22 = vfmadd213ps_fma(local_f20,_local_f80,auVar176);
      local_878 = ::_ps_cephes_exp_p2;
      local_f80 = auVar22._0_8_;
      local_4b0 = local_f80;
      uStack_f78 = auVar22._8_8_;
      uStack_4a8 = uStack_f78;
      local_4c0 = local_f20._0_8_;
      uStack_4b8 = local_f20._8_8_;
      local_4d0[0] = 0.008333452;
      local_4d0[1] = 0.008333452;
      afStack_4c8[0] = 0.008333452;
      afStack_4c8[1] = 0.008333452;
      auVar177._8_4_ = 0.008333452;
      auVar177._12_4_ = 0.008333452;
      auVar177._0_4_ = 0.008333452;
      auVar177._4_4_ = 0.008333452;
      auVar22 = vfmadd213ps_fma(local_f20,auVar22,auVar177);
      local_890 = ::_ps_cephes_exp_p3;
      local_f80 = auVar22._0_8_;
      local_480 = local_f80;
      uStack_f78 = auVar22._8_8_;
      uStack_478 = uStack_f78;
      local_490 = local_f20._0_8_;
      uStack_488 = local_f20._8_8_;
      local_4a0[0] = 0.041665796;
      local_4a0[1] = 0.041665796;
      afStack_498[0] = 0.041665796;
      afStack_498[1] = 0.041665796;
      auVar178._8_4_ = 0.041665796;
      auVar178._12_4_ = 0.041665796;
      auVar178._0_4_ = 0.041665796;
      auVar178._4_4_ = 0.041665796;
      auVar22 = vfmadd213ps_fma(local_f20,auVar22,auVar178);
      local_8a8 = ::_ps_cephes_exp_p4;
      local_f80 = auVar22._0_8_;
      local_450 = local_f80;
      uStack_f78 = auVar22._8_8_;
      uStack_448 = uStack_f78;
      local_460 = local_f20._0_8_;
      uStack_458 = local_f20._8_8_;
      local_470[0] = 0.16666666;
      local_470[1] = 0.16666666;
      afStack_468[0] = 0.16666666;
      afStack_468[1] = 0.16666666;
      auVar179._8_4_ = 0.16666666;
      auVar179._12_4_ = 0.16666666;
      auVar179._0_4_ = 0.16666666;
      auVar179._4_4_ = 0.16666666;
      auVar22 = vfmadd213ps_fma(local_f20,auVar22,auVar179);
      local_8c0 = ::_ps_cephes_exp_p5;
      local_f80 = auVar22._0_8_;
      local_420 = local_f80;
      uStack_f78 = auVar22._8_8_;
      uStack_418 = uStack_f78;
      local_430 = local_f20._0_8_;
      uStack_428 = local_f20._8_8_;
      local_440[0] = 0.5;
      local_440[1] = 0.5;
      afStack_438[0] = 0.5;
      afStack_438[1] = 0.5;
      auVar180._8_4_ = 0.5;
      auVar180._12_4_ = 0.5;
      auVar180._0_4_ = 0.5;
      auVar180._4_4_ = 0.5;
      auVar22 = vfmadd213ps_fma(local_f20,auVar22,auVar180);
      local_8d0 = local_f30;
      local_f80 = auVar22._0_8_;
      local_3f0 = local_f80;
      uStack_f78 = auVar22._8_8_;
      uStack_3e8 = uStack_f78;
      local_400 = local_f30;
      uStack_3f8 = uStack_f28;
      local_410 = local_f20._0_8_;
      uStack_408 = local_f20._8_8_;
      auVar22 = vfmadd213ps_fma(_local_f30,auVar22,local_f20);
      local_f80 = auVar22._0_8_;
      uVar25 = local_f80;
      uStack_f78 = auVar22._8_8_;
      uVar26 = uStack_f78;
      local_eb0 = 0x3f8000003f800000;
      uStack_ea8 = 0x3f8000003f800000;
      local_ea0._0_4_ = auVar22._0_4_;
      local_ea0._4_4_ = auVar22._4_4_;
      uStack_e98._0_4_ = auVar22._8_4_;
      uStack_e98._4_4_ = auVar22._12_4_;
      local_f80._4_4_ = local_ea0._4_4_ + 1.0;
      local_f80._0_4_ = (float)local_ea0 + 1.0;
      uStack_f78._0_4_ = (float)uStack_e98 + 1.0;
      uStack_f78._4_4_ = uStack_e98._4_4_ + 1.0;
      local_170._0_4_ = local_f40._0_4_;
      local_170._4_4_ = local_f40._4_4_;
      uStack_168._0_4_ = local_f40._8_4_;
      uStack_168._4_4_ = local_f40._12_4_;
      local_f50._4_4_ = (int)local_170._4_4_;
      local_f50._0_4_ = (int)(float)local_170;
      local_f50._8_4_ = (int)(float)uStack_168;
      local_f50._12_4_ = (int)uStack_168._4_4_;
      local_e0 = local_f50._0_8_;
      uStack_d8 = local_f50._8_8_;
      local_f0 = 0x7f0000007f;
      uStack_e8 = 0x7f0000007f;
      auVar198._8_8_ = local_f50._8_8_;
      auVar198._0_8_ = local_f50._0_8_;
      auVar197._8_8_ = 0x7f0000007f;
      auVar197._0_8_ = 0x7f0000007f;
      auVar22 = vpaddd_avx(auVar198,auVar197);
      local_f50._0_8_ = auVar22._0_8_;
      local_a0 = local_f50._0_8_;
      local_f50._8_8_ = auVar22._8_8_;
      uStack_98 = local_f50._8_8_;
      local_a4 = 0x17;
      local_f50 = vpslld_avx(auVar22,ZEXT416(0x17));
      local_80 = local_f50._0_8_;
      uStack_78 = local_f50._8_8_;
      local_f90 = local_f50._0_8_;
      uStack_f88 = local_f50._8_8_;
      local_f00 = local_f80;
      uStack_ef8 = uStack_f78;
      local_f10._0_4_ = local_f50._0_4_;
      local_f10._4_4_ = local_f50._4_4_;
      uStack_f08._0_4_ = local_f50._8_4_;
      uStack_f08._4_4_ = local_f50._12_4_;
      local_f80._0_4_ = ((float)local_ea0 + 1.0) * (float)local_f10;
      local_f80._4_4_ = (local_ea0._4_4_ + 1.0) * local_f10._4_4_;
      uStack_f08._0_4_ = ((float)uStack_e98 + 1.0) * (float)uStack_f08;
      uStack_f08._4_4_ = (uStack_e98._4_4_ + 1.0) * uStack_f08._4_4_;
      uStack_f78._0_4_ = (float)uStack_f08;
      uStack_f78._4_4_ = uStack_f08._4_4_;
      local_fa0 = local_f80;
      uStack_f98 = uStack_f78;
      local_e14 = 0x3f800000;
      local_e30 = 0x3f800000;
      local_fb0 = 0x3f8000003f800000;
      uStack_fa8 = 0x3f8000003f800000;
      local_1080._4_4_ = (float)local_f80._4_4_ + 1.0;
      local_1080._0_4_ = (float)local_f80._0_4_ + 1.0;
      uStack_1078._0_4_ = (float)uStack_f08 + 1.0;
      uStack_1078._4_4_ = uStack_f08._4_4_ + 1.0;
      local_10a0 = 0x3f800000;
      uStack_109c = 0x3f800000;
      uStack_1098 = 0x3f800000;
      uStack_1094 = 0x3f800000;
      local_b60 = local_1080;
      uStack_b58 = uStack_1078;
      local_b80 = (undefined1  [16])0x0;
      local_b70 = 0;
      uStack_b68 = 0;
      auVar152._8_8_ = uStack_1078;
      auVar152._0_8_ = local_1080;
      local_10b0 = vcmpps_avx(auVar152,ZEXT816(0),2);
      local_b00 = local_1080;
      uStack_af8 = uStack_1078;
      local_b10 = 0x800000;
      uStack_b0c = 0x800000;
      uStack_b08 = 0x800000;
      uStack_b04 = 0x800000;
      auVar156._8_8_ = uStack_1078;
      auVar156._0_8_ = local_1080;
      auVar155._8_4_ = 0x800000;
      auVar155._0_8_ = 0x80000000800000;
      auVar155._12_4_ = 0x800000;
      auVar22 = vmaxps_avx(auVar156,auVar155);
      local_1080 = auVar22._0_8_;
      local_ad0 = local_1080;
      uStack_1078 = auVar22._8_8_;
      uStack_ac8 = uStack_1078;
      local_ae0 = local_1080;
      uStack_ad8 = uStack_1078;
      local_ae4 = 0x17;
      auVar16 = vpsrld_avx(auVar22,ZEXT416(0x17));
      local_a30 = local_1080;
      uStack_a28 = uStack_1078;
      local_a40 = 0x807fffff;
      uStack_a3c = 0x807fffff;
      uStack_a38 = 0x807fffff;
      uStack_a34 = 0x807fffff;
      auVar160._8_4_ = 0x807fffff;
      auVar160._0_8_ = 0x807fffff807fffff;
      auVar160._12_4_ = 0x807fffff;
      auVar22 = vpand_avx(auVar22,auVar160);
      local_1080 = auVar22._0_8_;
      local_9f0 = local_1080;
      uStack_1078 = auVar22._8_8_;
      uStack_9e8 = uStack_1078;
      local_a00 = 0x3f000000;
      uStack_9fc = 0x3f000000;
      uStack_9f8 = 0x3f000000;
      uStack_9f4 = 0x3f000000;
      auVar161._8_4_ = 0x3f000000;
      auVar161._0_8_ = 0x3f0000003f000000;
      auVar161._12_4_ = 0x3f000000;
      auVar23 = vpor_avx(auVar22,auVar161);
      local_1090._0_8_ = auVar16._0_8_;
      local_9d0 = local_1090._0_8_;
      local_1090._8_8_ = auVar16._8_8_;
      uStack_9c8 = local_1090._8_8_;
      local_9e0 = 0x7f0000007f;
      uStack_9d8 = 0x7f0000007f;
      auVar162._8_8_ = 0x7f0000007f;
      auVar162._0_8_ = 0x7f0000007f;
      local_1090 = vpsubd_avx(auVar16,auVar162);
      local_9a0 = local_1090._0_8_;
      uStack_998 = local_1090._8_8_;
      auVar22 = vcvtdq2ps_avx(local_1090);
      local_10c0 = auVar22._0_8_;
      uVar27 = local_10c0;
      uStack_10b8 = auVar22._8_8_;
      uVar28 = uStack_10b8;
      local_fd0 = 0x3f8000003f800000;
      uStack_fc8 = 0x3f8000003f800000;
      local_fc0._0_4_ = auVar22._0_4_;
      local_fc0._4_4_ = auVar22._4_4_;
      uStack_fb8._0_4_ = auVar22._8_4_;
      uStack_fb8._4_4_ = auVar22._12_4_;
      local_10c0._4_4_ = local_fc0._4_4_ + 1.0;
      local_10c0._0_4_ = (float)local_fc0 + 1.0;
      uStack_10b8._0_4_ = (float)uStack_fb8 + 1.0;
      uStack_10b8._4_4_ = uStack_fb8._4_4_ + 1.0;
      local_1080 = auVar23._0_8_;
      local_980 = local_1080;
      uStack_1078 = auVar23._8_8_;
      uStack_978 = uStack_1078;
      local_990 = 0x3f3504f3;
      uStack_98c = 0x3f3504f3;
      uStack_988 = 0x3f3504f3;
      uStack_984 = 0x3f3504f3;
      auVar165._8_4_ = 0x3f3504f3;
      auVar165._0_8_ = 0x3f3504f33f3504f3;
      auVar165._12_4_ = 0x3f3504f3;
      local_10d0 = vcmpps_avx(auVar23,auVar165,1);
      local_a50 = local_1080;
      uStack_a48 = uStack_1078;
      local_a60 = local_10d0._0_8_;
      uStack_a58 = local_10d0._8_8_;
      local_10e0 = vpand_avx(auVar23,local_10d0);
      local_dc0 = local_1080;
      uStack_db8 = uStack_1078;
      local_dd0 = 0x3f8000003f800000;
      uStack_dc8 = 0x3f8000003f800000;
      auVar16._8_8_ = 0x3f8000003f800000;
      auVar16._0_8_ = 0x3f8000003f800000;
      auVar22 = vsubps_avx(auVar23,auVar16);
      local_de0 = local_10c0;
      uStack_dd8 = uStack_10b8;
      local_a70 = 0x3f8000003f800000;
      uStack_a68 = 0x3f8000003f800000;
      local_a80 = local_10d0._0_8_;
      uStack_a78 = local_10d0._8_8_;
      auVar159._8_8_ = 0x3f8000003f800000;
      auVar159._0_8_ = 0x3f8000003f800000;
      local_df0 = vpand_avx(local_10d0,auVar159);
      auVar23._8_8_ = uStack_10b8;
      auVar23._0_8_ = local_10c0;
      _local_10c0 = vsubps_avx(auVar23,local_df0);
      local_1080 = auVar22._0_8_;
      uVar29 = local_1080;
      uStack_1078 = auVar22._8_8_;
      uVar30 = uStack_1078;
      local_fe0._0_4_ = auVar22._0_4_;
      local_fe0._4_4_ = auVar22._4_4_;
      uStack_fd8._0_4_ = auVar22._8_4_;
      uStack_fd8._4_4_ = auVar22._12_4_;
      local_ff0._0_4_ = local_10e0._0_4_;
      local_ff0._4_4_ = local_10e0._4_4_;
      uStack_fe8._0_4_ = local_10e0._8_4_;
      uStack_fe8._4_4_ = local_10e0._12_4_;
      local_1080._0_4_ = (float)local_fe0 + (float)local_ff0;
      local_1080._4_4_ = local_fe0._4_4_ + local_ff0._4_4_;
      uStack_fd8._0_4_ = (float)uStack_fd8 + (float)uStack_fe8;
      uStack_fd8._4_4_ = uStack_fd8._4_4_ + uStack_fe8._4_4_;
      uStack_1078._0_4_ = (float)uStack_fd8;
      uStack_1078._4_4_ = uStack_fd8._4_4_;
      local_1030 = local_1080;
      uStack_1028 = uStack_1078;
      local_10f0 = (float)local_1080._0_4_ * (float)local_1080._0_4_;
      fStack_10ec = (float)local_1080._4_4_ * (float)local_1080._4_4_;
      fStack_10e8 = (float)uStack_fd8 * (float)uStack_fd8;
      fStack_10e4 = uStack_fd8._4_4_ * uStack_fd8._4_4_;
      uStack_10f8._0_4_ = 0x3d9021bb;
      local_1100 = (undefined1  [8])0x3d9021bb3d9021bb;
      uStack_10f8._4_4_ = 0x3d9021bb;
      local_830 = local_1100;
      local_848 = local_1080;
      local_770 = ::_ps_cephes_log_p1;
      local_6c0 = 0x3d9021bb3d9021bb;
      uStack_6b8 = uStack_10f8;
      local_6d0 = local_1080;
      uStack_6c8 = uStack_1078;
      local_6e0[0] = -0.1151461;
      local_6e0[1] = -0.1151461;
      afStack_6d8[0] = -0.1151461;
      afStack_6d8[1] = -0.1151461;
      auVar166._8_4_ = -0.1151461;
      auVar166._12_4_ = -0.1151461;
      auVar166._0_4_ = -0.1151461;
      auVar166._4_4_ = -0.1151461;
      auVar22 = vfmadd213ps_fma(_local_1080,_local_1100,auVar166);
      local_788 = ::_ps_cephes_log_p2;
      local_1100 = auVar22._0_8_;
      local_690 = local_1100;
      uStack_10f8 = auVar22._8_8_;
      uStack_688 = uStack_10f8;
      local_6a0 = local_1080;
      uStack_698 = uStack_1078;
      local_6b0[0] = 0.116769984;
      local_6b0[1] = 0.116769984;
      afStack_6a8[0] = 0.116769984;
      afStack_6a8[1] = 0.116769984;
      auVar167._8_4_ = 0.116769984;
      auVar167._12_4_ = 0.116769984;
      auVar167._0_4_ = 0.116769984;
      auVar167._4_4_ = 0.116769984;
      auVar22 = vfmadd213ps_fma(_local_1080,auVar22,auVar167);
      local_7a0 = ::_ps_cephes_log_p3;
      local_1100 = auVar22._0_8_;
      local_660 = local_1100;
      uStack_10f8 = auVar22._8_8_;
      uStack_658 = uStack_10f8;
      local_670 = local_1080;
      uStack_668 = uStack_1078;
      local_680[0] = -0.12420141;
      local_680[1] = -0.12420141;
      afStack_678[0] = -0.12420141;
      afStack_678[1] = -0.12420141;
      auVar168._8_4_ = -0.12420141;
      auVar168._12_4_ = -0.12420141;
      auVar168._0_4_ = -0.12420141;
      auVar168._4_4_ = -0.12420141;
      auVar22 = vfmadd213ps_fma(_local_1080,auVar22,auVar168);
      local_7b8 = ::_ps_cephes_log_p4;
      local_1100 = auVar22._0_8_;
      local_630 = local_1100;
      uStack_10f8 = auVar22._8_8_;
      uStack_628 = uStack_10f8;
      local_640 = local_1080;
      uStack_638 = uStack_1078;
      local_650[0] = 0.14249323;
      local_650[1] = 0.14249323;
      afStack_648[0] = 0.14249323;
      afStack_648[1] = 0.14249323;
      auVar169._8_4_ = 0.14249323;
      auVar169._12_4_ = 0.14249323;
      auVar169._0_4_ = 0.14249323;
      auVar169._4_4_ = 0.14249323;
      auVar22 = vfmadd213ps_fma(_local_1080,auVar22,auVar169);
      local_7d0 = ::_ps_cephes_log_p5;
      local_1100 = auVar22._0_8_;
      local_600 = local_1100;
      uStack_10f8 = auVar22._8_8_;
      uStack_5f8 = uStack_10f8;
      local_610 = local_1080;
      uStack_608 = uStack_1078;
      local_620[0] = -0.16668057;
      local_620[1] = -0.16668057;
      afStack_618[0] = -0.16668057;
      afStack_618[1] = -0.16668057;
      auVar170._8_4_ = -0.16668057;
      auVar170._12_4_ = -0.16668057;
      auVar170._0_4_ = -0.16668057;
      auVar170._4_4_ = -0.16668057;
      auVar22 = vfmadd213ps_fma(_local_1080,auVar22,auVar170);
      local_7e8 = ::_ps_cephes_log_p6;
      local_1100 = auVar22._0_8_;
      local_5d0 = local_1100;
      uStack_10f8 = auVar22._8_8_;
      uStack_5c8 = uStack_10f8;
      local_5e0 = local_1080;
      uStack_5d8 = uStack_1078;
      local_5f0[0] = 0.20000714;
      local_5f0[1] = 0.20000714;
      afStack_5e8[0] = 0.20000714;
      afStack_5e8[1] = 0.20000714;
      auVar171._8_4_ = 0.20000714;
      auVar171._12_4_ = 0.20000714;
      auVar171._0_4_ = 0.20000714;
      auVar171._4_4_ = 0.20000714;
      auVar22 = vfmadd213ps_fma(_local_1080,auVar22,auVar171);
      local_800 = ::_ps_cephes_log_p7;
      local_1100 = auVar22._0_8_;
      local_5a0 = local_1100;
      uStack_10f8 = auVar22._8_8_;
      uStack_598 = uStack_10f8;
      local_5b0 = local_1080;
      uStack_5a8 = uStack_1078;
      local_5c0[0] = -0.24999994;
      local_5c0[1] = -0.24999994;
      afStack_5b8[0] = -0.24999994;
      afStack_5b8[1] = -0.24999994;
      auVar172._8_4_ = -0.24999994;
      auVar172._12_4_ = -0.24999994;
      auVar172._0_4_ = -0.24999994;
      auVar172._4_4_ = -0.24999994;
      auVar22 = vfmadd213ps_fma(_local_1080,auVar22,auVar172);
      local_818 = ::_ps_cephes_log_p8;
      local_1100 = auVar22._0_8_;
      local_570 = local_1100;
      uStack_10f8 = auVar22._8_8_;
      uStack_568 = uStack_10f8;
      local_580 = local_1080;
      uStack_578 = uStack_1078;
      local_590[0] = 0.3333333;
      local_590[1] = 0.3333333;
      afStack_588[0] = 0.3333333;
      afStack_588[1] = 0.3333333;
      auVar173._8_4_ = 0.3333333;
      auVar173._12_4_ = 0.3333333;
      auVar173._0_4_ = 0.3333333;
      auVar173._4_4_ = 0.3333333;
      auVar22 = vfmadd213ps_fma(_local_1080,auVar22,auVar173);
      local_1100 = auVar22._0_8_;
      uVar31 = local_1100;
      uStack_10f8 = auVar22._8_8_;
      uVar32 = uStack_10f8;
      local_1050 = local_1080;
      uStack_1048 = uStack_1078;
      local_1040._0_4_ = auVar22._0_4_;
      local_1040._4_4_ = auVar22._4_4_;
      uStack_1038._0_4_ = auVar22._8_4_;
      uStack_1038._4_4_ = auVar22._12_4_;
      local_1100._4_4_ = local_1040._4_4_ * (float)local_1080._4_4_;
      local_1100._0_4_ = (float)local_1040 * (float)local_1080._0_4_;
      uStack_10f8._0_4_ = (float)uStack_1038 * (float)uStack_fd8;
      uStack_10f8._4_4_ = uStack_1038._4_4_ * uStack_fd8._4_4_;
      local_1060 = local_1100;
      uStack_1058 = uStack_10f8;
      local_1070 = CONCAT44(fStack_10ec,local_10f0);
      uStack_1068 = CONCAT44(fStack_10e4,fStack_10e8);
      local_1100._4_4_ = local_1040._4_4_ * (float)local_1080._4_4_ * fStack_10ec;
      local_1100._0_4_ = (float)local_1040 * (float)local_1080._0_4_ * local_10f0;
      uStack_10f8._0_4_ = (float)uStack_1038 * (float)uStack_fd8 * fStack_10e8;
      uStack_10f8._4_4_ = uStack_1038._4_4_ * uStack_fd8._4_4_ * fStack_10e4;
      local_838 = local_10c0;
      local_828 = ::_ps_cephes_log_q1;
      local_540 = local_10c0;
      uStack_538 = uStack_10b8;
      local_550[0] = -0.00021219444;
      local_550[1] = -0.00021219444;
      afStack_548[0] = -0.00021219444;
      afStack_548[1] = -0.00021219444;
      local_560 = local_1100;
      uStack_558 = uStack_10f8;
      auVar174._8_4_ = -0.00021219444;
      auVar174._12_4_ = -0.00021219444;
      auVar174._0_4_ = -0.00021219444;
      auVar174._4_4_ = -0.00021219444;
      auVar22 = vfmadd213ps_fma(auVar174,_local_10c0,_local_1100);
      local_6e8 = &local_10f0;
      local_6f0 = ::_ps_0p5;
      local_2a0 = CONCAT44(fStack_10ec,local_10f0);
      uStack_298 = CONCAT44(fStack_10e4,fStack_10e8);
      auVar204._4_4_ = fStack_10ec;
      auVar204._0_4_ = local_10f0;
      auVar204._8_4_ = fStack_10e8;
      auVar204._12_4_ = fStack_10e4;
      local_2b0[0] = 0.5;
      local_2b0[1] = 0.5;
      afStack_2a8[0] = 0.5;
      afStack_2a8[1] = 0.5;
      local_1100 = auVar22._0_8_;
      local_2c0 = local_1100;
      uStack_10f8 = auVar22._8_8_;
      uStack_2b8 = uStack_10f8;
      auVar186._8_4_ = 0.5;
      auVar186._12_4_ = 0.5;
      auVar186._0_4_ = 0.5;
      auVar186._4_4_ = 0.5;
      _local_1100 = vfnmadd213ps_fma(auVar186,auVar204,auVar22);
      local_1000 = local_1080;
      uStack_ff8 = uStack_1078;
      local_1010._0_4_ = local_1100._0_4_;
      local_1010._4_4_ = local_1100._4_4_;
      uStack_1008._0_4_ = local_1100._8_4_;
      uStack_1008._4_4_ = local_1100._12_4_;
      local_1080._4_4_ = (float)local_1080._4_4_ + local_1010._4_4_;
      local_1080._0_4_ = (float)local_1080._0_4_ + (float)local_1010;
      uStack_1078._0_4_ = (float)uStack_fd8 + (float)uStack_1008;
      uStack_1078._4_4_ = uStack_fd8._4_4_ + uStack_1008._4_4_;
      local_840 = ::_ps_cephes_log_q2;
      local_510 = local_10c0;
      uStack_508 = uStack_10b8;
      local_520[0] = 0.6933594;
      local_520[1] = 0.6933594;
      afStack_518[0] = 0.6933594;
      afStack_518[1] = 0.6933594;
      local_530 = local_1080;
      uStack_528 = uStack_1078;
      auVar175._8_4_ = 0.6933594;
      auVar175._12_4_ = 0.6933594;
      auVar175._0_4_ = 0.6933594;
      auVar175._4_4_ = 0.6933594;
      auVar22 = vfmadd213ps_fma(auVar175,_local_10c0,_local_1080);
      local_1080 = auVar22._0_8_;
      local_a10 = local_1080;
      uStack_1078 = auVar22._8_8_;
      uStack_a08 = uStack_1078;
      local_a20 = local_10b0._0_8_;
      uStack_a18 = local_10b0._8_8_;
      _local_1080 = vpor_avx(auVar22,local_10b0);
      local_1150 = local_1080;
      uStack_1148 = uStack_1078;
      local_e34 = 0x3f800000;
      local_e50 = 0x3f800000;
      local_1160 = 0x3f8000003f800000;
      uStack_1158 = 0x3f8000003f800000;
      local_e54 = 0x40000000;
      local_e70 = 0x40000000;
      local_1170 = 0x4000000040000000;
      uStack_1168 = 0x4000000040000000;
      local_1110._0_4_ = local_1080._0_4_;
      local_1110._4_4_ = local_1080._4_4_;
      uStack_1108._0_4_ = local_1080._8_4_;
      uStack_1108._4_4_ = local_1080._12_4_;
      local_d80 = (float)local_1110 * 2.0;
      fStack_d7c = local_1110._4_4_ * 2.0;
      fStack_d78 = (float)uStack_1108 * 2.0;
      fStack_d74 = uStack_1108._4_4_ * 2.0;
      local_c14 = 0x3f800000;
      local_c30 = 0x3f800000;
      local_d90 = 0x3f8000003f800000;
      uStack_d88 = 0x3f8000003f800000;
      local_d60._8_8_ = 0x3f8000003f800000;
      local_d60._0_8_ = 0x3f8000003f800000;
      local_ba0 = (undefined1  [16])0x0;
      local_be0 = 0;
      uStack_bd8 = 0;
      local_bf0 = CONCAT44(fStack_d7c,local_d80);
      uStack_be8 = CONCAT44(fStack_d74,fStack_d78);
      auVar150._8_8_ = uStack_be8;
      auVar150._0_8_ = local_bf0;
      auVar22 = vsubps_avx(ZEXT816(0),auVar150);
      local_bb0 = (undefined1  [16])0x0;
      local_d20 = 0x3f800000;
      uStack_d1c = 0x3f800000;
      uStack_d18 = 0x3f800000;
      uStack_d14 = 0x3f800000;
      local_ce0._0_8_ = auVar22._0_8_;
      local_1c0 = local_ce0._0_8_;
      local_ce0._8_8_ = auVar22._8_8_;
      uStack_1b8 = local_ce0._8_8_;
      local_1d0 = 0x42b0c0a5;
      uStack_1cc = 0x42b0c0a5;
      uStack_1c8 = 0x42b0c0a5;
      uStack_1c4 = 0x42b0c0a5;
      auVar191._8_4_ = 0x42b0c0a5;
      auVar191._0_8_ = 0x42b0c0a542b0c0a5;
      auVar191._12_4_ = 0x42b0c0a5;
      auVar22 = vminps_avx(auVar22,auVar191);
      local_ce0._0_8_ = auVar22._0_8_;
      local_b40 = local_ce0._0_8_;
      local_ce0._8_8_ = auVar22._8_8_;
      uStack_b38 = local_ce0._8_8_;
      local_b50 = 0xc2b0c0a5;
      uStack_b4c = 0xc2b0c0a5;
      uStack_b48 = 0xc2b0c0a5;
      uStack_b44 = 0xc2b0c0a5;
      auVar153._8_4_ = 0xc2b0c0a5;
      auVar153._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar153._12_4_ = 0xc2b0c0a5;
      auVar16 = vmaxps_avx(auVar153,auVar22);
      local_ce0._0_8_ = auVar16._0_8_;
      uVar33 = local_ce0._0_8_;
      local_ce0._8_8_ = auVar16._8_8_;
      uVar34 = local_ce0._8_8_;
      local_c90 = 0x3fb8aa3b;
      uStack_c8c = 0x3fb8aa3b;
      uStack_c88 = 0x3fb8aa3b;
      uStack_c84 = 0x3fb8aa3b;
      local_c80._0_4_ = auVar16._0_4_;
      local_c80._4_4_ = auVar16._4_4_;
      uStack_c78._0_4_ = auVar16._8_4_;
      uStack_c78._4_4_ = auVar16._12_4_;
      local_d00._4_4_ = local_c80._4_4_ * 1.442695;
      local_d00._0_4_ = (float)local_c80 * 1.442695;
      uStack_cf8._0_4_ = (float)uStack_c78 * 1.442695;
      uStack_cf8._4_4_ = uStack_c78._4_4_ * 1.442695;
      local_c40 = local_d00;
      uStack_c38 = uStack_cf8;
      local_c50 = 0x3f000000;
      uStack_c4c = 0x3f000000;
      uStack_c48 = 0x3f000000;
      uStack_c44 = 0x3f000000;
      local_d00._0_4_ = (float)local_c80 * 1.442695 + 0.5;
      local_d00._4_4_ = local_c80._4_4_ * 1.442695 + 0.5;
      fVar217 = (float)uStack_c78 * 1.442695 + 0.5;
      fVar218 = uStack_c78._4_4_ * 1.442695 + 0.5;
      uStack_cf8._0_4_ = fVar217;
      uStack_cf8._4_4_ = fVar218;
      local_180 = local_d00;
      uStack_178 = uStack_cf8;
      local_d10._4_4_ = (int)(float)local_d00._4_4_;
      local_d10._0_4_ = (int)(float)local_d00._0_4_;
      local_d10._8_4_ = (int)fVar217;
      local_d10._12_4_ = (int)fVar218;
      local_9c0 = local_d10._0_8_;
      uStack_9b8 = local_d10._8_8_;
      auVar163._8_8_ = local_d10._8_8_;
      auVar163._0_8_ = local_d10._0_8_;
      auVar23 = vcvtdq2ps_avx(auVar163);
      local_cf0 = auVar23._0_8_;
      local_140 = local_cf0;
      uStack_ce8 = auVar23._8_8_;
      uStack_138 = uStack_ce8;
      local_150 = local_d00;
      uStack_148 = uStack_cf8;
      auVar193._8_8_ = uStack_cf8;
      auVar193._0_8_ = local_d00;
      auVar22 = vcmpps_avx(auVar193,auVar23,1);
      local_d30._0_8_ = auVar22._0_8_;
      local_ab0 = local_d30._0_8_;
      local_d30._8_8_ = auVar22._8_8_;
      uStack_aa8 = local_d30._8_8_;
      local_ac0 = 0x3f8000003f800000;
      uStack_ab8 = 0x3f8000003f800000;
      auVar157._8_8_ = 0x3f8000003f800000;
      auVar157._0_8_ = 0x3f8000003f800000;
      local_d30 = vpand_avx(auVar22,auVar157);
      local_c00 = local_cf0;
      uStack_bf8 = uStack_ce8;
      local_c10 = local_d30._0_8_;
      uStack_c08 = local_d30._8_8_;
      _local_d00 = vsubps_avx(auVar23,local_d30);
      local_748 = local_d00;
      local_738 = ::_ps_cephes_exp_C1;
      local_968 = local_ce0;
      local_210 = local_d00;
      uStack_208 = uStack_cf8;
      local_220[0] = 0.6933594;
      local_220[1] = 0.6933594;
      afStack_218[0] = 0.6933594;
      afStack_218[1] = 0.6933594;
      local_230 = local_ce0._0_8_;
      uStack_228 = local_ce0._8_8_;
      auVar189._8_4_ = 0.6933594;
      auVar189._12_4_ = 0.6933594;
      auVar189._0_4_ = 0.6933594;
      auVar189._4_4_ = 0.6933594;
      auVar22 = vfnmadd213ps_fma(auVar189,_local_d00,auVar16);
      local_750 = ::_ps_cephes_exp_C2;
      local_1e0 = local_d00;
      uStack_1d8 = uStack_cf8;
      local_1f0[0] = -0.00021219444;
      local_1f0[1] = -0.00021219444;
      afStack_1e8[0] = -0.00021219444;
      afStack_1e8[1] = -0.00021219444;
      local_ce0._0_8_ = auVar22._0_8_;
      local_200 = local_ce0._0_8_;
      local_ce0._8_8_ = auVar22._8_8_;
      uStack_1f8 = local_ce0._8_8_;
      auVar190._8_4_ = -0.00021219444;
      auVar190._12_4_ = -0.00021219444;
      auVar190._0_4_ = -0.00021219444;
      auVar190._4_4_ = -0.00021219444;
      local_ce0 = vfnmadd213ps_fma(auVar190,_local_d00,auVar22);
      local_cb0 = local_ce0._0_8_;
      uStack_ca8 = local_ce0._8_8_;
      local_ca0._0_4_ = local_ce0._0_4_;
      local_ca0._4_4_ = local_ce0._4_4_;
      uStack_c98._0_4_ = local_ce0._8_4_;
      uStack_c98._4_4_ = local_ce0._12_4_;
      local_cf0._4_4_ = local_ca0._4_4_ * local_ca0._4_4_;
      local_cf0._0_4_ = (float)local_ca0 * (float)local_ca0;
      uStack_ce8._0_4_ = (float)uStack_c98 * (float)uStack_c98;
      uStack_ce8._4_4_ = uStack_c98._4_4_ * uStack_c98._4_4_;
      uStack_d38._0_4_ = 0x39506967;
      local_d40 = (undefined1  [8])0x3950696739506967;
      uStack_d38._4_4_ = 0x39506967;
      local_958 = local_d40;
      local_8f0 = ::_ps_cephes_exp_p1;
      local_3c0 = 0x3950696739506967;
      uStack_3b8 = uStack_d38;
      local_3d0 = local_ce0._0_8_;
      uStack_3c8 = local_ce0._8_8_;
      local_3e0[0] = 0.0013981999;
      local_3e0[1] = 0.0013981999;
      afStack_3d8[0] = 0.0013981999;
      afStack_3d8[1] = 0.0013981999;
      auVar181._8_4_ = 0.0013981999;
      auVar181._12_4_ = 0.0013981999;
      auVar181._0_4_ = 0.0013981999;
      auVar181._4_4_ = 0.0013981999;
      auVar22 = vfmadd213ps_fma(local_ce0,_local_d40,auVar181);
      local_908 = ::_ps_cephes_exp_p2;
      local_d40 = auVar22._0_8_;
      local_390 = local_d40;
      uStack_d38 = auVar22._8_8_;
      uStack_388 = uStack_d38;
      local_3a0 = local_ce0._0_8_;
      uStack_398 = local_ce0._8_8_;
      local_3b0[0] = 0.008333452;
      local_3b0[1] = 0.008333452;
      afStack_3a8[0] = 0.008333452;
      afStack_3a8[1] = 0.008333452;
      auVar182._8_4_ = 0.008333452;
      auVar182._12_4_ = 0.008333452;
      auVar182._0_4_ = 0.008333452;
      auVar182._4_4_ = 0.008333452;
      auVar22 = vfmadd213ps_fma(local_ce0,auVar22,auVar182);
      local_920 = ::_ps_cephes_exp_p3;
      local_d40 = auVar22._0_8_;
      local_360 = local_d40;
      uStack_d38 = auVar22._8_8_;
      uStack_358 = uStack_d38;
      local_370 = local_ce0._0_8_;
      uStack_368 = local_ce0._8_8_;
      local_380[0] = 0.041665796;
      local_380[1] = 0.041665796;
      afStack_378[0] = 0.041665796;
      afStack_378[1] = 0.041665796;
      auVar183._8_4_ = 0.041665796;
      auVar183._12_4_ = 0.041665796;
      auVar183._0_4_ = 0.041665796;
      auVar183._4_4_ = 0.041665796;
      auVar22 = vfmadd213ps_fma(local_ce0,auVar22,auVar183);
      local_938 = ::_ps_cephes_exp_p4;
      local_d40 = auVar22._0_8_;
      local_330 = local_d40;
      uStack_d38 = auVar22._8_8_;
      uStack_328 = uStack_d38;
      local_340 = local_ce0._0_8_;
      uStack_338 = local_ce0._8_8_;
      local_350[0] = 0.16666666;
      local_350[1] = 0.16666666;
      afStack_348[0] = 0.16666666;
      afStack_348[1] = 0.16666666;
      auVar184._8_4_ = 0.16666666;
      auVar184._12_4_ = 0.16666666;
      auVar184._0_4_ = 0.16666666;
      auVar184._4_4_ = 0.16666666;
      auVar22 = vfmadd213ps_fma(local_ce0,auVar22,auVar184);
      local_950 = ::_ps_cephes_exp_p5;
      local_d40 = auVar22._0_8_;
      local_300 = local_d40;
      uStack_d38 = auVar22._8_8_;
      uStack_2f8 = uStack_d38;
      local_310 = local_ce0._0_8_;
      uStack_308 = local_ce0._8_8_;
      local_320[0] = 0.5;
      local_320[1] = 0.5;
      afStack_318[0] = 0.5;
      afStack_318[1] = 0.5;
      auVar185._8_4_ = 0.5;
      auVar185._12_4_ = 0.5;
      auVar185._0_4_ = 0.5;
      auVar185._4_4_ = 0.5;
      auVar22 = vfmadd213ps_fma(local_ce0,auVar22,auVar185);
      local_960 = local_cf0;
      local_d40 = auVar22._0_8_;
      local_2d0 = local_d40;
      uStack_d38 = auVar22._8_8_;
      uStack_2c8 = uStack_d38;
      local_2e0 = local_cf0;
      uStack_2d8 = uStack_ce8;
      local_2f0 = local_ce0._0_8_;
      uStack_2e8 = local_ce0._8_8_;
      auVar22 = vfmadd213ps_fma(_local_cf0,auVar22,local_ce0);
      local_d40 = auVar22._0_8_;
      uVar35 = local_d40;
      uStack_d38 = auVar22._8_8_;
      uVar36 = uStack_d38;
      local_c70 = 0x3f8000003f800000;
      uStack_c68 = 0x3f8000003f800000;
      local_c60._0_4_ = auVar22._0_4_;
      local_c60._4_4_ = auVar22._4_4_;
      uStack_c58._0_4_ = auVar22._8_4_;
      uStack_c58._4_4_ = auVar22._12_4_;
      local_d40._4_4_ = local_c60._4_4_ + 1.0;
      local_d40._0_4_ = (float)local_c60 + 1.0;
      uStack_d38._0_4_ = (float)uStack_c58 + 1.0;
      uStack_d38._4_4_ = uStack_c58._4_4_ + 1.0;
      local_190._0_4_ = local_d00._0_4_;
      local_190._4_4_ = local_d00._4_4_;
      uStack_188._0_4_ = local_d00._8_4_;
      uStack_188._4_4_ = local_d00._12_4_;
      local_d10._4_4_ = (int)local_190._4_4_;
      local_d10._0_4_ = (int)(float)local_190;
      local_d10._8_4_ = (int)(float)uStack_188;
      local_d10._12_4_ = (int)uStack_188._4_4_;
      local_100 = local_d10._0_8_;
      uStack_f8 = local_d10._8_8_;
      local_110 = 0x7f0000007f;
      uStack_108 = 0x7f0000007f;
      auVar196._8_8_ = local_d10._8_8_;
      auVar196._0_8_ = local_d10._0_8_;
      auVar195._8_8_ = 0x7f0000007f;
      auVar195._0_8_ = 0x7f0000007f;
      auVar22 = vpaddd_avx(auVar196,auVar195);
      local_d10._0_8_ = auVar22._0_8_;
      local_c0 = local_d10._0_8_;
      local_d10._8_8_ = auVar22._8_8_;
      uStack_b8 = local_d10._8_8_;
      local_c4 = 0x17;
      local_d10 = vpslld_avx(auVar22,ZEXT416(0x17));
      local_90 = local_d10._0_8_;
      uStack_88 = local_d10._8_8_;
      local_d50 = local_d10._0_8_;
      uStack_d48 = local_d10._8_8_;
      local_cc0 = _local_d40;
      local_cd0._0_4_ = local_d10._0_4_;
      local_cd0._4_4_ = local_d10._4_4_;
      uStack_cc8._0_4_ = local_d10._8_4_;
      uStack_cc8._4_4_ = local_d10._12_4_;
      local_d40._0_4_ = ((float)local_c60 + 1.0) * (float)local_cd0;
      local_d40._4_4_ = (local_c60._4_4_ + 1.0) * local_cd0._4_4_;
      uStack_cc8._0_4_ = ((float)uStack_c58 + 1.0) * (float)uStack_cc8;
      uStack_cc8._4_4_ = (uStack_c58._4_4_ + 1.0) * uStack_cc8._4_4_;
      uStack_d38._0_4_ = (float)uStack_cc8;
      uStack_d38._4_4_ = uStack_cc8._4_4_;
      local_d70 = local_d40;
      uStack_d68 = uStack_d38;
      local_bd0 = (float)local_d40._0_4_ + 1.0;
      fStack_bcc = (float)local_d40._4_4_ + 1.0;
      fStack_bc8 = (float)uStack_cc8 + 1.0;
      fStack_bc4 = uStack_cc8._4_4_ + 1.0;
      auVar151._4_4_ = fStack_bcc;
      auVar151._0_4_ = local_bd0;
      auVar151._8_4_ = fStack_bc8;
      auVar151._12_4_ = fStack_bc4;
      _local_1130 = vdivps_avx(local_d60,auVar151);
      local_da0._0_4_ = (float)local_1130._0_4_ * 2.0;
      local_da0._4_4_ = (float)local_1130._4_4_ * 2.0;
      local_da0._8_4_ = fStack_1128 * 2.0;
      local_da0._12_4_ = fStack_1124 * 2.0;
      auVar149._8_8_ = 0x3f8000003f800000;
      auVar149._0_8_ = 0x3f8000003f800000;
      _local_1190 = vsubps_avx(local_da0,auVar149);
      local_1180._0_4_ = (undefined4)local_6b80;
      local_1180._4_4_ = (undefined4)((ulong)local_6b80 >> 0x20);
      fStack_1178 = (float)uStack_6b78;
      fStack_1174 = (float)((ulong)uStack_6b78 >> 0x20);
      local_6df0 = CONCAT44((float)local_1180._4_4_ * (float)local_1190._4_4_,
                            (float)local_1180._0_4_ * (float)local_1190._0_4_);
      uStack_6de8 = CONCAT44(fStack_1174 * fStack_1184,fStack_1178 * fStack_1188);
      local_6b58 = local_6d00;
      local_6b70 = local_6df0;
      uStack_6b68 = uStack_6de8;
      auVar22._8_8_ = uStack_6de8;
      auVar22._0_8_ = local_6df0;
      *(undefined1 (*) [16])*local_6d00 = auVar22;
      local_6d00 = (undefined1 (*) [64])(*local_6d00 + 0x10);
      _local_1180 = auVar202;
      local_1140 = local_1170;
      uStack_1138 = uStack_1168;
      local_1120 = local_1170;
      uStack_1118 = uStack_1168;
      local_1110 = local_1080;
      uStack_1108 = uStack_1078;
      local_1040 = uVar31;
      uStack_1038 = uVar32;
      local_1020 = local_1030;
      uStack_1018 = uStack_1028;
      local_1010 = local_1100;
      uStack_1008 = uStack_10f8;
      local_ff0 = local_10e0._0_8_;
      uStack_fe8 = local_10e0._8_8_;
      local_fe0 = uVar29;
      uStack_fd8 = uVar30;
      local_fc0 = uVar27;
      uStack_fb8 = uVar28;
      local_f10 = local_f50._0_8_;
      uStack_f08 = local_f50._8_8_;
      local_ee0 = local_ef0;
      uStack_ed8 = uStack_ee8;
      local_ec0 = uVar20;
      uStack_eb8 = uVar24;
      local_ea0 = uVar25;
      uStack_e98 = uVar26;
      uStack_e6c = local_e70;
      uStack_e68 = local_e70;
      uStack_e64 = local_e70;
      uStack_e4c = local_e50;
      uStack_e48 = local_e50;
      uStack_e44 = local_e50;
      uStack_e2c = local_e30;
      uStack_e28 = local_e30;
      uStack_e24 = local_e30;
      local_db0 = local_1160;
      uStack_da8 = uStack_1158;
      local_cd0 = local_d10._0_8_;
      uStack_cc8 = local_d10._8_8_;
      local_ca0 = local_cb0;
      uStack_c98 = uStack_ca8;
      local_c80 = uVar33;
      uStack_c78 = uVar34;
      local_c60 = uVar35;
      uStack_c58 = uVar36;
      uStack_c2c = local_c30;
      uStack_c28 = local_c30;
      uStack_c24 = local_c30;
      local_bc0 = local_d60;
      local_948 = local_968;
      local_940 = local_958;
      local_930 = local_968;
      local_928 = local_958;
      local_918 = local_968;
      local_910 = local_958;
      local_900 = local_968;
      local_8f8 = local_958;
      local_8e8 = local_968;
      local_8e0 = local_958;
      local_8b8 = local_8d8;
      local_8b0 = local_8c8;
      local_8a0 = local_8d8;
      local_898 = local_8c8;
      local_888 = local_8d8;
      local_880 = local_8c8;
      local_870 = local_8d8;
      local_868 = local_8c8;
      local_858 = local_8d8;
      local_850 = local_8c8;
      local_820 = local_838;
      local_810 = local_848;
      local_808 = local_830;
      local_7f8 = local_848;
      local_7f0 = local_830;
      local_7e0 = local_848;
      local_7d8 = local_830;
      local_7c8 = local_848;
      local_7c0 = local_830;
      local_7b0 = local_848;
      local_7a8 = local_830;
      local_798 = local_848;
      local_790 = local_830;
      local_780 = local_848;
      local_778 = local_830;
      local_768 = local_848;
      local_760 = local_830;
      local_758 = local_968;
      local_740 = local_968;
      local_730 = local_748;
      local_728 = local_8d8;
      local_710 = local_8d8;
      local_700 = local_718;
      local_6f8 = local_830;
      local_1a0 = local_6b80;
      uStack_198 = uStack_6b78;
      local_190 = local_d00;
      uStack_188 = uStack_cf8;
      local_170 = local_f40;
      uStack_168 = uStack_f38;
    }
    for (; local_6d58 < local_6cf0; local_6d58 = local_6d58 + 1) {
      fVar217 = *(float *)*local_6d00;
      fVar218 = expf(*(float *)*local_6d00);
      fVar218 = logf(fVar218 + 1.0);
      fVar218 = tanhf(fVar218);
      *(float *)*local_6d00 = fVar217 * fVar218;
      local_6d00 = (undefined1 (*) [64])(*local_6d00 + 4);
    }
  }
  return 0;
}

Assistant:

int Mish_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = mish_avx512(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = mish_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = mish_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr * tanhf(logf(expf(*ptr) + 1.f));
            ptr++;
        }
    }

    return 0;
}